

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sten.cpp
# Opt level: O3

void __thiscall amrex::MLNodeLaplacian::buildStencil(MLNodeLaplacian *this)

{
  Array4<const_int> *pAVar1;
  size_t __n;
  _func_int *p_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  _func_int *p_Var7;
  _func_int *p_Var8;
  _func_int *p_Var9;
  int iVar10;
  int iVar11;
  int iVar12;
  long *plVar13;
  DistributionMapping *pDVar14;
  pointer puVar15;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar16;
  Geometry *this_00;
  Array4<double> *pAVar17;
  FabArray<amrex::IArrayBox> *pFVar18;
  Array4<const_int> *pAVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  IndexType IVar22;
  uint uVar23;
  _func_int ***ppp_Var24;
  undefined4 uVar25;
  int iVar26;
  int iVar27;
  int i;
  FabType FVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  MultiFab *pMVar32;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var33;
  long lVar34;
  undefined1 auVar35 [8];
  element_type *peVar36;
  Arena *arena;
  double *pdVar37;
  Periodicity *period;
  int iVar38;
  int iVar39;
  uint uVar40;
  int *piVar41;
  long lVar42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var43;
  long lVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  uint *puVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  FabArray<amrex::FArrayBox> *pFVar54;
  FabArray<amrex::FArrayBox> *pFVar55;
  _func_int *p_Var56;
  long lVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  uint uVar66;
  _func_int *p_Var67;
  long lVar68;
  _func_int *p_Var69;
  long lVar70;
  long lVar71;
  long lVar72;
  Array4<double> *pAVar73;
  long lVar74;
  long lVar75;
  _func_int *p_Var76;
  long lVar77;
  long lVar78;
  void *pvVar79;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var80;
  long lVar81;
  long lVar82;
  IndexType IVar83;
  long lVar84;
  int i_1;
  int iVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  bool bVar90;
  bool bVar91;
  bool bVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  double dVar102;
  double dVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  Real RVar106;
  undefined1 auVar107 [16];
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  Real wpp_2;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  Real w1_4;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  pointer piVar152;
  undefined1 auVar153 [16];
  ulong uVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  Real w1_2;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  Real wpm_6;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  int iVar199;
  Real wpm_7;
  int iVar207;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  Real w1_5;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  Real w1_6;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  Real w1_3;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  Real w1_7;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  Real wpp_3;
  Periodicity PVar237;
  int i_2;
  Real wpm_5;
  Real wpp_1;
  Real wpp;
  Real wpm_4;
  Real wpm_1;
  Box result;
  Real w1_1;
  Real wpm_2;
  FArrayBox sgfab;
  Real facz;
  FArrayBox cnfab;
  Real wpm_3;
  MFIter mfi;
  Real wpm;
  Array4<double> ns_starr;
  Box bx;
  Real w1;
  MFIter mfi_1;
  Elixir cneli;
  Box tbx;
  Elixir sgeli;
  _func_int *local_1788;
  long local_1780;
  long local_1778;
  long local_1760;
  _func_int *local_1758;
  double local_1750;
  long local_1748;
  long local_1740;
  _func_int *local_1738;
  _func_int *local_1730;
  _func_int *local_1728;
  _func_int *local_1720;
  _func_int *local_1718;
  long local_1710;
  long local_1708;
  long local_1700;
  long local_16f8;
  _func_int *local_16e8;
  _func_int *local_16d8;
  long local_16b8;
  long local_16a0;
  long local_1698;
  _func_int *local_1688;
  _func_int *local_1678;
  long local_1668;
  _func_int *local_1648;
  long local_1630;
  _func_int *local_1608;
  _func_int *local_15f8;
  _func_int *local_15d8;
  _func_int *local_15c8;
  double local_15b8;
  long local_1568;
  double local_1558;
  long local_1548;
  _func_int *local_1530;
  long local_1518;
  double local_14f8;
  long local_14e8;
  double local_14d0;
  double local_14c8;
  long local_14b8;
  long local_1498;
  double local_1488;
  _func_int *local_1478;
  long local_1468;
  double local_1450;
  double local_1448;
  long local_1440;
  long local_1438;
  long local_1430;
  long local_1428;
  long local_1420;
  long local_1418;
  long local_1410;
  _func_int *local_1408;
  double *local_13f8;
  long local_13b8;
  long local_13a0;
  _func_int *local_1388;
  double local_1378;
  long local_1348;
  long local_1318;
  double local_1300;
  long local_12f8;
  long local_12f0;
  double local_12e8;
  long local_12d8;
  _func_int *local_12c8;
  double local_12a8;
  _func_int *local_1288;
  long local_1268;
  _func_int *local_1260;
  long local_1248;
  double local_1238;
  double local_1228;
  double local_11d8;
  long local_11c8;
  double *local_11b8;
  _func_int *local_1138;
  long local_1128;
  Box local_1118;
  _func_int *local_10f8;
  undefined8 uStack_10f0;
  _func_int *local_10e8;
  undefined8 uStack_10e0;
  _func_int *local_10d8;
  undefined8 uStack_10d0;
  double local_10c8;
  undefined8 uStack_10c0;
  _func_int *local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  long local_1098;
  _func_int **local_1090;
  _func_int *local_1088;
  undefined8 uStack_1080;
  _func_int *local_1078;
  undefined8 uStack_1070;
  undefined1 local_1068 [16];
  pointer local_1058;
  pointer piStack_1050;
  _func_int *local_1048;
  undefined8 uStack_1040;
  double local_1038;
  undefined8 uStack_1030;
  double local_1028;
  undefined8 uStack_1020;
  double *local_1018;
  undefined8 uStack_1010;
  double local_1008;
  undefined8 uStack_1000;
  _func_int *local_ff8;
  undefined8 uStack_ff0;
  _func_int *local_fe8;
  undefined8 uStack_fe0;
  _func_int *local_fd8;
  undefined8 uStack_fd0;
  double local_fc8;
  double dStack_fc0;
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  *local_fb0;
  undefined8 local_fa8;
  uint uStack_fa0;
  int iStack_f9c;
  int iStack_f98;
  uint uStack_f94;
  IndexType IStack_f90;
  FabArray<amrex::FArrayBox> *local_f88;
  undefined8 uStack_f80;
  _func_int *local_f78;
  undefined8 uStack_f70;
  _func_int *local_f68;
  undefined8 uStack_f60;
  double local_f58;
  undefined8 uStack_f50;
  _func_int *local_f48;
  undefined8 uStack_f40;
  double local_f38;
  undefined8 uStack_f30;
  _func_int *local_f28;
  undefined8 uStack_f20;
  _func_int *local_f18;
  undefined8 uStack_f10;
  _func_int *local_f08;
  undefined8 uStack_f00;
  _func_int *local_ef8;
  undefined8 uStack_ef0;
  FabArray<amrex::EBCellFlagFab> *local_ee8;
  undefined8 uStack_ee0;
  _Bit_type *local_ed8;
  double dStack_ed0;
  undefined1 local_ec8 [16];
  _func_int *local_eb8;
  undefined8 uStack_eb0;
  _func_int *local_ea8;
  undefined8 uStack_ea0;
  double local_e98;
  undefined8 uStack_e90;
  double local_e88;
  undefined8 uStack_e80;
  _func_int *local_e78;
  undefined8 uStack_e70;
  double local_e68;
  undefined1 local_e60 [8];
  undefined1 local_e58 [8];
  undefined1 auStack_e50 [12];
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  int local_e38;
  int local_e34;
  int local_e2c;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_e18;
  undefined8 uStack_e10;
  _func_int *local_e08;
  _Bit_type *p_Stack_e00;
  pointer local_df8;
  undefined8 uStack_df0;
  double local_de8;
  undefined8 uStack_de0;
  _func_int *local_dd8;
  double dStack_dd0;
  _func_int *local_dc8;
  undefined8 uStack_dc0;
  double local_db8;
  undefined8 uStack_db0;
  double local_da8;
  undefined8 uStack_da0;
  double local_d98;
  undefined8 uStack_d90;
  _func_int *local_d88;
  undefined8 uStack_d80;
  double local_d78;
  undefined8 uStack_d70;
  _func_int *local_d68;
  undefined8 uStack_d60;
  double local_d58;
  double dStack_d50;
  double local_d48;
  double dStack_d40;
  double local_d38;
  double dStack_d30;
  _func_int *local_d28;
  undefined8 uStack_d20;
  _func_int *local_d18;
  undefined8 uStack_d10;
  _func_int *local_d08;
  undefined8 uStack_d00;
  double local_cf8;
  undefined8 uStack_cf0;
  double local_ce8;
  undefined8 uStack_ce0;
  undefined1 local_cd8 [16];
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *local_cc0;
  double local_cb8;
  double local_cb0;
  double local_ca8;
  double local_ca0;
  _func_int *local_c98;
  _func_int **local_c90;
  _func_int **local_c88;
  double local_c80;
  double local_c78;
  BaseFab<double> local_c70;
  _func_int *local_c28;
  undefined8 uStack_c20;
  _func_int *local_c18;
  undefined8 uStack_c10;
  _func_int *local_c08;
  undefined8 uStack_c00;
  _func_int *local_bf8;
  undefined8 uStack_bf0;
  _func_int *local_be8;
  undefined8 uStack_be0;
  double local_bd8;
  undefined8 uStack_bd0;
  _func_int *local_bc8;
  undefined8 uStack_bc0;
  double local_bb8;
  undefined8 uStack_bb0;
  undefined1 local_ba0 [32];
  int aiStack_b80 [18];
  double local_b38;
  undefined8 uStack_b30;
  double local_b28;
  undefined8 uStack_b20;
  _func_int *local_b18;
  undefined8 uStack_b10;
  _func_int *local_b08;
  undefined8 uStack_b00;
  _func_int *local_af8;
  undefined8 uStack_af0;
  undefined1 local_ae8 [8];
  uint uStack_ae0;
  Orientation OStack_adc;
  uint local_ad8;
  int iStack_ad4;
  long lStack_ad0;
  int local_ac8;
  int iStack_ac4;
  int iStack_ac0;
  int iStack_abc;
  int iStack_ab8;
  undefined8 uStack_ab4;
  _func_int *local_aa8;
  undefined8 uStack_aa0;
  _func_int *local_a98;
  undefined8 uStack_a90;
  _func_int *local_a88;
  undefined8 uStack_a80;
  _func_int *local_a78;
  undefined8 uStack_a70;
  double local_a68;
  undefined8 uStack_a60;
  _func_int *local_a58;
  undefined8 uStack_a50;
  double local_a48;
  undefined8 uStack_a40;
  double local_a38;
  undefined8 uStack_a30;
  _func_int *local_a28;
  undefined8 uStack_a20;
  _func_int *local_a18;
  undefined8 uStack_a10;
  _func_int *local_a08;
  undefined8 uStack_a00;
  _func_int *local_9f8;
  undefined8 uStack_9f0;
  _func_int *local_9e8;
  undefined8 uStack_9e0;
  _func_int *local_9d8;
  undefined8 uStack_9d0;
  _func_int *local_9c8;
  undefined8 uStack_9c0;
  _func_int *local_9b8;
  undefined8 uStack_9b0;
  double local_9a8;
  undefined8 uStack_9a0;
  _func_int *local_998;
  undefined8 uStack_990;
  _func_int *local_988;
  undefined8 uStack_980;
  _func_int *local_978;
  undefined8 uStack_970;
  ulong local_960;
  long local_958;
  _func_int **local_950;
  double local_948;
  double local_940;
  double local_938;
  double local_930;
  double local_928;
  double local_920;
  double local_918;
  double local_910;
  double local_908;
  double local_900;
  double local_8f8;
  double local_8f0;
  double local_8e8;
  double local_8e0;
  long local_8d8;
  _func_int **local_8d0;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  double *local_8b8;
  uint uStack_8b0;
  int aiStack_8ac [5];
  double local_898;
  undefined8 uStack_890;
  _func_int *local_888;
  undefined8 uStack_880;
  _func_int *local_878;
  undefined8 uStack_870;
  _func_int *local_868;
  undefined8 uStack_860;
  _func_int *local_858;
  undefined8 uStack_850;
  _func_int *local_848;
  undefined8 uStack_840;
  _func_int *local_838;
  undefined8 uStack_830;
  double local_828;
  undefined8 uStack_820;
  undefined1 local_818 [12];
  Orientation OStack_80c;
  int local_808;
  int iStack_804;
  long lStack_800;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  undefined1 auStack_7e8 [12];
  _func_int *local_7d8;
  undefined8 uStack_7d0;
  _func_int *local_7c8;
  undefined8 uStack_7c0;
  _func_int *local_7b8;
  undefined8 uStack_7b0;
  _func_int *local_7a8;
  undefined8 uStack_7a0;
  _func_int *local_798;
  undefined8 uStack_790;
  _func_int *local_788;
  undefined8 uStack_780;
  _func_int *local_778;
  undefined8 uStack_770;
  _func_int *local_768;
  undefined8 uStack_760;
  _func_int *local_758;
  undefined8 uStack_750;
  _func_int *local_748;
  undefined8 uStack_740;
  _func_int *local_738;
  undefined8 uStack_730;
  _func_int *local_728;
  undefined8 uStack_720;
  _func_int *local_718;
  undefined8 uStack_710;
  _func_int *local_708;
  undefined8 uStack_700;
  double local_6f8;
  undefined8 uStack_6f0;
  double local_6e8;
  undefined8 uStack_6e0;
  _func_int *local_6d8;
  undefined8 uStack_6d0;
  _func_int *local_6c8;
  undefined8 uStack_6c0;
  double local_6b8;
  undefined8 uStack_6b0;
  _func_int *local_6a8;
  undefined8 uStack_6a0;
  _func_int *local_698;
  undefined8 uStack_690;
  _func_int *local_688;
  undefined8 uStack_680;
  double local_678;
  undefined8 uStack_670;
  _func_int *local_668;
  undefined8 uStack_660;
  double local_658;
  undefined8 uStack_650;
  double local_648;
  undefined8 uStack_640;
  double local_638;
  undefined8 uStack_630;
  double local_628;
  undefined8 uStack_620;
  double local_618;
  undefined8 uStack_610;
  _func_int *local_608;
  undefined8 uStack_600;
  _func_int *local_5f8;
  undefined8 uStack_5f0;
  _func_int *local_5e8;
  undefined8 uStack_5e0;
  double local_5d8;
  undefined8 uStack_5d0;
  double local_5c8;
  undefined8 uStack_5c0;
  _func_int *local_5b8;
  undefined8 uStack_5b0;
  _func_int *local_5a8;
  undefined8 uStack_5a0;
  _func_int *local_598;
  undefined8 uStack_590;
  _func_int *local_588;
  undefined8 uStack_580;
  _func_int *local_578;
  undefined8 uStack_570;
  _func_int *local_568;
  undefined8 uStack_560;
  _func_int *local_558;
  undefined8 uStack_550;
  _func_int *local_548;
  undefined8 uStack_540;
  double local_538;
  undefined8 uStack_530;
  _func_int *local_528;
  undefined8 uStack_520;
  _func_int *local_518;
  undefined8 uStack_510;
  _func_int *local_508;
  undefined8 uStack_500;
  _func_int *local_4f8;
  undefined8 uStack_4f0;
  _func_int *local_4e8;
  undefined8 uStack_4e0;
  _func_int *local_4d8;
  undefined8 uStack_4d0;
  _func_int *local_4c8;
  undefined8 uStack_4c0;
  _func_int *local_4b8;
  undefined8 uStack_4b0;
  FabArray<amrex::FArrayBox> *local_4a8;
  long local_4a0;
  long local_498;
  _func_int **local_490;
  _func_int *local_488;
  undefined8 uStack_480;
  MFItInfo local_46c;
  Box local_458;
  double local_438;
  undefined8 uStack_430;
  double local_428;
  undefined8 uStack_420;
  _func_int *local_418;
  undefined8 uStack_410;
  double local_408;
  undefined8 uStack_400;
  _func_int *local_3f8;
  undefined8 uStack_3f0;
  _func_int *local_3e8;
  undefined8 uStack_3e0;
  _func_int *local_3d8;
  undefined8 uStack_3d0;
  _func_int **local_3c8;
  undefined8 uStack_3c0;
  _func_int *local_3b8;
  undefined8 uStack_3b0;
  _func_int *local_3a8;
  undefined8 uStack_3a0;
  _func_int *local_398;
  undefined8 uStack_390;
  long local_388;
  FabArray<amrex::FArrayBox> *local_380;
  long local_378;
  ulong local_370;
  Arena *local_368;
  long local_360;
  _func_int **local_350;
  ulong local_348;
  long local_340;
  _func_int **local_338;
  _func_int **local_330;
  _func_int **local_328;
  _func_int **local_320;
  _func_int **local_318;
  _func_int **local_310;
  _func_int **local_308;
  ulong local_300;
  FabArray<amrex::FArrayBox> *local_2f8;
  long local_2f0;
  _func_int **local_2e8;
  _func_int **local_2e0;
  _func_int **local_2d8;
  _func_int **local_2d0;
  _func_int **local_2c8;
  _func_int **local_2c0;
  _func_int **local_2b8;
  _func_int **local_2b0;
  _func_int **local_2a8;
  _func_int **local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  undefined1 local_268 [124];
  int local_1ec;
  int local_1e8;
  pointer local_1e0;
  pointer piStack_1d8;
  _Bit_type *local_1d0;
  _func_int *local_1c8;
  _Bit_type *p_Stack_1c0;
  Real local_1b8;
  IntVect local_1a8;
  int local_19c;
  Elixir local_e0;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  Elixir local_48;
  
  local_fb0 = &this->m_stencil;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::resize(&local_fb0->
            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  local_cc0 = &this->m_nosigma_stencil;
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::resize(&local_cc0->
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::resize(&(this->m_s0_norm0).
            super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  uVar66 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
  uVar31 = (ulong)uVar66;
  if (0 < (int)uVar66) {
    lVar51 = 0;
    lVar86 = 0;
    do {
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::resize((vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)((long)&(((this->m_stencil).
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          ).
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  + lVar51),
               (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                     super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar86]);
      local_268._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->m_s0_norm0).
                           super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_> + lVar51),
                 (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                       super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar86],(value_type_conflict2 *)local_268);
      lVar86 = lVar86 + 1;
      uVar31 = (ulong)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
      lVar51 = lVar51 + 0x18;
    } while (lVar86 < (long)uVar31);
  }
  if ((this->super_MLNodeLinOp).m_coarsening_strategy != RAP) {
    return;
  }
  if (**(int **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                   super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> == 1) {
    Assert_host("!m_geom[0][0].IsRZ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sten.cpp"
                ,0x22,"\"MLNodeLaplacian::buildStencil: cylindrical not supported for RAP\"");
    uVar31 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
  }
  if (0 < (int)uVar31) {
    uVar47 = 0;
    do {
      if ((uVar47 != (int)uVar31 - 1) &&
         ((this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar47] != 2)) {
        Assert_host("amrlev == m_num_amr_levels-1 || AMRRefRatio(amrlev) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sten.cpp"
                    ,0x26,(char *)0x0);
      }
      uVar66 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar47];
      uVar31 = (ulong)uVar66;
      local_1098 = uVar47 * 3;
      if (0 < (int)uVar66) {
        local_1778 = 0;
        lVar51 = 0;
        uVar154 = 0;
        do {
          local_e60 = (undefined1  [8])0x100000001;
          local_e58._0_4_ = 1;
          convert((BoxArray *)local_268,
                  (BoxArray *)
                  (*(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                             super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar47].
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> +
                  lVar51),(IntVect *)local_e60);
          lVar86 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
                             super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar47].
                             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             .
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
          ;
          pMVar32 = (MultiFab *)operator_new(0x180);
          uVar93 = uVar154 + 1;
          local_ba0[0] = true;
          local_ba0._1_2_ = null >> 8;
          local_ba0[3] = null >> 0x18;
          local_ba0._4_4_ = (IndexType)0x0;
          stack0xfffffffffffff478 = (undefined1  [16])0x0;
          local_ba0._8_4_ = 0;
          local_ba0._12_4_ = 0;
          local_ba0._16_4_ = 0;
          local_ba0._20_4_ = 0;
          local_c70._vptr_BaseFab = (_func_int **)&PTR__FabFactory_00712918;
          MultiFab::MultiFab(pMVar32,(BoxArray *)local_268,
                             (DistributionMapping *)(lVar86 + local_1778),9,
                             (uint)((uVar31 & 0xffffffff) != uVar93 || uVar47 != 0) * 3 + 1,
                             (MFInfo *)local_ba0,(FabFactory<amrex::FArrayBox> *)&local_c70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_ba0 + 0x10));
          lVar86 = *(long *)((long)&(((local_fb0->
                                      super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                      ).
                                      super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                    ).
                                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            + local_1098 * 8);
          plVar13 = *(long **)(lVar86 + uVar154 * 8);
          *(MultiFab **)(lVar86 + uVar154 * 8) = pMVar32;
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))();
          }
          BoxArray::~BoxArray((BoxArray *)local_268);
          pFVar55 = *(FabArray<amrex::FArrayBox> **)
                     (*(long *)((long)&(((this->m_stencil).
                                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       ).
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               + local_1098 * 8) + uVar154 * 8);
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (pFVar55,0.0,0,(pFVar55->super_FabArrayBase).n_comp,
                     &(pFVar55->super_FabArrayBase).n_grow);
          uVar31 = (ulong)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar47];
          lVar51 = lVar51 + 0x68;
          local_1778 = local_1778 + 0x10;
          uVar154 = uVar93;
        } while ((long)uVar93 < (long)uVar31);
      }
      if (uVar47 != 0) {
        local_e60 = (undefined1  [8])0x100000001;
        local_e58._0_4_ = 1;
        convert((BoxArray *)local_268,
                *(BoxArray **)
                 &(this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                  super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar47].
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                (IntVect *)local_e60);
        pDVar14 = *(DistributionMapping **)
                   &(this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar47].
                    super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    .
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
        ;
        _Var33.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
             operator_new(0x180);
        local_ba0[0] = true;
        local_ba0._1_2_ = null >> 8;
        local_ba0[3] = null >> 0x18;
        local_ba0._4_4_ = (IndexType)0x0;
        stack0xfffffffffffff478 = (undefined1  [16])0x0;
        local_ba0._8_4_ = 0;
        local_ba0._12_4_ = 0;
        local_ba0._16_4_ = 0;
        local_ba0._20_4_ = 0;
        local_c70._vptr_BaseFab = (_func_int **)&PTR__FabFactory_00712918;
        MultiFab::MultiFab((MultiFab *)
                           _Var33.
                           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                           .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                           (BoxArray *)local_268,pDVar14,9,4,(MFInfo *)local_ba0,
                           (FabFactory<amrex::FArrayBox> *)&local_c70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_ba0 + 0x10));
        puVar15 = (local_cc0->
                  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ).
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        tVar16.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
              &puVar15[uVar47]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        puVar15[uVar47]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
             _Var33.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        if (tVar16.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar16.
                                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
        BoxArray::~BoxArray((BoxArray *)local_268);
        _Var33.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (local_cc0->
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar47]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   _Var33.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
                   *(int *)((long)_Var33.
                                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl +
                           0xcc),
                   (IntVect *)
                   ((long)_Var33.
                          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
      }
      local_388 = uVar47 * 0x18;
      this_00 = *(Geometry **)
                 &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar47].
                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      dVar103 = (this_00->super_CoordSys).inv_dx[0];
      dVar187 = (this_00->super_CoordSys).inv_dx[1];
      dVar102 = (this_00->super_CoordSys).inv_dx[2];
      lVar51 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar47].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ;
      if ((lVar51 == 0) ||
         (lVar51 = __dynamic_cast(lVar51,&FabFactory<amrex::FArrayBox>::typeinfo,
                                  &EBFArrayBoxFactory::typeinfo,0), lVar51 == 0)) {
        local_e18._M_head_impl =
             *(MultiFab **)
              &(this->m_integral).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar47]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        local_f78 = (_func_int *)
                    CONCAT44(local_f78._4_4_,(int)CONCAT71(SUB87(local_e18._M_head_impl,1),1));
        local_ee8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        local_f88 = (FabArray<amrex::FArrayBox> *)0x0;
      }
      else {
        local_ee8 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar51 + 0xd8));
        local_e18._M_head_impl =
             *(MultiFab **)
              &(this->m_integral).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar47]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        local_f88 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar51 + 0xd8))->
                     super_FabArray<amrex::FArrayBox>;
        local_f78 = (_func_int *)((ulong)local_f78 & 0xffffffff00000000);
      }
      local_46c.device_sync = true;
      local_46c.num_streams = Gpu::Device::max_gpu_streams.itype;
      local_46c.do_tiling = true;
      local_46c.tilesize.vect[2] = DAT_00717ec0;
      local_46c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
      local_46c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
      local_46c.dynamic = true;
      FArrayBox::FArrayBox((FArrayBox *)local_e60);
      FArrayBox::FArrayBox((FArrayBox *)&local_c70);
      MFIter::MFIter((MFIter *)local_ba0,
                     (FabArrayBase *)
                     **(undefined8 **)
                       ((long)&(((local_fb0->
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ).
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               ).
                               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       + local_1098 * 8),&local_46c);
      if (aiStack_b80[0] < aiStack_b80[2]) {
        local_cd8._0_8_ = dVar102 * 0.027777777777777776 * dVar102;
        local_cd8._8_8_ = 0;
        local_10a8._0_8_ = (double)local_cd8._0_8_ + (double)local_cd8._0_8_;
        local_10a8._8_8_ = 0;
        dVar102 = -(double)local_10a8._0_8_;
        dVar108 = (double)local_cd8._0_8_ * 4.0;
        dVar109 = -(double)local_cd8._0_8_;
        local_fc8 = dVar103 * 0.027777777777777776 * dVar103;
        auVar153._8_8_ = dVar187 * 0.027777777777777776 * dVar187;
        dVar187 = local_fc8 * 4.0;
        local_d38 = auVar153._8_8_ + auVar153._8_8_;
        local_dd8 = (_func_int *)-local_d38;
        dStack_dd0 = -auVar153._8_8_;
        local_d48 = local_fc8 + local_fc8;
        local_d58 = auVar153._8_8_ * 4.0;
        local_e08 = (_func_int *)
                    ((double)local_10a8._0_8_ + ((local_fc8 + local_fc8) - auVar153._8_8_));
        p_Stack_e00 = (_Bit_type *)
                      ((double)local_10a8._0_8_ + ((auVar153._8_8_ + auVar153._8_8_) - local_fc8));
        local_1058 = (pointer)((double)local_cd8._0_8_ * -2.0 + (local_d58 - local_d48));
        piStack_1050 = (pointer)((double)local_cd8._0_8_ * 4.0 + ((double)local_dd8 - local_d48));
        dVar103 = local_fc8 * -2.0;
        auVar153._0_8_ = local_fc8 + auVar153._8_8_ + (double)local_cd8._0_8_;
        dVar223 = -auVar153._8_8_;
        dVar228 = -local_fc8;
        local_ed8 = (_Bit_type *)((local_d48 + local_d38) - (double)local_cd8._0_8_);
        local_1068._0_8_ = (dVar187 - local_d38) - (double)local_10a8._0_8_;
        local_1068._8_8_ = auVar153._8_8_;
        dStack_fc0 = auVar153._8_8_;
        dStack_ed0 = auVar153._8_8_;
        local_ec8 = auVar153;
        dStack_d50 = auVar153._8_8_;
        dStack_d40 = auVar153._8_8_;
        dStack_d30 = auVar153._8_8_;
        do {
          BATransformer::operator()
                    (&local_458,(BATransformer *)(CONCAT44(local_ba0._12_4_,local_ba0._8_4_) + 8),
                     (Box *)((long)*(int *)(*(long *)aiStack_b80._24_8_ + (long)aiStack_b80[0] * 4)
                             * 0x1c + **(long **)(CONCAT44(local_ba0._12_4_,local_ba0._8_4_) + 0x50)
                            ));
          local_458.smallend.vect._0_8_ =
               CONCAT44(local_458.smallend.vect[1] + -1,local_458.smallend.vect[0] + -1);
          local_458.smallend.vect[2] = local_458.smallend.vect[2] - 1;
          MFIter::growntilebox((Box *)&local_fa8,(MFIter *)local_ba0,1);
          uVar31 = CONCAT44(-(uint)(local_458.smallend.vect[1] < (int)((ulong)local_fa8 >> 0x20)),
                            -(uint)(local_458.smallend.vect[0] < (int)local_fa8));
          local_fa8 = (double *)
                      (~uVar31 & local_458.smallend.vect._0_8_ | (ulong)local_fa8 & uVar31);
          uStack_8b0 = local_458.smallend.vect[2];
          if (local_458.smallend.vect[2] < (int)uStack_fa0) {
            uStack_8b0 = uStack_fa0;
          }
          uVar31 = CONCAT44(-(uint)(iStack_f98 < local_458.bigend.vect[1]),
                            -(uint)(iStack_f9c < local_458.bigend.vect[0]));
          uVar31 = ~uVar31 & local_458.bigend.vect._0_8_ | CONCAT44(iStack_f98,iStack_f9c) & uVar31;
          iStack_f9c = (int)uVar31;
          iStack_f98 = (int)(uVar31 >> 0x20);
          uVar66 = local_458.bigend.vect[2];
          if ((int)uStack_f94 < local_458.bigend.vect[2]) {
            uVar66 = uStack_f94;
          }
          aiStack_8ac[2] = uVar66;
          aiStack_8ac[3] = IStack_f90.itype;
          local_8b8 = local_fa8;
          aiStack_8ac[0] = iStack_f9c;
          lVar51 = 0;
          aiStack_8ac[1] = iStack_f98;
          do {
            if ((IStack_f90.itype >> ((uint)lVar51 & 0x1f) & 1) != 0) {
              aiStack_8ac[lVar51] = aiStack_8ac[lVar51] + -1;
            }
            lVar51 = lVar51 + 1;
          } while (lVar51 != 3);
          aiStack_8ac[3] = 0;
          local_1118.btype.itype = 0;
          local_1118.smallend.vect[0] = (int)local_fa8;
          local_1118.smallend.vect[1] = (int)((ulong)local_fa8 >> 0x20);
          local_1118.smallend.vect[2] = uStack_8b0 - 1;
          local_1118.bigend.vect[0] = aiStack_8ac[0] + 1;
          local_1118.smallend.vect[1] = local_1118.smallend.vect[1] + -1;
          local_1118.smallend.vect[0] = local_1118.smallend.vect[0] + -1;
          local_1118.bigend.vect[1] = aiStack_8ac[1] + 1;
          local_1118.bigend.vect[2] = aiStack_8ac[2] + 1;
          piVar41 = aiStack_b80;
          if ((Vector<int,_std::allocator<int>_> *)aiStack_b80._32_8_ !=
              (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar41 = (int *)((long)aiStack_b80[0] * 4 + *(long *)aiStack_b80._32_8_);
          }
          lVar51 = *(long *)(*(long *)(**(long **)((long)&(((this->m_sigma).
                                                                                                                        
                                                  super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                                  ).
                                                  super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                                  + local_1098 * 8) + 0x108) + (long)*piVar41 * 8);
          lVar86 = *(long *)(lVar51 + 0x10);
          iVar30 = *(int *)(lVar51 + 0x18);
          iVar39 = *(int *)(lVar51 + 0x1c);
          iVar49 = *(int *)(lVar51 + 0x20);
          iVar85 = *(int *)(lVar51 + 0x24);
          iVar10 = *(int *)(lVar51 + 0x28);
          uStack_fa0 = uStack_8b0;
          uStack_f94 = uVar66;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_818,
                     (FabArray<amrex::FArrayBox> *)
                     **(undefined8 **)
                       ((long)&(((local_fb0->
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ).
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               ).
                               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       + local_1098 * 8),(MFIter *)local_ba0);
          tVar16.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                &(local_cc0->
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar47]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
          if (tVar16.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl ==
              (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
            local_ad8 = 0;
            iStack_ad4 = 0;
            lStack_ad0 = 0;
            local_ae8._0_4_ = 0;
            local_ae8._4_4_ = 0;
            uStack_ae0 = 0;
            OStack_adc.val = 0;
            local_ac8 = 1;
            iStack_ac4 = 1;
            iStack_ac0 = 1;
            iStack_abc = 0;
            iStack_ab8 = 0;
            uStack_ab4._0_4_ = 0;
            uStack_ab4._4_4_ = 0;
          }
          else {
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_ae8,
                       (FabArray<amrex::FArrayBox> *)
                       tVar16.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       (MFIter *)local_ba0);
          }
          lVar34 = (long)((iVar85 - iVar30) + 1);
          lVar52 = (long)((iVar10 - iVar39) + 1);
          lVar42 = lVar52 * lVar34;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_88,&(local_e18._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_ba0);
          if ((char)local_f78 == '\0') {
            FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                      ((Array4<const_amrex::EBCellFlag> *)local_268,local_ee8,(MFIter *)local_ba0);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_c8,local_f88,(MFIter *)local_ba0);
            piVar41 = aiStack_b80;
            if ((Vector<int,_std::allocator<int>_> *)aiStack_b80._32_8_ !=
                (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar41 = (int *)((long)aiStack_b80[0] * 4 + *(long *)aiStack_b80._32_8_);
            }
            FVar28 = EBCellFlagFab::getType
                               ((local_ee8->m_fabs_v).
                                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[*piVar41],&local_1118);
            uVar40 = uStack_f94;
            iVar12 = iStack_f98;
            iVar10 = iStack_f9c;
            uVar66 = uStack_fa0;
            iVar85 = local_1118.smallend.vect[2];
            if (FVar28 == singlevalued) {
              iVar50 = local_1118.smallend.vect[0];
              iVar58 = local_1118.smallend.vect[1];
              iVar10 = *(int *)(lVar51 + 0x18);
              iVar12 = *(int *)(lVar51 + 0x1c);
              iVar29 = iVar10;
              if (iVar10 < local_1118.smallend.vect[0]) {
                iVar29 = local_1118.smallend.vect[0];
              }
              iVar59 = iVar12;
              if (iVar12 < local_1118.smallend.vect[1]) {
                iVar59 = local_1118.smallend.vect[1];
              }
              iVar11 = *(int *)(lVar51 + 0x20);
              iVar60 = iVar11;
              if (iVar11 < local_1118.smallend.vect[2]) {
                iVar60 = local_1118.smallend.vect[2];
              }
              iVar61 = *(int *)(lVar51 + 0x24);
              if (local_1118.bigend.vect[0] < *(int *)(lVar51 + 0x24)) {
                iVar61 = local_1118.bigend.vect[0];
              }
              uVar66 = *(uint *)(lVar51 + 0x28);
              if (local_1118.bigend.vect[1] < (int)*(uint *)(lVar51 + 0x28)) {
                uVar66 = local_1118.bigend.vect[1];
              }
              local_d88 = (_func_int *)(ulong)uVar66;
              iVar199 = *(int *)(lVar51 + 0x2c);
              if (local_1118.bigend.vect[2] < *(int *)(lVar51 + 0x2c)) {
                iVar199 = local_1118.bigend.vect[2];
              }
              local_10e8 = (_func_int *)CONCAT44(local_10e8._4_4_,iVar199);
              FArrayBox::resize((FArrayBox *)&local_c70,&local_1118,0x1b,(Arena *)0x0);
              arena = (Arena *)CONCAT44(local_c70.super_DataAllocator.m_arena._4_4_,
                                        (int)local_c70.super_DataAllocator.m_arena);
              if (arena == (Arena *)0x0) {
                arena = The_Arena();
              }
              Gpu::Elixir::Elixir(&local_e0,(void *)0x0,arena);
              iVar38 = local_c70.domain.bigend.vect[2];
              iVar27 = local_c70.domain.bigend.vect[1];
              iVar26 = local_c70.domain.bigend.vect[0];
              iVar207 = local_c70.domain.smallend.vect[1];
              iVar199 = local_c70.domain.smallend.vect[0];
              lVar51 = CONCAT44(local_c70.dptr._4_4_,(int)local_c70.dptr);
              lVar52 = (long)local_c70.domain.smallend.vect[0];
              lVar53 = (long)local_c70.domain.smallend.vect[1];
              local_fe8 = (_func_int *)(long)local_c70.domain.smallend.vect[2];
              FArrayBox::resize((FArrayBox *)local_e60,&local_1118,1,(Arena *)0x0);
              auVar35 = local_e58;
              if (local_e58 == (undefined1  [8])0x0) {
                auVar35 = (undefined1  [8])The_Arena();
              }
              local_1090 = (_func_int **)(long)((iVar26 - iVar199) + 1);
              local_ff8 = (_func_int *)(long)((iVar27 - iVar207) + 1);
              local_e88 = (double)((long)local_ff8 * (long)local_1090);
              lVar70 = (long)((iVar38 - (int)local_fe8) + 1);
              Gpu::Elixir::Elixir(&local_48,(void *)0x0,(Arena *)auVar35);
              auVar117 = _DAT_0067f170;
              auVar21 = _DAT_0065b9b0;
              auVar20 = _DAT_0065b9a0;
              local_df8 = (pointer)auStack_e50._0_8_;
              lVar71 = (long)(int)auStack_e50._8_4_;
              lVar72 = (long)iStack_e44;
              local_f68 = (_func_int *)(long)iStack_e40;
              lVar57 = (long)((iStack_e3c - auStack_e50._8_4_) + 1);
              lVar74 = (long)((local_e38 - iStack_e44) + 1);
              local_10d8 = (_func_int *)(lVar74 * lVar57);
              local_1760 = (long)local_1118.smallend.vect[2];
              if (local_1118.smallend.vect[2] <= local_1118.bigend.vect[2]) {
                lVar77 = (long)local_e88 * lVar70;
                lVar81 = (long)local_1118.smallend.vect[1];
                lVar78 = (long)local_1118.smallend.vect[0];
                lVar75 = lVar77 * 0x10;
                local_1028 = (double)(lVar77 * 0x20);
                local_12f0 = ((lVar70 * 8 + local_1760 * 8 + (long)local_fe8 * -8) * (long)local_ff8
                              + lVar81 * 8 + lVar53 * -8) * (long)local_1090 + lVar78 * 8 +
                             lVar52 * -8 + lVar51;
                local_12f8 = (lVar81 * 8 + (local_1760 - (long)local_fe8) * (long)local_ff8 * 8 +
                             lVar53 * -8) * (long)local_1090 + lVar78 * 8 + lVar52 * -8 + lVar51;
                local_1038 = (double)(lVar77 * 0xb0);
                local_f38 = (double)(lVar77 * 0xb8);
                do {
                  if (local_1118.smallend.vect[1] <= local_1118.bigend.vect[1]) {
                    local_1228 = (double)local_12f8;
                    local_12c8 = (_func_int *)local_12f0;
                    lVar82 = lVar81;
                    do {
                      if (local_1118.smallend.vect[0] <= local_1118.bigend.vect[0]) {
                        lVar45 = (lVar82 - local_c8.begin.y) *
                                 CONCAT44(local_c8.jstride._4_4_,(uint)local_c8.jstride);
                        lVar46 = (local_1760 - local_c8.begin.z) *
                                 CONCAT44(local_c8.kstride._4_4_,(int)local_c8.kstride);
                        lVar84 = lVar51 + (local_1760 - (long)local_fe8) * (long)local_e88 * 8 +
                                 (lVar82 - lVar53) * (long)local_1090 * 8;
                        lVar62 = (lVar82 - local_88.begin.y) * local_88.jstride;
                        lVar44 = (local_1760 - local_88.begin.z) * local_88.kstride;
                        local_1018 = local_88.p + lVar62 + lVar44 + local_88.nstride * 0xf;
                        p_Var69 = local_12c8;
                        dVar188 = local_1228;
                        lVar87 = lVar78;
                        do {
                          iVar199 = auVar117._0_4_;
                          iVar207 = auVar117._4_4_;
                          if (((((lVar87 < iVar29) || (lVar82 < iVar59)) || (local_1760 < iVar60))
                              || ((iVar61 < lVar87 || ((int)local_d88 < lVar82)))) ||
                             ((int)local_10e8 < local_1760)) {
                            lVar63 = 0x1c;
                            lVar64 = 0;
                            auVar136 = auVar20;
                            do {
                              if (SUB164(auVar136 ^ auVar21,4) == iVar207 &&
                                  SUB164(auVar136 ^ auVar21,0) < iVar199) {
                                *(undefined8 *)((long)dVar188 + lVar64) = 0;
                                *(undefined8 *)((long)p_Var69 + lVar64) = 0;
                              }
                              lVar65 = auVar136._8_8_;
                              auVar136._0_8_ = auVar136._0_8_ + 2;
                              auVar136._8_8_ = lVar65 + 2;
                              lVar64 = lVar64 + lVar75;
                              lVar63 = lVar63 + -2;
                            } while (lVar63 != 0);
                            uVar105 = 0;
                          }
                          else {
                            uVar66 = *(uint *)(local_268._0_8_ +
                                              (lVar87 - (int)local_268._32_4_) * 4 +
                                              (local_1760 - (int)local_268._40_4_) *
                                              local_268._16_8_ * 4 +
                                              (lVar82 - (int)local_268._36_4_) *
                                              CONCAT44(local_268._12_4_,local_268._8_4_) * 4) & 3;
                            if (uVar66 == 0) {
LAB_0059c023:
                              lVar63 = 0x1c;
                              lVar64 = 0;
                              auVar137 = auVar20;
                              do {
                                if (SUB164(auVar137 ^ auVar21,4) == iVar207 &&
                                    SUB164(auVar137 ^ auVar21,0) < iVar199) {
                                  *(undefined8 *)((long)dVar188 + lVar64) = 0x3ff0000000000000;
                                  *(undefined8 *)((long)p_Var69 + lVar64) = 0x3ff0000000000000;
                                }
                                lVar65 = auVar137._8_8_;
                                auVar137._0_8_ = auVar137._0_8_ + 2;
                                auVar137._8_8_ = lVar65 + 2;
                                lVar64 = lVar64 + lVar75;
                                lVar63 = lVar63 + -2;
                              } while (lVar63 != 0);
                            }
                            else if (uVar66 == 3) {
                              lVar63 = 0x1c;
                              lVar64 = 0;
                              auVar118 = auVar20;
                              do {
                                if (SUB164(auVar118 ^ auVar21,4) == iVar207 &&
                                    SUB164(auVar118 ^ auVar21,0) < iVar199) {
                                  *(undefined8 *)((long)dVar188 + lVar64) = 0;
                                  *(undefined8 *)((long)p_Var69 + lVar64) = 0;
                                }
                                lVar65 = auVar118._8_8_;
                                auVar118._0_8_ = auVar118._0_8_ + 2;
                                auVar118._8_8_ = lVar65 + 2;
                                lVar64 = lVar64 + lVar75;
                                lVar63 = lVar63 + -2;
                              } while (lVar63 != 0);
                            }
                            else {
                              lVar63 = lVar87 - local_c8.begin.x;
                              if (0.9999999999999778 <= local_c8.p[lVar45 + lVar46 + lVar63])
                              goto LAB_0059c023;
                              lVar65 = lVar87 - local_88.begin.x;
                              *(double *)(lVar84 + (lVar87 - lVar52) * 8) =
                                   (((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 6] -
                                     local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 9]) -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xb]) +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         ((-local_88.p[lVar62 + lVar44 + lVar65] -
                                          local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 4]
                                         ) * 2.25;
                              lVar64 = lVar84 + (lVar87 - lVar52) * 8;
                              *(double *)(lVar64 + lVar77 * 8) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xb] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] -
                                           local_88.p[lVar62 + lVar44 + lVar65]) -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) * 4.5;
                              *(double *)(lVar75 + lVar64) =
                                   (((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 9] -
                                     local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 6]) -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xb]) +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         ((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride] -
                                          local_88.p[lVar62 + lVar44 + lVar65]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 4]
                                         ) * 2.25;
                              *(double *)(lVar77 * 0x18 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 9] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride]
                                           - local_88.p
                                             [lVar62 + lVar44 + lVar65 + local_88.nstride * 3]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) * 4.5;
                              *(double *)((long)local_1028 + lVar64) =
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf] *
                                   36.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 2.25 +
                                          (-local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) * 9.0;
                              *(double *)(lVar77 * 0x28 + lVar64) =
                                   (-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 9] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride]
                                           - local_88.p
                                             [lVar62 + lVar44 + lVar65 + local_88.nstride * 3]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) * 4.5;
                              *(double *)(lVar77 * 0x30 + lVar64) =
                                   ((-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 6] -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 9]) +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xb] +
                                   local_1018[lVar65]) * 9.0 +
                                   local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                   ((local_88.p[lVar62 + lVar44 + lVar65] -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride]) +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) *
                                   2.25;
                              *(double *)(lVar77 * 0x38 + lVar64) =
                                   (-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xb] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p[lVar62 + lVar44 + lVar65] +
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 3]) -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) * 4.5;
                              *(double *)(lVar77 * 0x40 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 6] +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 9] +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xb] +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xf]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         (local_88.p[lVar62 + lVar44 + lVar65] +
                                          local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride] +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 4]
                                         ) * 2.25;
                              *(double *)(lVar77 * 0x48 + lVar64) =
                                   (((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 7] -
                                     local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 10]) -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xd]) +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         ((-local_88.p[lVar62 + lVar44 + lVar65] -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 2]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 5]
                                         ) * 2.25;
                              *(double *)(lVar77 * 0x50 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xd] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] -
                                           local_88.p[lVar62 + lVar44 + lVar65]) -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5;
                              *(double *)(lVar77 * 0x58 + lVar64) =
                                   (((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 10] -
                                     local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 7]) -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xd]) +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         ((local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] -
                                          local_88.p[lVar62 + lVar44 + lVar65]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 5]
                                         ) * 2.25;
                              *(double *)(lVar77 * 0x60 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 10] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((-local_88.p
                                             [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] -
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 3]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5;
                              *(double *)(lVar77 * 0x68 + lVar64) =
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10] *
                                   36.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 2.25 +
                                          (-local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 9.0;
                              *(double *)(lVar77 * 0x70 + lVar64) =
                                   (-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 10] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] -
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 3]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5;
                              *(double *)(lVar77 * 0x78 + lVar64) =
                                   ((-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 7] -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 10]) +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xd] +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         ((local_88.p[lVar62 + lVar44 + lVar65] -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 2]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 5]
                                         ) * 2.25;
                              *(double *)(lVar77 * 0x80 + lVar64) =
                                   (-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xd] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p[lVar62 + lVar44 + lVar65] +
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 3]) -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5;
                              *(double *)(lVar77 * 0x88 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 7] +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 10] +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xd] +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x10]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         (local_88.p[lVar62 + lVar44 + lVar65] +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 3] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 5]
                                         ) * 2.25;
                              *(double *)(lVar77 * 0x90 + lVar64) =
                                   (((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 8] -
                                     local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xc])
                                    - local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xe])
                                   + local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11])
                                   * 9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                           ((-local_88.p
                                              [lVar62 + lVar44 + lVar65 + local_88.nstride] -
                                            local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 2]) +
                                            local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 4] +
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 2.25
                              ;
                              *(double *)(lVar77 * 0x98 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xe] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 4] -
                                           local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride])
                                          - local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5
                              ;
                              *(double *)(lVar77 * 0xa0 + lVar64) =
                                   (((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xc]
                                     - local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 8])
                                    - local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xe])
                                   + local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11])
                                   * 9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                           ((local_88.p
                                             [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] -
                                            local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride])
                                            + local_88.p
                                              [lVar62 + lVar44 + lVar65 + local_88.nstride * 4] +
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 2.25
                              ;
                              *(double *)(lVar77 * 0xa8 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xc] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((-local_88.p
                                             [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] -
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5;
                              *(double *)((long)local_1038 + lVar64) =
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11] *
                                   36.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 2.25 +
                                          (-local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 4] -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 9.0;
                              *(double *)((long)local_f38 + lVar64) =
                                   (-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xc] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p
                                            [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] -
                                           local_88.p
                                           [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5;
                              *(double *)(lVar77 * 0xc0 + lVar64) =
                                   ((-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 8] -
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xc]) +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xe] +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         ((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride] -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 2]) +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 4] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 5]
                                         ) * 2.25;
                              *(double *)(lVar77 * 200 + lVar64) =
                                   (-local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xe] -
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11]) *
                                   18.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 1.125 +
                                          ((local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride]
                                           + local_88.p
                                             [lVar62 + lVar44 + lVar65 + local_88.nstride * 4]) -
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 5]) * 4.5;
                              *(double *)(lVar77 * 0xd0 + lVar64) =
                                   (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 8] +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xc] +
                                    local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0xe] +
                                   local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 0x11]) *
                                   9.0 + local_c8.p[lVar45 + lVar46 + lVar63] * 0.5625 +
                                         (local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride] +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 2] +
                                          local_88.p
                                          [lVar62 + lVar44 + lVar65 + local_88.nstride * 4] +
                                         local_88.p[lVar62 + lVar44 + lVar65 + local_88.nstride * 5]
                                         ) * 2.25;
                            }
                            uVar105 = *(undefined8 *)
                                       (lVar86 + (local_1760 - iVar49) * lVar42 * 8 +
                                        (lVar82 - iVar39) * lVar34 * 8 + (lVar87 - iVar30) * 8);
                          }
                          *(undefined8 *)
                           (auStack_e50._0_8_ +
                           (lVar87 - lVar71) * 8 +
                           (lVar82 - lVar72) * lVar57 * 8 +
                           (local_1760 - (long)local_f68) * (long)local_10d8 * 8) = uVar105;
                          lVar87 = lVar87 + 1;
                          p_Var69 = (_func_int *)((long)p_Var69 + 8);
                          dVar188 = (double)((long)dVar188 + 8);
                        } while (local_1118.bigend.vect[0] + 1 != (int)lVar87);
                      }
                      lVar82 = lVar82 + 1;
                      local_12c8 = (_func_int *)((long)local_12c8 + (long)local_1090 * 8);
                      local_1228 = (double)((long)local_1228 + (long)local_1090 * 8);
                    } while (local_1118.bigend.vect[1] + 1U != (int)lVar82);
                  }
                  local_1760 = local_1760 + 1;
                  local_12f0 = local_12f0 + (long)local_e88 * 8;
                  local_12f8 = local_12f8 + (long)local_e88 * 8;
                } while (local_1118.bigend.vect[2] + 1 != (int)local_1760);
              }
              lVar86 = (long)(int)local_fa8;
              lVar34 = (long)local_fa8._4_4_;
              local_14c8 = (double)(long)(int)uStack_fa0;
              local_ea8 = (_func_int *)(ulong)uStack_f94;
              if ((int)uStack_fa0 <= (int)uStack_f94) {
                lVar75 = lVar34 * 8;
                lVar62 = lVar75 + (((long)local_14c8 - (long)local_f68) + -1) * lVar74 * 8 +
                         lVar72 * -8;
                lVar45 = lVar75 + ((long)local_14c8 - (long)local_f68) * lVar74 * 8 + lVar72 * -8;
                lVar42 = lVar70 * 0x80 + (long)local_14c8 * 8;
                lVar78 = lVar70 * 0x38 + (long)local_14c8 * 8 + (long)local_fe8 * -8;
                lVar77 = (long)local_14c8 * 8;
                lVar64 = lVar70 * 0x20 + (long)local_14c8 * 8 + (long)local_fe8 * -8;
                lVar44 = lVar77 + lVar70 * 0x18 + (long)local_fe8 * -8;
                lVar46 = lVar77 + lVar70 * 0x28 + (long)local_fe8 * -8;
                lVar63 = (lVar42 + (long)local_fe8 * -8) * (long)local_ff8 + lVar34 * 8 +
                         lVar53 * -8;
                lVar81 = (lVar70 * 0x70 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                         (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                lVar82 = (lVar70 * 0x68 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                         (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                lVar84 = (lVar70 * 0x50 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                         (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                lVar87 = (lVar70 * 0x60 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                         (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                local_15c8 = (_func_int *)
                             (lVar62 * lVar57 + lVar86 * 8 + lVar71 * -8 + auStack_e50._0_8_);
                local_15f8 = (_func_int *)
                             (lVar45 * lVar57 + lVar86 * 8 + lVar71 * -8 + auStack_e50._0_8_);
                local_1608 = (_func_int *)
                             ((lVar62 + -8) * lVar57 + lVar86 * 8 + lVar71 * -8 + auStack_e50._0_8_)
                ;
                local_1688 = (_func_int *)
                             ((lVar45 + -8) * lVar57 + lVar86 * 8 + lVar71 * -8 + auStack_e50._0_8_)
                ;
                local_f48 = (_func_int *)
                            (((lVar42 + lVar70 * 8 + (long)local_fe8 * -8 + -8) * (long)local_ff8 +
                              lVar34 * 8 + lVar53 * -8) * (long)local_1090 + lVar86 * 8 +
                             lVar52 * -8 + lVar51 + -8);
                local_d68 = (_func_int *)
                            (((lVar78 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                             (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51 + -8);
                local_1410 = ((lVar70 * 0xb8 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_d78 = (double)(lVar86 * 8 +
                                     ((lVar70 * 0x30 + (long)local_14c8 * 8 + (long)local_fe8 * -8)
                                      * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                                     (long)local_1090 + lVar52 * -8 + lVar51 + -8);
                local_1248 = ((lVar70 * 0x78 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51 + -8;
                local_1418 = ((lVar70 * 0xb0 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_10c8 = (double)(lVar86 * 8 + lVar63 * (long)local_1090 + lVar52 * -8 + lVar51
                                     + -8);
                local_1420 = ((lVar70 * 0x98 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_f58 = (double)(((lVar78 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                                      (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51) - 8);
                local_1428 = ((lVar70 * 0xa8 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_1430 = ((lVar70 * 200 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_bb8 = (double)((lVar63 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 +
                                     lVar51 + -8);
                local_1048 = (_func_int *)
                             (((lVar70 * 0x40 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                               (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090 +
                              lVar86 * 8 + lVar52 * -8 + lVar51 + -8);
                local_1438 = (lVar34 * 8 +
                              (lVar70 * 0x58 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                              (long)local_ff8 + lVar53 * -8) * (long)local_1090 + lVar86 * 8 +
                             lVar52 * -8 + lVar51;
                local_1038 = (double)(((lVar70 * 0xa0 + (long)local_14c8 * 8 + (long)local_fe8 * -8
                                       + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                                      (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_f38 = (double)(((lVar64 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                                     (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_11b8 = (double *)
                             (((((long)local_14c8 + lVar70) * 8 + (long)local_fe8 * -8 + -8) *
                               (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                              lVar86 * 8 + lVar52 * -8 + lVar51);
                local_12d8 = ((lVar44 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                             (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                local_1238 = (double)(lVar81 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51)
                ;
                local_1348 = ((lVar77 + lVar70 * 0x48 + (long)local_fe8 * -8) * (long)local_ff8 +
                              lVar34 * 8 + lVar53 * -8) * (long)local_1090 + lVar86 * 8 +
                             lVar52 * -8 + lVar51;
                local_1498 = ((lVar70 * 0x90 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_13f8 = (double *)
                             (lVar82 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_1648 = (_func_int *)
                             ((lVar64 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                              (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_15d8 = (_func_int *)
                             ((lVar75 + ((long)local_14c8 - (long)local_fe8) * (long)local_ff8 * 8 +
                              lVar53 * -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_1440 = lVar84 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                local_13a0 = ((lVar70 * 8 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_12f0 = (lVar44 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                             (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                local_12f8 = lVar87 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                local_1268 = ((lVar70 * 0xd0 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                              (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090 +
                             lVar86 * 8 + lVar52 * -8 + lVar51;
                local_1448 = (double)(((lVar46 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8 +
                                      -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_1450 = (double)((lVar81 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 +
                                     lVar51);
                local_14d0 = (double)(((lVar70 * 0x10 + (long)local_14c8 * 8 + (long)local_fe8 * -8)
                                       * (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) *
                                      (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_1300 = (double)(((lVar70 * 0xc0 + (long)local_14c8 * 8 + (long)local_fe8 * -8)
                                       * (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) *
                                      (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_e78 = (_func_int *)
                            ((lVar82 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_11c8 = (lVar84 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                local_de8 = (double)((lVar46 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) *
                                     (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_10b8 = (_func_int *)
                             ((lVar87 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                local_ce8 = (double)CONCAT44(local_ce8._4_4_,uStack_f94 + 1);
                local_eb8 = (_func_int *)(lVar86 * 8);
                local_fd8 = (_func_int *)((long)local_10d8 * 8);
                lVar42 = lVar57 * 8;
                local_e98 = (double)((long)local_e88 * 8);
                lVar75 = (long)local_1090 * 8;
                local_16a0 = (long)local_14c8;
                do {
                  if (local_fa8._4_4_ <= iStack_f98) {
                    lVar78 = (long)local_7f8;
                    local_1028 = (double)(CONCAT44(OStack_80c.val,local_818._8_4_) * 8);
                    lVar77 = (lVar34 - iStack_7f4) * (long)local_1028 +
                             (local_16a0 - iStack_7f0) * CONCAT44(iStack_804,local_808) * 8;
                    ppp_Var24 = (_func_int ***)local_818._0_8_;
                    local_1718 = local_eb8 + lVar77 + lStack_800 * 8 + lVar78 * -8 + (long)ppp_Var24
                    ;
                    local_16e8 = local_eb8 +
                                 lStack_800 * 0x10 + lVar77 + lVar78 * -8 + (long)ppp_Var24;
                    local_1728 = local_eb8 +
                                 lVar77 + lStack_800 * 0x18 + lVar78 * -8 + (long)ppp_Var24;
                    local_1738 = local_eb8 +
                                 lStack_800 * 0x20 + lVar77 + lVar78 * -8 + (long)ppp_Var24;
                    local_16d8 = local_eb8 +
                                 lVar77 + lStack_800 * 0x28 + lVar78 * -8 + (long)ppp_Var24;
                    local_1720 = local_eb8 +
                                 lStack_800 * 0x30 + lVar77 + lVar78 * -8 + (long)ppp_Var24;
                    local_1730 = local_eb8 +
                                 lStack_800 * 0x38 + lVar77 + lVar78 * -8 + (long)ppp_Var24;
                    local_1710 = local_11c8;
                    local_1678 = local_e78;
                    local_16b8 = (long)local_1300;
                    local_1700 = (long)local_14d0;
                    local_1698 = (long)local_1450;
                    local_1708 = (long)local_1448;
                    local_1128 = local_12f0;
                    local_1630 = local_13a0;
                    local_1518 = (long)local_15d8;
                    local_1750 = (double)local_1498;
                    local_14e8 = local_1348;
                    local_14b8 = local_12d8;
                    local_1548 = (long)local_11b8;
                    local_1558 = local_f38;
                    local_15b8 = local_1038;
                    local_1468 = local_1438;
                    local_1478 = local_1048;
                    local_1378 = local_bb8;
                    local_1788 = (_func_int *)local_f58;
                    local_1318 = local_1420;
                    local_14f8 = local_10c8;
                    local_1228 = (double)local_1248;
                    local_12c8 = (_func_int *)local_d78;
                    local_13b8 = local_1410;
                    local_1388 = local_d68;
                    local_1288 = local_f48;
                    local_1138 = local_1688;
                    local_1530 = local_1608;
                    p_Var69 = local_1648;
                    lVar78 = local_1440;
                    lVar81 = local_1428;
                    p_Var56 = local_15f8;
                    lVar82 = local_12f8;
                    p_Var67 = local_15c8;
                    dVar217 = local_de8;
                    lVar84 = local_1418;
                    p_Var76 = local_10b8;
                    lVar87 = local_1430;
                    pdVar37 = local_13f8;
                    local_1488 = (double)lVar34;
                    dVar188 = local_1238;
                    lVar77 = local_1268;
                    do {
                      if ((int)local_fa8 <= iStack_f9c) {
                        lVar62 = 0;
                        do {
                          *(double *)(local_1718 + lVar62 * 8) =
                               (*(double *)(local_1708 + lVar62 * 8) * dVar102 +
                               *(double *)(lVar77 + lVar62 * 8) * dVar187 +
                               *(double *)(local_1698 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(local_1530 + lVar62 * 8) +
                               (*(double *)(local_14b8 + lVar62 * 8) * dVar102 +
                               *(double *)((long)local_15b8 + lVar62 * 8) * dVar187 +
                               *(double *)((long)dVar188 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(p_Var67 + lVar62 * 8) +
                               (*(double *)(local_1128 + lVar62 * 8) * dVar102 +
                               *(double *)((long)local_1750 + lVar62 * 8) * dVar187 +
                               *(double *)(lVar82 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(p_Var56 + lVar62 * 8) +
                               (*(double *)((long)dVar217 + lVar62 * 8) * dVar102 +
                               *(double *)(local_16b8 + lVar62 * 8) * dVar187 +
                               *(double *)(p_Var76 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(local_1138 + lVar62 * 8);
                          *(double *)(local_16e8 + lVar62 * 8) =
                               (*(double *)(local_1388 + lVar62 * 8) * dVar102 +
                               *(double *)(local_13b8 + -8 + lVar62 * 8) * dVar103 +
                               *(double *)(local_1288 + lVar62 * 8) * local_d58) *
                               *(double *)(p_Var67 + lVar62 * 8 + -8) +
                               (*(double *)(local_1548 + lVar62 * 8) * dVar102 +
                               *(double *)(local_13b8 + lVar62 * 8) * dVar103 +
                               *(double *)(local_1468 + lVar62 * 8) * local_d58) *
                               *(double *)(p_Var67 + lVar62 * 8) +
                               (*(double *)(local_1630 + lVar62 * 8) * dVar102 +
                               *(double *)(lVar81 + lVar62 * 8) * dVar103 +
                               *(double *)(local_14e8 + lVar62 * 8) * local_d58) *
                               *(double *)(p_Var56 + lVar62 * 8) +
                               (*(double *)((long)local_1788 + lVar62 * 8) * dVar102 +
                               *(double *)(lVar81 + -8 + lVar62 * 8) * dVar103 +
                               *(double *)((long)local_1228 + lVar62 * 8) * local_d58) *
                               *(double *)(p_Var56 + lVar62 * 8 + -8);
                          *(double *)(local_1728 + lVar62 * 8) =
                               (*(double *)(local_1478 + lVar62 * 8) * dVar108 +
                               *(double *)(lVar87 + -8 + lVar62 * 8) * dVar103 +
                               *(double *)((long)local_1378 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(local_1138 + lVar62 * 8 + -8) +
                               (*(double *)(local_1700 + lVar62 * 8) * dVar108 +
                               *(double *)(lVar87 + lVar62 * 8) * dVar103 +
                               *(double *)(local_1710 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(local_1138 + lVar62 * 8) +
                               (*(double *)(local_1518 + lVar62 * 8) * dVar108 +
                               *(double *)(local_1318 + lVar62 * 8) * dVar103 +
                               *(double *)(lVar78 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(p_Var56 + lVar62 * 8) +
                               (*(double *)((long)local_12c8 + lVar62 * 8) * dVar108 +
                               *(double *)(local_1318 + -8 + lVar62 * 8) * dVar103 +
                               *(double *)((long)local_14f8 + lVar62 * 8) * (double)local_dd8) *
                               *(double *)(p_Var56 + lVar62 * 8 + -8);
                          *(double *)(local_1738 + lVar62 * 8) =
                               (*(double *)((long)p_Var69 + lVar62 * 8) * dVar109 +
                               *(double *)(lVar81 + lVar62 * 8) * local_d48 +
                               *(double *)(lVar82 + lVar62 * 8) * local_d38) *
                               *(double *)(p_Var56 + lVar62 * 8) +
                               (*(double *)((long)local_1558 + lVar62 * 8) * dVar109 +
                               *(double *)(local_13b8 + lVar62 * 8) * local_d48 +
                               *(double *)((long)dVar188 + lVar62 * 8) * local_d38) *
                               *(double *)(p_Var67 + lVar62 * 8);
                          *(double *)(local_16d8 + lVar62 * 8) =
                               (*(double *)(local_1128 + lVar62 * 8) * (double)local_10a8._0_8_ +
                               *(double *)(local_1318 + lVar62 * 8) * local_d48 +
                               pdVar37[lVar62] * dVar223) * *(double *)(p_Var56 + lVar62 * 8) +
                               (*(double *)((long)dVar217 + lVar62 * 8) * (double)local_10a8._0_8_ +
                               *(double *)(lVar87 + lVar62 * 8) * local_d48 +
                               *(double *)(local_1678 + lVar62 * 8) * dVar223) *
                               *(double *)(local_1138 + lVar62 * 8);
                          *(double *)(local_1720 + lVar62 * 8) =
                               (*(double *)(local_1630 + lVar62 * 8) * (double)local_10a8._0_8_ +
                               *(double *)(lVar84 + lVar62 * 8) * dVar228 +
                               *(double *)(lVar78 + lVar62 * 8) * local_d38) *
                               *(double *)(p_Var56 + lVar62 * 8) +
                               (*(double *)((long)local_1788 + lVar62 * 8) *
                                (double)local_10a8._0_8_ +
                               *(double *)(lVar84 + -8 + lVar62 * 8) * dVar228 +
                               *(double *)((long)local_14f8 + lVar62 * 8) * local_d38) *
                               *(double *)(p_Var56 + lVar62 * 8 + -8);
                          *(double *)(local_1730 + lVar62 * 8) =
                               (*(double *)((long)p_Var69 + lVar62 * 8) * (double)local_cd8._0_8_ +
                               *(double *)(lVar84 + lVar62 * 8) * local_fc8 +
                               pdVar37[lVar62] * auVar153._8_8_) * *(double *)(p_Var56 + lVar62 * 8)
                          ;
                          lVar62 = lVar62 + 1;
                          local_1018 = pdVar37;
                        } while ((iStack_f9c - (int)local_fa8) + 1 != (int)lVar62);
                      }
                      local_1488 = (double)((long)local_1488 + 1);
                      p_Var67 = p_Var67 + lVar42;
                      p_Var56 = p_Var56 + lVar42;
                      local_1530 = local_1530 + lVar42;
                      local_1138 = local_1138 + lVar42;
                      local_1718 = local_1718 + (long)local_1028;
                      local_16e8 = local_16e8 + (long)local_1028;
                      local_1728 = local_1728 + (long)local_1028;
                      local_1738 = local_1738 + (long)local_1028;
                      local_16d8 = local_16d8 + (long)local_1028;
                      local_1720 = local_1720 + (long)local_1028;
                      local_1730 = local_1730 + (long)local_1028;
                      local_1288 = local_1288 + lVar75;
                      local_1388 = local_1388 + lVar75;
                      local_13b8 = local_13b8 + lVar75;
                      local_12c8 = (_func_int *)((long)local_12c8 + lVar75);
                      local_1228 = (double)((long)local_1228 + lVar75);
                      lVar84 = lVar84 + lVar75;
                      local_14f8 = (double)((long)local_14f8 + lVar75);
                      local_1318 = local_1318 + lVar75;
                      local_1788 = (_func_int *)((long)local_1788 + lVar75);
                      lVar81 = lVar81 + lVar75;
                      lVar87 = lVar87 + lVar75;
                      local_1378 = (double)((long)local_1378 + lVar75);
                      local_1478 = local_1478 + lVar75;
                      local_1468 = local_1468 + lVar75;
                      local_15b8 = (double)((long)local_15b8 + lVar75);
                      local_1558 = (double)((long)local_1558 + lVar75);
                      local_1548 = local_1548 + lVar75;
                      local_14b8 = local_14b8 + lVar75;
                      dVar188 = (double)((long)dVar188 + lVar75);
                      local_14e8 = local_14e8 + lVar75;
                      local_1750 = (double)((long)local_1750 + lVar75);
                      pdVar37 = pdVar37 + (long)local_1090;
                      p_Var69 = (_func_int *)((long)p_Var69 + lVar75);
                      local_1518 = local_1518 + lVar75;
                      lVar78 = lVar78 + lVar75;
                      local_1630 = local_1630 + lVar75;
                      local_1128 = local_1128 + lVar75;
                      lVar82 = lVar82 + lVar75;
                      lVar77 = lVar77 + lVar75;
                      local_1708 = local_1708 + lVar75;
                      local_1698 = local_1698 + lVar75;
                      local_1700 = local_1700 + lVar75;
                      local_16b8 = local_16b8 + lVar75;
                      local_1678 = local_1678 + lVar75;
                      local_1710 = local_1710 + lVar75;
                      dVar217 = (double)((long)dVar217 + lVar75);
                      p_Var76 = p_Var76 + lVar75;
                    } while (iStack_f98 + 1 != SUB84(local_1488,0));
                  }
                  local_16a0 = local_16a0 + 1;
                  local_15c8 = local_15c8 + (long)local_fd8;
                  local_15f8 = local_15f8 + (long)local_fd8;
                  local_1608 = local_1608 + (long)local_fd8;
                  local_1688 = local_1688 + (long)local_fd8;
                  local_f48 = local_f48 + (long)local_e98;
                  local_d68 = local_d68 + (long)local_e98;
                  local_1410 = local_1410 + (long)local_e98;
                  local_d78 = (double)((long)local_d78 + (long)local_e98);
                  local_1248 = local_1248 + (long)local_e98;
                  local_1418 = local_1418 + (long)local_e98;
                  local_10c8 = (double)((long)local_10c8 + (long)local_e98);
                  local_1420 = local_1420 + (long)local_e98;
                  local_f58 = (double)((long)local_f58 + (long)local_e98);
                  local_1428 = local_1428 + (long)local_e98;
                  local_1430 = local_1430 + (long)local_e98;
                  local_bb8 = (double)((long)local_bb8 + (long)local_e98);
                  local_1048 = local_1048 + (long)local_e98;
                  local_1438 = local_1438 + (long)local_e98;
                  local_1038 = (double)((long)local_1038 + (long)local_e98);
                  local_f38 = (double)((long)local_f38 + (long)local_e98);
                  local_11b8 = (double *)((long)local_11b8 + (long)local_e98);
                  local_12d8 = local_12d8 + (long)local_e98;
                  local_1238 = (double)((long)local_1238 + (long)local_e98);
                  local_1348 = local_1348 + (long)local_e98;
                  local_1498 = local_1498 + (long)local_e98;
                  local_13f8 = local_13f8 + (long)local_e88;
                  local_1648 = (_func_int *)((long)local_1648 + (long)local_e98);
                  local_15d8 = (_func_int *)((long)local_15d8 + (long)local_e98);
                  local_1440 = local_1440 + (long)local_e98;
                  local_13a0 = local_13a0 + (long)local_e98;
                  local_12f0 = local_12f0 + (long)local_e98;
                  local_12f8 = local_12f8 + (long)local_e98;
                  local_1268 = local_1268 + (long)local_e98;
                  local_1448 = (double)((long)local_1448 + (long)local_e98);
                  local_1450 = (double)((long)local_1450 + (long)local_e98);
                  local_14d0 = (double)((long)local_14d0 + (long)local_e98);
                  local_1300 = (double)((long)local_1300 + (long)local_e98);
                  local_e78 = local_e78 + (long)local_e98;
                  local_11c8 = local_11c8 + (long)local_e98;
                  local_de8 = (double)((long)local_de8 + (long)local_e98);
                  local_10b8 = local_10b8 + (long)local_e98;
                } while (uStack_f94 + 1 != (int)local_16a0);
              }
              auVar21 = _DAT_0065b9b0;
              auVar20 = _DAT_0065b9a0;
              dVar188 = local_e88;
              if (CONCAT44(local_ae8._4_4_,local_ae8._0_4_) != 0) {
                if (iVar60 <= (int)local_10e8) {
                  if (iVar50 < iVar10) {
                    iVar50 = iVar10;
                  }
                  if (iVar58 < iVar12) {
                    iVar58 = iVar12;
                  }
                  if (iVar85 < iVar11) {
                    iVar85 = iVar11;
                  }
                  lVar42 = (long)iVar85;
                  uVar66 = iVar61 - iVar50;
                  auVar117._4_4_ = 0;
                  auVar117._0_4_ = uVar66;
                  auVar117._8_4_ = uVar66;
                  auVar117._12_4_ = 0;
                  lVar75 = auStack_e50._0_8_ +
                           ((long)iVar58 * 8 + (lVar42 - (long)local_f68) * lVar74 * 8 + lVar72 * -8
                           ) * lVar57 + (long)iVar50 * 8 + lVar71 * -8 + 8;
                  do {
                    lVar77 = lVar75;
                    lVar78 = (long)iVar58;
                    if (iVar59 <= (int)local_d88) {
                      do {
                        if (iVar29 <= iVar61) {
                          uVar31 = 0;
                          do {
                            auVar119._8_4_ = (int)uVar31;
                            auVar119._0_8_ = uVar31;
                            auVar119._12_4_ = (int)(uVar31 >> 0x20);
                            auVar137 = auVar117 ^ auVar21;
                            auVar136 = (auVar119 | auVar20) ^ auVar21;
                            bVar90 = auVar137._0_4_ < auVar136._0_4_;
                            iVar30 = auVar137._4_4_;
                            iVar39 = auVar136._4_4_;
                            if ((bool)(~(iVar30 < iVar39 || iVar39 == iVar30 && bVar90) & 1)) {
                              *(undefined8 *)(lVar77 + -8 + uVar31 * 8) = 0x3ff0000000000000;
                            }
                            if (iVar30 >= iVar39 && (iVar39 != iVar30 || !bVar90)) {
                              *(undefined8 *)(lVar77 + uVar31 * 8) = 0x3ff0000000000000;
                            }
                            uVar31 = uVar31 + 2;
                          } while (((ulong)uVar66 + 2 & 0x1fffffffe) != uVar31);
                        }
                        lVar78 = lVar78 + 1;
                        lVar77 = lVar77 + lVar57 * 8;
                      } while ((((int)local_d88 + iVar58) - iVar59) + 1 != (int)lVar78);
                    }
                    lVar42 = lVar42 + 1;
                    lVar75 = lVar75 + (long)local_10d8 * 8;
                  } while ((((int)local_10e8 + iVar85) - iVar60) + 1 != (int)lVar42);
                }
                if ((int)uStack_fa0 <= (int)uStack_f94) {
                  lVar75 = lVar34 * 8;
                  lVar77 = lVar75 + (((long)local_14c8 - (long)local_f68) + -1) * lVar74 * 8 +
                           lVar72 * -8;
                  lVar42 = lVar75 + ((long)local_14c8 - (long)local_f68) * lVar74 * 8 + lVar72 * -8;
                  local_13f8 = (double *)
                               (lVar77 * lVar57 + lVar86 * 8 + lVar71 * -8 + auStack_e50._0_8_);
                  local_1648 = (_func_int *)
                               (lVar42 * lVar57 + lVar86 * 8 + lVar71 * -8 + auStack_e50._0_8_);
                  local_15d8 = (_func_int *)
                               ((lVar77 + -8) * lVar57 + lVar86 * 8 + lVar71 * -8 +
                               auStack_e50._0_8_);
                  local_1260 = (_func_int *)
                               ((lVar42 + -8) * lVar57 + lVar86 * 8 + lVar71 * -8 +
                               auStack_e50._0_8_);
                  lVar42 = lVar70 * 0x80 + (long)local_14c8 * 8;
                  lVar62 = lVar70 * 0x38 + (long)local_14c8 * 8 + (long)local_fe8 * -8;
                  lVar74 = (long)local_14c8 * 8;
                  lVar71 = lVar70 * 0x20 + (long)local_14c8 * 8 + (long)local_fe8 * -8;
                  lVar72 = lVar74 + lVar70 * 0x18 + (long)local_fe8 * -8;
                  lVar84 = lVar74 + lVar70 * 0x28 + (long)local_fe8 * -8;
                  lVar87 = (lVar42 + (long)local_fe8 * -8) * (long)local_ff8 + lVar34 * 8 +
                           lVar53 * -8;
                  lVar77 = (lVar70 * 0x70 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                           (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                  lVar78 = (lVar70 * 0x68 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                           (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                  lVar81 = (lVar70 * 0x50 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                           (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                  lVar82 = (lVar70 * 0x60 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                           (long)local_ff8 + lVar34 * 8 + lVar53 * -8;
                  local_e78 = (_func_int *)
                              (((lVar42 + lVar70 * 8 + (long)local_fe8 * -8 + -8) * (long)local_ff8
                                + lVar34 * 8 + lVar53 * -8) * (long)local_1090 + lVar86 * 8 +
                               lVar52 * -8 + lVar51 + -8);
                  local_11c8 = ((lVar62 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                               (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51 + -8;
                  local_1568 = ((lVar70 * 0xb8 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                               lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_de8 = (double)(((lVar70 * 0x30 + (long)local_14c8 * 8 + (long)local_fe8 * -8
                                        ) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                                       (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51 + -8);
                  local_10b8 = (_func_int *)
                               (((lVar70 * 0x78 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                 (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                                lVar86 * 8 + lVar52 * -8 + lVar51 + -8);
                  local_16a0 = ((lVar70 * 0xb0 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                               lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_f48 = (_func_int *)
                              (lVar87 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51 + -8);
                  local_15c8 = (_func_int *)
                               (lVar86 * 8 +
                                ((lVar70 * 0x98 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                 (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                                lVar52 * -8 + lVar51);
                  local_d68 = (_func_int *)
                              ((lVar62 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                               (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51 + -8);
                  local_15f8 = (_func_int *)
                               (((lVar70 * 0xa8 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                 (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                                lVar86 * 8 + lVar52 * -8 + lVar51);
                  local_1608 = (_func_int *)
                               (((lVar70 * 200 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                 (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090
                                + lVar86 * 8 + lVar52 * -8 + lVar51);
                  local_d78 = (double)((lVar87 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 +
                                       lVar51 + -8);
                  local_1248 = ((lVar70 * 0x40 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090
                               + lVar86 * 8 + lVar52 * -8 + lVar51 + -8;
                  local_1688 = (_func_int *)
                               (((lVar70 * 0x58 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8)
                                 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                                lVar86 * 8 + lVar52 * -8 + lVar51);
                  local_1410 = ((lVar70 * 0xa0 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                               lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1418 = ((lVar71 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                               (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1420 = ((((long)local_14c8 + lVar70) * 8 + (long)local_fe8 * -8 + -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                               lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1428 = ((lVar72 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                               (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1430 = lVar77 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1438 = ((lVar74 + lVar70 * 0x48 + (long)local_fe8 * -8) * (long)local_ff8 +
                                lVar34 * 8 + lVar53 * -8) * (long)local_1090 + lVar86 * 8 +
                               lVar52 * -8 + lVar51;
                  local_1038 = (double)(((lVar70 * 0x90 + (long)local_14c8 * 8 +
                                         (long)local_fe8 * -8) * (long)local_ff8 + lVar34 * 8 +
                                        lVar53 * -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 +
                                       lVar51);
                  local_f38 = (double)(lVar78 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51
                                      );
                  local_11b8 = (double *)
                               ((lVar71 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                                (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                  local_12d8 = (lVar75 + ((long)local_14c8 - (long)local_fe8) * (long)local_ff8 * 8
                               + lVar53 * -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51
                  ;
                  local_1238 = (double)(lVar81 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 +
                                       lVar51);
                  local_1348 = ((lVar70 * 8 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8) * (long)local_1090 +
                               lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1498 = (lVar72 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8) *
                               (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1668 = lVar82 * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1440 = ((lVar70 * 0xd0 + (long)local_14c8 * 8 + (long)local_fe8 * -8 + -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090
                               + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_13a0 = lVar86 * 8 +
                               ((lVar84 + -8) * (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) *
                               (long)local_1090 + lVar52 * -8 + lVar51;
                  local_12f0 = (lVar77 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_12f8 = ((lVar70 * 0x10 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090
                               + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1268 = ((lVar70 * 0xc0 + (long)local_14c8 * 8 + (long)local_fe8 * -8) *
                                (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) * (long)local_1090
                               + lVar86 * 8 + lVar52 * -8 + lVar51;
                  local_1448 = (double)((lVar78 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8
                                       + lVar51);
                  local_1450 = (double)((lVar81 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8
                                       + lVar51);
                  local_14d0 = (double)((lVar84 * (long)local_ff8 + lVar34 * 8 + lVar53 * -8 + -8) *
                                        (long)local_1090 + lVar86 * 8 + lVar52 * -8 + lVar51);
                  local_1300 = (double)((lVar82 + -8) * (long)local_1090 + lVar86 * 8 + lVar52 * -8
                                       + lVar51);
                  local_ea8 = (_func_int *)(ulong)(uStack_f94 + 1);
                  local_10d8 = (_func_int *)((long)local_10d8 * 8);
                  lVar57 = lVar57 * 8;
                  lVar51 = CONCAT44(local_ae8._4_4_,local_ae8._0_4_) + lVar86 * 8;
                  dVar188 = (double)((long)local_e88 * 8);
                  lVar86 = (long)local_1090 * 8;
                  do {
                    if (local_fa8._4_4_ <= iStack_f98) {
                      lVar52 = (long)local_ac8;
                      local_1028 = (double)(CONCAT44(OStack_adc.val,uStack_ae0) * 8);
                      lVar42 = (lVar34 - iStack_ac4) * (long)local_1028 +
                               ((long)local_14c8 - (long)iStack_ac0) *
                               CONCAT44(iStack_ad4,local_ad8) * 8;
                      local_1728 = (_func_int *)(lVar42 + lStack_ad0 * 8 + lVar52 * -8 + lVar51);
                      local_1720 = (_func_int *)(lStack_ad0 * 0x10 + lVar42 + lVar52 * -8 + lVar51);
                      local_16d8 = (_func_int *)(lVar42 + lStack_ad0 * 0x18 + lVar52 * -8 + lVar51);
                      local_1718 = (_func_int *)(lStack_ad0 * 0x20 + lVar42 + lVar52 * -8 + lVar51);
                      local_1678 = (_func_int *)(lVar42 + lStack_ad0 * 0x28 + lVar52 * -8 + lVar51);
                      local_1710 = lStack_ad0 * 0x30 + lVar42 + lVar52 * -8 + lVar51;
                      local_16e8 = (_func_int *)(lStack_ad0 * 0x38 + lVar42 + lVar52 * -8 + lVar51);
                      local_16b8 = (long)local_1450;
                      local_1700 = (long)local_1448;
                      local_1698 = local_1268;
                      local_1708 = local_12f8;
                      local_1518 = local_1440;
                      local_1778 = (long)local_1238;
                      local_14e8 = local_12d8;
                      local_1488 = local_f38;
                      local_1750 = local_1038;
                      local_1548 = local_1438;
                      local_14b8 = local_1430;
                      local_1558 = (double)local_1428;
                      local_14f8 = (double)local_1420;
                      local_15b8 = (double)local_1418;
                      local_1468 = local_1410;
                      local_1478 = local_1688;
                      local_1378 = (double)local_1248;
                      local_1228 = local_d78;
                      local_1318 = (long)local_15f8;
                      local_1408 = local_d68;
                      local_1788 = local_f48;
                      local_1128 = local_16a0;
                      local_12c8 = local_10b8;
                      local_1388 = (_func_int *)local_de8;
                      local_13b8 = local_1568;
                      local_1288 = (_func_int *)local_11c8;
                      local_1530 = local_e78;
                      local_1758 = local_15d8;
                      local_1138 = (_func_int *)local_13f8;
                      pdVar37 = local_11b8;
                      dVar217 = local_1300;
                      lVar53 = local_1668;
                      dVar200 = local_14d0;
                      lVar74 = local_1498;
                      p_Var69 = local_1260;
                      p_Var56 = local_1608;
                      p_Var67 = local_15c8;
                      lVar70 = local_1348;
                      p_Var76 = local_1648;
                      local_1630 = lVar34;
                      lVar42 = local_13a0;
                      lVar52 = local_12f0;
                      do {
                        if ((int)local_fa8 <= iStack_f9c) {
                          lVar71 = 0;
                          do {
                            *(double *)((long)local_1728 + lVar71 * 8) =
                                 (*(double *)(lVar42 + lVar71 * 8) * dVar102 +
                                 *(double *)(local_1518 + lVar71 * 8) * dVar187 +
                                 *(double *)(lVar52 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(local_1758 + lVar71 * 8) +
                                 (*(double *)((long)local_1558 + lVar71 * 8) * dVar102 +
                                 *(double *)(local_1468 + lVar71 * 8) * dVar187 +
                                 *(double *)(local_14b8 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(local_1138 + lVar71 * 8) +
                                 (*(double *)(lVar74 + lVar71 * 8) * dVar102 +
                                 *(double *)((long)local_1750 + lVar71 * 8) * dVar187 +
                                 *(double *)(lVar53 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(p_Var76 + lVar71 * 8) +
                                 (*(double *)((long)dVar200 + lVar71 * 8) * dVar102 +
                                 *(double *)(local_1698 + lVar71 * 8) * dVar187 +
                                 *(double *)((long)dVar217 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(p_Var69 + lVar71 * 8);
                            *(double *)((long)local_1720 + lVar71 * 8) =
                                 (*(double *)((long)local_1288 + lVar71 * 8) * dVar102 +
                                 *(double *)(local_13b8 + -8 + lVar71 * 8) * dVar103 +
                                 *(double *)(local_1530 + lVar71 * 8) * local_d58) *
                                 *(double *)(local_1138 + lVar71 * 8 + -8) +
                                 (*(double *)((long)local_14f8 + lVar71 * 8) * dVar102 +
                                 *(double *)(local_13b8 + lVar71 * 8) * dVar103 +
                                 *(double *)((long)local_1478 + lVar71 * 8) * local_d58) *
                                 *(double *)(local_1138 + lVar71 * 8) +
                                 (*(double *)(lVar70 + lVar71 * 8) * dVar102 +
                                 *(double *)(local_1318 + lVar71 * 8) * dVar103 +
                                 *(double *)(local_1548 + lVar71 * 8) * local_d58) *
                                 *(double *)(p_Var76 + lVar71 * 8) +
                                 (*(double *)(local_1408 + lVar71 * 8) * dVar102 +
                                 *(double *)(local_1318 + -8 + lVar71 * 8) * dVar103 +
                                 *(double *)(local_12c8 + lVar71 * 8) * local_d58) *
                                 *(double *)(p_Var76 + lVar71 * 8 + -8);
                            *(double *)((long)local_16d8 + lVar71 * 8) =
                                 (*(double *)((long)local_1378 + lVar71 * 8) * dVar108 +
                                 *(double *)((long)p_Var56 + -8 + lVar71 * 8) * dVar103 +
                                 *(double *)((long)local_1228 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(p_Var69 + lVar71 * 8 + -8) +
                                 (*(double *)(local_1708 + lVar71 * 8) * dVar108 +
                                 *(double *)((long)p_Var56 + lVar71 * 8) * dVar103 +
                                 *(double *)(local_16b8 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(p_Var69 + lVar71 * 8) +
                                 (*(double *)(local_14e8 + lVar71 * 8) * dVar108 +
                                 *(double *)((long)p_Var67 + lVar71 * 8) * dVar103 +
                                 *(double *)(local_1778 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(p_Var76 + lVar71 * 8) +
                                 (*(double *)((long)local_1388 + lVar71 * 8) * dVar108 +
                                 *(double *)((long)p_Var67 + -8 + lVar71 * 8) * dVar103 +
                                 *(double *)(local_1788 + lVar71 * 8) * (double)local_dd8) *
                                 *(double *)(p_Var76 + lVar71 * 8 + -8);
                            *(double *)((long)local_1718 + lVar71 * 8) =
                                 (pdVar37[lVar71] * dVar109 +
                                 *(double *)(local_1318 + lVar71 * 8) * local_d48 +
                                 *(double *)(lVar53 + lVar71 * 8) * local_d38) *
                                 *(double *)(p_Var76 + lVar71 * 8) +
                                 (*(double *)((long)local_15b8 + lVar71 * 8) * dVar109 +
                                 *(double *)(local_13b8 + lVar71 * 8) * local_d48 +
                                 *(double *)(local_14b8 + lVar71 * 8) * local_d38) *
                                 *(double *)(local_1138 + lVar71 * 8);
                            *(double *)((long)local_1678 + lVar71 * 8) =
                                 (*(double *)(lVar74 + lVar71 * 8) * (double)local_10a8._0_8_ +
                                 *(double *)((long)p_Var67 + lVar71 * 8) * local_d48 +
                                 *(double *)((long)local_1488 + lVar71 * 8) * dVar223) *
                                 *(double *)(p_Var76 + lVar71 * 8) +
                                 (*(double *)((long)dVar200 + lVar71 * 8) * (double)local_10a8._0_8_
                                 + *(double *)((long)p_Var56 + lVar71 * 8) * local_d48 +
                                   *(double *)(local_1700 + lVar71 * 8) * dVar223) *
                                 *(double *)(p_Var69 + lVar71 * 8);
                            *(double *)(local_1710 + lVar71 * 8) =
                                 (*(double *)(lVar70 + lVar71 * 8) * (double)local_10a8._0_8_ +
                                 *(double *)(local_1128 + lVar71 * 8) * dVar228 +
                                 *(double *)(local_1778 + lVar71 * 8) * local_d38) *
                                 *(double *)(p_Var76 + lVar71 * 8) +
                                 (*(double *)(local_1408 + lVar71 * 8) * (double)local_10a8._0_8_ +
                                 *(double *)(local_1128 + -8 + lVar71 * 8) * dVar228 +
                                 *(double *)(local_1788 + lVar71 * 8) * local_d38) *
                                 *(double *)(p_Var76 + lVar71 * 8 + -8);
                            *(double *)((long)local_16e8 + lVar71 * 8) =
                                 (pdVar37[lVar71] * (double)local_cd8._0_8_ +
                                 *(double *)(local_1128 + lVar71 * 8) * local_fc8 +
                                 *(double *)((long)local_1488 + lVar71 * 8) * auVar153._8_8_) *
                                 *(double *)(p_Var76 + lVar71 * 8);
                            lVar71 = lVar71 + 1;
                            local_1018 = pdVar37;
                          } while ((iStack_f9c - (int)local_fa8) + 1 != (int)lVar71);
                        }
                        local_1630 = local_1630 + 1;
                        local_1138 = local_1138 + lVar57;
                        p_Var76 = p_Var76 + lVar57;
                        local_1758 = local_1758 + lVar57;
                        p_Var69 = p_Var69 + lVar57;
                        local_1728 = (_func_int *)((long)local_1728 + (long)local_1028);
                        local_1720 = (_func_int *)((long)local_1720 + (long)local_1028);
                        local_16d8 = (_func_int *)((long)local_16d8 + (long)local_1028);
                        local_1718 = (_func_int *)((long)local_1718 + (long)local_1028);
                        local_1678 = (_func_int *)((long)local_1678 + (long)local_1028);
                        local_1710 = local_1710 + (long)local_1028;
                        local_16e8 = (_func_int *)((long)local_16e8 + (long)local_1028);
                        local_1530 = local_1530 + lVar86;
                        local_1288 = (_func_int *)((long)local_1288 + lVar86);
                        local_13b8 = local_13b8 + lVar86;
                        local_1388 = (_func_int *)((long)local_1388 + lVar86);
                        local_12c8 = local_12c8 + lVar86;
                        local_1128 = local_1128 + lVar86;
                        local_1788 = local_1788 + lVar86;
                        p_Var67 = (_func_int *)((long)p_Var67 + lVar86);
                        local_1408 = local_1408 + lVar86;
                        local_1318 = local_1318 + lVar86;
                        p_Var56 = (_func_int *)((long)p_Var56 + lVar86);
                        local_1228 = (double)((long)local_1228 + lVar86);
                        local_1378 = (double)((long)local_1378 + lVar86);
                        local_1478 = (_func_int *)((long)local_1478 + lVar86);
                        local_1468 = local_1468 + lVar86;
                        local_15b8 = (double)((long)local_15b8 + lVar86);
                        local_14f8 = (double)((long)local_14f8 + lVar86);
                        local_1558 = (double)((long)local_1558 + lVar86);
                        local_14b8 = local_14b8 + lVar86;
                        local_1548 = local_1548 + lVar86;
                        local_1750 = (double)((long)local_1750 + lVar86);
                        local_1488 = (double)((long)local_1488 + lVar86);
                        pdVar37 = pdVar37 + (long)local_1090;
                        local_14e8 = local_14e8 + lVar86;
                        local_1778 = local_1778 + lVar86;
                        lVar70 = lVar70 + lVar86;
                        lVar74 = lVar74 + lVar86;
                        lVar53 = lVar53 + lVar86;
                        local_1518 = local_1518 + lVar86;
                        lVar42 = lVar42 + lVar86;
                        lVar52 = lVar52 + lVar86;
                        local_1708 = local_1708 + lVar86;
                        local_1698 = local_1698 + lVar86;
                        local_1700 = local_1700 + lVar86;
                        local_16b8 = local_16b8 + lVar86;
                        dVar200 = (double)((long)dVar200 + lVar86);
                        dVar217 = (double)((long)dVar217 + lVar86);
                      } while (iStack_f98 + 1 != (int)local_1630);
                    }
                    local_14c8 = (double)((long)local_14c8 + 1);
                    local_13f8 = (double *)((long)local_13f8 + (long)local_10d8);
                    local_1648 = local_1648 + (long)local_10d8;
                    local_15d8 = local_15d8 + (long)local_10d8;
                    local_1260 = local_1260 + (long)local_10d8;
                    local_e78 = local_e78 + (long)dVar188;
                    local_11c8 = local_11c8 + (long)dVar188;
                    local_1568 = local_1568 + (long)dVar188;
                    local_de8 = (double)((long)local_de8 + (long)dVar188);
                    local_10b8 = local_10b8 + (long)dVar188;
                    local_16a0 = local_16a0 + (long)dVar188;
                    local_f48 = local_f48 + (long)dVar188;
                    local_15c8 = (_func_int *)((long)local_15c8 + (long)dVar188);
                    local_d68 = local_d68 + (long)dVar188;
                    local_15f8 = (_func_int *)((long)local_15f8 + (long)dVar188);
                    local_1608 = (_func_int *)((long)local_1608 + (long)dVar188);
                    local_d78 = (double)((long)local_d78 + (long)dVar188);
                    local_1248 = local_1248 + (long)dVar188;
                    local_1688 = (_func_int *)((long)local_1688 + (long)dVar188);
                    local_1410 = local_1410 + (long)dVar188;
                    local_1418 = local_1418 + (long)dVar188;
                    local_1420 = local_1420 + (long)dVar188;
                    local_1428 = local_1428 + (long)dVar188;
                    local_1430 = local_1430 + (long)dVar188;
                    local_1438 = local_1438 + (long)dVar188;
                    local_1038 = (double)((long)local_1038 + (long)dVar188);
                    local_f38 = (double)((long)local_f38 + (long)dVar188);
                    local_11b8 = local_11b8 + (long)local_e88;
                    local_12d8 = local_12d8 + (long)dVar188;
                    local_1238 = (double)((long)local_1238 + (long)dVar188);
                    local_1348 = local_1348 + (long)dVar188;
                    local_1498 = local_1498 + (long)dVar188;
                    local_1668 = local_1668 + (long)dVar188;
                    local_1440 = local_1440 + (long)dVar188;
                    local_13a0 = local_13a0 + (long)dVar188;
                    local_12f0 = local_12f0 + (long)dVar188;
                    local_12f8 = local_12f8 + (long)dVar188;
                    local_1268 = local_1268 + (long)dVar188;
                    local_1448 = (double)((long)local_1448 + (long)dVar188);
                    local_1450 = (double)((long)local_1450 + (long)dVar188);
                    local_14d0 = (double)((long)local_14d0 + (long)dVar188);
                    local_1300 = (double)((long)local_1300 + (long)dVar188);
                  } while (uStack_f94 + 1 != SUB84(local_14c8,0));
                }
              }
              local_e88 = dVar188;
              Gpu::Elixir::~Elixir(&local_48);
              Gpu::Elixir::~Elixir(&local_e0);
            }
            else {
              if (FVar28 != covered) goto LAB_0059a1c3;
              iVar30 = (int)local_fa8;
              lVar34 = (long)(int)local_fa8;
              iVar39 = local_fa8._4_4_;
              lVar86 = (long)local_fa8._4_4_;
              __n = (ulong)(uint)(iStack_f9c - (int)local_fa8) * 8 + 8;
              iVar49 = (iStack_f98 - local_fa8._4_4_) + 1;
              local_1758 = (_func_int *)0x0;
              lVar51 = 0;
              do {
                uVar23 = uVar66;
                if ((int)uVar66 <= (int)uVar40) {
                  do {
                    if (iVar39 <= iVar12) {
                      lVar42 = CONCAT44(OStack_80c.val,local_818._8_4_) * 8;
                      pvVar79 = (void *)(local_818._0_8_ +
                                        lStack_800 * (long)local_1758 +
                                        (lVar86 - iStack_7f4) * lVar42 +
                                        (long)(int)(uVar23 - iStack_7f0) *
                                        CONCAT44(iStack_804,local_808) * 8 + (long)local_7f8 * -8 +
                                        lVar34 * 8);
                      iVar85 = iVar49;
                      do {
                        if (iVar30 <= iVar10) {
                          memset(pvVar79,0,__n);
                        }
                        pvVar79 = (void *)((long)pvVar79 + lVar42);
                        iVar85 = iVar85 + -1;
                      } while (iVar85 != 0);
                    }
                    bVar90 = uVar23 != uVar40;
                    uVar23 = uVar23 + 1;
                  } while (bVar90);
                }
                lVar51 = lVar51 + 1;
                local_1758 = (_func_int *)((long)local_1758 + 8);
              } while (lVar51 != 9);
              lVar51 = CONCAT44(local_ae8._4_4_,local_ae8._0_4_);
              if (lVar51 != 0) {
                local_1758 = (_func_int *)0x0;
                lVar42 = 0;
                do {
                  uVar23 = uVar66;
                  if ((int)uVar66 <= (int)uVar40) {
                    do {
                      if (iVar39 <= iVar12) {
                        lVar52 = CONCAT44(OStack_adc.val,uStack_ae0) * 8;
                        pvVar79 = (void *)(lStack_ad0 * (long)local_1758 +
                                           (lVar86 - iStack_ac4) * lVar52 +
                                           (long)(int)(uVar23 - iStack_ac0) *
                                           CONCAT44(iStack_ad4,local_ad8) * 8 + (long)local_ac8 * -8
                                          + lVar51 + lVar34 * 8);
                        iVar85 = iVar49;
                        do {
                          if (iVar30 <= iVar10) {
                            memset(pvVar79,0,__n);
                          }
                          pvVar79 = (void *)((long)pvVar79 + lVar52);
                          iVar85 = iVar85 + -1;
                        } while (iVar85 != 0);
                      }
                      bVar90 = uVar23 != uVar40;
                      uVar23 = uVar23 + 1;
                    } while (bVar90);
                  }
                  lVar42 = lVar42 + 1;
                  local_1758 = (_func_int *)((long)local_1758 + 8);
                } while (lVar42 != 9);
              }
            }
          }
          else {
LAB_0059a1c3:
            iVar50 = local_1118.smallend.vect[2];
            iVar12 = local_1118.smallend.vect[0];
            iVar29 = local_1118.smallend.vect[1];
            iVar85 = *(int *)(lVar51 + 0x18);
            iVar10 = *(int *)(lVar51 + 0x1c);
            iVar58 = iVar85;
            if (iVar85 < local_1118.smallend.vect[0]) {
              iVar58 = local_1118.smallend.vect[0];
            }
            iVar59 = iVar10;
            if (iVar10 < local_1118.smallend.vect[1]) {
              iVar59 = local_1118.smallend.vect[1];
            }
            iVar11 = *(int *)(lVar51 + 0x20);
            iVar60 = iVar11;
            if (iVar11 < local_1118.smallend.vect[2]) {
              iVar60 = local_1118.smallend.vect[2];
            }
            iVar61 = *(int *)(lVar51 + 0x24);
            if (local_1118.bigend.vect[0] < *(int *)(lVar51 + 0x24)) {
              iVar61 = local_1118.bigend.vect[0];
            }
            uVar66 = *(uint *)(lVar51 + 0x28);
            if (local_1118.bigend.vect[1] < (int)*(uint *)(lVar51 + 0x28)) {
              uVar66 = local_1118.bigend.vect[1];
            }
            iVar199 = *(int *)(lVar51 + 0x2c);
            if (local_1118.bigend.vect[2] < *(int *)(lVar51 + 0x2c)) {
              iVar199 = local_1118.bigend.vect[2];
            }
            FArrayBox::resize((FArrayBox *)local_e60,&local_1118,1,(Arena *)0x0);
            auVar35 = local_e58;
            if (local_e58 == (undefined1  [8])0x0) {
              auVar35 = (undefined1  [8])The_Arena();
            }
            Gpu::Elixir::Elixir(&local_e0,(void *)0x0,(Arena *)auVar35);
            iVar27 = local_e2c;
            uVar105 = auStack_e50._0_8_;
            uVar25 = auStack_e50._8_4_;
            lVar74 = (long)(int)auStack_e50._8_4_;
            iVar207 = iStack_e44;
            lVar70 = (long)iStack_e44;
            iVar26 = iStack_e40;
            lVar51 = (long)iStack_e40;
            iVar38 = iStack_e3c + 1;
            p_Var43 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (long)(iVar38 - auStack_e50._8_4_);
            lVar53 = (long)((local_e38 + 1) - iStack_e44);
            peVar36 = (element_type *)(lVar53 * (long)p_Var43);
            lVar57 = (long)local_1118.smallend.vect[2];
            if (local_1118.smallend.vect[2] <= local_1118.bigend.vect[2]) {
              lVar75 = (long)local_1118.smallend.vect[0];
              lVar71 = (long)local_1118.smallend.vect[1] * 8;
              lVar72 = (lVar71 + (lVar57 - lVar51) * lVar53 * 8 + lVar70 * -8) * (long)p_Var43 +
                       lVar75 * 8 + lVar74 * -8 + auStack_e50._0_8_;
              lVar86 = lVar86 + (lVar71 + (lVar57 - iVar49) * lVar52 * 8 + (long)iVar39 * -8) *
                                lVar34 + lVar75 * 8 + (long)iVar30 * -8;
              do {
                lVar52 = lVar72;
                lVar71 = lVar86;
                lVar77 = (long)local_1118.smallend.vect[1];
                if (local_1118.smallend.vect[1] <= local_1118.bigend.vect[1]) {
                  do {
                    if (local_1118.smallend.vect[0] <= local_1118.bigend.vect[0]) {
                      lVar78 = 0;
                      do {
                        uVar104 = 0;
                        if ((((long)iVar58 <= lVar75 + lVar78) && (iVar59 <= lVar77)) &&
                           ((iVar60 <= lVar57 &&
                            (((lVar75 + lVar78 <= (long)iVar61 && (lVar77 <= (int)uVar66)) &&
                             (lVar57 <= iVar199)))))) {
                          uVar104 = *(undefined8 *)(lVar71 + lVar78 * 8);
                        }
                        *(undefined8 *)(lVar52 + lVar78 * 8) = uVar104;
                        lVar78 = lVar78 + 1;
                      } while ((local_1118.bigend.vect[0] - local_1118.smallend.vect[0]) + 1 !=
                               (int)lVar78);
                    }
                    lVar77 = lVar77 + 1;
                    lVar52 = lVar52 + (long)iVar38 * 8 + lVar74 * -8;
                    lVar71 = lVar71 + lVar34 * 8;
                  } while (local_1118.bigend.vect[1] + 1U != (int)lVar77);
                }
                lVar57 = lVar57 + 1;
                lVar72 = lVar72 + (long)peVar36 * 8;
                lVar86 = lVar86 + lVar42 * 8;
              } while (local_1118.bigend.vect[2] + 1 != (int)lVar57);
            }
            p_Var80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((((long)local_e34 + 1) - lVar51) * (long)peVar36);
            uVar104._4_4_ = local_e38 + 1;
            uVar104._0_4_ = iVar38;
            local_c8.kstride._0_4_ = iStack_f98;
            local_c8.kstride._4_4_ = uStack_f94;
            local_c8.p = local_fa8;
            local_c8.jstride._0_4_ = uStack_fa0;
            local_c8.jstride._4_4_ = iStack_f9c;
            local_268._20_4_ = iStack_804;
            local_268._16_4_ = local_808;
            local_268._24_8_ = lStack_800;
            local_268._48_4_ = auStack_7e8._0_4_;
            local_268._52_8_ = auStack_7e8._4_8_;
            local_268._32_4_ = local_7f8;
            local_268._36_4_ = iStack_7f4;
            local_268._40_4_ = iStack_7f0;
            local_268._44_4_ = iStack_7ec;
            local_268._0_8_ = local_818._0_8_;
            local_268._8_4_ = local_818._8_4_;
            local_268._12_4_ = OStack_80c.val;
            local_268._64_8_ = local_1068._0_8_;
            local_268._72_8_ = auStack_e50._0_8_;
            local_268._104_4_ = auStack_e50._8_4_;
            local_268._108_4_ = iStack_e44;
            local_268._112_4_ = iStack_e40;
            iVar30 = (int)((long)local_e34 + 1);
            local_1e8 = local_e2c;
            local_1e0 = local_1058;
            piStack_1d8 = piStack_1050;
            local_1d0 = local_ed8;
            local_1c8 = local_e08;
            p_Stack_1c0 = p_Stack_e00;
            local_1b8 = (Real)local_ec8._0_8_;
            local_268._80_8_ = p_Var43;
            local_268._88_8_ = peVar36;
            local_268._96_8_ = p_Var80;
            local_268._116_8_ = uVar104;
            local_1ec = iVar30;
            LoopConcurrent<amrex::mlndlap_set_stencil(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                      ((Box *)&local_c8,(anon_class_184_9_71aa95b3 *)local_268);
            auVar21 = _DAT_0065b9b0;
            auVar20 = _DAT_0065b9a0;
            if (CONCAT44(local_ae8._4_4_,local_ae8._0_4_) != 0) {
              if (iVar60 <= iVar199) {
                if (iVar12 < iVar85) {
                  iVar12 = iVar85;
                }
                if (iVar29 < iVar10) {
                  iVar29 = iVar10;
                }
                if (iVar50 < iVar11) {
                  iVar50 = iVar11;
                }
                lVar86 = (long)iVar50;
                uVar40 = iVar61 - iVar12;
                auVar107._4_4_ = 0;
                auVar107._0_4_ = uVar40;
                auVar107._8_4_ = uVar40;
                auVar107._12_4_ = 0;
                lVar51 = uVar105 + ((long)iVar29 * 8 + (lVar86 - lVar51) * lVar53 * 8 + lVar70 * -8)
                                   * (long)p_Var43 + (long)iVar12 * 8 + lVar74 * -8 + 8;
                do {
                  lVar34 = lVar51;
                  lVar42 = (long)iVar29;
                  if (iVar59 <= (int)uVar66) {
                    do {
                      if (iVar58 <= iVar61) {
                        uVar31 = 0;
                        do {
                          auVar116._8_4_ = (int)uVar31;
                          auVar116._0_8_ = uVar31;
                          auVar116._12_4_ = (int)(uVar31 >> 0x20);
                          auVar136 = auVar107 ^ auVar21;
                          auVar117 = (auVar116 | auVar20) ^ auVar21;
                          bVar90 = auVar136._0_4_ < auVar117._0_4_;
                          iVar39 = auVar136._4_4_;
                          iVar49 = auVar117._4_4_;
                          if ((bool)(~(iVar39 < iVar49 || iVar49 == iVar39 && bVar90) & 1)) {
                            *(undefined8 *)(lVar34 + -8 + uVar31 * 8) = 0x3ff0000000000000;
                          }
                          if (iVar39 >= iVar49 && (iVar49 != iVar39 || !bVar90)) {
                            *(undefined8 *)(lVar34 + uVar31 * 8) = 0x3ff0000000000000;
                          }
                          uVar31 = uVar31 + 2;
                        } while (((ulong)uVar40 + 2 & 0x1fffffffe) != uVar31);
                      }
                      lVar42 = lVar42 + 1;
                      lVar34 = lVar34 + (long)iVar38 * 8 + lVar74 * -8;
                    } while (((uVar66 + iVar29) - iVar59) + 1 != (int)lVar42);
                  }
                  lVar86 = lVar86 + 1;
                  lVar51 = lVar51 + (long)peVar36 * 8;
                } while (((iVar199 + iVar50) - iVar60) + 1 != (int)lVar86);
              }
              local_c8.kstride._0_4_ = iStack_f98;
              local_c8.kstride._4_4_ = uStack_f94;
              local_c8.p = local_fa8;
              local_c8.jstride._0_4_ = uStack_fa0;
              local_c8.jstride._4_4_ = iStack_f9c;
              local_268._48_4_ = iStack_ab8;
              local_268._52_4_ = (int)uStack_ab4;
              local_268._56_4_ = uStack_ab4._4_4_;
              local_268._4_4_ = local_ae8._4_4_;
              local_268._0_4_ = local_ae8._0_4_;
              local_268._20_4_ = iStack_ad4;
              local_268._16_4_ = local_ad8;
              local_268._24_8_ = lStack_ad0;
              local_268._32_4_ = local_ac8;
              local_268._36_4_ = iStack_ac4;
              local_268._40_4_ = iStack_ac0;
              local_268._44_4_ = iStack_abc;
              local_268._8_4_ = uStack_ae0;
              local_268._12_4_ = OStack_adc.val;
              local_268._64_8_ = local_1068._0_8_;
              local_268._72_8_ = uVar105;
              local_268._104_4_ = uVar25;
              local_268._108_4_ = iVar207;
              local_268._112_4_ = iVar26;
              local_1e8 = iVar27;
              local_1e0 = local_1058;
              piStack_1d8 = piStack_1050;
              local_1d0 = local_ed8;
              local_1c8 = local_e08;
              p_Stack_1c0 = p_Stack_e00;
              local_1b8 = (Real)local_ec8._0_8_;
              local_268._80_8_ = p_Var43;
              local_268._88_8_ = peVar36;
              local_268._96_8_ = p_Var80;
              local_268._116_8_ = uVar104;
              local_1ec = iVar30;
              LoopConcurrent<amrex::mlndlap_set_stencil(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                        ((Box *)&local_c8,(anon_class_184_9_71aa95b3 *)local_268);
            }
            Gpu::Elixir::~Elixir(&local_e0);
          }
          MFIter::operator++((MFIter *)local_ba0);
        } while (aiStack_b80[0] < aiStack_b80[2]);
      }
      MFIter::~MFIter((MFIter *)local_ba0);
      local_c70._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
      BaseFab<double>::clear(&local_c70);
      local_e60 = (undefined1  [8])&PTR__BaseFab_00712bd8;
      BaseFab<double>::clear((BaseFab<double> *)local_e60);
      MFIter::MFIter((MFIter *)local_268,
                     (FabArrayBase *)
                     **(undefined8 **)
                       ((long)&(((local_fb0->
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ).
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               ).
                               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       + local_1098 * 8),true);
      if ((int)local_268._32_4_ < (int)local_268._40_4_) {
        do {
          MFIter::tilebox((Box *)&local_c70,(MFIter *)local_268);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_ba0,
                     (FabArray<amrex::FArrayBox> *)
                     **(undefined8 **)
                       ((long)&(((local_fb0->
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ).
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               ).
                               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       + local_1098 * 8),(MFIter *)local_268);
          uVar31 = (ulong)DAT_0065b980;
          uVar154 = (ulong)DAT_0065c6d0;
          if ((int)local_c70.super_DataAllocator.m_arena <= local_c70.dptr._4_4_) {
            lVar51 = (long)local_c70._vptr_BaseFab._4_4_;
            iVar30 = (int)local_c70.super_DataAllocator.m_arena + -1;
            iVar39 = (int)local_c70.super_DataAllocator.m_arena;
            do {
              if (local_c70._vptr_BaseFab._4_4_ <= (int)local_c70.dptr) {
                lVar70 = CONCAT44(local_ba0._12_4_,local_ba0._8_4_) * 8;
                lVar77 = ((lVar51 + -1) - (long)aiStack_b80[1]) * lVar70;
                lVar34 = CONCAT44(local_ba0._20_4_,local_ba0._16_4_) * 8;
                lVar81 = (iVar30 - aiStack_b80[2]) * lVar34;
                lVar86 = lVar77 + lVar81;
                lVar74 = local_ba0._24_8_ * 0x38;
                lVar34 = ((long)iVar39 - (long)aiStack_b80[2]) * lVar34;
                lVar77 = lVar77 + lVar34;
                lVar42 = (lVar51 - aiStack_b80[1]) * lVar70;
                lVar81 = lVar81 + lVar42;
                lVar42 = lVar42 + lVar34;
                lVar34 = local_ba0._24_8_ * 0x30;
                lVar78 = (long)aiStack_b80[0];
                lVar52 = CONCAT44(local_ba0._4_4_,
                                  CONCAT13(local_ba0[3],CONCAT21(local_ba0._1_2_,local_ba0[0]))) +
                         (long)(int)local_c70._vptr_BaseFab * 8;
                lVar82 = lVar86 + lVar74 + lVar78 * -8 + lVar52;
                lVar57 = lVar77 + lVar74 + lVar78 * -8 + lVar52;
                lVar71 = lVar77 + local_ba0._24_8_ * 0x20 + lVar78 * -8 + lVar52;
                lVar53 = lVar81 + lVar74 + lVar78 * -8 + lVar52;
                lVar72 = lVar81 + local_ba0._24_8_ * 0x28 + lVar78 * -8 + lVar52;
                lVar75 = lVar74 + lVar42 + lVar78 * -8 + lVar52;
                local_1740 = local_ba0._24_8_ * 0x28 + lVar42 + lVar78 * -8 + lVar52;
                lVar87 = local_ba0._24_8_ * 0x20 + lVar42 + lVar78 * -8 + lVar52;
                lVar84 = lVar42 + local_ba0._24_8_ * 8 + lVar78 * -8 + lVar52;
                local_1780 = lVar81 + lVar34 + lVar78 * -8 + lVar52;
                lVar81 = lVar81 + local_ba0._24_8_ * 0x18 + lVar78 * -8 + lVar52;
                local_16f8 = local_ba0._24_8_ * 0x40 + lVar42 + lVar78 * -8 + lVar52;
                local_1748 = lVar42 + lVar78 * -8 + lVar52;
                local_1778 = lVar42 + lVar34 + lVar78 * -8 + lVar52;
                lVar74 = local_ba0._24_8_ * 0x18 + lVar42 + lVar78 * -8 + lVar52;
                lVar42 = lVar42 + local_ba0._24_8_ * 0x10 + lVar78 * -8 + lVar52;
                lVar86 = lVar86 + lVar34 + lVar78 * -8 + lVar52;
                local_1788 = (_func_int *)(lVar34 + lVar77 + lVar78 * -8 + lVar52);
                lVar52 = local_ba0._24_8_ * 0x10 + lVar77 + lVar78 * -8 + lVar52;
                local_1730 = (_func_int *)lVar51;
                do {
                  if ((int)local_c70._vptr_BaseFab <= local_c70.super_DataAllocator.m_arena._4_4_) {
                    lVar34 = 0;
                    do {
                      *(ulong *)(local_1748 + lVar34 * 8) =
                           (ulong)(*(double *)(lVar84 + -8 + lVar34 * 8) +
                                   *(double *)(lVar84 + lVar34 * 8) +
                                   *(double *)(lVar52 + lVar34 * 8) +
                                   *(double *)(lVar42 + lVar34 * 8) +
                                   *(double *)(lVar81 + lVar34 * 8) +
                                   *(double *)(lVar74 + lVar34 * 8) +
                                   *(double *)(lVar71 + -8 + lVar34 * 8) +
                                   *(double *)(lVar71 + lVar34 * 8) +
                                   *(double *)(lVar87 + -8 + lVar34 * 8) +
                                   *(double *)(lVar87 + lVar34 * 8) +
                                   *(double *)(lVar72 + -8 + lVar34 * 8) +
                                   *(double *)(lVar72 + lVar34 * 8) +
                                   *(double *)(local_1740 + -8 + lVar34 * 8) +
                                   *(double *)(local_1740 + lVar34 * 8) +
                                   *(double *)(lVar86 + lVar34 * 8) +
                                   *(double *)(local_1780 + lVar34 * 8) +
                                   *(double *)((long)local_1788 + lVar34 * 8) +
                                   *(double *)(local_1778 + lVar34 * 8) +
                                   *(double *)(lVar82 + -8 + lVar34 * 8) +
                                   *(double *)(lVar82 + lVar34 * 8) +
                                   *(double *)(lVar53 + -8 + lVar34 * 8) +
                                   *(double *)(lVar53 + lVar34 * 8) +
                                   *(double *)(lVar57 + -8 + lVar34 * 8) +
                                   *(double *)(lVar57 + lVar34 * 8) +
                                   *(double *)(lVar75 + -8 + lVar34 * 8) +
                                  *(double *)(lVar75 + lVar34 * 8)) ^ uVar31;
                      *(double *)(local_16f8 + lVar34 * 8) =
                           1.0 / ((double)(*(ulong *)(lVar75 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar75 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar57 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar57 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar53 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar53 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar82 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar82 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(local_1778 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)((long)local_1788 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(local_1780 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar86 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(local_1740 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(local_1740 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar72 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar72 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar87 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar87 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar71 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar71 + -8 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar74 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar81 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar42 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar52 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar84 + lVar34 * 8) & uVar154) +
                                  (double)(*(ulong *)(lVar84 + -8 + lVar34 * 8) & uVar154) + 1e-100)
                      ;
                      lVar34 = lVar34 + 1;
                    } while ((local_c70.super_DataAllocator.m_arena._4_4_ -
                             (int)local_c70._vptr_BaseFab) + 1 != (int)lVar34);
                  }
                  local_1730 = (_func_int *)((long)local_1730 + 1);
                  lVar82 = lVar82 + lVar70;
                  lVar57 = lVar57 + lVar70;
                  lVar71 = lVar71 + lVar70;
                  lVar53 = lVar53 + lVar70;
                  lVar72 = lVar72 + lVar70;
                  lVar75 = lVar75 + lVar70;
                  local_1740 = local_1740 + lVar70;
                  lVar87 = lVar87 + lVar70;
                  lVar84 = lVar84 + lVar70;
                  local_1780 = local_1780 + lVar70;
                  lVar81 = lVar81 + lVar70;
                  local_16f8 = local_16f8 + lVar70;
                  local_1748 = local_1748 + lVar70;
                  local_1778 = local_1778 + lVar70;
                  lVar74 = lVar74 + lVar70;
                  lVar42 = lVar42 + lVar70;
                  lVar86 = lVar86 + lVar70;
                  local_1788 = (_func_int *)((long)local_1788 + lVar70);
                  lVar52 = lVar52 + lVar70;
                } while ((int)local_c70.dptr + 1 != (int)local_1730);
              }
              iVar30 = iVar30 + 1;
              bVar90 = iVar39 != local_c70.dptr._4_4_;
              iVar39 = iVar39 + 1;
            } while (bVar90);
          }
          tVar16.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                &(local_cc0->
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar47]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
          if (tVar16.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
              (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_e60,
                       (FabArray<amrex::FArrayBox> *)
                       tVar16.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       (MFIter *)local_268);
            uVar31 = (ulong)DAT_0065b980;
            uVar154 = (ulong)DAT_0065c6d0;
            if ((int)local_c70.super_DataAllocator.m_arena <= local_c70.dptr._4_4_) {
              lVar51 = (long)local_c70._vptr_BaseFab._4_4_;
              iVar30 = (int)local_c70.super_DataAllocator.m_arena + -1;
              iVar39 = (int)local_c70.super_DataAllocator.m_arena;
              do {
                if (local_c70._vptr_BaseFab._4_4_ <= (int)local_c70.dptr) {
                  lVar70 = (long)local_e58 * 8;
                  lVar77 = ((lVar51 + -1) - (long)iStack_e3c) * lVar70;
                  lVar74 = (long)(iVar30 - local_e38) * auStack_e50._0_8_ * 8;
                  lVar86 = lVar77 + lVar74;
                  lVar57 = (long)stack0xfffffffffffff1b8 * 0x38;
                  lVar34 = ((long)iVar39 - (long)local_e38) * auStack_e50._0_8_ * 8;
                  lVar77 = lVar77 + lVar34;
                  lVar42 = (lVar51 - iStack_e3c) * lVar70;
                  lVar74 = lVar74 + lVar42;
                  lVar42 = lVar42 + lVar34;
                  lVar34 = (long)stack0xfffffffffffff1b8 * 0x30;
                  lVar78 = (long)iStack_e40;
                  lVar82 = (long)local_e60 +
                           lVar86 + lVar57 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar53 = (long)local_e60 +
                           lVar77 + lVar57 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar71 = (long)local_e60 +
                           lVar77 + (long)stack0xfffffffffffff1b8 * 0x20 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar52 = (long)local_e60 +
                           lVar74 + lVar57 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar72 = (long)local_e60 +
                           lVar74 + (long)stack0xfffffffffffff1b8 * 0x28 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar75 = (long)local_e60 +
                           lVar57 + lVar42 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                  local_1740 = (long)local_e60 +
                               (long)stack0xfffffffffffff1b8 * 0x28 + lVar42 + lVar78 * -8 +
                               (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar87 = (long)local_e60 +
                           (long)stack0xfffffffffffff1b8 * 0x20 + lVar42 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar84 = (long)local_e60 +
                           lVar42 + (long)stack0xfffffffffffff1b8 * 8 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  local_1780 = (long)local_e60 +
                               lVar74 + lVar34 + lVar78 * -8 +
                               (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar81 = (long)local_e60 +
                           lVar74 + (long)stack0xfffffffffffff1b8 * 0x18 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  local_16f8 = (long)local_e60 +
                               (long)stack0xfffffffffffff1b8 * 0x40 + lVar42 + lVar78 * -8 +
                               (long)(int)local_c70._vptr_BaseFab * 8;
                  local_1748 = (long)local_e60 +
                               lVar42 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                  local_1778 = (long)local_e60 +
                               lVar42 + lVar34 + lVar78 * -8 +
                               (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar74 = (long)local_e60 +
                           (long)stack0xfffffffffffff1b8 * 0x18 + lVar42 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar42 = (long)local_e60 +
                           lVar42 + (long)stack0xfffffffffffff1b8 * 0x10 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  lVar57 = (long)local_e60 +
                           lVar86 + lVar34 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                  local_1788 = (_func_int *)
                               ((long)local_e60 +
                               lVar34 + lVar77 + lVar78 * -8 +
                               (long)(int)local_c70._vptr_BaseFab * 8);
                  lVar86 = (long)local_e60 +
                           (long)stack0xfffffffffffff1b8 * 0x10 + lVar77 + lVar78 * -8 +
                           (long)(int)local_c70._vptr_BaseFab * 8;
                  local_1730 = (_func_int *)lVar51;
                  do {
                    if ((int)local_c70._vptr_BaseFab <= local_c70.super_DataAllocator.m_arena._4_4_)
                    {
                      lVar34 = 0;
                      do {
                        *(ulong *)(local_1748 + lVar34 * 8) =
                             (ulong)(*(double *)(lVar84 + -8 + lVar34 * 8) +
                                     *(double *)(lVar84 + lVar34 * 8) +
                                     *(double *)(lVar86 + lVar34 * 8) +
                                     *(double *)(lVar42 + lVar34 * 8) +
                                     *(double *)(lVar81 + lVar34 * 8) +
                                     *(double *)(lVar74 + lVar34 * 8) +
                                     *(double *)(lVar71 + -8 + lVar34 * 8) +
                                     *(double *)(lVar71 + lVar34 * 8) +
                                     *(double *)(lVar87 + -8 + lVar34 * 8) +
                                     *(double *)(lVar87 + lVar34 * 8) +
                                     *(double *)(lVar72 + -8 + lVar34 * 8) +
                                     *(double *)(lVar72 + lVar34 * 8) +
                                     *(double *)(local_1740 + -8 + lVar34 * 8) +
                                     *(double *)(local_1740 + lVar34 * 8) +
                                     *(double *)(lVar57 + lVar34 * 8) +
                                     *(double *)(local_1780 + lVar34 * 8) +
                                     *(double *)((long)local_1788 + lVar34 * 8) +
                                     *(double *)(local_1778 + lVar34 * 8) +
                                     *(double *)(lVar82 + -8 + lVar34 * 8) +
                                     *(double *)(lVar82 + lVar34 * 8) +
                                     *(double *)(lVar52 + -8 + lVar34 * 8) +
                                     *(double *)(lVar52 + lVar34 * 8) +
                                     *(double *)(lVar53 + -8 + lVar34 * 8) +
                                     *(double *)(lVar53 + lVar34 * 8) +
                                     *(double *)(lVar75 + -8 + lVar34 * 8) +
                                    *(double *)(lVar75 + lVar34 * 8)) ^ uVar31;
                        *(double *)(local_16f8 + lVar34 * 8) =
                             1.0 / ((double)(*(ulong *)(lVar75 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar75 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar53 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar53 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar52 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar52 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar82 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar82 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(local_1778 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)((long)local_1788 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(local_1780 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar57 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(local_1740 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(local_1740 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar72 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar72 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar87 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar87 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar71 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar71 + -8 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar74 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar81 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar42 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar86 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar84 + lVar34 * 8) & uVar154) +
                                    (double)(*(ulong *)(lVar84 + -8 + lVar34 * 8) & uVar154) +
                                   1e-100);
                        lVar34 = lVar34 + 1;
                      } while ((local_c70.super_DataAllocator.m_arena._4_4_ -
                               (int)local_c70._vptr_BaseFab) + 1 != (int)lVar34);
                    }
                    local_1730 = (_func_int *)((long)local_1730 + 1);
                    lVar82 = lVar82 + lVar70;
                    lVar53 = lVar53 + lVar70;
                    lVar71 = lVar71 + lVar70;
                    lVar52 = lVar52 + lVar70;
                    lVar72 = lVar72 + lVar70;
                    lVar75 = lVar75 + lVar70;
                    local_1740 = local_1740 + lVar70;
                    lVar87 = lVar87 + lVar70;
                    lVar84 = lVar84 + lVar70;
                    local_1780 = local_1780 + lVar70;
                    lVar81 = lVar81 + lVar70;
                    local_16f8 = local_16f8 + lVar70;
                    local_1748 = local_1748 + lVar70;
                    local_1778 = local_1778 + lVar70;
                    lVar74 = lVar74 + lVar70;
                    lVar42 = lVar42 + lVar70;
                    lVar57 = lVar57 + lVar70;
                    local_1788 = (_func_int *)((long)local_1788 + lVar70);
                    lVar86 = lVar86 + lVar70;
                  } while ((int)local_c70.dptr + 1 != (int)local_1730);
                }
                iVar30 = iVar30 + 1;
                bVar90 = iVar39 != local_c70.dptr._4_4_;
                iVar39 = iVar39 + 1;
              } while (bVar90);
            }
          }
          MFIter::operator++((MFIter *)local_268);
        } while ((int)local_268._32_4_ < (int)local_268._40_4_);
      }
      MFIter::~MFIter((MFIter *)local_268);
      pFVar55 = (FabArray<amrex::FArrayBox> *)
                **(undefined8 **)
                  ((long)&(((local_fb0->
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ).
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          ).
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  + local_1098 * 8);
      PVar237 = Geometry::periodicity(this_00);
      local_268._0_8_ = PVar237.period.vect._0_8_;
      local_268._8_4_ = PVar237.period.vect[2];
      FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar55,(Periodicity *)local_268,false);
      tVar16.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
            &(local_cc0->
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar47]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      if (tVar16.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
        PVar237 = Geometry::periodicity(this_00);
        local_268._0_8_ = PVar237.period.vect._0_8_;
        local_268._8_4_ = PVar237.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)
                   tVar16.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   (Periodicity *)local_268,false);
      }
      if (1 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar47]) {
        lVar51 = 1;
        do {
          lVar86 = *(long *)((long)&(((local_fb0->
                                      super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                      ).
                                      super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                    ).
                                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            + local_1098 * 8);
          pFVar55 = *(FabArray<amrex::FArrayBox> **)(lVar86 + -8 + lVar51 * 8);
          pFVar54 = *(FabArray<amrex::FArrayBox> **)(lVar86 + lVar51 * 8);
          pDVar14 = &(pFVar55->super_FabArrayBase).distributionMap;
          local_378 = lVar51;
          bVar90 = DistributionMapping::operator==
                             (&(pFVar54->super_FabArrayBase).distributionMap,pDVar14);
          bVar91 = (pFVar54->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                   (pFVar55->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          MultiFab::MultiFab((MultiFab *)local_268);
          local_380 = pFVar54;
          if (bVar91 || !bVar90) {
            amrex::coarsen((BoxArray *)local_ba0,&(pFVar55->super_FabArrayBase).boxarray,2);
            local_e60 = (undefined1  [8])0x1;
            stack0xfffffffffffff1b8 = (undefined1  [16])0x0;
            _local_e58 = (undefined1  [16])0x0;
            local_c70._vptr_BaseFab = (_func_int **)&PTR__FabFactory_00712918;
            MultiFab::define((MultiFab *)local_268,(BoxArray *)local_ba0,pDVar14,
                             (pFVar55->super_FabArrayBase).n_comp,1,(MFInfo *)local_e60,
                             (FabFactory<amrex::FArrayBox> *)&local_c70);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_e50);
            FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)local_268,0.0,0,local_19c,&local_1a8);
            BoxArray::~BoxArray((BoxArray *)local_ba0);
            pFVar54 = (FabArray<amrex::FArrayBox> *)local_268;
          }
          MFIter::MFIter((MFIter *)local_ba0,&pFVar54->super_FabArrayBase,true);
          local_4a8 = pFVar54;
          local_2f8 = pFVar55;
          if (aiStack_b80[0] < aiStack_b80[2]) {
            do {
              pFVar54 = local_4a8;
              BATransformer::operator()
                        ((Box *)local_818,
                         (BATransformer *)(CONCAT44(local_ba0._12_4_,local_ba0._8_4_) + 8),
                         (Box *)((long)*(int *)(*(long *)aiStack_b80._24_8_ +
                                               (long)aiStack_b80[0] * 4) * 0x1c +
                                **(long **)(CONCAT44(local_ba0._12_4_,local_ba0._8_4_) + 0x50)));
              local_818._0_8_ = CONCAT44(SUB84(local_818._0_8_,4) + -1,(int)local_818._0_8_ + -1);
              local_818._8_4_ = local_818._8_4_ - 1;
              MFIter::growntilebox((Box *)local_ae8,(MFIter *)local_ba0,1);
              uVar31 = CONCAT44(-(uint)(SUB84(local_818._0_8_,4) < (int)local_ae8._4_4_),
                                -(uint)((int)local_818._0_8_ < (int)local_ae8._0_4_));
              uVar31 = ~uVar31 & local_818._0_8_ |
                       CONCAT44(local_ae8._4_4_,local_ae8._0_4_) & uVar31;
              local_ae8._0_4_ = (undefined4)uVar31;
              local_ae8._4_4_ = (undefined4)(uVar31 >> 0x20);
              uVar66 = local_818._8_4_;
              if ((int)local_818._8_4_ < (int)uStack_ae0) {
                uVar66 = uStack_ae0;
              }
              uVar31 = CONCAT44(-(uint)((int)local_ad8 < local_808),
                                -(uint)(OStack_adc.val < OStack_80c.val));
              uVar31 = ~uVar31 & CONCAT44(local_808,OStack_80c.val) |
                       CONCAT44(local_ad8,OStack_adc.val) & uVar31;
              OStack_adc.val = (int)uVar31;
              local_ad8 = (uint)(uVar31 >> 0x20);
              iVar30 = iStack_804;
              if (iStack_ad4 < iStack_804) {
                iVar30 = iStack_ad4;
              }
              uStack_ae0 = uVar66;
              iStack_ad4 = iVar30;
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_e60,pFVar54,(MFIter *)local_ba0);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)&local_c70,pFVar55,(MFIter *)local_ba0);
              local_960 = (ulong)uStack_ae0;
              local_8c4 = iStack_ad4;
              if ((int)uStack_ae0 <= iStack_ad4) {
                local_300 = (ulong)(uint)OStack_adc.val;
                local_370 = (ulong)local_ad8;
                local_4a0 = (long)(int)local_ae8._4_4_;
                local_498 = (long)(int)local_ae8._0_4_;
                local_8bc = OStack_adc.val + 1;
                local_8c0 = local_ad8 + 1;
                do {
                  iVar30 = (int)local_960;
                  if ((int)local_ae8._4_4_ <= (int)local_ad8) {
                    lVar86 = CONCAT44(local_c70.dptr._4_4_,(int)local_c70.dptr);
                    lVar71 = ((iVar30 * 2 + -1) - local_c70.domain.bigend.vect[1]) * lVar86;
                    local_cd8._0_8_ = lVar71;
                    iVar39 = iVar30 * 2 - local_c70.domain.bigend.vect[1];
                    uVar66 = ~local_c70.domain.bigend.vect[1];
                    lVar70 = (int)(uVar66 + iVar30 * 2 + -1) * lVar86;
                    lVar42 = lVar86 * iVar39;
                    lVar52 = ((iVar30 * 2 + 1) - local_c70.domain.bigend.vect[1]) * lVar86;
                    lVar53 = (int)(uVar66 + iVar30 * 2 + 1) * lVar86;
                    lVar57 = (int)(uVar66 + iVar30 * 2) * lVar86;
                    local_8d8 = (iVar39 + -2) * lVar86;
                    lVar51 = ((long)iVar30 - (long)local_e38) * auStack_e50._0_8_;
                    local_308 = (_func_int **)
                                ((long)local_e60 +
                                (pointer *)
                                ((long)&(stack0xfffffffffffff1b8->_M_dataplus)._M_p + lVar51) * 8);
                    lVar86 = (iVar39 + 2) * lVar86;
                    local_328 = (_func_int **)
                                ((long)local_e60 + (lVar51 + (long)stack0xfffffffffffff1b8 * 2) * 8)
                    ;
                    local_318 = (_func_int **)
                                ((long)local_e60 + (lVar51 + (long)stack0xfffffffffffff1b8 * 4) * 8)
                    ;
                    local_330 = (_func_int **)
                                ((long)local_e60 + (lVar51 + (long)stack0xfffffffffffff1b8 * 5) * 8)
                    ;
                    local_338 = (_func_int **)
                                ((long)local_e60 + (lVar51 + (long)stack0xfffffffffffff1b8 * 3) * 8)
                    ;
                    local_310 = (_func_int **)
                                ((long)local_e60 + (lVar51 + (long)stack0xfffffffffffff1b8 * 6) * 8)
                    ;
                    local_320 = (_func_int **)
                                ((long)local_e60 + (lVar51 + (long)stack0xfffffffffffff1b8 * 7) * 8)
                    ;
                    local_340 = (long)local_c70.domain.bigend.vect[0];
                    uVar66 = ~local_c70.domain.bigend.vect[0];
                    local_348 = (ulong)uVar66;
                    lVar34 = CONCAT44(local_c70.domain.smallend.vect[1],
                                      local_c70.domain.smallend.vect[0]);
                    lVar74 = (long)local_c70.domain.smallend.vect[2];
                    uVar40 = ~local_c70.domain.smallend.vect[2];
                    local_350 = local_c70._vptr_BaseFab;
                    lVar51 = CONCAT44(local_c70.super_DataAllocator.m_arena._4_4_,
                                      (int)local_c70.super_DataAllocator.m_arena);
                    local_2f0 = (long)iStack_e40;
                    local_360 = (long)iStack_e3c;
                    local_368 = (Arena *)local_e58;
                    local_958 = local_4a0;
                    do {
                      if ((int)local_ae8._0_4_ <= OStack_adc.val) {
                        lVar72 = local_958 * 2 + -1;
                        lVar81 = (lVar72 - local_340) * lVar51;
                        local_490 = local_c70._vptr_BaseFab + (int)((int)lVar72 + uVar66) * lVar51;
                        lVar77 = (local_958 * 2 - local_340) * lVar51;
                        lVar72 = local_958 * 2 + 1;
                        lVar82 = (lVar72 - local_340) * lVar51;
                        iVar39 = (int)lVar72;
                        lVar84 = (int)(iVar39 + uVar66) * lVar51;
                        iVar49 = (int)(local_958 * 2);
                        lVar87 = (int)(iVar49 + uVar66) * lVar51;
                        local_1090 = local_c70._vptr_BaseFab +
                                     ((iVar49 - local_c70.domain.bigend.vect[0]) + -2) * lVar51;
                        local_8d0 = local_c70._vptr_BaseFab +
                                    (iVar39 - local_c70.domain.bigend.vect[0]) * lVar51;
                        lVar75 = (local_958 - local_360) * (long)local_e58;
                        local_2a8 = local_308 + lVar75;
                        lVar72 = local_958 * 2 + 2;
                        lVar62 = (lVar72 - local_340) * lVar51;
                        local_2b0 = local_328 + lVar75;
                        local_2b8 = local_338 + lVar75;
                        local_2c0 = local_318 + lVar75;
                        lVar78 = (int)((int)lVar72 + uVar66) * lVar51;
                        local_2c8 = local_330 + lVar75;
                        local_2d0 = local_310 + lVar75;
                        local_2d8 = local_320 + lVar75;
                        local_2e0 = local_1090 + lVar42;
                        local_2e8 = local_8d0 + lVar42;
                        lVar72 = local_498;
                        do {
                          lVar75 = lVar72 * 2 + 1;
                          lVar63 = lVar75 - lVar74;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar70 + lVar34 * 7]);
                          dVar103 = ABS((double)local_490[lVar63 + lVar71 + lVar34 * 7]);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar71 + lVar34 * 7]);
                          iVar39 = (int)lVar75;
                          lVar44 = (long)(int)(iVar39 + uVar40);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar71 + lVar34 * 7]);
                          dVar120 = (double)local_c70._vptr_BaseFab
                                            [lVar81 + lVar63 + lVar71 + lVar34 * 8] * dVar102 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar63 + lVar71 + lVar34 * 6]) /
                                     (dVar108 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar71 + lVar34 * 5]) /
                                    (dVar103 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar71 + lVar34 * 4]) /
                                    (dVar187 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar71 + lVar34 * 3]) /
                                    (ABS((double)local_490[lVar44 + lVar71 + lVar34 * 7]) + dVar103
                                     + dVar108 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar71 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar44 + lVar70 + lVar34 * 7]) + dVar187
                                     + dVar108 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar71 + lVar34]) /
                                    (ABS((double)local_490[lVar63 + lVar70 + lVar34 * 7]) + dVar187
                                     + dVar103 + dVar102 + 1e-100) + 1.0);
                          lVar75 = lVar72 * 2 + 2;
                          lVar64 = lVar75 - lVar74;
                          dVar187 = ABS((double)local_490[lVar64 + lVar70 + lVar34 * 6]);
                          dVar103 = ABS((double)local_490[lVar64 + lVar71 + lVar34 * 6]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar70 + lVar34 * 6]);
                          dVar138 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar71 + lVar34 * 6]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar70 + lVar34 * 3]) /
                                    (dVar187 + dVar108 + 1e-100);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar71 + lVar34 * 3]) /
                                    (dVar103 + dVar138 + 1e-100);
                          dVar102 = ABS((double)local_490[lVar64 + lVar71 + lVar34 * 2]) /
                                    (dVar187 + dVar103 + 1e-100) + 1.0;
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar71 + lVar34 * 2]) /
                                    (dVar108 + dVar138 + 1e-100) + 1.0;
                          dVar138 = (dVar228 + dVar223) * dVar138;
                          dVar138 = dVar138 / ((dVar102 + dVar223) * dVar103 +
                                               (dVar109 + dVar228) * dVar108 +
                                               (dVar102 + dVar109) * dVar187 + dVar138 + 1e-100);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar70 + lVar34 * 5]);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar71 + lVar34 * 5]);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar70 + lVar34 * 5]);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar71 + lVar34 * 5]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar70 + lVar34 * 3]) /
                                    (dVar108 + dVar223 + 1e-100);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar71 + lVar34 * 3]) /
                                    (dVar102 + dVar121 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar71 + lVar34]) /
                                    (dVar108 + dVar102 + 1e-100) + 1.0;
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar71 + lVar34]) /
                                    (dVar223 + dVar121 + 1e-100) + 1.0;
                          dVar121 = (dVar228 + dVar109) * dVar121;
                          dVar121 = dVar121 / ((dVar103 + dVar109) * dVar102 +
                                               (dVar187 + dVar228) * dVar223 +
                                               (dVar103 + dVar187) * dVar108 + dVar121 + 1e-100);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar71 + lVar34 * 3]);
                          dVar102 = dVar102 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar64 + lVar70 + lVar34 * 3])
                                              + dVar102);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + lVar70 + lVar34 * 3] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar64 + lVar71 + lVar34 * 3] == 0.0)
                          ;
                          dVar102 = (double)((uVar154 & 0x3fe0000000000000 |
                                             ~uVar154 & (ulong)dVar102) & uVar31 |
                                            ~uVar31 & (ulong)dVar102);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar70 + lVar34 * 7]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar71 + lVar34 * 7]);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34 * 7]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar71 + lVar34 * 7]) + dVar187;
                          dVar110 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar63 + lVar71 + lVar34 * 8] * dVar187 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar71 + lVar34 * 6]) /
                                     (dVar109 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34 * 5]) /
                                    (dVar103 + dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar71 + lVar34 * 4]) /
                                    (dVar108 + dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar44 + lVar71 + lVar34 * 7]) + dVar109
                                     + dVar103 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar71 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar44 + lVar70 + lVar34 * 7]) + dVar108
                                     + ABS((double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar44 + lVar71 + lVar34 * 7]) +
                                     dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar70 + lVar34 * 7]) + dVar108
                                     + dVar187 + dVar103 + 1e-100) + 1.0);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar70 + lVar34 * 6]);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar71 + lVar34 * 6]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar70 + lVar34 * 6]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar71 + lVar34 * 6]);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar70 + lVar34 * 3]) /
                                    (dVar103 + dVar108 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar71 + lVar34 * 3]) /
                                    (dVar223 + dVar109 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar71 + lVar34 * 2]) /
                                    (dVar103 + dVar223 + 1e-100) + 1.0;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar71 + lVar34 * 2]) /
                                    (dVar108 + dVar109 + 1e-100) + 1.0;
                          dVar223 = (dVar217 + dVar188) * dVar223;
                          dVar223 = dVar223 / ((dVar228 + dVar187) * dVar108 +
                                               (dVar217 + dVar228) * dVar103 + dVar223 +
                                               (dVar187 + dVar188) * dVar109 + 1e-100);
                          dVar108 = ABS((double)local_490[lVar44 + lVar42 + lVar34 * 4]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar42 + lVar34 * 4]);
                          dVar109 = ABS((double)local_490[lVar63 + lVar42 + lVar34 * 4]);
                          dVar155 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar42 + lVar34 * 4]);
                          dVar228 = ABS((double)local_490[lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar108 + dVar109 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar187 + dVar155 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar42 + lVar34]) /
                                    (dVar108 + dVar187 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar42 + lVar34]) /
                                    (dVar109 + dVar155 + 1e-100) + 1.0;
                          dVar155 = (dVar217 + dVar188) * dVar155;
                          dVar155 = dVar155 / ((dVar103 + dVar188) * dVar187 +
                                               (dVar228 + dVar217) * dVar109 +
                                               (dVar103 + dVar228) * dVar108 + dVar155 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar42 + lVar34 * 2]);
                          dVar103 = dVar103 / (ABS((double)local_490[lVar64 + lVar42 + lVar34 * 2])
                                              + dVar103);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_490[lVar64 + lVar42 + lVar34 * 2] == 0.0)
                          ;
                          dVar103 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar103
                                             ) & uVar154 | ~uVar154 & (ulong)dVar103);
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar42 + lVar34];
                          dVar187 = ABS((double)p_Var69) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar77 + lVar44 + lVar42 + lVar34]) +
                                    ABS((double)p_Var69));
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar44 + lVar42 + lVar34] == 0.0);
                          dVar187 = (double)((-(ulong)((double)p_Var69 == 0.0) & 0x3fe0000000000000
                                             | ~-(ulong)((double)p_Var69 == 0.0) & (ulong)dVar187) &
                                             uVar31 | ~uVar31 & (ulong)dVar187);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar42 + lVar34 * 4]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar42 + lVar34 * 4]);
                          dVar177 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar42 + lVar34 * 4]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34 * 4]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar228 + dVar177 + 1e-100);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar109 + dVar217 + 1e-100);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar42 + lVar34]) /
                                    (dVar228 + dVar109 + 1e-100) + 1.0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34]) /
                                    (dVar177 + dVar217 + 1e-100) + 1.0;
                          dVar177 = (dVar229 + dVar188) * dVar177;
                          dVar177 = dVar177 / ((dVar108 + dVar229) * dVar228 + dVar177 +
                                               (dVar108 + dVar200) * dVar109 +
                                               (dVar188 + dVar200) * dVar217 + 1e-100);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar42 + lVar34 * 2]);
                          dVar108 = dVar108 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar82 + lVar64 + lVar42 + lVar34 * 2])
                                              + dVar108);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar64 + lVar42 + lVar34 * 2] == 0.0)
                          ;
                          dVar108 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar108
                                             ) & uVar154 | ~uVar154 & (ulong)dVar108);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar228 = ABS((double)local_490[lVar63 + lVar53 + lVar34 * 7]) + dVar109;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34 * 7]);
                          dVar188 = dVar109 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar81 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar228 = (double)local_c70._vptr_BaseFab
                                            [lVar81 + lVar63 + lVar52 + lVar34 * 8] * dVar109 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar63 + lVar53 + lVar34 * 6]) /
                                     (dVar188 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar53 + lVar34 * 5]) /
                                    (dVar228 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34 * 4]) /
                                    (dVar217 + dVar109 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (ABS((double)local_490[lVar44 + lVar53 + lVar34 * 7]) +
                                     ABS((double)local_490[lVar63 + lVar53 + lVar34 * 7]) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar44 + lVar53 + lVar34 * 7]) + dVar109
                                    + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar44 + lVar52 + lVar34 * 7]) + dVar188
                                     + dVar217 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34]) /
                                    (ABS((double)local_490[lVar63 + lVar52 + lVar34 * 7]) + dVar228
                                     + dVar217 + 1e-100) + 1.0);
                          dVar200 = ABS((double)local_490[lVar64 + lVar53 + lVar34 * 6]);
                          dVar188 = ABS((double)local_490[lVar64 + lVar52 + lVar34 * 6]);
                          dVar156 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar53 + lVar34 * 3]) /
                                    (dVar200 + dVar156 + 1e-100);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar188 + dVar229 + 1e-100);
                          dVar109 = ABS((double)local_490[lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar200 + dVar188 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar156 + dVar229 + 1e-100) + 1.0;
                          dVar156 = (dVar208 + dVar217) * dVar156;
                          dVar156 = dVar156 / ((dVar109 + dVar208) * dVar200 + dVar156 +
                                               (dVar109 + dVar189) * dVar188 +
                                               (dVar217 + dVar189) * dVar229 + 1e-100);
                          uStack_f70 = 0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar157 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar217 + dVar157 + 1e-100);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar188 + dVar229 + 1e-100);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34]) /
                                    (dVar217 + dVar188 + 1e-100) + 1.0;
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34]) /
                                    (dVar157 + dVar229 + 1e-100) + 1.0;
                          dVar157 = (dVar208 + dVar200) * dVar157;
                          dVar157 = dVar157 / ((dVar109 + dVar208) * dVar217 + dVar157 +
                                               (dVar109 + dVar189) * dVar188 +
                                               (dVar200 + dVar189) * dVar229 + 1e-100);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar53 + lVar34 * 3]);
                          dVar109 = dVar109 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar64 + lVar52 + lVar34 * 3])
                                              + dVar109);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + lVar52 + lVar34 * 3] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar64 + lVar53 + lVar34 * 3] == 0.0)
                          ;
                          dVar109 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar109
                                             ) & uVar154 | ~uVar154 & (ulong)dVar109);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar236 = dVar235 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar82 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar52 + lVar34 * 7]);
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 3]) /
                                    (dVar122 + dVar188 + 1e-100);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar200 + dVar232 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar122 + dVar200 + 1e-100) + 1.0;
                          dVar122 = (dVar217 + dVar230) * dVar122;
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar188 + dVar232 + 1e-100) + 1.0;
                          dVar122 = dVar122 / ((dVar230 + dVar229) * dVar188 + dVar122 +
                                               (dVar217 + dVar208) * dVar200 +
                                               (dVar229 + dVar208) * dVar232 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar53 + lVar34 * 7]) + dVar235;
                          lVar65 = lVar72 * 2 - lVar74;
                          p_Var56 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar42 + lVar34];
                          dVar231 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar63 + lVar52 + lVar34 * 8] * dVar235 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar53 + lVar34 * 6]) /
                                     (dVar188 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar53 + lVar34 * 5]) /
                                    (dVar236 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar52 + lVar34 * 4]) /
                                    (dVar189 + dVar235 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar44 + lVar53 + lVar34 * 7]) + dVar188
                                     + ABS((double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar63 + lVar53 + lVar34 * 7]) + 1e-100
                                    ) + ABS((double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar63 + lVar52 + lVar34 * 2]) /
                                        (ABS((double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar44 + lVar52 + lVar34 * 7]) +
                                         dVar188 + dVar189 + 1e-100) +
                                        ABS((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52 + lVar34]) /
                                        (ABS((double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar63 + lVar52 + lVar34 * 7]) +
                                         dVar236 + dVar189 + 1e-100) + 1.0);
                          dVar139 = ABS((double)local_1090[lVar65 + local_8d8 + lVar34 * 6]);
                          dVar123 = ABS((double)local_1090[lVar65 + lVar57 + lVar34 * 6]);
                          dVar178 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + local_8d8 + lVar34 * 6]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar57 + lVar34 * 6]);
                          dVar190 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + local_8d8 + lVar34 * 3]) /
                                    (dVar139 + dVar178 + 1e-100);
                          dVar209 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar57 + lVar34 * 3]) /
                                    (dVar123 + dVar217 + 1e-100);
                          dVar236 = ABS((double)local_1090[lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar139 + dVar123 + 1e-100) + 1.0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar178 + dVar217 + 1e-100) + 1.0;
                          dVar217 = (dVar188 + dVar209) * dVar217;
                          dVar140 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + local_8d8 + lVar34 * 7]);
                          dVar124 = ABS((double)local_1090[lVar65 + lVar57 + lVar34 * 7]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar57 + lVar34 * 7]);
                          lVar88 = (long)(iVar39 - local_c70.domain.smallend.vect[2]);
                          dVar158 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar57 + lVar34 * 7]);
                          dVar159 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 3]);
                          dVar159 = dVar159 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + local_8d8 + lVar34 * 3
                                                           ]) + dVar159);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar57 + lVar34 * 3] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar65 + local_8d8 + lVar34 * 3] ==
                                            0.0);
                          dVar160 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 5]);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 5]);
                          dVar210 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + local_8d8 + lVar34 * 5]);
                          dVar179 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34 * 5]);
                          dVar191 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + local_8d8 + lVar34 * 3]) /
                                    (dVar160 + dVar210 + 1e-100);
                          dVar224 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34 * 3]) /
                                    (dVar125 + dVar179 + 1e-100);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34]) /
                                    (dVar160 + dVar125 + 1e-100) + 1.0;
                          dVar141 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34]) /
                                    (dVar210 + dVar179 + 1e-100) + 1.0;
                          dVar125 = (dVar112 + dVar224) * dVar125;
                          dVar161 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 6]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 6]);
                          dVar211 = ABS((double)local_8d0[lVar65 + local_8d8 + lVar34 * 6]);
                          dVar180 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 6]);
                          dVar192 = ABS((double)local_8d0[lVar65 + local_8d8 + lVar34 * 3]) /
                                    (dVar161 + dVar211 + 1e-100);
                          dVar225 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 3]) /
                                    (dVar229 + dVar180 + 1e-100);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar161 + dVar229 + 1e-100) + 1.0;
                          dVar142 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar211 + dVar180 + 1e-100) + 1.0;
                          dVar229 = (dVar200 + dVar225) * dVar229;
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 7]);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 7]);
                          dVar143 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 7]);
                          dVar162 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34 * 7]) + dVar113;
                          dVar163 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar163 = dVar163 / (ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar163);
                          uVar93 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar94 = -(ulong)((double)local_1090[lVar65 + lVar42 + lVar34 * 2] == 0.0)
                          ;
                          dVar164 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 4]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar212 = ABS((double)local_1090[lVar88 + lVar42 + lVar34 * 4]);
                          dVar181 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar193 = ABS((double)local_1090[lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar164 + dVar212 + 1e-100);
                          dVar226 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar208 + dVar181 + 1e-100);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34]) /
                                    (dVar164 + dVar208 + 1e-100) + 1.0;
                          dVar144 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34]) /
                                    (dVar212 + dVar181 + 1e-100) + 1.0;
                          dVar208 = (dVar189 + dVar226) * dVar208;
                          dVar127 = ABS((double)p_Var56) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar77 + lVar88 + lVar42 + lVar34]) +
                                    ABS((double)p_Var56));
                          uVar95 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar88 + lVar42 + lVar34] == 0.0);
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar145 = dVar145 / (ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar145);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar97 = -(ulong)((double)local_8d0[lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          dVar182 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar146 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 4]);
                          dVar227 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar213 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 4]);
                          dVar194 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar182 + dVar227 + 1e-100);
                          dVar233 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar146 + dVar213 + 1e-100);
                          dVar128 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34]) /
                                    (dVar182 + dVar146 + 1e-100) + 1.0;
                          dVar182 = (dVar128 + dVar194) * dVar182;
                          dVar165 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34]) /
                                    (dVar227 + dVar213 + 1e-100) + 1.0;
                          dVar195 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 6]);
                          dVar183 = ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 6]);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar214 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar195 + dVar232 + 1e-100);
                          dVar234 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar183 + dVar214 + 1e-100);
                          dVar129 = ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar195 + dVar183 + 1e-100) + 1.0;
                          dVar166 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar232 + dVar214 + 1e-100) + 1.0;
                          dVar232 = (dVar230 + dVar166) * dVar232;
                          dVar201 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar114 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 7]) + dVar201;
                          dVar167 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar202 = dVar201 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar87 + lVar88 + lVar42 + lVar34 * 7]);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 3]);
                          dVar130 = dVar130 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + lVar52 + lVar34 * 3])
                                              + dVar130);
                          uVar98 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 3] == 0.0);
                          uVar99 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar52 + lVar34 * 3] == 0.0);
                          dVar168 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar131 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar203 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 5]);
                          dVar196 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 5]);
                          dVar184 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar168 + dVar203 + 1e-100);
                          dVar215 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 3]) /
                                    (dVar131 + dVar196 + 1e-100);
                          dVar218 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34]) /
                                    (dVar168 + dVar131 + 1e-100) + 1.0;
                          dVar168 = (dVar218 + dVar184) * dVar168;
                          dVar147 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34]) /
                                    (dVar203 + dVar196 + 1e-100) + 1.0;
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar148 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar216 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 6]);
                          dVar204 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 6]);
                          dVar197 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar235 + dVar216 + 1e-100);
                          dVar219 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar148 + dVar204 + 1e-100);
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar235 + dVar148 + 1e-100) + 1.0;
                          dVar235 = (dVar132 + dVar197) * dVar235;
                          dVar169 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar216 + dVar204 + 1e-100) + 1.0;
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar133 = dVar115 + ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]);
                          dVar149 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar170 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 7]) + dVar115;
                          local_d38 = (double)(lVar72 - local_2f0);
                          local_2a8[(long)local_d38] =
                               (_func_int *)
                               (((double)local_8d0[lVar88 + lVar52 + lVar34 * 8] * dVar115 *
                                 (ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar88 + lVar42 + lVar34 * 6]) /
                                  (dVar170 + 1e-100) +
                                 ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 5]) /
                                 (dVar133 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar65 + lVar52 + lVar34 * 4]) /
                                 (dVar149 + dVar115 + 1e-100) +
                                 ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 3]) /
                                 (ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 7]) +
                                  ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]) + dVar170 +
                                 1e-100) + ABS((double)local_c70._vptr_BaseFab
                                                       [lVar77 + lVar88 + lVar52 + lVar34 * 2]) /
                                           (ABS((double)local_c70._vptr_BaseFab
                                                        [lVar77 + lVar88 + lVar52 + lVar34 * 7]) +
                                            dVar149 + dVar170 + 1e-100) +
                                           ABS((double)local_8d0[lVar65 + lVar52 + lVar34]) /
                                           (ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 7]) +
                                            dVar133 + dVar149 + 1e-100) + 1.0) *
                                 (dVar122 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52 + lVar34] +
                                 dVar231 * (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52]
                                 + dVar109 * (double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar63 + lVar52 + lVar34 * 4] +
                                   dVar108 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar63 + lVar53 + lVar34 * 5] +
                                   dVar187 * (double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar63 + lVar53 + lVar34 * 6] +
                                   (double)local_c70._vptr_BaseFab
                                           [lVar84 + lVar63 + lVar53 + lVar34 * 7] +
                                   (double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar63 + lVar53 + lVar34 * 3] * dVar177 +
                                   (double)local_c70._vptr_BaseFab
                                           [lVar84 + lVar63 + lVar52 + lVar34 * 2] * dVar157) +
                                (dVar235 /
                                ((dVar197 + dVar169) * dVar216 + dVar235 +
                                 (dVar132 + dVar219) * dVar148 + (dVar169 + dVar219) * dVar204 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52 + lVar34]
                                 * dVar231 +
                                dVar157 * (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar65 + lVar52 + lVar34 * 4] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar53 + lVar34 * 7] * dVar187 +
                                dVar177 * (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar65 + lVar53 + lVar34 * 5]) +
                                (dVar168 /
                                ((dVar184 + dVar147) * dVar203 + dVar168 +
                                 (dVar218 + dVar215) * dVar131 + (dVar147 + dVar215) * dVar196 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 4] * dVar122 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar231 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar52 + lVar34] *
                                dVar109 + (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar52]
                                          * dVar157 +
                                          dVar156 * (double)local_c70._vptr_BaseFab
                                                            [lVar87 + lVar63 + lVar52 + lVar34 * 4]
                                          + dVar228 * (double)local_c70._vptr_BaseFab
                                                              [lVar87 + lVar63 + lVar52 + lVar34 * 2
                                                              ] +
                                            (double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar63 + lVar53 + lVar34 * 7] *
                                            dVar108 + (double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar63 + lVar53 + lVar34 * 6
                                                              ] * dVar177 +
                                                      (double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar63 + lVar53 + lVar34 * 3
                                                              ] * dVar187 +
                                                      dVar155 * (double)local_c70._vptr_BaseFab
                                                                        [lVar87 + lVar63 + lVar53 + 
                                                  lVar34 * 6] +
                                                  (double)local_c70._vptr_BaseFab
                                                          [lVar87 + lVar63 + lVar53 + lVar34 * 7] *
                                                  dVar103 + (double)local_c70._vptr_BaseFab
                                                                    [lVar77 + lVar63 + lVar53 + 
                                                  lVar34 * 5]) +
                                (double)((uVar99 & 0x3fe0000000000000 | ~uVar99 & (ulong)dVar130) &
                                         uVar98 | ~uVar98 & (ulong)dVar130) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 4] * dVar231 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34] *
                                dVar157 + (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar65 + lVar52 + lVar34 * 4] * dVar228
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar53 + lVar34 * 7] *
                                            dVar177 + (double)local_c70._vptr_BaseFab
                                                              [lVar87 + lVar65 + lVar53 + lVar34 * 7
                                                              ] * dVar155 +
                                                      (double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar65 + lVar53 + lVar34 * 5
                                                              ] * dVar187) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar88 + lVar52 + lVar34 * 8] * dVar201 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar42 + lVar34 * 6]) /
                                 (dVar202 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar42 + lVar34 * 5]) /
                                (dVar114 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar52 + lVar34 * 4]) /
                                (dVar167 + dVar201 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar88 + lVar42 + lVar34 * 3]) /
                                (ABS((double)local_1090[lVar88 + lVar42 + lVar34 * 7]) +
                                 ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 7]) + dVar201 +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar42 + lVar34 * 7]) + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar88 + lVar52 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar52 + lVar34 * 7]) +
                                 dVar167 + dVar202 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar52 + lVar34]) /
                                (ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 7]) + dVar114 +
                                 dVar167 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar52 + lVar34 * 4] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar52 + lVar34 * 2] * dVar157 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52 + lVar34] *
                                dVar156 + (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52]
                                          * dVar228 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar63 + lVar53 + lVar34 * 6] * dVar187
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar63 + lVar53 + lVar34 * 3] *
                                            dVar155 + dVar103 * (double)local_c70._vptr_BaseFab
                                                                        [lVar81 + lVar63 + lVar53 + 
                                                  lVar34 * 5] +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar63 + lVar53 + lVar34 * 7]) +
                                (dVar232 /
                                ((dVar129 + dVar230) * dVar195 + dVar232 +
                                 (dVar129 + dVar234) * dVar183 + (dVar166 + dVar234) * dVar214 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar52 + lVar34 * 4] * dVar157 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar65 + lVar52 + lVar34] *
                                dVar228 + (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar65 + lVar53 + lVar34 * 5] * dVar155
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar65 + lVar53 + lVar34 * 7] *
                                            dVar187) +
                                (dVar182 /
                                ((dVar194 + dVar165) * dVar227 + dVar182 +
                                 (dVar128 + dVar233) * dVar146 + (dVar165 + dVar233) * dVar213 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 5] * dVar122 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar231 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar63 + lVar42 + lVar34 * 7] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar63 + lVar42 + lVar34 * 6] * dVar157 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar42 + lVar34] *
                                dVar108 + (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar42]
                                          * dVar177 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar63 + lVar42 + lVar34 * 2] * dVar187
                                          + dVar223 * (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar63 + lVar57 + lVar34 * 5
                                                              ] +
                                            dVar110 * (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar63 + lVar57 + lVar34 * 3
                                                              ] +
                                            dVar121 * (double)local_c70._vptr_BaseFab
                                                              [lVar84 + lVar63 + lVar57 + lVar34 * 6
                                                              ] +
                                            (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar63 + lVar57 + lVar34 * 7] *
                                            dVar102 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar63 + lVar42 + lVar34 * 4]) +
                                (double)((uVar97 & 0x3fe0000000000000 | ~uVar97 & (ulong)dVar145) &
                                         uVar96 | ~uVar96 & (ulong)dVar145) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar42 + lVar34 * 5] * dVar231 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar42 + lVar34 * 7] * dVar157 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar42 + lVar34] *
                                dVar177 + (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar65 + lVar42 + lVar34 * 4] * dVar187
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar65 + lVar57 + lVar34 * 7] *
                                            dVar121 + (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar65 + lVar57 + lVar34 * 5
                                                              ] * dVar110) +
                                (double)((uVar95 & 0x3fe0000000000000 | ~uVar95 & (ulong)dVar127) &
                                         -(ulong)((double)p_Var56 == 0.0) |
                                        ~-(ulong)((double)p_Var56 == 0.0) & (ulong)dVar127) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar42 + lVar34 * 7] * dVar122 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar231 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar42 + lVar34 * 5] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar42 + lVar34 * 3] * dVar157 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar63 + lVar42 + lVar34 * 7] * dVar156 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar63 + lVar42 + lVar34 * 6] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar42 + lVar34 * 4] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar42 + lVar34 * 2] * dVar177 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar42] * dVar187
                                + (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar63 + lVar42 + lVar34 * 4] * dVar103 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar63 + lVar42 + lVar34 * 2] * dVar155 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar57 + lVar34 * 7] * dVar223 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar57 + lVar34 * 6] * dVar110 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar57 + lVar34 * 5] * dVar102 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar57 + lVar34 * 3] * dVar121 +
                                  dVar120 * (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar63 + lVar57 + lVar34 * 6] +
                                  dVar138 * (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar63 + lVar57 + lVar34 * 7] +
                                (double)p_Var69) +
                                (dVar208 /
                                ((dVar193 + dVar144) * dVar212 + (dVar189 + dVar193) * dVar164 +
                                 dVar208 + (dVar144 + dVar226) * dVar181 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar42 + lVar34 * 7] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar42 + lVar34 * 6] * dVar157 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar42 + lVar34 * 5] * dVar156 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar42 + lVar34 * 3] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar42 + lVar34 * 2] * dVar187 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar42 + lVar34] *
                                dVar103 + (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar42]
                                          * dVar155 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar63 + lVar57 + lVar34 * 7] * dVar102
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar63 + lVar57 + lVar34 * 6] *
                                            dVar121 + (double)local_c70._vptr_BaseFab
                                                              [lVar81 + lVar63 + lVar57 + lVar34 * 3
                                                              ] * dVar120 +
                                                      (double)local_c70._vptr_BaseFab
                                                              [lVar81 + lVar63 + lVar57 + lVar34 * 5
                                                              ] * dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar42 + lVar34 * 4]) +
                                (double)((uVar93 & 0x3fe0000000000000 | ~uVar93 & (ulong)dVar163) &
                                         uVar94 | ~uVar94 & (ulong)dVar163) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar42 + lVar34 * 7] * dVar157 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar42 + lVar34 * 5] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar42 + lVar34 * 4] * dVar187 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar65 + lVar42 + lVar34] *
                                dVar155 + (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar65 + lVar57 + lVar34 * 5] * dVar120
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar65 + lVar57 + lVar34 * 7] *
                                            dVar121) +
                                (double)local_8d0[lVar88 + lVar57 + lVar34 * 8] * dVar113 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar88 + lVar57 + lVar34 * 6]) /
                                 (dVar162 + 1e-100) +
                                ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 5]) /
                                (dVar143 + dVar113 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar65 + lVar57 + lVar34 * 4]) /
                                (dVar126 + dVar113 + 1e-100) +
                                ABS((double)local_8d0[lVar88 + lVar57 + lVar34 * 3]) /
                                (ABS((double)local_8d0[lVar88 + lVar57 + lVar34 * 7]) +
                                 dVar143 + dVar162 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar88 + lVar57 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar88 + local_8d8 + lVar34 * 7]) + dVar126 +
                                 dVar113 + ABS((double)local_c70._vptr_BaseFab
                                                       [lVar77 + lVar88 + lVar57 + lVar34 * 7]) +
                                1e-100) + ABS((double)local_8d0[lVar65 + lVar57 + lVar34]) /
                                          (ABS((double)local_8d0[lVar65 + local_8d8 + lVar34 * 7]) +
                                           dVar126 + dVar113 + dVar143 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar71 + lVar34 * 5] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar63 + lVar71 + lVar34 * 3] * dVar177 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar63 + lVar71 + lVar34 * 6] * dVar187 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar71 + lVar34] *
                                dVar223 + (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar71]
                                          * dVar110 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar63 + lVar71 + lVar34 * 2] * dVar121
                                          + dVar102 * (double)local_c70._vptr_BaseFab
                                                              [lVar84 + lVar63 + lVar71 + lVar34 * 4
                                                              ] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar63 + lVar71 + lVar34 * 7]) +
                                (dVar229 /
                                ((dVar192 + dVar142) * dVar211 + (dVar200 + dVar192) * dVar161 +
                                 dVar229 + (dVar142 + dVar225) * dVar180 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar71 + lVar34 * 5] * dVar177 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar71 + lVar34 * 7] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar71 + lVar34 * 4] * dVar121 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar71 + lVar34] *
                                dVar110) +
                                (dVar125 /
                                ((dVar191 + dVar141) * dVar210 + (dVar112 + dVar191) * dVar160 +
                                 dVar125 + (dVar141 + dVar224) * dVar179 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar71 + lVar34 * 7] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar71 + lVar34 * 6] * dVar177 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar71 + lVar34 * 3] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar63 + lVar71 + lVar34 * 7] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar63 + lVar71 + lVar34 * 6] * dVar155 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar71 + lVar34 * 4] * dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar71 + lVar34 * 2] * dVar110 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar71 + lVar34] *
                                dVar102 + (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar71]
                                          * dVar121 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar63 + lVar71 + lVar34 * 2] * dVar120
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar63 + lVar71 + lVar34 * 4] *
                                            dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar71 + lVar34 * 5]) +
                                (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar159) &
                                         uVar154 | ~uVar154 & (ulong)dVar159) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar71 + lVar34 * 7] * dVar177 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar71 + lVar34 * 5] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar65 + lVar71 + lVar34 * 7] * dVar155 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar71 + lVar34 * 4] * dVar110 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar65 + lVar71 + lVar34 * 4] * dVar120 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar71 + lVar34] *
                                dVar121) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar88 + lVar57 + lVar34 * 8] * dVar111 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar57 + lVar34 * 6]) /
                                 (dVar158 + dVar111 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar57 + lVar34 * 5]) /
                                (dVar124 + dVar111 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar57 + lVar34 * 4]) /
                                (dVar140 + dVar111 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar88 + lVar57 + lVar34 * 3]) /
                                (ABS((double)local_1090[lVar88 + lVar57 + lVar34 * 7]) + dVar124 +
                                 dVar111 + dVar158 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar88 + lVar57 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + local_8d8 + lVar34 * 7]) + dVar140 +
                                 dVar111 + dVar158 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar57 + lVar34]) /
                                (ABS((double)local_1090[lVar65 + local_8d8 + lVar34 * 7]) + dVar140
                                 + dVar124 + dVar111 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar71 + lVar34 * 6] * dVar187 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar71 + lVar34 * 5] * dVar103 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar71 + lVar34 * 3] * dVar155 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar71 + lVar34 * 4] * dVar102 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar71 + lVar34 * 2] * dVar121 +
                                 (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar71] * dVar120
                                 + (double)local_c70._vptr_BaseFab
                                           [lVar81 + lVar63 + lVar71 + lVar34] * dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar71 + lVar34 * 7]) +
                                (dVar217 /
                                ((dVar236 + dVar209) * dVar123 +
                                 (dVar190 + dVar188) * dVar178 + (dVar236 + dVar190) * dVar139 +
                                 dVar217 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar71 + lVar34 * 7] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar71 + lVar34 * 5] * dVar155 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar65 + lVar71 + lVar34] *
                                dVar120 + (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar65 + lVar71 + lVar34 * 4] * dVar121)
                                + (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar42 + lVar34 * 7] * dVar231 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar42 + lVar34 * 5] * dVar157 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar65 + lVar42 + lVar34 * 7] * dVar228 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar42 + lVar34 * 4] * dVar177 +
                                  (double)p_Var56 * dVar187 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar65 + lVar42 + lVar34 * 4] * dVar155 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar57 + lVar34 * 7] * dVar110 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar65 + lVar57 + lVar34 * 7] * dVar120 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar57 + lVar34 * 5] * dVar121) * 0.125
                               );
                          lVar45 = lVar72 * 2 + -1;
                          lVar68 = lVar45 - lVar74;
                          lVar45 = (long)(int)((int)lVar45 + uVar40);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar70 + lVar34 * 7]);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar71 + lVar34 * 7]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar71 + lVar34 * 7]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar71 + lVar34 * 7]);
                          dVar236 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar68 + lVar71 + lVar34 * 8] * dVar108 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar68 + lVar71 + lVar34 * 6]) /
                                     (dVar187 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar71 + lVar34 * 5]) /
                                    (dVar102 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar71 + lVar34 * 4]) /
                                    (dVar103 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar71 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar45 + lVar71 + lVar34 * 7]) + dVar102
                                     + dVar187 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar71 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar45 + lVar70 + lVar34 * 7]) + dVar103
                                     + dVar187 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar71 + lVar34]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar68 + lVar70 + lVar34 * 7]) + dVar103
                                     + dVar102 + dVar108 + 1e-100) + 1.0);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar70 + lVar34 * 6]);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar71 + lVar34 * 6]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar70 + lVar34 * 6]);
                          dVar138 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar71 + lVar34 * 6]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar70 + lVar34 * 3]) /
                                    (dVar187 + dVar108 + 1e-100);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar71 + lVar34 * 3]) /
                                    (dVar103 + dVar138 + 1e-100);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar71 + lVar34 * 2]) /
                                    (dVar187 + dVar103 + 1e-100) + 1.0;
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar71 + lVar34 * 2]) /
                                    (dVar108 + dVar138 + 1e-100) + 1.0;
                          dVar138 = (dVar228 + dVar223) * dVar138;
                          dVar138 = dVar138 / ((dVar102 + dVar223) * dVar103 +
                                               (dVar109 + dVar228) * dVar108 +
                                               (dVar102 + dVar109) * dVar187 + dVar138 + 1e-100);
                          uStack_890 = 0;
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar70 + lVar34 * 7]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar71 + lVar34 * 7]);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar71 + lVar34 * 7]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34 * 7]);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar71 + lVar34 * 3]);
                          dVar102 = dVar102 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar65 + lVar70 + lVar34 * 3])
                                              + dVar102);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar71 + lVar34 * 3] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar65 + lVar70 + lVar34 * 3] == 0.0)
                          ;
                          dVar102 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar102
                                             ) & uVar154 | ~uVar154 & (ulong)dVar102);
                          uStack_530 = 0;
                          dVar111 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar63 + lVar71 + lVar34 * 8] * dVar103 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar71 + lVar34 * 6]) /
                                     (dVar187 + dVar103 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar71 + lVar34 * 5]) /
                                    (dVar108 + dVar103 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar71 + lVar34 * 4]) /
                                    (dVar109 + dVar103 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar71 + lVar34 * 7]) + dVar108
                                     + dVar103 + dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar70 + lVar34 * 7]) + dVar109
                                     + dVar103 + dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar71 + lVar34]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar44 + lVar70 + lVar34 * 7]) + dVar109
                                     + dVar108 + dVar103 + 1e-100) + 1.0);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar70 + lVar34 * 5]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar71 + lVar34 * 5]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar70 + lVar34 * 5]);
                          dVar159 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar71 + lVar34 * 5]);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar70 + lVar34 * 3]) /
                                    (dVar108 + dVar109 + 1e-100);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar71 + lVar34 * 3]) /
                                    (dVar187 + dVar159 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar71 + lVar34]) /
                                    (dVar108 + dVar187 + 1e-100) + 1.0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar71 + lVar34]) /
                                    (dVar109 + dVar159 + 1e-100) + 1.0;
                          dVar159 = (dVar188 + dVar228) * dVar159;
                          dVar159 = dVar159 / ((dVar103 + dVar228) * dVar187 +
                                               (dVar223 + dVar188) * dVar109 +
                                               (dVar103 + dVar223) * dVar108 + dVar159 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar70 + lVar34 * 5]);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar71 + lVar34 * 5]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar70 + lVar34 * 5]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar71 + lVar34 * 5]);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar70 + lVar34 * 3]) /
                                    (dVar103 + dVar108 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar71 + lVar34 * 3]) /
                                    (dVar223 + dVar109 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar71 + lVar34]) /
                                    (dVar103 + dVar223 + 1e-100) + 1.0;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar71 + lVar34]) /
                                    (dVar108 + dVar109 + 1e-100) + 1.0;
                          dVar223 = (dVar217 + dVar188) * dVar223;
                          dVar223 = dVar223 / ((dVar228 + dVar187) * dVar108 +
                                               (dVar217 + dVar228) * dVar103 + dVar223 +
                                               (dVar187 + dVar188) * dVar109 + 1e-100);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar45 + lVar42 + lVar34 * 4]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar42 + lVar34 * 4]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar42 + lVar34 * 4]);
                          dVar160 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar42 + lVar34 * 4]);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar42 + lVar34 * 2]) /
                                    (dVar108 + dVar109 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar42 + lVar34 * 2]) /
                                    (dVar187 + dVar160 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar42 + lVar34]) /
                                    (dVar108 + dVar187 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar42 + lVar34]) /
                                    (dVar109 + dVar160 + 1e-100) + 1.0;
                          dVar160 = (dVar217 + dVar188) * dVar160;
                          dVar160 = dVar160 / ((dVar103 + dVar188) * dVar187 +
                                               (dVar228 + dVar217) * dVar109 +
                                               (dVar103 + dVar228) * dVar108 + dVar160 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar103 = dVar103 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar84 + lVar65 + lVar42 + lVar34 * 2])
                                              + dVar103);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar65 + lVar42 + lVar34 * 2] == 0.0)
                          ;
                          dVar103 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar103
                                             ) & uVar154 | ~uVar154 & (ulong)dVar103);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar42 + lVar34 * 4]);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar42 + lVar34 * 4]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar42 + lVar34 * 4]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34 * 4]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar108 + dVar109 + 1e-100);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar228 + dVar188 + 1e-100);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar42 + lVar34]) /
                                    (dVar108 + dVar228 + 1e-100) + 1.0;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34]) /
                                    (dVar109 + dVar188 + 1e-100) + 1.0;
                          dVar228 = (dVar229 + dVar200) * dVar228;
                          dVar228 = dVar228 / ((dVar217 + dVar187) * dVar109 +
                                               (dVar229 + dVar217) * dVar108 + dVar228 +
                                               (dVar187 + dVar200) * dVar188 + 1e-100);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar42 + lVar34]);
                          dVar187 = dVar187 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar45 + lVar42 + lVar34]) +
                                              dVar187);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar68 + lVar42 + lVar34] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar45 + lVar42 + lVar34] == 0.0);
                          dVar187 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar187
                                             ) & uVar154 | ~uVar154 & (ulong)dVar187);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar42 + lVar34]);
                          dVar108 = dVar108 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar63 + lVar42 + lVar34]) +
                                              dVar108);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar63 + lVar42 + lVar34] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar44 + lVar42 + lVar34] == 0.0);
                          dVar108 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar108
                                             ) & uVar154 | ~uVar154 & (ulong)dVar108);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar53 + lVar34 * 7]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar53 + lVar34 * 7]) + dVar109;
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 7]);
                          dVar188 = dVar109 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar82 + lVar45 + lVar53 + lVar34 * 7]);
                          iVar39 = (int)(lVar72 * 2);
                          lVar46 = (long)(int)(iVar39 + uVar40);
                          dVar120 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar68 + lVar52 + lVar34 * 8] * dVar109 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar68 + lVar53 + lVar34 * 6]) /
                                     (dVar188 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar53 + lVar34 * 5]) /
                                    (dVar217 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 4]) /
                                    (dVar200 + dVar109 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar53 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar45 + lVar53 + lVar34 * 7]) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar68 + lVar53 + lVar34 * 7]) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar45 + lVar53 + lVar34 * 7]) + dVar109
                                    + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar45 + lVar52 + lVar34 * 7]) + dVar188
                                     + dVar200 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar68 + lVar52 + lVar34 * 7]) + dVar217
                                     + dVar200 + 1e-100) + 1.0);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar161 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar200 + dVar161 + 1e-100);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar188 + dVar229 + 1e-100);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar200 + dVar188 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar161 + dVar229 + 1e-100) + 1.0;
                          dVar161 = (dVar208 + dVar217) * dVar161;
                          dVar161 = dVar161 / ((dVar109 + dVar208) * dVar200 + dVar161 +
                                               (dVar109 + dVar189) * dVar188 +
                                               (dVar217 + dVar189) * dVar229 + 1e-100);
                          uStack_3c0 = 0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar53 + lVar34 * 7]) + dVar188;
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar217 = dVar188 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar82 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar139 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar139 + dVar109 + 1e-100);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar189 + dVar200 + 1e-100);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34]) /
                                    (dVar139 + dVar189 + 1e-100) + 1.0;
                          dVar139 = (dVar229 + dVar110) * dVar139;
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34]) /
                                    (dVar109 + dVar200 + 1e-100) + 1.0;
                          dVar139 = dVar139 / ((dVar110 + dVar230) * dVar109 + dVar139 +
                                               (dVar229 + dVar235) * dVar189 +
                                               (dVar230 + dVar235) * dVar200 + 1e-100);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar53 + lVar34 * 3]);
                          dVar109 = dVar109 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar65 + lVar52 + lVar34 * 3])
                                              + dVar109);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar52 + lVar34 * 3] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar65 + lVar53 + lVar34 * 3] == 0.0)
                          ;
                          dVar109 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar109
                                             ) & uVar154 | ~uVar154 & (ulong)dVar109);
                          dVar188 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar63 + lVar52 + lVar34 * 8] * dVar188 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar53 + lVar34 * 6]) /
                                     (dVar217 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar53 + lVar34 * 5]) /
                                    (dVar232 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 4]) /
                                    (dVar208 + dVar188 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar53 + lVar34 * 7]) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar44 + lVar53 + lVar34 * 7]) + dVar188
                                     + ABS((double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar63 + lVar53 + lVar34 * 7]) + 1e-100
                                    ) + ABS((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52 + lVar34 * 2]) /
                                        (ABS((double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar63 + lVar52 + lVar34 * 7]) +
                                         dVar208 + dVar217 + 1e-100) +
                                        ABS((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar44 + lVar52 + lVar34]) /
                                        (ABS((double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar44 + lVar52 + lVar34 * 7]) +
                                         dVar232 + dVar208 + 1e-100) + 1.0);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar53 + lVar34 * 5]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar52 + lVar34 * 5]);
                          dVar140 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar53 + lVar34 * 5]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar52 + lVar34 * 5]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar53 + lVar34 * 3]) /
                                    (dVar229 + dVar140 + 1e-100);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar52 + lVar34 * 3]) /
                                    (dVar208 + dVar230 + 1e-100);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar52 + lVar34]) /
                                    (dVar229 + dVar208 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar52 + lVar34]) /
                                    (dVar140 + dVar230 + 1e-100) + 1.0;
                          dVar140 = (dVar189 + dVar217) * dVar140;
                          dVar140 = dVar140 / ((dVar200 + dVar189) * dVar229 + dVar140 +
                                               (dVar200 + dVar232) * dVar208 +
                                               (dVar217 + dVar232) * dVar230 + 1e-100);
                          lVar89 = (long)((iVar39 - local_c70.domain.smallend.vect[2]) + -2);
                          dVar164 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + local_8d8 + lVar34 * 5]);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar57 + lVar34 * 5]);
                          dVar202 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + local_8d8 + lVar34 * 5]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar57 + lVar34 * 5]);
                          dVar213 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + local_8d8 + lVar34 * 3]) /
                                    (dVar164 + dVar202 + 1e-100);
                          dVar141 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar57 + lVar34 * 3]) /
                                    (dVar121 + dVar200 + 1e-100);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar57 + lVar34]) /
                                    (dVar164 + dVar121 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar57 + lVar34]) /
                                    (dVar202 + dVar200 + 1e-100) + 1.0;
                          dVar200 = (dVar217 + dVar141) * dVar200;
                          dVar165 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 3]);
                          dVar165 = dVar165 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + local_8d8 + lVar34 * 3
                                                           ]) + dVar165);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar57 + lVar34 * 3] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar65 + local_8d8 + lVar34 * 3] ==
                                            0.0);
                          dVar190 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 5]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 5]);
                          dVar226 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + local_8d8 + lVar34 * 5]);
                          dVar203 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34 * 5]);
                          dVar214 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + local_8d8 + lVar34 * 3]) /
                                    (dVar190 + dVar226 + 1e-100);
                          dVar142 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34 * 3]) /
                                    (dVar189 + dVar203 + 1e-100);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34]) /
                                    (dVar190 + dVar189 + 1e-100) + 1.0;
                          dVar166 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34]) /
                                    (dVar226 + dVar203 + 1e-100) + 1.0;
                          dVar189 = (dVar229 + dVar142) * dVar189;
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + local_8d8 + lVar34 * 7]);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar57 + lVar34 * 7]);
                          dVar167 = ABS((double)local_8d0[lVar46 + lVar57 + lVar34 * 7]);
                          dVar191 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar57 + lVar34 * 7]) + dVar125;
                          dVar192 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 6]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 6]);
                          dVar227 = ABS((double)local_8d0[lVar65 + local_8d8 + lVar34 * 6]);
                          dVar204 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 6]);
                          dVar215 = ABS((double)local_8d0[lVar65 + local_8d8 + lVar34 * 3]) /
                                    (dVar192 + dVar227 + 1e-100);
                          dVar143 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 3]) /
                                    (dVar230 + dVar204 + 1e-100);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar192 + dVar230 + 1e-100) + 1.0;
                          dVar169 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar227 + dVar204 + 1e-100) + 1.0;
                          dVar230 = (dVar208 + dVar143) * dVar230;
                          dVar123 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 7]);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 7]);
                          dVar170 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 7]);
                          dVar193 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34 * 7]) + dVar113;
                          dVar177 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34]);
                          dVar177 = dVar177 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar89 + lVar42 + lVar34]) +
                                              dVar177);
                          uVar93 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar46 + lVar42 + lVar34] == 0.0);
                          uVar94 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar89 + lVar42 + lVar34] == 0.0);
                          dVar144 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34]);
                          dVar144 = dVar144 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar88 + lVar42 + lVar34]) +
                                              dVar144);
                          uVar95 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar88 + lVar42 + lVar34] == 0.0);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34] == 0.0);
                          dVar209 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 4]);
                          dVar178 = ABS((double)local_8d0[lVar89 + lVar42 + lVar34 * 4]);
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 4]);
                          dVar216 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 4]);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar209 + dVar126 + 1e-100);
                          dVar145 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar178 + dVar216 + 1e-100);
                          dVar182 = ABS((double)local_8d0[lVar89 + lVar42 + lVar34]) /
                                    (dVar209 + dVar178 + 1e-100) + 1.0;
                          dVar194 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34]) /
                                    (dVar126 + dVar216 + 1e-100) + 1.0;
                          dVar126 = (dVar124 + dVar194) * dVar126;
                          dVar146 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar146 = dVar146 / (ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar146);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar98 = -(ulong)((double)local_8d0[lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar195 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 4]);
                          dVar234 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar231 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 4]);
                          dVar218 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar232 + dVar234 + 1e-100);
                          dVar147 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar195 + dVar231 + 1e-100);
                          dVar127 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34]) /
                                    (dVar232 + dVar195 + 1e-100) + 1.0;
                          dVar232 = (dVar127 + dVar218) * dVar232;
                          dVar179 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34]) /
                                    (dVar234 + dVar231 + 1e-100) + 1.0;
                          dVar210 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 5]);
                          dVar196 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar52 + lVar34 * 5]);
                          dVar129 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 5]);
                          dVar219 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 5]);
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 3]) /
                                    (dVar210 + dVar129 + 1e-100);
                          dVar148 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 3]) /
                                    (dVar196 + dVar219 + 1e-100);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar52 + lVar34]) /
                                    (dVar210 + dVar196 + 1e-100) + 1.0;
                          dVar180 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34]) /
                                    (dVar129 + dVar219 + 1e-100) + 1.0;
                          dVar129 = (dVar128 + dVar180) * dVar129;
                          dVar149 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 3]);
                          dVar149 = dVar149 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + lVar52 + lVar34 * 3])
                                              + dVar149);
                          uVar99 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 3] == 0.0);
                          uVar100 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar65 + lVar52 + lVar34 * 3] == 0.0)
                          ;
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar155 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar211 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 5]);
                          dVar197 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 5]);
                          dVar224 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar235 + dVar211 + 1e-100);
                          dVar233 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 3]) /
                                    (dVar155 + dVar197 + 1e-100);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34]) /
                                    (dVar235 + dVar155 + 1e-100) + 1.0;
                          dVar235 = (dVar130 + dVar224) * dVar235;
                          dVar181 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34]) /
                                    (dVar211 + dVar197 + 1e-100) + 1.0;
                          dVar131 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 7]);
                          dVar168 = dVar131 + ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 7]);
                          dVar183 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 7]);
                          dVar156 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 7]) + dVar131;
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar162 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar225 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 6]);
                          dVar212 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 6]);
                          dVar201 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar110 + dVar225 + 1e-100);
                          dVar184 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar162 + dVar212 + 1e-100);
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar110 + dVar162 + 1e-100) + 1.0;
                          dVar110 = (dVar132 + dVar201) * dVar110;
                          dVar157 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar225 + dVar212 + 1e-100) + 1.0;
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar133 = dVar115 + ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]);
                          dVar158 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar163 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 7]) + dVar115;
                          local_2b0[(long)local_d38] =
                               (_func_int *)
                               (((double)local_8d0[lVar88 + lVar52 + lVar34 * 8] * dVar115 *
                                 (ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar88 + lVar42 + lVar34 * 6]) /
                                  (dVar163 + 1e-100) +
                                 ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 5]) /
                                 (dVar133 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar65 + lVar52 + lVar34 * 4]) /
                                 (dVar158 + dVar115 + 1e-100) +
                                 ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 3]) /
                                 (ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 7]) +
                                  ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]) + dVar163 +
                                 1e-100) + ABS((double)local_c70._vptr_BaseFab
                                                       [lVar77 + lVar88 + lVar52 + lVar34 * 2]) /
                                           (ABS((double)local_c70._vptr_BaseFab
                                                        [lVar77 + lVar88 + lVar52 + lVar34 * 7]) +
                                            dVar158 + dVar163 + 1e-100) +
                                           ABS((double)local_8d0[lVar65 + lVar52 + lVar34]) /
                                           (ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 7]) +
                                            dVar133 + dVar158 + 1e-100) + 1.0) *
                                 (dVar139 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52 + lVar34 * 2] +
                                 dVar109 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar44 + lVar52 + lVar34 * 4] +
                                 dVar188 * (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52]
                                 + dVar161 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar44 + lVar52 + lVar34] +
                                   dVar108 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar63 + lVar53 + lVar34 * 6] +
                                   dVar103 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar44 + lVar53 + lVar34 * 5] +
                                   dVar228 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar63 + lVar53 + lVar34 * 3] +
                                   (double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar44 + lVar53 + lVar34 * 7]) +
                                (dVar110 /
                                ((dVar201 + dVar157) * dVar225 + dVar110 +
                                 (dVar132 + dVar184) * dVar162 + (dVar157 + dVar184) * dVar212 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar52 + lVar34 * 4] * dVar139 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar52 + lVar34 * 2] * dVar109 +
                                dVar140 * (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar46 + lVar52 + lVar34 * 4] +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52 + lVar34] *
                                dVar188 + (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52]
                                          * dVar161 +
                                          dVar120 * (double)local_c70._vptr_BaseFab
                                                            [lVar82 + lVar46 + lVar52 + lVar34] +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar65 + lVar53 + lVar34 * 7] * dVar108
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar46 + lVar53 + lVar34 * 7] *
                                            dVar187 + (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar65 + lVar53 + lVar34 * 5
                                                              ] * dVar228 +
                                                      dVar160 * (double)local_c70._vptr_BaseFab
                                                                        [lVar82 + lVar46 + lVar53 + 
                                                  lVar34 * 5] +
                                                  (double)local_c70._vptr_BaseFab
                                                          [lVar82 + lVar65 + lVar53 + lVar34 * 3] *
                                                  dVar103 +
                                            (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar53 + lVar34 * 6]) +
                                (double)local_8d0[lVar46 + lVar52 + lVar34 * 8] * dVar131 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar46 + lVar42 + lVar34 * 6]) /
                                 (dVar156 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 5]) /
                                (dVar168 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar46 + lVar52 + lVar34 * 4]) /
                                (dVar183 + dVar131 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 3]) /
                                (ABS((double)local_8d0[lVar89 + lVar42 + lVar34 * 7]) + dVar156 +
                                 ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 7]) + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar46 + lVar52 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar89 + lVar52 + lVar34 * 7]) + dVar156 +
                                 dVar183 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar52 + lVar34]) /
                                (ABS((double)local_8d0[lVar46 + lVar52 + lVar34 * 7]) +
                                 dVar168 + dVar183 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar52 + lVar34 * 4] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar52 + lVar34 * 2] * dVar140 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52 + lVar34] *
                                dVar161 + (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52]
                                          * dVar120 +
                                          dVar187 * (double)local_c70._vptr_BaseFab
                                                            [lVar82 + lVar68 + lVar53 + lVar34 * 6]
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar68 + lVar53 + lVar34 * 3] *
                                            dVar160 + (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar68 + lVar53 + lVar34 * 5
                                                              ] * dVar103 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar68 + lVar53 + lVar34 * 7]) +
                                (dVar235 /
                                ((dVar224 + dVar181) * dVar211 + dVar235 +
                                 (dVar130 + dVar233) * dVar155 + (dVar181 + dVar233) * dVar197 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 4] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar53 + lVar34 * 7] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar53 + lVar34 * 6] * dVar228) +
                                (double)((uVar100 & 0x3fe0000000000000 | ~uVar100 & (ulong)dVar149)
                                         & uVar99 | ~uVar99 & (ulong)dVar149) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 4] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar52 + lVar34 * 2] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar52 + lVar34 * 4] * dVar120 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar53 + lVar34 * 7] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar53 + lVar34 * 7] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar53 + lVar34 * 6] * dVar103) +
                                (dVar129 /
                                ((dVar114 + dVar128) * dVar210 + dVar129 +
                                 (dVar114 + dVar148) * dVar196 + (dVar180 + dVar148) * dVar219 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar52 + lVar34 * 4] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar52 + lVar34 * 2] * dVar120 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar53 + lVar34 * 6] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar53 + lVar34 * 7] * dVar103) +
                                (dVar232 /
                                ((dVar218 + dVar179) * dVar234 + dVar232 +
                                 (dVar127 + dVar147) * dVar195 + (dVar179 + dVar147) * dVar231 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 6] * dVar139 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 7] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 5] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar63 + lVar42 + lVar34 * 2] * dVar108 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar42] * dVar228
                                + (double)local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar42 + lVar34]
                                  * dVar103 +
                                  dVar223 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar57 + lVar34 * 6] +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar44 + lVar57 + lVar34 * 7] * dVar102 +
                                  dVar138 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar44 + lVar57 + lVar34 * 5] +
                                  dVar111 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar57 + lVar34 * 3] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 4]) +
                                (double)((uVar98 & 0x3fe0000000000000 | ~uVar98 & (ulong)dVar146) &
                                         uVar97 | ~uVar97 & (ulong)dVar146) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar42 + lVar34 * 7] * dVar139 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar42 + lVar34 * 6] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar42 + lVar34 * 7] * dVar140 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar42 + lVar34 * 5] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar42 + lVar34 * 3] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar42 + lVar34 * 5] * dVar120 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar42 + lVar34 * 4] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar42 + lVar34 * 4] * dVar187 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar42 + lVar34] *
                                dVar228 + (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar42]
                                          * dVar103 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar46 + lVar42 + lVar34] * dVar160 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar65 + lVar57 + lVar34 * 7] * dVar223
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar57 + lVar34 * 6] *
                                            dVar102 + dVar159 * (double)local_c70._vptr_BaseFab
                                                                        [lVar82 + lVar46 + lVar57 + 
                                                  lVar34 * 7] +
                                                  (double)local_c70._vptr_BaseFab
                                                          [lVar82 + lVar65 + lVar57 + lVar34 * 5] *
                                                  dVar111 + dVar236 * (double)local_c70.
                                                                              _vptr_BaseFab
                                                                              [lVar82 + lVar46 + 
                                                  lVar57 + lVar34 * 5] +
                                                  (double)local_c70._vptr_BaseFab
                                                          [lVar82 + lVar65 + lVar57 + lVar34 * 3] *
                                                  dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar42 + lVar34 * 2]) +
                                (dVar126 /
                                ((dVar182 + dVar124) * dVar209 + dVar126 +
                                 (dVar182 + dVar145) * dVar178 + (dVar194 + dVar145) * dVar216 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar42 + lVar34 * 7] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar42 + lVar34 * 6] * dVar140 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar42 + lVar34 * 5] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar42 + lVar34 * 3] * dVar120 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar42 + lVar34 * 2] * dVar187 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar42 + lVar34] *
                                dVar103 + (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar42]
                                          * dVar160 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar68 + lVar57 + lVar34 * 7] * dVar102
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar68 + lVar57 + lVar34 * 6] *
                                            dVar159 + (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar68 + lVar57 + lVar34 * 3
                                                              ] * dVar236 +
                                                      (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar68 + lVar57 + lVar34 * 5
                                                              ] * dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar42 + lVar34 * 4]) +
                                (double)((uVar95 & 0x3fe0000000000000 | ~uVar95 & (ulong)dVar144) &
                                         uVar96 | ~uVar96 & (ulong)dVar144) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar42 + lVar34 * 7] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar42 + lVar34 * 2] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar42 + lVar34 * 4] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar57 + lVar34 * 7] * dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar57 + lVar34 * 6] * dVar111) +
                                (double)((uVar93 & 0x3fe0000000000000 | ~uVar93 & (ulong)dVar177) &
                                         uVar94 | ~uVar94 & (ulong)dVar177) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar42 + lVar34 * 7] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar42 + lVar34 * 6] * dVar120 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar42 + lVar34 * 4] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar42 + lVar34 * 2] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar57 + lVar34 * 6] * dVar236 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar57 + lVar34 * 7] * dVar138) +
                                (double)local_8d0[lVar88 + lVar57 + lVar34 * 8] * dVar113 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar88 + lVar57 + lVar34 * 6]) /
                                 (dVar193 + 1e-100) +
                                ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 5]) /
                                (dVar170 + dVar113 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar65 + lVar57 + lVar34 * 4]) /
                                (dVar123 + dVar113 + 1e-100) +
                                ABS((double)local_8d0[lVar88 + lVar57 + lVar34 * 3]) /
                                (ABS((double)local_8d0[lVar88 + lVar57 + lVar34 * 7]) +
                                 dVar170 + dVar193 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar88 + lVar57 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar88 + local_8d8 + lVar34 * 7]) + dVar123 +
                                 dVar113 + ABS((double)local_c70._vptr_BaseFab
                                                       [lVar77 + lVar88 + lVar57 + lVar34 * 7]) +
                                1e-100) + ABS((double)local_8d0[lVar65 + lVar57 + lVar34]) /
                                          (ABS((double)local_8d0[lVar65 + local_8d8 + lVar34 * 7]) +
                                           dVar123 + dVar113 + dVar170 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar71 + lVar34 * 6] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar63 + lVar71 + lVar34 * 3] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar71 + lVar34 * 5] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar63 + lVar71 + lVar34 * 2] * dVar223 +
                                dVar102 * (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar44 + lVar71 + lVar34 * 4] +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar71 + lVar34] *
                                dVar138 + (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar71]
                                          * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar71 + lVar34 * 7]) +
                                (dVar230 /
                                ((dVar215 + dVar169) * dVar227 + (dVar208 + dVar215) * dVar192 +
                                 dVar230 + (dVar169 + dVar143) * dVar204 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar71 + lVar34 * 7] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar71 + lVar34 * 7] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar71 + lVar34 * 5] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar71 + lVar34 * 3] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar71 + lVar34 * 5] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar71 + lVar34 * 4] * dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar71 + lVar34 * 2] * dVar102 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar71 + lVar34 * 4] * dVar159 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar71 + lVar34] *
                                dVar111 + (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar46 + lVar71 + lVar34] * dVar236 +
                                          (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar71]
                                          * dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar71 + lVar34 * 6]) +
                                (double)local_8d0[lVar46 + lVar57 + lVar34 * 8] * dVar125 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar46 + lVar57 + lVar34 * 6]) /
                                 (dVar191 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar57 + lVar34 * 5]) /
                                (dVar167 + dVar125 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar46 + lVar57 + lVar34 * 4]) /
                                (dVar122 + dVar125 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar57 + lVar34 * 3]) /
                                (ABS((double)local_8d0[lVar89 + lVar57 + lVar34 * 7]) + dVar191 +
                                 dVar167 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar46 + lVar57 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar89 + local_8d8 + lVar34 * 7]) + dVar122 +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar89 + lVar57 + lVar34 * 7]) + dVar125 +
                                1e-100) + ABS((double)local_8d0[lVar46 + lVar57 + lVar34]) /
                                          (ABS((double)local_8d0[lVar46 + local_8d8 + lVar34 * 7]) +
                                           dVar122 + dVar125 + dVar167 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar71 + lVar34 * 6] * dVar187 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar71 + lVar34 * 5] * dVar103 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar71 + lVar34 * 3] * dVar160 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar71 + lVar34 * 4] * dVar102 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar71 + lVar34 * 2] * dVar159 +
                                 (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar71] * dVar236
                                 + (double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar68 + lVar71 + lVar34] * dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar71 + lVar34 * 7]) +
                                (dVar189 /
                                ((dVar214 + dVar166) * dVar226 + (dVar229 + dVar214) * dVar190 +
                                 dVar189 + (dVar166 + dVar142) * dVar203 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar71 + lVar34 * 6] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar71 + lVar34 * 7] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar71 + lVar34 * 4] * dVar138 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar71 + lVar34 * 2] * dVar111) +
                                (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar165) &
                                         uVar154 | ~uVar154 & (ulong)dVar165) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar71 + lVar34 * 7] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar71 + lVar34 * 6] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar71 + lVar34 * 7] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar71 + lVar34 * 4] * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar71 + lVar34 * 4] * dVar236 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar71 + lVar34 * 2] * dVar138) +
                                (dVar200 /
                                ((dVar112 + dVar141) * dVar121 +
                                 (dVar213 + dVar217) * dVar202 + (dVar112 + dVar213) * dVar164 +
                                 dVar200 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar71 + lVar34 * 7] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar71 + lVar34 * 6] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar71 + lVar34 * 2] * dVar236 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar71 + lVar34 * 4] * dVar138) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar42 + lVar34 * 7] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar42 + lVar34 * 6] * dVar161 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar42 + lVar34 * 7] * dVar120 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar42 + lVar34 * 4] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar42 + lVar34 * 2] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar42 + lVar34 * 4] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar57 + lVar34 * 7] * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar57 + lVar34 * 7] * dVar236 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar57 + lVar34 * 6] * dVar138) * 0.125);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar53 + lVar34 * 7]);
                          dVar102 = ABS((double)local_490[lVar68 + lVar52 + lVar34 * 7]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar52 + lVar34 * 7]);
                          uStack_660 = 0;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar45 + lVar52 + lVar34 * 7]);
                          uStack_680 = 0;
                          dVar108 = (double)local_c70._vptr_BaseFab
                                            [lVar81 + lVar68 + lVar52 + lVar34 * 8] * dVar108 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar68 + lVar52 + lVar34 * 6]) /
                                     (dVar187 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar52 + lVar34 * 5]) /
                                    (dVar102 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar52 + lVar34 * 4]) /
                                    (dVar103 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar52 + lVar34 * 3]) /
                                    (ABS((double)local_490[lVar45 + lVar52 + lVar34 * 7]) + dVar102
                                     + dVar187 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar45 + lVar53 + lVar34 * 7]) + dVar103
                                     + dVar187 + dVar108 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar52 + lVar34]) /
                                    (ABS((double)local_490[lVar68 + lVar53 + lVar34 * 7]) + dVar103
                                     + dVar102 + dVar108 + 1e-100) + 1.0);
                          dVar187 = ABS((double)local_490[lVar65 + lVar53 + lVar34 * 6]);
                          dVar103 = ABS((double)local_490[lVar65 + lVar52 + lVar34 * 6]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar187 + dVar109 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar103 + dVar223 + 1e-100);
                          dVar102 = ABS((double)local_490[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar187 + dVar103 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar109 + dVar223 + 1e-100) + 1.0;
                          dVar223 = (dVar217 + dVar188) * dVar223;
                          dVar223 = dVar223 / ((dVar102 + dVar188) * dVar103 +
                                               (dVar228 + dVar217) * dVar109 +
                                               (dVar102 + dVar228) * dVar187 + dVar223 + 1e-100);
                          uStack_690 = 0;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar103 = ABS((double)local_490[lVar44 + lVar52 + lVar34 * 7]);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34 * 7]);
                          uStack_6c0 = 0;
                          dVar109 = (double)local_c70._vptr_BaseFab
                                            [lVar81 + lVar63 + lVar52 + lVar34 * 8] * dVar102 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar63 + lVar52 + lVar34 * 6]) /
                                     (dVar109 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar52 + lVar34 * 5]) /
                                    (dVar103 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar52 + lVar34 * 4]) /
                                    (dVar187 + dVar102 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (ABS((double)local_490[lVar63 + lVar52 + lVar34 * 7]) + dVar103
                                     + dVar102 + dVar109 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar63 + lVar53 + lVar34 * 7]) + dVar187
                                     + dVar102 + dVar109 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar52 + lVar34]) /
                                    (ABS((double)local_490[lVar44 + lVar53 + lVar34 * 7]) + dVar187
                                     + dVar103 + dVar102 + 1e-100) + 1.0);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar45 + lVar53 + lVar34 * 5]);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar45 + lVar52 + lVar34 * 5]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar53 + lVar34 * 5]);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar52 + lVar34 * 5]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar53 + lVar34 * 3]) /
                                    (dVar187 + dVar188 + 1e-100);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar52 + lVar34 * 3]) /
                                    (dVar103 + dVar228 + 1e-100);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar45 + lVar52 + lVar34]) /
                                    (dVar187 + dVar103 + 1e-100) + 1.0;
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar52 + lVar34]) /
                                    (dVar188 + dVar228 + 1e-100) + 1.0;
                          dVar228 = (dVar229 + dVar200) * dVar228;
                          dVar228 = dVar228 / ((dVar102 + dVar200) * dVar103 +
                                               (dVar217 + dVar229) * dVar188 +
                                               (dVar102 + dVar217) * dVar187 + dVar228 + 1e-100);
                          uStack_6a0 = 0;
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34 * 3];
                          dVar103 = ABS((double)p_Var69);
                          dVar187 = dVar103 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + lVar53 + lVar34 * 3])
                                              + dVar103);
                          dVar102 = dVar187;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            dVar102 = 0.5;
                          }
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar53 + lVar34 * 3] == 0.0);
                          dVar200 = (double)(~uVar31 & (ulong)dVar187 | (ulong)dVar102 & uVar31);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar187 + dVar189 + 1e-100);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar229 + dVar188 + 1e-100);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34]) /
                                    (dVar187 + dVar229 + 1e-100) + 1.0;
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34]) /
                                    (dVar189 + dVar188 + 1e-100) + 1.0;
                          dVar229 = (dVar230 + dVar208) * dVar229;
                          dVar229 = dVar229 / ((dVar217 + dVar102) * dVar189 +
                                               (dVar230 + dVar217) * dVar187 + dVar229 +
                                               (dVar102 + dVar208) * dVar188 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar53 + lVar34 * 7]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar52 + lVar34 * 7]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 7]);
                          uStack_6e0 = 0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar45 + lVar52 + lVar34 * 7]) + dVar187;
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar86 + lVar34]);
                          dVar102 = dVar102 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar45 + lVar86 + lVar34]) +
                                              dVar102);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar68 + lVar86 + lVar34] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar45 + lVar86 + lVar34] == 0.0);
                          dVar102 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar102
                                             ) & uVar154 | ~uVar154 & (ulong)dVar102);
                          dVar182 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar68 + lVar52 + lVar34 * 8] * dVar187 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar68 + lVar52 + lVar34 * 6]) /
                                     (dVar188 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 5]) /
                                    (dVar189 + dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar52 + lVar34 * 4]) /
                                    (dVar217 + dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar45 + lVar52 + lVar34 * 7]) + dVar188
                                     + dVar189 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar45 + lVar53 + lVar34 * 7]) + dVar217
                                     + ABS((double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar45 + lVar52 + lVar34 * 7]) +
                                     dVar187 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar68 + lVar53 + lVar34 * 7]) + dVar217
                                     + dVar187 + dVar189 + 1e-100) + 1.0);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar188 + dVar217 + 1e-100);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar189 + dVar208 + 1e-100);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar188 + dVar189 + 1e-100) + 1.0;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar217 + dVar208 + 1e-100) + 1.0;
                          dVar189 = (dVar235 + dVar232) * dVar189;
                          dVar189 = dVar189 / ((dVar230 + dVar187) * dVar217 +
                                               (dVar235 + dVar230) * dVar188 + dVar189 +
                                               (dVar187 + dVar232) * dVar208 + 1e-100);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 7]);
                          uStack_400 = 0;
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar52 + lVar34 * 7]) + dVar217;
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar208 + dVar236 + 1e-100);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar187 + dVar111 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34]) /
                                    (dVar208 + dVar187 + 1e-100) + 1.0;
                          dVar208 = (dVar188 + dVar112) * dVar208;
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34]) /
                                    (dVar236 + dVar111 + 1e-100) + 1.0;
                          dVar208 = dVar208 / ((dVar112 + dVar235) * dVar236 + dVar208 +
                                               (dVar188 + dVar125) * dVar187 +
                                               (dVar235 + dVar125) * dVar111 + 1e-100);
                          local_2a0 = local_c70._vptr_BaseFab + lVar81 + lVar68 + lVar42;
                          local_298 = (double)local_c70._vptr_BaseFab
                                              [lVar81 + lVar65 + lVar42 + lVar34 * 6] * dVar200;
                          local_290 = (double)local_c70._vptr_BaseFab
                                              [lVar81 + lVar44 + lVar42 + lVar34 * 7] * dVar200;
                          local_288 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar42 + lVar34 * 3] * dVar200;
                          local_280 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar44 + lVar42 + lVar34 * 5] * dVar200;
                          local_278 = (double)local_c70._vptr_BaseFab
                                              [lVar84 + lVar68 + lVar42 + lVar34 * 7] * dVar200;
                          local_270 = (double)local_c70._vptr_BaseFab
                                              [lVar84 + lVar65 + lVar42 + lVar34 * 6] * dVar200;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar86 + lVar34 * 2]);
                          dVar187 = dVar187 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar82 + lVar65 + lVar86 + lVar34 * 2])
                                              + dVar187);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar86 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar65 + lVar86 + lVar34 * 2] == 0.0)
                          ;
                          dVar187 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar187
                                             ) & uVar154 | ~uVar154 & (ulong)dVar187);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar86 + lVar34]);
                          dVar188 = dVar188 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar63 + lVar86 + lVar34]) +
                                              dVar188);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar63 + lVar86 + lVar34] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar44 + lVar86 + lVar34] == 0.0);
                          dVar188 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar188
                                             ) & uVar154 | ~uVar154 & (ulong)dVar188);
                          dVar195 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar63 + lVar52 + lVar34 * 8] * dVar217 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar52 + lVar34 * 6]) /
                                     (dVar230 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 5]) /
                                    (dVar110 + dVar217 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar52 + lVar34 * 4]) /
                                    (dVar232 + dVar217 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar52 + lVar34 * 7]) +
                                     dVar110 + dVar230 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar53 + lVar34 * 7]) + dVar232
                                     + dVar217 +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar52 + lVar34 * 7]) + 1e-100)
                                    + ABS((double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar44 + lVar52 + lVar34]) /
                                      (ABS((double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar44 + lVar53 + lVar34 * 7]) +
                                       dVar232 + dVar217 + dVar110 + 1e-100) + 1.0);
                          dVar232 = ABS((double)local_490[lVar45 + lVar86 + lVar34 * 4]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar45 + lVar86 + lVar34 * 4]);
                          dVar235 = ABS((double)local_490[lVar68 + lVar86 + lVar34 * 4]);
                          dVar143 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar86 + lVar34 * 4]);
                          dVar110 = ABS((double)local_490[lVar68 + lVar86 + lVar34 * 2]) /
                                    (dVar232 + dVar235 + 1e-100);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar86 + lVar34 * 2]) /
                                    (dVar230 + dVar143 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar45 + lVar86 + lVar34]) /
                                    (dVar232 + dVar230 + 1e-100) + 1.0;
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar68 + lVar86 + lVar34]) /
                                    (dVar235 + dVar143 + 1e-100) + 1.0;
                          dVar143 = (dVar111 + dVar236) * dVar143;
                          dVar143 = dVar143 / ((dVar217 + dVar236) * dVar230 +
                                               (dVar110 + dVar111) * dVar235 +
                                               (dVar217 + dVar110) * dVar232 + dVar143 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar86 + lVar34 * 2]);
                          dVar217 = dVar217 / (ABS((double)local_490[lVar65 + lVar86 + lVar34 * 2])
                                              + dVar217);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar65 + lVar86 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_490[lVar65 + lVar86 + lVar34 * 2] == 0.0)
                          ;
                          dVar217 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar217
                                             ) & uVar154 | ~uVar154 & (ulong)dVar217);
                          local_3c8 = local_490 + lVar44 + lVar86;
                          dVar230 = ABS((double)local_3c8[lVar34 * 4]);
                          dVar164 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar110 = ABS((double)local_490[lVar63 + lVar86 + lVar34 * 4]);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar112 = ABS((double)local_490[lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar230 + dVar110 + 1e-100);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar164 + dVar236 + 1e-100);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar86 + lVar34]) /
                                    (dVar230 + dVar164 + 1e-100) + 1.0;
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar86 + lVar34]) /
                                    (dVar110 + dVar236 + 1e-100) + 1.0;
                          dVar164 = (dVar111 + dVar235) * dVar164;
                          dVar164 = dVar164 / ((dVar112 + dVar232) * dVar110 +
                                               (dVar111 + dVar112) * dVar230 + dVar164 +
                                               (dVar232 + dVar235) * dVar236 + 1e-100);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar45 + lVar86 + lVar34 * 4]);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar86 + lVar34 * 4]);
                          dVar144 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar86 + lVar34 * 4]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar86 + lVar34 * 4]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar86 + lVar34 * 2]) /
                                    (dVar235 + dVar144 + 1e-100);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar86 + lVar34 * 2]) /
                                    (dVar236 + dVar110 + 1e-100);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar86 + lVar34]) /
                                    (dVar235 + dVar236 + 1e-100) + 1.0;
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar86 + lVar34]) /
                                    (dVar144 + dVar110 + 1e-100) + 1.0;
                          dVar144 = (dVar111 + dVar230) * dVar144;
                          dVar144 = dVar144 / ((dVar232 + dVar111) * dVar235 + dVar144 +
                                               (dVar232 + dVar112) * dVar236 +
                                               (dVar230 + dVar112) * dVar110 + 1e-100);
                          local_950 = local_c70._vptr_BaseFab + lVar87 + lVar46 + lVar42;
                          dVar128 = ABS((double)local_2e0[lVar89 + lVar34 * 4]);
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar89 + lVar42 + lVar34 * 4]);
                          dVar159 = ABS((double)local_1090[lVar46 + lVar42 + lVar34 * 4]);
                          dVar232 = ABS((double)local_950[lVar34 * 4]);
                          dVar165 = ABS((double)local_1090[lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar128 + dVar159 + 1e-100);
                          dVar178 = ABS((double)local_950[lVar34 * 2]) /
                                    (dVar122 + dVar232 + 1e-100);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar89 + lVar42 + lVar34]) /
                                    (dVar128 + dVar122 + 1e-100) + 1.0;
                          dVar230 = ABS((double)local_950[lVar34]) / (dVar159 + dVar232 + 1e-100) +
                                    1.0;
                          dVar232 = (dVar230 + dVar178) * dVar232;
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar145 = dVar145 / (ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar145);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_1090[lVar65 + lVar42 + lVar34 * 2] == 0.0
                                            );
                          dVar146 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 4]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar191 = ABS((double)local_2e0[lVar88 + lVar34 * 4]);
                          dVar160 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar179 = ABS((double)local_2e0[lVar88 + lVar34 * 2]) /
                                    (dVar146 + dVar191 + 1e-100);
                          dVar166 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar110 + dVar160 + 1e-100);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34]) /
                                    (dVar146 + dVar110 + 1e-100) + 1.0;
                          dVar129 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34]) /
                                    (dVar191 + dVar160 + 1e-100) + 1.0;
                          dVar110 = (dVar235 + dVar166) * dVar110;
                          dVar147 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34]);
                          dVar147 = dVar147 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar89 + lVar42 + lVar34]) +
                                              dVar147);
                          uVar93 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar46 + lVar42 + lVar34] == 0.0);
                          uVar94 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar89 + lVar42 + lVar34] == 0.0);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34]);
                          dVar130 = dVar130 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar88 + lVar42 + lVar34]) +
                                              dVar130);
                          uVar95 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar88 + lVar42 + lVar34] == 0.0);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34] == 0.0);
                          dVar161 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 4]);
                          dVar148 = ABS((double)local_2e8[lVar89 + lVar34 * 4]);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 4]);
                          dVar180 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 4]);
                          dVar123 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar161 + dVar124 + 1e-100);
                          dVar167 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar148 + dVar180 + 1e-100);
                          dVar168 = ABS((double)local_2e8[lVar89 + lVar34]) /
                                    (dVar161 + dVar148 + 1e-100) + 1.0;
                          dVar131 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34]) /
                                    (dVar124 + dVar180 + 1e-100) + 1.0;
                          dVar124 = (dVar123 + dVar131) * dVar124;
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar132 = dVar132 / (ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar132);
                          uVar97 = -(ulong)((double)local_8d0[lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar98 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar149 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 4]);
                          dVar193 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar192 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 4]);
                          dVar181 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar236 + dVar193 + 1e-100);
                          dVar169 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar149 + dVar192 + 1e-100);
                          dVar126 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34]) /
                                    (dVar236 + dVar149 + 1e-100) + 1.0;
                          dVar236 = (dVar126 + dVar181) * dVar236;
                          dVar133 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34]) /
                                    (dVar193 + dVar192 + 1e-100) + 1.0;
                          dVar115 = ABS((double)local_950[lVar34 * 7]);
                          dVar138 = ABS((double)local_1090[lVar46 + lVar42 + lVar34 * 7]) + dVar115;
                          dVar183 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar46 + lVar52 + lVar34 * 7]);
                          dVar155 = dVar115 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar87 + lVar89 + lVar42 + lVar34 * 7]);
                          dVar162 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 6]);
                          dVar156 = ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 6]);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar184 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar162 + dVar112 + 1e-100);
                          dVar170 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar156 + dVar184 + 1e-100);
                          dVar120 = ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar162 + dVar156 + 1e-100) + 1.0;
                          dVar139 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar112 + dVar184 + 1e-100) + 1.0;
                          dVar112 = (dVar111 + dVar139) * dVar112;
                          dVar140 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar157 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 7]) + dVar140;
                          dVar190 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar141 = dVar140 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar87 + lVar88 + lVar42 + lVar34 * 7]);
                          dVar158 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 5]);
                          dVar142 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar52 + lVar34 * 5]);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 5]);
                          dVar163 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 5]);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 3]) /
                                    (dVar158 + dVar113 + 1e-100);
                          dVar177 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 3]) /
                                    (dVar142 + dVar163 + 1e-100);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar52 + lVar34]) /
                                    (dVar158 + dVar142 + 1e-100) + 1.0;
                          dVar194 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34]) /
                                    (dVar113 + dVar163 + 1e-100) + 1.0;
                          dVar113 = (dVar125 + dVar194) * dVar113;
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 3]);
                          dVar127 = dVar127 / (dVar103 + dVar127);
                          dVar103 = dVar127;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            dVar103 = 0.5;
                          }
                          uVar99 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 3] == 0.0);
                          dVar196 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar211 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar226 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 5]);
                          dVar224 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 5]);
                          dVar219 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar196 + dVar226 + 1e-100);
                          dVar231 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 3]) /
                                    (dVar211 + dVar224 + 1e-100);
                          dVar234 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34]) /
                                    (dVar196 + dVar211 + 1e-100) + 1.0;
                          dVar196 = (dVar234 + dVar219) * dVar196;
                          dVar204 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34]) /
                                    (dVar226 + dVar224 + 1e-100) + 1.0;
                          dVar201 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 7]);
                          dVar209 = dVar201 + ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 7]);
                          dVar212 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 7]);
                          dVar215 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 7]) + dVar201;
                          dVar197 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar216 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar233 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 6]);
                          dVar227 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 6]);
                          dVar225 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar197 + dVar233 + 1e-100);
                          dVar220 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar216 + dVar227 + 1e-100);
                          dVar202 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar197 + dVar216 + 1e-100) + 1.0;
                          dVar197 = (dVar202 + dVar225) * dVar197;
                          dVar213 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar233 + dVar227 + 1e-100) + 1.0;
                          dVar203 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar210 = dVar203 + ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]);
                          dVar214 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar218 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 7]) + dVar203;
                          local_2b8[(long)local_d38] =
                               (_func_int *)
                               (((double)local_8d0[lVar88 + lVar52 + lVar34 * 8] * dVar203 *
                                 (ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar88 + lVar42 + lVar34 * 6]) /
                                  (dVar218 + 1e-100) +
                                 ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 5]) /
                                 (dVar210 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar65 + lVar52 + lVar34 * 4]) /
                                 (dVar214 + dVar203 + 1e-100) +
                                 ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 3]) /
                                 (ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 7]) +
                                  ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]) + dVar218 +
                                 1e-100) + ABS((double)local_c70._vptr_BaseFab
                                                       [lVar77 + lVar88 + lVar52 + lVar34 * 2]) /
                                           (ABS((double)local_c70._vptr_BaseFab
                                                        [lVar77 + lVar88 + lVar52 + lVar34 * 7]) +
                                            dVar214 + dVar218 + 1e-100) +
                                           ABS((double)local_8d0[lVar65 + lVar52 + lVar34]) /
                                           (ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 7]) +
                                            dVar210 + dVar214 + 1e-100) + 1.0) *
                                 (dVar208 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52 + lVar34 * 3] +
                                 dVar187 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar44 + lVar52 + lVar34 * 5] +
                                 dVar188 * (double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar63 + lVar52 + lVar34 * 6] +
                                 dVar195 * (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52]
                                 + dVar189 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar44 + lVar52 + lVar34] +
                                   dVar200 * (double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar44 + lVar52 + lVar34 * 4] +
                                   dVar229 * (double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar63 + lVar52 + lVar34 * 2] +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar84 + lVar44 + lVar52 + lVar34 * 7]) +
                                (dVar197 /
                                ((dVar225 + dVar213) * dVar233 + dVar197 +
                                 (dVar202 + dVar220) * dVar216 + (dVar213 + dVar220) * dVar227 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar52 + lVar34 * 5] * dVar208 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar52 + lVar34 * 3] * dVar187 +
                                dVar144 * (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar46 + lVar52 + lVar34 * 5] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar52 + lVar34 * 7] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar46 + lVar52 + lVar34 * 7] * dVar102 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52 + lVar34] *
                                dVar195 + (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52]
                                          * dVar189 +
                                          dVar182 * (double)local_c70._vptr_BaseFab
                                                            [lVar82 + lVar46 + lVar52 + lVar34] +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar65 + lVar52 + lVar34 * 4] * dVar229
                                          + dVar228 * (double)local_c70._vptr_BaseFab
                                                              [lVar84 + lVar46 + lVar52 + lVar34 * 4
                                                              ] +
                                            (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar65 + lVar52 + lVar34 * 2] *
                                            dVar200 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar52 + lVar34 * 6]) +
                                (double)local_8d0[lVar46 + lVar52 + lVar34 * 8] * dVar201 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar46 + lVar42 + lVar34 * 6]) /
                                 (dVar215 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 5]) /
                                (dVar209 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar46 + lVar52 + lVar34 * 4]) /
                                (dVar212 + dVar201 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 3]) /
                                (ABS((double)local_2e8[lVar89 + lVar34 * 7]) + dVar215 +
                                 ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 7]) + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar46 + lVar52 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar89 + lVar52 + lVar34 * 7]) + dVar215 +
                                 dVar212 + 1e-100) +
                                ABS((double)local_8d0[lVar46 + lVar52 + lVar34]) /
                                (ABS((double)local_8d0[lVar46 + lVar52 + lVar34 * 7]) +
                                 dVar209 + dVar212 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar52 + lVar34 * 5] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar52 + lVar34 * 3] * dVar144 +
                                dVar102 * (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar68 + lVar52 + lVar34 * 6] +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52 + lVar34] *
                                dVar189 + (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52]
                                          * dVar182 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar68 + lVar52 + lVar34 * 2] * dVar228
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar68 + lVar52 + lVar34 * 4] *
                                            dVar200 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar68 + lVar52 + lVar34 * 7]) +
                                (dVar196 /
                                ((dVar219 + dVar204) * dVar226 + dVar196 +
                                 (dVar234 + dVar231) * dVar211 + (dVar204 + dVar231) * dVar224 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 6] * dVar208 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 7] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar52 + lVar34 * 3] * dVar188 +
                                dVar164 * (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar63 + lVar52 + lVar34 * 6] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar44 + lVar52 + lVar34 * 7] * dVar217 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar195 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 4] * dVar189 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar52] * dVar229
                                + (double)local_c70._vptr_BaseFab[lVar77 + lVar44 + lVar52 + lVar34]
                                  * dVar200 +
                                  dVar223 * (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar44 + lVar52 + lVar34 * 4] +
                                  dVar109 * (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar63 + lVar52 + lVar34 * 2] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 5]) +
                                (double)(~uVar99 & (ulong)dVar127 | (ulong)dVar103 & uVar99) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 7] * dVar208 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar52 + lVar34 * 6] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar52 + lVar34 * 7] * dVar144 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar52 + lVar34 * 5] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar52 + lVar34 * 5] * dVar102 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar65 + lVar52 + lVar34 * 7] * dVar164 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar65 + lVar52 + lVar34 * 6] * dVar217 +
                                dVar143 * (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar46 + lVar52 + lVar34 * 7] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar52 + lVar34 * 4] * dVar195 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar52 + lVar34 * 2] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar52 + lVar34 * 4] * dVar182 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34] *
                                dVar229 + (double)local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52]
                                          * dVar200 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar77 + lVar46 + lVar52 + lVar34] * dVar228 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar65 + lVar52 + lVar34 * 4] * dVar109
                                          + dVar108 * (double)local_c70._vptr_BaseFab
                                                              [lVar87 + lVar46 + lVar52 + lVar34 * 4
                                                              ] +
                                            (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar65 + lVar52 + lVar34 * 2] *
                                            dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar52 + lVar34 * 3]) +
                                (dVar113 /
                                ((dVar121 + dVar125) * dVar158 + dVar113 +
                                 (dVar121 + dVar177) * dVar142 + (dVar194 + dVar177) * dVar163 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar52 + lVar34 * 7] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar52 + lVar34 * 6] * dVar144 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar52 + lVar34 * 3] * dVar102 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar68 + lVar52 + lVar34 * 7] * dVar217 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar68 + lVar52 + lVar34 * 6] * dVar143 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar52 + lVar34 * 4] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar52 + lVar34 * 2] * dVar182 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar68 + lVar52 + lVar34] *
                                dVar200 + (double)local_c70._vptr_BaseFab[lVar77 + lVar68 + lVar52]
                                          * dVar228 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar68 + lVar52 + lVar34 * 2] * dVar108
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar68 + lVar52 + lVar34 * 4] *
                                            dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar52 + lVar34 * 5]) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar88 + lVar52 + lVar34 * 8] * dVar140 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar42 + lVar34 * 6]) /
                                 (dVar141 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar42 + lVar34 * 5]) /
                                (dVar157 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar52 + lVar34 * 4]) /
                                (dVar190 + dVar140 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar88 + lVar42 + lVar34 * 3]) /
                                (ABS((double)local_2e0[lVar88 + lVar34 * 7]) +
                                 ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 7]) + dVar140 +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar42 + lVar34 * 7]) + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar88 + lVar52 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar52 + lVar34 * 7]) +
                                 dVar190 + dVar141 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar65 + lVar52 + lVar34]) /
                                (ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 7]) + dVar157 +
                                 dVar190 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar52 + lVar34 * 6] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar52 + lVar34 * 3] * dVar164 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar44 + lVar52 + lVar34 * 5] * dVar217 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar52 + lVar34 * 2] * dVar229 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar44 + lVar52 + lVar34 * 4] * dVar200 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar44 + lVar52 + lVar34] *
                                dVar223 + (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52]
                                          * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar44 + lVar52 + lVar34 * 7]) +
                                (dVar112 /
                                ((dVar120 + dVar111) * dVar162 + dVar112 +
                                 (dVar120 + dVar170) * dVar156 + (dVar139 + dVar170) * dVar184 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar52 + lVar34 * 7] * dVar188 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar46 + lVar52 + lVar34 * 7] * dVar102 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar52 + lVar34 * 5] * dVar164 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar52 + lVar34 * 3] * dVar217 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar46 + lVar52 + lVar34 * 5] * dVar143 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar52 + lVar34 * 4] * dVar229 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar52 + lVar34 * 2] * dVar200 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar46 + lVar52 + lVar34 * 4] * dVar228 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar65 + lVar52 + lVar34] *
                                dVar109 + (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar46 + lVar52 + lVar34] * dVar108 +
                                          (double)local_c70._vptr_BaseFab[lVar81 + lVar65 + lVar52]
                                          * dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar52 + lVar34 * 6]) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar46 + lVar52 + lVar34 * 8] * dVar115 *
                                (ABS((double)local_950[lVar34 * 6]) / (dVar155 + 1e-100) +
                                ABS((double)local_950[lVar34 * 5]) / (dVar138 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar87 + lVar46 + lVar52 + lVar34 * 4]) /
                                (dVar183 + dVar115 + 1e-100) +
                                ABS((double)local_950[lVar34 * 3]) /
                                (ABS((double)local_2e0[lVar89 + lVar34 * 7]) +
                                 ABS((double)local_1090[lVar46 + lVar42 + lVar34 * 7]) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar89 + lVar42 + lVar34 * 7]) + dVar115 +
                                1e-100) + ABS((double)local_c70._vptr_BaseFab
                                                      [lVar87 + lVar46 + lVar52 + lVar34 * 2]) /
                                          (ABS((double)local_c70._vptr_BaseFab
                                                       [lVar87 + lVar89 + lVar52 + lVar34 * 7]) +
                                           dVar155 + dVar183 + 1e-100) +
                                          ABS((double)local_c70._vptr_BaseFab
                                                      [lVar87 + lVar46 + lVar52 + lVar34]) /
                                          (ABS((double)local_1090[lVar46 + lVar52 + lVar34 * 7]) +
                                           dVar138 + dVar183 + 1e-100) + 1.0) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar68 + lVar52 + lVar34 * 6] * dVar102 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar68 + lVar52 + lVar34 * 5] * dVar217 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar68 + lVar52 + lVar34 * 3] * dVar143 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar68 + lVar52 + lVar34 * 4] * dVar200 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar68 + lVar52 + lVar34 * 2] * dVar228 +
                                 (double)local_c70._vptr_BaseFab[lVar81 + lVar68 + lVar52] * dVar108
                                 + (double)local_c70._vptr_BaseFab
                                           [lVar81 + lVar68 + lVar52 + lVar34] * dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar68 + lVar52 + lVar34 * 7]) +
                                (dVar236 /
                                ((dVar181 + dVar133) * dVar193 + dVar236 +
                                 (dVar126 + dVar169) * dVar149 + (dVar133 + dVar169) * dVar192 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar195 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 5] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar44 + lVar42 + lVar34 * 7] * dVar200 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar63 + lVar42 + lVar34 * 6] * dVar229) +
                                (double)((uVar97 & 0x3fe0000000000000 | ~uVar97 & (ulong)dVar132) &
                                         uVar98 | ~uVar98 & (ulong)dVar132) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar42 + lVar34 * 5] * dVar195 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar42 + lVar34 * 3] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar42 + lVar34 * 5] * dVar182 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar42 + lVar34 * 7] * dVar229 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar46 + lVar42 + lVar34 * 7] * dVar228 +
                                local_270) +
                                (dVar124 /
                                ((dVar168 + dVar123) * dVar161 + dVar124 +
                                 (dVar168 + dVar167) * dVar148 + (dVar131 + dVar167) * dVar180 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar42 + lVar34 * 5] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar42 + lVar34 * 3] * dVar182 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar68 + lVar42 + lVar34 * 6] * dVar228 +
                                local_278) +
                                (double)((uVar95 & 0x3fe0000000000000 | ~uVar95 & (ulong)dVar130) &
                                         uVar96 | ~uVar96 & (ulong)dVar130) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar195 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar42 + lVar34 * 7] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar42 + lVar34 * 3] * dVar229 +
                                local_280 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar44 + lVar42 + lVar34 * 7] * dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar63 + lVar42 + lVar34 * 6] * dVar109) +
                                (double)((uVar93 & 0x3fe0000000000000 | ~uVar93 & (ulong)dVar147) &
                                         uVar94 | ~uVar94 & (ulong)dVar147) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar42 + lVar34 * 7] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar42 + lVar34 * 6] * dVar182 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar42 + lVar34 * 5] * dVar200 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar68 + lVar42 + lVar34 * 3] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar68 + lVar42 + lVar34 * 6] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar68 + lVar42 + lVar34 * 7] * dVar223) +
                                (dVar110 /
                                ((dVar179 + dVar129) * dVar191 + (dVar235 + dVar179) * dVar146 +
                                 dVar110 + (dVar129 + dVar166) * dVar160 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar42 + lVar34 * 6] * dVar229 +
                                local_290 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar44 + lVar42 + lVar34 * 5] * dVar223 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar63 + lVar42 + lVar34 * 3] * dVar109) +
                                (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar145) &
                                         uVar154 | ~uVar154 & (ulong)dVar145) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar42 + lVar34 * 7] * dVar229 +
                                local_298 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar46 + lVar42 + lVar34 * 7] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar42 + lVar34 * 5] * dVar109 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar46 + lVar42 + lVar34 * 5] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar65 + lVar42 + lVar34 * 3] * dVar223) +
                                (dVar232 /
                                ((dVar114 + dVar178) * dVar122 +
                                 (dVar165 + dVar230) * dVar159 + (dVar114 + dVar165) * dVar128 +
                                 dVar232 + 1e-100)) *
                                ((double)local_2a0[lVar34 * 7] * dVar200 +
                                (double)local_2a0[lVar34 * 6] * dVar228 +
                                (double)local_2a0[lVar34 * 3] * dVar108 +
                                (double)local_2a0[lVar34 * 5] * dVar223) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar42 + lVar34 * 7] * dVar195 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar42 + lVar34 * 6] * dVar189 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar42 + lVar34 * 7] * dVar182 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar65 + lVar42 + lVar34 * 5] * dVar229 +
                                local_288 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar46 + lVar42 + lVar34 * 5] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar65 + lVar42 + lVar34 * 7] * dVar109 +
                                (double)local_950[lVar34 * 7] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar65 + lVar42 + lVar34 * 6] * dVar223) * 0.125);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar70 + lVar34 * 7]);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar71 + lVar34 * 7]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar71 + lVar34 * 7]);
                          p_Var69 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar71 + lVar34 * 2];
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar70 + lVar34 * 7]);
                          local_628 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar44 + lVar71 + lVar34 * 7]);
                          local_658 = ABS((double)p_Var69) /
                                      (dVar103 + dVar208 + local_628 + dVar187 + 1e-100);
                          uStack_650 = 0;
                          p_Var56 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar71 + lVar34 * 3];
                          local_618 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar44 + lVar71 + lVar34 * 7]);
                          uStack_610 = 0;
                          local_638 = ABS((double)p_Var56) /
                                      (dVar102 + local_618 + local_628 + dVar187 + 1e-100);
                          uStack_630 = 0;
                          p_Var67 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar71 + lVar34 * 6];
                          uStack_620 = 0;
                          local_648 = ABS((double)p_Var67) / (dVar187 + local_628 + 1e-100);
                          uStack_640 = 0;
                          dVar232 = dVar187 * (double)local_c70._vptr_BaseFab
                                                      [lVar82 + lVar63 + lVar71 + lVar34 * 8] *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar71 + lVar34 * 5]) /
                                     (dVar102 + dVar187 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar71 + lVar34 * 4]) /
                                     (dVar103 + dVar187 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar71 + lVar34]) /
                                     (ABS((double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar63 + lVar70 + lVar34 * 7]) + dVar103
                                      + dVar102 + dVar187 + 1e-100) + 1.0 + local_658 + local_638 +
                                    local_648);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar70 + lVar34 * 6]);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar71 + lVar34 * 6]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar70 + lVar34 * 6]);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar71 + lVar34 * 6]);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar70 + lVar34 * 3]) /
                                    (dVar187 + dVar108 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar71 + lVar34 * 3]) /
                                    (dVar103 + dVar228 + 1e-100);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar71 + lVar34 * 2]) /
                                    (dVar187 + dVar103 + 1e-100) + 1.0;
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar71 + lVar34 * 2]) /
                                    (dVar108 + dVar228 + 1e-100) + 1.0;
                          dVar228 = (dVar223 + dVar188) * dVar228;
                          dVar228 = dVar228 / ((dVar102 + dVar188) * dVar103 +
                                               (dVar109 + dVar223) * dVar108 +
                                               (dVar102 + dVar109) * dVar187 + dVar228 + 1e-100);
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar70 + lVar34 * 5]);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar71 + lVar34 * 5]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar70 + lVar34 * 5]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar71 + lVar34 * 5]);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar70 + lVar34 * 3]) /
                                    (dVar109 + dVar200 + 1e-100);
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar71 + lVar34 * 3]) /
                                    (dVar108 + dVar188 + 1e-100);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar71 + lVar34]) /
                                    (dVar109 + dVar108 + 1e-100) + 1.0;
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar71 + lVar34]) /
                                    (dVar200 + dVar188 + 1e-100) + 1.0;
                          dVar108 = (dVar230 + dVar102) * dVar108;
                          dVar188 = (dVar110 + dVar102) * dVar188;
                          dVar102 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar64 + lVar71 + lVar34 * 3]);
                          dVar102 = dVar102 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar64 + lVar70 + lVar34 * 3])
                                              + dVar102);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar64 + lVar71 + lVar34 * 3] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar64 + lVar70 + lVar34 * 3] == 0.0)
                          ;
                          dVar102 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar102
                                             ) & uVar154 | ~uVar154 & (ulong)dVar102);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar42 + lVar34 * 4]);
                          dVar223 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar42 + lVar34 * 4]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar42 + lVar34 * 4]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34 * 4]);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar217 + dVar189 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34 * 2]) /
                                    (dVar223 + dVar229 + 1e-100);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar42 + lVar34]) /
                                    (dVar217 + dVar223 + 1e-100) + 1.0;
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar42 + lVar34]) /
                                    (dVar189 + dVar229 + 1e-100) + 1.0;
                          dVar223 = (dVar111 + dVar103) * dVar223;
                          dVar229 = (dVar235 + dVar103) * dVar229;
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar42 + lVar34 * 2]);
                          dVar103 = dVar103 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar84 + lVar64 + lVar42 + lVar34 * 2])
                                              + dVar103);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar64 + lVar42 + lVar34 * 2] == 0.0)
                          ;
                          dVar103 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar103
                                             ) & uVar154 | ~uVar154 & (ulong)dVar103);
                          p_Var76 = local_c70._vptr_BaseFab[lVar62 + lVar63 + lVar42 + lVar34];
                          p_Var2 = local_c70._vptr_BaseFab[lVar62 + lVar44 + lVar42 + lVar34];
                          dVar200 = (dVar236 + dVar110) * dVar200 + (dVar230 + dVar236) * dVar109 +
                                    dVar108 + dVar188 + 1e-100;
                          dVar188 = dVar188 / dVar200;
                          dVar187 = (dVar187 + dVar235) * dVar189 + (dVar111 + dVar187) * dVar217 +
                                    dVar223 + dVar229 + 1e-100;
                          dVar229 = dVar229 / dVar187;
                          local_428 = ABS((double)p_Var2);
                          uStack_420 = 0;
                          local_438 = local_428 + ABS((double)p_Var76);
                          dVar109 = 0.5;
                          if ((double)p_Var76 != 0.0 || (double)p_Var2 != 0.0) {
                            dVar109 = ABS((double)p_Var76) / local_438;
                          }
                          uStack_430 = 0;
                          local_6d8 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34];
                          uStack_6d0 = 0;
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar53 + lVar34 * 7]) + dVar230;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar52 + lVar34 * 7]);
                          p_Var3 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 2];
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar182 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 7]);
                          uStack_a30 = 0;
                          dVar120 = ABS((double)p_Var3) /
                                    (dVar230 + dVar125 + dVar182 + dVar217 + 1e-100);
                          p_Var4 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar53 + lVar34 * 3];
                          uStack_5c0 = 0;
                          dVar114 = ABS((double)p_Var4) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar53 + lVar34 * 7]) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar44 + lVar53 + lVar34 * 7]) + dVar125
                                     + dVar230 + 1e-100);
                          uStack_5d0 = 0;
                          local_ca8 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar63 + lVar42 + lVar34 * 4] * dVar103;
                          local_cb0 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar63 + lVar53 + lVar34 * 7] * dVar103;
                          p_Var5 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar53 + lVar34 * 6];
                          local_678 = ABS((double)p_Var5) / (dVar230 + dVar125 + 1e-100);
                          uStack_670 = 0;
                          local_668 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 8]
                          ;
                          dVar112 = dVar230 * (double)local_668 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar53 + lVar34 * 5]) /
                                     (dVar189 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar52 + lVar34 * 4]) /
                                     (dVar217 + dVar230 + 1e-100) +
                                     ABS((double)local_6d8) /
                                     (ABS((double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar63 + lVar52 + lVar34 * 7]) + dVar189
                                      + dVar217 + 1e-100) + 1.0 + dVar120 + dVar114 + local_678);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 3]) /
                                    (dVar235 + dVar236 + 1e-100);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar189 + dVar110 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar235 + dVar189 + 1e-100) + 1.0;
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar236 + dVar110 + 1e-100) + 1.0;
                          dVar236 = (dVar111 + dVar230) * dVar236;
                          dVar236 = dVar236 / ((dVar217 + dVar111) * dVar235 + dVar236 +
                                               (dVar217 + dVar113) * dVar189 +
                                               (dVar230 + dVar113) * dVar110 + 1e-100);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar110 + dVar111 + 1e-100);
                          dVar168 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar230 + dVar113 + 1e-100);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34]) /
                                    (dVar110 + dVar230 + 1e-100) + 1.0;
                          dVar110 = (dVar189 + dVar217) * dVar110;
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34]) /
                                    (dVar111 + dVar113 + 1e-100) + 1.0;
                          dVar111 = (dVar217 + dVar235) * dVar111;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar64 + lVar53 + lVar34 * 3]);
                          dVar217 = dVar217 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar64 + lVar52 + lVar34 * 3])
                                              + dVar217);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar64 + lVar52 + lVar34 * 3] == 0.0);
                          dVar115 = 0.5;
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar64 + lVar53 + lVar34 * 3] == 0.0)
                          ;
                          dVar217 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar217
                                             ) & uVar154 | ~uVar154 & (ulong)dVar217);
                          local_6c8 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar71];
                          local_8f8 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar63 + lVar71 + lVar34 * 4] * dVar228;
                          local_8f0 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar63 + lVar57 + lVar34 * 7] * dVar228;
                          local_688 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar57 + lVar34 * 3]
                          ;
                          local_900 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar71 + lVar34 * 4] * dVar188;
                          local_8e8 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar57 + lVar34 * 7] * dVar188;
                          local_698 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar57 + lVar34 * 6]
                          ;
                          local_6a8 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar42];
                          local_c98 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar42 + lVar34 * 2]
                          ;
                          local_6f8 = (double)p_Var67 * dVar109 +
                                      (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar63 + lVar71 + lVar34 * 5] * dVar103 +
                                      (double)p_Var56 * dVar229 +
                                      (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar63 + lVar71 + lVar34 * 4] * dVar102 +
                                      (double)p_Var69 * dVar188 +
                                      (double)local_6c8 * dVar232 +
                                      (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar63 + lVar71 + lVar34] * dVar228 +
                                      (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar63 + lVar71 + lVar34 * 7];
                          uStack_6f0 = 0;
                          local_6b8 = dVar110 + dVar111 + (dVar189 + dVar168) * dVar230 +
                                      (dVar235 + dVar168) * dVar113 + 1e-100;
                          uStack_6b0 = 0;
                          dVar111 = dVar111 / local_6b8;
                          local_938 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar71 + lVar34] * dVar232;
                          local_940 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar71 + lVar34 * 5] * dVar229;
                          local_948 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar42 + lVar34 * 4] * dVar229;
                          local_918 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar57 + lVar34 * 5] * dVar232;
                          local_920 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar42 + lVar34] * dVar229;
                          local_928 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar42 + lVar34 * 4] * dVar109;
                          local_930 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar42 + lVar34 * 5] * dVar112;
                          local_910 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar63 + lVar42 + lVar34 * 5] * dVar236;
                          local_6e8 = dVar109 * (double)local_c70._vptr_BaseFab
                                                        [lVar82 + lVar65 + lVar53 + lVar34 * 7];
                          local_908 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar53 + lVar34 * 5] * dVar229;
                          local_408 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar52 + lVar34] * dVar112;
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 7]);
                          local_ca0 = (double)local_8d0[lVar88 + lVar57 + lVar34 * 8] * dVar189;
                          local_418 = local_c70._vptr_BaseFab
                                      [lVar77 + lVar65 + local_8d8 + lVar34 * 3];
                          uStack_410 = 0;
                          local_7a8 = local_c70._vptr_BaseFab
                                      [lVar77 + lVar65 + local_8d8 + lVar34 * 6];
                          uStack_7a0 = 0;
                          local_798 = local_8d0[lVar65 + local_8d8 + lVar34 * 6];
                          uStack_790 = 0;
                          local_788 = local_8d0[lVar65 + local_8d8 + lVar34 * 7];
                          uStack_780 = 0;
                          local_3d8 = local_c70._vptr_BaseFab
                                      [lVar77 + lVar88 + local_8d8 + lVar34 * 5];
                          uStack_3d0 = 0;
                          local_768 = local_c70._vptr_BaseFab
                                      [lVar77 + lVar88 + local_8d8 + lVar34 * 7];
                          uStack_760 = 0;
                          local_728 = local_8d0[lVar88 + lVar57 + lVar34 * 3];
                          uStack_720 = 0;
                          local_748 = local_8d0[lVar88 + lVar57 + lVar34 * 7];
                          uStack_740 = 0;
                          local_7c8 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar57 + lVar34 * 6]
                          ;
                          uStack_7c0 = 0;
                          local_708 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar57 + lVar34 * 4]
                          ;
                          uStack_700 = 0;
                          local_7b8 = local_8d0[lVar65 + lVar57 + lVar34 * 6];
                          uStack_7b0 = 0;
                          local_7d8 = local_8d0[lVar65 + lVar57 + lVar34 * 3];
                          uStack_7d0 = 0;
                          local_778 = local_8d0[lVar65 + lVar57 + lVar34];
                          uStack_770 = 0;
                          local_3e8 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar57 + lVar34 * 5]
                          ;
                          uStack_3e0 = 0;
                          local_3f8 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar57 + lVar34 * 3]
                          ;
                          uStack_3f0 = 0;
                          local_758 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar57 + lVar34 * 2]
                          ;
                          uStack_750 = 0;
                          local_738 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar57 + lVar34 * 7]
                          ;
                          uStack_730 = 0;
                          local_718 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar57 + lVar34 * 6]
                          ;
                          uStack_710 = 0;
                          p_Var6 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar42 + lVar34];
                          if ((double)p_Var76 != 0.0 || (double)p_Var2 != 0.0) {
                            dVar115 = local_428 / local_438;
                          }
                          local_cb8 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar71 + lVar34 * 4] * dVar232 +
                                      (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar71 + lVar34 * 7] * dVar229;
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 3]);
                          dVar235 = dVar235 / (ABS((double)local_418) + dVar235);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar57 + lVar34 * 3] == 0.0);
                          dVar123 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 5]);
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 5]);
                          dVar143 = ABS((double)local_3d8);
                          dVar142 = ABS((double)local_3e8);
                          dVar133 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + local_8d8 + lVar34 * 3]) /
                                    (dVar123 + dVar143 + 1e-100);
                          dVar140 = ABS((double)local_3f8) / (dVar128 + dVar142 + 1e-100);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34]) /
                                    (dVar123 + dVar128 + 1e-100) + 1.0;
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar57 + lVar34]) /
                                    (dVar143 + dVar142 + 1e-100) + 1.0;
                          dVar230 = (dVar113 + dVar140) * dVar128;
                          dVar124 = ABS((double)local_7a8);
                          dVar131 = ABS((double)local_7c8);
                          dVar168 = ABS((double)local_798);
                          dVar129 = ABS((double)local_7b8);
                          dVar141 = ABS((double)local_8d0[lVar65 + local_8d8 + lVar34 * 3]) /
                                    (dVar124 + dVar168 + 1e-100);
                          dVar138 = ABS((double)local_7d8) / (dVar131 + dVar129 + 1e-100);
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar124 + dVar131 + 1e-100) + 1.0;
                          dVar144 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 2]) /
                                    (dVar168 + dVar129 + 1e-100) + 1.0;
                          dVar131 = (dVar132 + dVar138) * dVar131;
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + local_8d8 + lVar34 * 7]);
                          dVar127 = ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 7]);
                          dVar139 = ABS((double)local_738) + dVar189;
                          dVar121 = ABS((double)p_Var6);
                          dVar122 = dVar121 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar88 + lVar42 + lVar34]) +
                                              dVar121);
                          if (((double)p_Var6 == 0.0) && (!NAN((double)p_Var6))) {
                            uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                       [lVar77 + lVar88 + lVar42 + lVar34] == 0.0);
                            dVar122 = (double)(uVar154 & 0x3fe0000000000000 |
                                              ~uVar154 & (ulong)dVar122);
                          }
                          dVar162 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar162 = dVar162 / (ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar162);
                          uVar154 = -(ulong)((double)local_8d0[lVar65 + lVar42 + lVar34 * 2] == 0.0)
                          ;
                          uVar93 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          dVar214 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar204 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 4]);
                          dVar180 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar167 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 4]);
                          dVar163 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar214 + dVar180 + 1e-100);
                          dVar183 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar204 + dVar167 + 1e-100);
                          dVar194 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34]) /
                                    (dVar214 + dVar204 + 1e-100) + 1.0;
                          dVar155 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34]) /
                                    (dVar180 + dVar167 + 1e-100) + 1.0;
                          dVar147 = (dVar194 + dVar163) * dVar214;
                          dVar164 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 3]);
                          dVar164 = dVar164 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + lVar52 + lVar34 * 3])
                                              + dVar164);
                          uVar94 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar52 + lVar34 * 3] == 0.0);
                          uVar95 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 3] == 0.0);
                          dVar215 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar209 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar181 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 5]);
                          dVar169 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 5]);
                          dVar165 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar215 + dVar181 + 1e-100);
                          dVar184 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 3]) /
                                    (dVar209 + dVar169 + 1e-100);
                          dVar195 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34]) /
                                    (dVar215 + dVar209 + 1e-100) + 1.0;
                          dVar156 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34]) /
                                    (dVar181 + dVar169 + 1e-100) + 1.0;
                          dVar148 = (dVar195 + dVar165) * dVar215;
                          dVar146 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar170 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar210 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 6]);
                          dVar196 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 6]);
                          dVar190 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar146 + dVar210 + 1e-100);
                          dVar216 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar170 + dVar196 + 1e-100);
                          dVar157 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar146 + dVar170 + 1e-100) + 1.0;
                          dVar146 = (dVar157 + dVar190) * dVar146;
                          dVar166 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar210 + dVar196 + 1e-100) + 1.0;
                          dVar191 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar197 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]);
                          dVar211 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar158 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 7]) + dVar191;
                          dVar161 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar70 + lVar34 * 6]);
                          dVar149 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar71 + lVar34 * 6]);
                          dVar177 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar70 + lVar34 * 6]);
                          dVar160 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar71 + lVar34 * 6]);
                          dVar178 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar70 + lVar34 * 3]) /
                                    (dVar161 + dVar177 + 1e-100);
                          dVar179 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar71 + lVar34 * 3]) /
                                    (dVar149 + dVar160 + 1e-100);
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar71 + lVar34 * 2]) /
                                    (dVar161 + dVar149 + 1e-100) + 1.0;
                          dVar159 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar71 + lVar34 * 2]) /
                                    (dVar177 + dVar160 + 1e-100) + 1.0;
                          dVar160 = (dVar159 + dVar179) * dVar160;
                          dVar160 = dVar160 / ((dVar145 + dVar179) * dVar149 +
                                               (dVar178 + dVar159) * dVar177 +
                                               (dVar145 + dVar178) * dVar161 + dVar160 + 1e-100);
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar71 + lVar34 * 3]);
                          dVar145 = dVar145 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar65 + lVar70 + lVar34 * 3])
                                              + dVar145);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar71 + lVar34 * 3] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar70 + lVar34 * 3] == 0.0);
                          dVar145 = (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar145
                                             ) & uVar97 | ~uVar97 & (ulong)dVar145);
                          dVar224 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar63 + lVar71 + lVar34 * 8] * local_628 *
                                    (local_648 +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar71 + lVar34 * 5]) /
                                    (local_618 + local_628 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar71 + lVar34 * 4]) /
                                    (dVar208 + local_628 + 1e-100) +
                                    local_638 +
                                    local_658 +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar71 + lVar34]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar44 + lVar70 + lVar34 * 7]) + dVar208
                                     + local_618 + local_628 + 1e-100) + 1.0);
                          dVar108 = dVar108 / dVar200;
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar200 = dVar200 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar84 + lVar65 + lVar42 + lVar34 * 2])
                                              + dVar200);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          dVar200 = (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar200
                                             ) & uVar97 | ~uVar97 & (ulong)dVar200);
                          dVar223 = dVar223 / dVar187;
                          dVar159 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar212 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar161 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar177 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar159 + dVar212 + 1e-100);
                          dVar178 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar208 + dVar161 + 1e-100);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar159 + dVar208 + 1e-100) + 1.0;
                          dVar149 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar212 + dVar161 + 1e-100) + 1.0;
                          dVar212 = (dVar177 + dVar149) * dVar212;
                          dVar212 = dVar212 / ((dVar187 + dVar177) * dVar159 + dVar212 +
                                               (dVar187 + dVar178) * dVar208 +
                                               (dVar149 + dVar178) * dVar161 + 1e-100);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar53 + lVar34 * 7]) + dVar125;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar53 + lVar34 * 3]);
                          dVar187 = dVar187 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar65 + lVar52 + lVar34 * 3])
                                              + dVar187);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar52 + lVar34 * 3] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar53 + lVar34 * 3] == 0.0);
                          dVar187 = (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar187
                                             ) & uVar97 | ~uVar97 & (ulong)dVar187);
                          dVar149 = (double)local_668 * dVar125 *
                                    (local_678 +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar53 + lVar34 * 5]) /
                                    (dVar208 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 4]) /
                                    (dVar182 + dVar125 + 1e-100) +
                                    dVar114 + dVar120 + ABS((double)local_c70._vptr_BaseFab
                                                                    [lVar82 + lVar44 + lVar52 + 
                                                  lVar34]) /
                                                  (ABS((double)local_c70._vptr_BaseFab
                                                               [lVar84 + lVar44 + lVar52 + lVar34 * 
                                                  7]) + dVar208 + dVar182 + 1e-100) + 1.0);
                          dVar110 = dVar110 / local_6b8;
                          lVar75 = (long)(int)((int)lVar75 + uVar40);
                          dVar177 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + local_8d8 + lVar34 * 5]);
                          dVar120 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar57 + lVar34 * 5]);
                          dVar201 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + local_8d8 + lVar34 * 3]) /
                                    (dVar123 + dVar177 + 1e-100);
                          dVar159 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar57 + lVar34 * 3]) /
                                    (dVar128 + dVar120 + 1e-100);
                          dVar192 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar57 + lVar34]) /
                                    (dVar177 + dVar120 + 1e-100) + 1.0;
                          dVar120 = (dVar192 + dVar159) * dVar120;
                          dVar202 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar57 + lVar34 * 3]);
                          dVar202 = dVar202 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar64 + local_8d8 + lVar34 * 3
                                                           ]) + dVar202);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + lVar57 + lVar34 * 3] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + local_8d8 + lVar34 * 3] ==
                                           0.0);
                          dVar193 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + local_8d8 + lVar34 * 7]);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar57 + lVar34 * 7]);
                          dVar178 = ABS((double)local_8d0[lVar75 + lVar57 + lVar34 * 7]);
                          dVar203 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + local_8d8 + lVar34 * 6]);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar57 + lVar34 * 6]);
                          dVar219 = ABS((double)local_8d0[lVar64 + local_8d8 + lVar34 * 6]);
                          dVar213 = ABS((double)local_8d0[lVar64 + lVar57 + lVar34 * 6]);
                          dVar218 = ABS((double)local_8d0[lVar64 + local_8d8 + lVar34 * 3]) /
                                    (dVar203 + dVar219 + 1e-100);
                          dVar161 = ABS((double)local_8d0[lVar64 + lVar57 + lVar34 * 3]) /
                                    (dVar114 + dVar213 + 1e-100);
                          dVar182 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar57 + lVar34 * 2]) /
                                    (dVar203 + dVar114 + 1e-100) + 1.0;
                          dVar179 = ABS((double)local_8d0[lVar64 + lVar57 + lVar34 * 2]) /
                                    (dVar219 + dVar213 + 1e-100) + 1.0;
                          dVar114 = (dVar182 + dVar161) * dVar114;
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34]);
                          dVar208 = dVar208 / (dVar121 + dVar208);
                          if (((double)p_Var6 == 0.0) && (!NAN((double)p_Var6))) {
                            uVar98 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar77 + lVar75 + lVar42 + lVar34] == 0.0);
                            dVar208 = (double)(uVar98 & 0x3fe0000000000000 |
                                              ~uVar98 & (ulong)dVar208);
                          }
                          dVar227 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 4]);
                          dVar171 = ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 4]);
                          dVar226 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar214 + dVar227 + 1e-100);
                          dVar220 = ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar204 + dVar171 + 1e-100);
                          dVar121 = ABS((double)local_8d0[lVar75 + lVar42 + lVar34]) /
                                    (dVar227 + dVar171 + 1e-100) + 1.0;
                          dVar227 = (dVar226 + dVar121) * dVar227;
                          dVar172 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar42 + lVar34 * 2]);
                          dVar172 = dVar172 / (ABS((double)local_8d0[lVar64 + lVar42 + lVar34 * 2])
                                              + dVar172);
                          uVar98 = -(ulong)((double)local_8d0[lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          uVar99 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          dVar233 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 5]);
                          dVar185 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34 * 5]);
                          dVar231 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 3]) /
                                    (dVar215 + dVar233 + 1e-100);
                          dVar134 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34 * 3]) /
                                    (dVar209 + dVar185 + 1e-100);
                          dVar173 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34]) /
                                    (dVar233 + dVar185 + 1e-100) + 1.0;
                          dVar233 = (dVar231 + dVar173) * dVar233;
                          dVar174 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar42 + lVar34 * 3]);
                          dVar174 = dVar174 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar64 + lVar52 + lVar34 * 3])
                                              + dVar174);
                          uVar100 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar64 + lVar42 + lVar34 * 3] == 0.0)
                          ;
                          uVar101 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar64 + lVar52 + lVar34 * 3] == 0.0)
                          ;
                          dVar150 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 7]);
                          dVar234 = dVar150 + ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 7]);
                          dVar175 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34 * 7]);
                          dVar205 = dVar191 + dVar150;
                          dVar176 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar42 + lVar34 * 6]);
                          dVar135 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar206 = ABS((double)local_8d0[lVar64 + lVar42 + lVar34 * 6]);
                          dVar198 = ABS((double)local_8d0[lVar64 + lVar52 + lVar34 * 6]);
                          dVar186 = ABS((double)local_8d0[lVar64 + lVar42 + lVar34 * 3]) /
                                    (dVar176 + dVar206 + 1e-100);
                          dVar221 = ABS((double)local_8d0[lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar135 + dVar198 + 1e-100);
                          dVar225 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar176 + dVar135 + 1e-100) + 1.0;
                          dVar176 = (dVar225 + dVar186) * dVar176;
                          dVar151 = ABS((double)local_8d0[lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar206 + dVar198 + 1e-100) + 1.0;
                          local_2c0[(long)local_d38] =
                               (_func_int *)
                               ((((double)local_8d0[lVar88 + lVar52 + lVar34 * 8] * dVar191 *
                                  (ABS((double)local_c70._vptr_BaseFab
                                               [lVar77 + lVar88 + lVar42 + lVar34 * 6]) /
                                   (dVar158 + 1e-100) +
                                  ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 5]) /
                                  (dVar191 + dVar197 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar52 + lVar34 * 4]) /
                                  (dVar191 + dVar211 + 1e-100) +
                                  ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 3]) /
                                  (ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 7]) +
                                   dVar197 + dVar158 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar88 + lVar52 + lVar34 * 2]) /
                                  (ABS((double)local_c70._vptr_BaseFab
                                               [lVar77 + lVar88 + lVar52 + lVar34 * 7]) +
                                   dVar211 + dVar158 + 1e-100) +
                                  ABS((double)local_8d0[lVar65 + lVar52 + lVar34]) /
                                  (ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 7]) +
                                   dVar191 + dVar197 + dVar211 + 1e-100) + 1.0) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar63 + lVar52 + lVar34 * 4] * dVar217 +
                                  dVar111 * (double)p_Var3 +
                                  (double)local_6d8 * dVar236 +
                                  dVar112 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52] +
                                  (double)p_Var4 * dVar229 +
                                  dVar103 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar53 + lVar34 * 5] +
                                  (double)p_Var5 * dVar109 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar63 + lVar53 + lVar34 * 7]) +
                                 (dVar146 /
                                 ((dVar190 + dVar166) * dVar210 + dVar146 +
                                  (dVar157 + dVar216) * dVar170 + (dVar166 + dVar216) * dVar196 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar65 + lVar52 + lVar34 * 4] * dVar111 +
                                 local_408 + local_908 + local_6e8) +
                                 (dVar148 /
                                 ((dVar165 + dVar156) * dVar181 + dVar148 +
                                  (dVar195 + dVar184) * dVar209 + (dVar156 + dVar184) * dVar169 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar52 + lVar34 * 4] * dVar236 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar112 +
                                 dVar229 * (double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar63 + lVar53 + lVar34 * 6] +
                                 local_cb0) +
                                 (double)((uVar94 & 0x3fe0000000000000 | ~uVar94 & (ulong)dVar164) &
                                          uVar95 | ~uVar95 & (ulong)dVar164) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar53 + lVar34 * 7] * dVar229 +
                                 dVar112 * (double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar65 + lVar52 + lVar34 * 4]) +
                                 (dVar147 /
                                 ((dVar163 + dVar155) * dVar180 + dVar147 +
                                  (dVar194 + dVar183) * dVar204 + (dVar155 + dVar183) * dVar167 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar63 + lVar42 + lVar34 * 7] * dVar217 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 6] * dVar111 +
                                 local_910 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar112 +
                                 (double)local_c98 * dVar109 +
                                 (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar42 + lVar34]
                                 * dVar103 +
                                 (double)local_6a8 * dVar229 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar57 + lVar34 * 7] * dVar102 +
                                 dVar188 * (double)local_698 +
                                 (double)local_688 * dVar232 +
                                 dVar228 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar63 + lVar57 + lVar34 * 5] +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 4]) +
                                 (double)((uVar154 & 0x3fe0000000000000 | ~uVar154 & (ulong)dVar162)
                                          & uVar93 | ~uVar93 & (ulong)dVar162) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar65 + lVar42 + lVar34 * 7] * dVar111 +
                                 local_930 + local_928 + local_920 + local_918 + local_8e8) +
                                 dVar122 * ((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar63 + lVar42 + lVar34 * 7] *
                                            dVar236 +
                                           (double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar112
                                           + local_ca8 +
                                             (double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar63 + lVar42 + lVar34 * 2] *
                                             dVar229 + dVar232 * (double)local_c70._vptr_BaseFab
                                                                         [lVar77 + lVar63 + lVar57 +
                                                                                            lVar34 *
                                                                                            6] +
                                                       local_8f0) +
                                 local_ca0 *
                                 (ABS((double)local_718) / (dVar139 + 1e-100) +
                                 ABS((double)local_8d0[lVar65 + lVar57 + lVar34 * 5]) /
                                 (dVar189 + dVar127 + 1e-100) +
                                 ABS((double)local_708) / (dVar126 + dVar189 + 1e-100) +
                                 ABS((double)local_728) /
                                 (ABS((double)local_748) + dVar127 + dVar139 + 1e-100) +
                                 ABS((double)local_758) /
                                 (ABS((double)local_768) + dVar126 + dVar189 +
                                  ABS((double)local_738) + 1e-100) +
                                 ABS((double)local_778) /
                                 (ABS((double)local_788) + dVar126 + dVar189 + dVar127 + 1e-100) +
                                 1.0) * local_6f8 +
                                 (dVar131 /
                                 ((dVar141 + dVar144) * dVar168 + (dVar132 + dVar141) * dVar124 +
                                  dVar131 + (dVar144 + dVar138) * dVar129 + 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar65 + lVar71 + lVar34 * 7] * dVar109 +
                                 local_940 + local_938 + local_900) +
                                 (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar235) &
                                          -(ulong)((double)local_418 == 0.0) |
                                         ~-(ulong)((double)local_418 == 0.0) & (ulong)dVar235) *
                                 local_cb8 +
                                 (dVar230 /
                                 ((dVar133 + dVar130) * dVar143 + (dVar113 + dVar133) * dVar123 +
                                  dVar230 + (dVar130 + dVar140) * dVar142 + 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar71 + lVar34 * 7] * dVar103 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar71 + lVar34 * 6] * dVar229 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar71 + lVar34 * 2] * dVar232 +
                                 local_8f8) +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar42 + lVar34 * 7] * dVar112 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar57 + lVar34 * 7] * dVar232 +
                                 local_948) * 0.125 +
                                ((dVar176 /
                                 ((dVar186 + dVar151) * dVar206 + dVar176 +
                                  (dVar225 + dVar221) * dVar135 + (dVar151 + dVar221) * dVar198 +
                                 1e-100)) *
                                 (dVar110 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar75 + lVar52 + lVar34 * 4] +
                                 dVar149 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar75 + lVar52 + lVar34] +
                                 dVar223 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar75 + lVar53 + lVar34 * 5] +
                                 dVar115 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar75 + lVar53 + lVar34 * 7]) +
                                (double)local_8d0[lVar75 + lVar52 + lVar34 * 8] * dVar150 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar75 + lVar42 + lVar34 * 6]) /
                                 (dVar205 + 1e-100) +
                                ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 5]) /
                                (dVar234 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar75 + lVar52 + lVar34 * 4]) /
                                (dVar175 + dVar150 + 1e-100) +
                                ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 3]) /
                                (dVar197 + dVar205 +
                                 ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 7]) + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar75 + lVar52 + lVar34 * 2]) /
                                (dVar211 + dVar205 + dVar175 + 1e-100) +
                                ABS((double)local_8d0[lVar75 + lVar52 + lVar34]) /
                                (ABS((double)local_8d0[lVar75 + lVar52 + lVar34 * 7]) +
                                 dVar234 + dVar175 + 1e-100) + 1.0) *
                                ((double)p_Var3 * dVar110 +
                                dVar187 * (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar44 + lVar52 + lVar34 * 4] +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52] * dVar149
                                + dVar212 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar44 + lVar52 + lVar34] +
                                  (double)p_Var5 * dVar115 +
                                  dVar200 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar44 + lVar53 + lVar34 * 5] +
                                  (double)p_Var4 * dVar223 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar44 + lVar53 + lVar34 * 7]) +
                                (double)((uVar101 & 0x3fe0000000000000 | ~uVar101 & (ulong)dVar174)
                                         & uVar100 | ~uVar100 & (ulong)dVar174) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar75 + lVar53 + lVar34 * 7] * dVar223 +
                                dVar149 * (double)local_c70._vptr_BaseFab
                                                  [lVar77 + lVar75 + lVar52 + lVar34 * 4]) +
                                (dVar233 /
                                ((dVar195 + dVar231) * dVar215 + dVar233 +
                                 (dVar195 + dVar134) * dVar209 + (dVar173 + dVar134) * dVar185 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar149 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 4] * dVar212 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar53 + lVar34 * 7] * dVar200 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar53 + lVar34 * 6] * dVar223) +
                                (double)((uVar98 & 0x3fe0000000000000 | ~uVar98 & (ulong)dVar172) &
                                         uVar99 | ~uVar99 & (ulong)dVar172) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar75 + lVar42 + lVar34 * 7] * dVar110 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar75 + lVar42 + lVar34 * 5] * dVar149 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar75 + lVar42 + lVar34 * 4] * dVar115 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar75 + lVar42 + lVar34] *
                                dVar223 + dVar224 * (double)local_c70._vptr_BaseFab
                                                            [lVar82 + lVar75 + lVar57 + lVar34 * 5]
                                          + dVar108 * (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar75 + lVar57 + lVar34 * 7
                                                              ]) +
                                (dVar227 /
                                ((dVar194 + dVar226) * dVar214 + dVar227 +
                                 (dVar194 + dVar220) * dVar204 + (dVar121 + dVar220) * dVar171 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 6] * dVar110 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 7] * dVar187 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar149 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 5] * dVar212 +
                                (double)local_c98 * dVar115 +
                                (double)local_6a8 * dVar223 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar42 + lVar34] *
                                dVar200 + (double)local_698 * dVar108 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar44 + lVar57 + lVar34 * 7] * dVar145
                                          + dVar160 * (double)local_c70._vptr_BaseFab
                                                              [lVar82 + lVar44 + lVar57 + lVar34 * 5
                                                              ] + (double)local_688 * dVar224 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 4]) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar75 + lVar42 + lVar34 * 7] * dVar149 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar75 + lVar57 + lVar34 * 7] * dVar224 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar75 + lVar42 + lVar34 * 4] * dVar223 +
                                dVar208 * ((double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar149
                                          + (double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar44 + lVar42 + lVar34 * 7] *
                                            dVar212 + (double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar63 + lVar42 + lVar34 * 2
                                                              ] * dVar223 +
                                                      (double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar44 + lVar42 + lVar34 * 4
                                                              ] * dVar200 +
                                                      (double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar44 + lVar57 + lVar34 * 7
                                                              ] * dVar160 +
                                                      (double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar63 + lVar57 + lVar34 * 6
                                                              ] * dVar224) +
                                (dVar114 /
                                ((dVar218 + dVar179) * dVar219 + (dVar182 + dVar218) * dVar203 +
                                 dVar114 + (dVar179 + dVar161) * dVar213 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar75 + lVar71 + lVar34 * 7] * dVar115 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar75 + lVar71 + lVar34 * 5] * dVar223 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar75 + lVar71 + lVar34] *
                                dVar224 + (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar75 + lVar71 + lVar34 * 4] * dVar108)
                                + (double)local_8d0[lVar75 + lVar57 + lVar34 * 8] * dVar125 *
                                  (ABS((double)local_c70._vptr_BaseFab
                                               [lVar77 + lVar75 + lVar57 + lVar34 * 6]) /
                                   (dVar189 + dVar125 + 1e-100) +
                                  ABS((double)local_8d0[lVar75 + lVar57 + lVar34 * 5]) /
                                  (dVar178 + dVar125 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar75 + lVar57 + lVar34 * 4]) /
                                  (dVar193 + dVar125 + 1e-100) +
                                  ABS((double)local_8d0[lVar75 + lVar57 + lVar34 * 3]) /
                                  (dVar127 + dVar189 + dVar125 + dVar178 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar75 + lVar57 + lVar34 * 2]) /
                                  (dVar126 + dVar193 + dVar189 + dVar125 + 1e-100) +
                                  ABS((double)local_8d0[lVar75 + lVar57 + lVar34]) /
                                  (ABS((double)local_8d0[lVar75 + local_8d8 + lVar34 * 7]) + dVar193
                                   + dVar125 + dVar178 + 1e-100) + 1.0) *
                                  ((double)p_Var67 * dVar115 +
                                  (double)p_Var56 * dVar223 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar44 + lVar71 + lVar34 * 5] * dVar200 +
                                  (double)p_Var69 * dVar108 +
                                  dVar145 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar44 + lVar71 + lVar34 * 4] +
                                  (double)local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar71 + lVar34]
                                  * dVar160 + (double)local_6c8 * dVar224 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar44 + lVar71 + lVar34 * 7]) +
                                  (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar202)
                                           & uVar97 | ~uVar97 & (ulong)dVar202) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar77 + lVar75 + lVar71 + lVar34 * 4] * dVar224 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar75 + lVar71 + lVar34 * 7] * dVar223) +
                                  (dVar120 /
                                  ((dVar113 + dVar159) * dVar128 +
                                   (dVar201 + dVar192) * dVar177 + (dVar113 + dVar201) * dVar123 +
                                   dVar120 + 1e-100)) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar77 + lVar63 + lVar71 + lVar34 * 6] * dVar223 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar44 + lVar71 + lVar34 * 7] * dVar200 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar44 + lVar71 + lVar34 * 4] * dVar160 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar71 + lVar34 * 2] * dVar224)) *
                                0.125) * 0.5);
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34 * 3];
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 3]);
                          dVar103 = ABS((double)p_Var69);
                          dVar187 = dVar187 / (dVar187 + dVar103);
                          p_Var56 = local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52 + lVar34 * 2];
                          p_Var67 = local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52 + lVar34 * 3];
                          p_Var76 = local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52 + lVar34 * 6];
                          p_Var2 = local_c70._vptr_BaseFab[lVar77 + lVar64 + lVar52 + lVar34 * 3];
                          p_Var3 = local_c70._vptr_BaseFab[lVar77 + lVar44 + lVar86 + lVar34];
                          p_Var4 = local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar86 + lVar34];
                          dVar102 = dVar187;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            dVar102 = 0.5;
                          }
                          dVar103 = dVar103 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + lVar53 + lVar34 * 3])
                                              + dVar103);
                          dVar108 = dVar103;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            dVar108 = 0.5;
                          }
                          dVar223 = ABS((double)p_Var3) + ABS((double)p_Var4);
                          dVar109 = 0.5;
                          if ((double)p_Var4 != 0.0 || (double)p_Var3 != 0.0) {
                            dVar109 = ABS((double)p_Var4) / dVar223;
                          }
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar42 + lVar34];
                          dVar228 = 0.5;
                          if ((double)p_Var4 != 0.0 || (double)p_Var3 != 0.0) {
                            dVar228 = ABS((double)p_Var3) / dVar223;
                          }
                          dVar188 = ABS((double)p_Var69);
                          dVar223 = dVar188 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar88 + lVar42 + lVar34]) +
                                              dVar188);
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar77 + lVar88 + lVar42 + lVar34] == 0.0);
                            dVar223 = (double)(uVar31 & 0x3fe0000000000000 |
                                              ~uVar31 & (ulong)dVar223);
                          }
                          local_11d8 = ABS((double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar75 + lVar42 + lVar34]);
                          local_11d8 = local_11d8 / (dVar188 + local_11d8);
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar77 + lVar75 + lVar42 + lVar34] == 0.0);
                            local_11d8 = (double)(uVar31 & 0x3fe0000000000000 |
                                                 ~uVar31 & (ulong)local_11d8);
                          }
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar188 = ABS((double)local_490[lVar63 + lVar52 + lVar34 * 7]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar52 + lVar34 * 7]);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar182 = ABS((double)p_Var56) /
                                    (dVar200 + dVar235 + dVar112 + dVar217 + 1e-100);
                          dVar110 = ABS((double)local_490[lVar44 + lVar52 + lVar34 * 7]);
                          dVar113 = ABS((double)p_Var67) /
                                    (dVar188 + dVar110 + dVar112 + dVar217 + 1e-100);
                          dVar230 = ABS((double)p_Var76) / (dVar217 + dVar112 + 1e-100);
                          dVar236 = dVar217 * (double)local_c70._vptr_BaseFab
                                                      [lVar81 + lVar63 + lVar52 + lVar34 * 8] *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar63 + lVar52 + lVar34 * 5]) /
                                     (dVar188 + dVar217 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar63 + lVar52 + lVar34 * 4]) /
                                     (dVar200 + dVar217 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar81 + lVar63 + lVar52 + lVar34]) /
                                     (ABS((double)local_490[lVar63 + lVar53 + lVar34 * 7]) + dVar200
                                      + dVar188 + dVar217 + 1e-100) + 1.0 + dVar182 + dVar113 +
                                    dVar230);
                          dVar232 = ABS((double)local_490[lVar64 + lVar53 + lVar34 * 6]);
                          dVar200 = ABS((double)local_490[lVar64 + lVar52 + lVar34 * 6]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar53 + lVar34 * 3]) /
                                    (dVar232 + dVar189 + 1e-100);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar200 + dVar229 + 1e-100);
                          dVar217 = ABS((double)local_490[lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar232 + dVar200 + 1e-100) + 1.0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar189 + dVar229 + 1e-100) + 1.0;
                          dVar229 = (dVar188 + dVar111) * dVar229;
                          dVar229 = dVar229 / ((dVar217 + dVar111) * dVar200 +
                                               (dVar208 + dVar188) * dVar189 +
                                               (dVar217 + dVar208) * dVar232 + dVar229 + 1e-100);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar125 + dVar111 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar208 + dVar232 + 1e-100);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34]) /
                                    (dVar125 + dVar208 + 1e-100) + 1.0;
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34]) /
                                    (dVar111 + dVar232 + 1e-100) + 1.0;
                          dVar208 = (dVar200 + dVar217) * dVar208;
                          dVar232 = (dVar189 + dVar217) * dVar232;
                          dVar189 = (dVar188 + dVar189) * dVar111 + (dVar200 + dVar188) * dVar125 +
                                    dVar208 + dVar232 + 1e-100;
                          dVar232 = dVar232 / dVar189;
                          dVar217 = ABS((double)p_Var2);
                          dVar200 = dVar217 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar64 + lVar53 + lVar34 * 3])
                                              + dVar217);
                          dVar188 = dVar200;
                          if (((double)p_Var2 == 0.0) && (!NAN((double)p_Var2))) {
                            dVar188 = 0.5;
                          }
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + lVar53 + lVar34 * 3] == 0.0);
                          dVar130 = (double)(~uVar31 & (ulong)dVar200 | (ulong)dVar188 & uVar31);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 3]) /
                                    (dVar200 + dVar115 + 1e-100);
                          dVar168 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar125 + dVar111 + 1e-100);
                          dVar120 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar200 + dVar125 + 1e-100) + 1.0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar115 + dVar111 + 1e-100) + 1.0;
                          dVar125 = (dVar120 + dVar168) * dVar125;
                          dVar125 = dVar125 / ((dVar114 + dVar188) * dVar115 +
                                               (dVar120 + dVar114) * dVar200 + dVar125 +
                                               (dVar188 + dVar168) * dVar111 + 1e-100);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar168 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar52 + lVar34 * 7]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar52 + lVar34 * 7]);
                          p_Var69 = local_c70._vptr_BaseFab[lVar84 + lVar63 + lVar52 + lVar34 * 2];
                          dVar144 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar170 = ABS((double)p_Var69) /
                                    (dVar111 + dVar144 + dVar145 + dVar168 + 1e-100);
                          p_Var3 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 3];
                          dVar161 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar177 = ABS((double)p_Var3) /
                                    (dVar168 + dVar145 + dVar161 + dVar200 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar86 + lVar34 * 2]);
                          dVar188 = dVar188 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar82 + lVar64 + lVar86 + lVar34 * 2])
                                              + dVar188);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar64 + lVar86 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar84 + lVar64 + lVar86 + lVar34 * 2] == 0.0)
                          ;
                          dVar188 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar188
                                             ) & uVar154 | ~uVar154 & (ulong)dVar188);
                          p_Var4 = local_c70._vptr_BaseFab[lVar84 + lVar63 + lVar52 + lVar34 * 6];
                          dVar114 = ABS((double)p_Var4) / (dVar168 + dVar145 + 1e-100);
                          dVar134 = dVar168 * (double)local_c70._vptr_BaseFab
                                                      [lVar82 + lVar63 + lVar52 + lVar34 * 8] *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar52 + lVar34 * 5]) /
                                     (dVar200 + dVar168 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar52 + lVar34 * 4]) /
                                     (dVar111 + dVar168 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar52 + lVar34]) /
                                     (ABS((double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar63 + lVar53 + lVar34 * 7]) + dVar111
                                      + dVar168 + dVar200 + 1e-100) + 1.0 + dVar170 + dVar177 +
                                    dVar114);
                          dVar123 = ABS((double)local_3c8[lVar34 * 4]);
                          dVar168 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar124 = ABS((double)local_490[lVar63 + lVar86 + lVar34 * 4]);
                          dVar216 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar121 = ABS((double)local_490[lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar123 + dVar124 + 1e-100);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar168 + dVar216 + 1e-100);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar86 + lVar34]) /
                                    (dVar123 + dVar168 + 1e-100) + 1.0;
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar63 + lVar86 + lVar34]) /
                                    (dVar124 + dVar216 + 1e-100) + 1.0;
                          dVar168 = (dVar111 + dVar200) * dVar168;
                          dVar216 = (dVar127 + dVar200) * dVar216;
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar64 + lVar86 + lVar34 * 2]);
                          dVar200 = dVar200 / (ABS((double)local_490[lVar64 + lVar86 + lVar34 * 2])
                                              + dVar200);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar64 + lVar86 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_490[lVar64 + lVar86 + lVar34 * 2] == 0.0)
                          ;
                          dVar200 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar200
                                             ) & uVar154 | ~uVar154 & (ulong)dVar200);
                          dVar160 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar162 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar160 + dVar162 + 1e-100);
                          dVar129 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar128 + dVar115 + 1e-100);
                          dVar120 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34]) /
                                    (dVar160 + dVar128 + 1e-100) + 1.0;
                          dVar160 = (dVar120 + dVar122) * dVar160;
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34]) /
                                    (dVar162 + dVar115 + 1e-100) + 1.0;
                          dVar162 = (dVar122 + dVar126) * dVar162;
                          dVar131 = (dVar121 + dVar127) * dVar124 + (dVar111 + dVar121) * dVar123 +
                                    dVar168 + dVar216 + 1e-100;
                          dVar216 = dVar216 / dVar131;
                          dVar180 = dVar160 + dVar162 + (dVar120 + dVar129) * dVar128 +
                                    (dVar126 + dVar129) * dVar115 + 1e-100;
                          uStack_9a0 = 0;
                          dVar162 = dVar162 / dVar180;
                          dVar181 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar181 = dVar181 / (ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar181);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar154 = -(ulong)((double)local_1090[lVar65 + lVar42 + lVar34 * 2] == 0.0
                                            );
                          dVar122 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 4]);
                          dVar146 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar202 = ABS((double)local_2e0[lVar88 + lVar34 * 4]);
                          dVar147 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar183 = ABS((double)local_2e0[lVar88 + lVar34 * 2]) /
                                    (dVar122 + dVar202 + 1e-100);
                          dVar218 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar146 + dVar147 + 1e-100);
                          dVar171 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34]) /
                                    (dVar122 + dVar146 + 1e-100) + 1.0;
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar88 + lVar42 + lVar34]) /
                                    (dVar202 + dVar147 + 1e-100) + 1.0;
                          dVar203 = (dVar171 + dVar218) * dVar146;
                          dVar148 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 2]);
                          dVar148 = dVar148 / (ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar148);
                          uVar93 = -(ulong)((double)local_8d0[lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          uVar94 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 2] == 0.0);
                          dVar149 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar133 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 4]);
                          dVar184 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar163 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 4]);
                          dVar155 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar149 + dVar184 + 1e-100);
                          dVar204 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar133 + dVar163 + 1e-100);
                          dVar195 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34]) /
                                    (dVar149 + dVar133 + 1e-100) + 1.0;
                          dVar138 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34]) /
                                    (dVar184 + dVar163 + 1e-100) + 1.0;
                          dVar115 = (dVar195 + dVar155) * dVar149;
                          dVar164 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 6]);
                          dVar156 = ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 6]);
                          dVar209 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar190 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar135 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar164 + dVar209 + 1e-100);
                          dVar219 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar156 + dVar190 + 1e-100);
                          dVar123 = ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar164 + dVar156 + 1e-100) + 1.0;
                          dVar139 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar209 + dVar190 + 1e-100) + 1.0;
                          dVar209 = (dVar135 + dVar139) * dVar209;
                          dVar124 = ABS((double)local_1090[lVar65 + lVar42 + lVar34 * 7]);
                          dVar196 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar42 + lVar34 * 7]);
                          uStack_b20 = 0;
                          dVar210 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar165 = dVar196 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar87 + lVar88 + lVar42 + lVar34 * 7]);
                          uStack_b30 = 0;
                          uVar95 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 3] == 0.0);
                          dVar140 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar120 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 5]);
                          dVar157 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 5]);
                          dVar166 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar140 + dVar120 + 1e-100);
                          dVar191 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 3]) /
                                    (dVar126 + dVar157 + 1e-100);
                          dVar234 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34]) /
                                    (dVar140 + dVar126 + 1e-100) + 1.0;
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34]) /
                                    (dVar120 + dVar157 + 1e-100) + 1.0;
                          dVar141 = (dVar234 + dVar166) * dVar140;
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar167 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar121 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 6]);
                          dVar224 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 6]);
                          dVar233 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar128 + dVar121 + 1e-100);
                          dVar150 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar167 + dVar224 + 1e-100);
                          dVar158 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar128 + dVar167 + 1e-100) + 1.0;
                          dVar128 = (dVar158 + dVar233) * dVar128;
                          dVar192 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar121 + dVar224 + 1e-100) + 1.0;
                          dVar197 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar211 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]);
                          dVar225 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar159 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 7]) + dVar197;
                          dVar143 = ABS((double)local_490[lVar65 + lVar53 + lVar34 * 6]);
                          dVar142 = ABS((double)local_490[lVar65 + lVar52 + lVar34 * 6]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar169 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar178 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar143 + dVar111 + 1e-100);
                          dVar179 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar142 + dVar169 + 1e-100);
                          dVar129 = ABS((double)local_490[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar143 + dVar142 + 1e-100) + 1.0;
                          dVar193 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar111 + dVar169 + 1e-100) + 1.0;
                          dVar169 = (dVar193 + dVar179) * dVar169;
                          dVar169 = dVar169 / ((dVar129 + dVar179) * dVar142 +
                                               (dVar178 + dVar193) * dVar111 +
                                               (dVar129 + dVar178) * dVar143 + dVar169 + 1e-100);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar65 + lVar86 + lVar34 * 2]);
                          dVar111 = dVar111 / (ABS((double)local_490[lVar65 + lVar86 + lVar34 * 2])
                                              + dVar111);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar65 + lVar86 + lVar34 * 2] == 0.0);
                          uVar97 = -(ulong)((double)local_490[lVar65 + lVar86 + lVar34 * 2] == 0.0);
                          dVar111 = (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar111
                                             ) & uVar97 | ~uVar97 & (ulong)dVar111);
                          dVar220 = (double)local_c70._vptr_BaseFab
                                            [lVar81 + lVar63 + lVar52 + lVar34 * 8] * dVar112 *
                                    (dVar230 +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar52 + lVar34 * 5]) /
                                    (dVar110 + dVar112 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar81 + lVar44 + lVar52 + lVar34 * 4]) /
                                    (dVar235 + dVar112 + 1e-100) +
                                    dVar113 + dVar182 + ABS((double)local_c70._vptr_BaseFab
                                                                    [lVar81 + lVar44 + lVar52 + 
                                                  lVar34]) /
                                                  (ABS((double)local_490[lVar44 + lVar53 + lVar34 * 
                                                  7]) + dVar235 + dVar110 + dVar112 + 1e-100) + 1.0)
                          ;
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar53 + lVar34 * 3] == 0.0);
                          dVar201 = (double)(~uVar96 & (ulong)dVar103 | (ulong)dVar108 & uVar96);
                          dVar208 = dVar208 / dVar189;
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar182 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar189 + dVar103 + 1e-100);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar182 + dVar230 + 1e-100);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar189 + dVar182 + 1e-100) + 1.0;
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar103 + dVar230 + 1e-100) + 1.0;
                          dVar182 = (dVar112 + dVar110) * dVar182;
                          dVar182 = dVar182 / ((dVar235 + dVar108) * dVar103 +
                                               (dVar112 + dVar235) * dVar189 + dVar182 +
                                               (dVar108 + dVar110) * dVar230 + 1e-100);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar86 + lVar34 * 2]);
                          dVar103 = dVar103 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar82 + lVar65 + lVar86 + lVar34 * 2])
                                              + dVar103);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar86 + lVar34 * 2] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar65 + lVar86 + lVar34 * 2] == 0.0);
                          dVar103 = (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar103
                                             ) & uVar97 | ~uVar97 & (ulong)dVar103);
                          dVar226 = dVar145 * (double)local_c70._vptr_BaseFab
                                                      [lVar82 + lVar63 + lVar52 + lVar34 * 8] *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar44 + lVar52 + lVar34 * 5]) /
                                     (dVar161 + dVar145 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar44 + lVar52 + lVar34 * 4]) /
                                     (dVar144 + dVar145 + 1e-100) +
                                     ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar44 + lVar52 + lVar34]) /
                                     (ABS((double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar44 + lVar53 + lVar34 * 7]) + dVar144
                                      + dVar145 + dVar161 + 1e-100) + 1.0 + dVar170 + dVar177 +
                                    dVar114);
                          dVar168 = dVar168 / dVar131;
                          dVar160 = dVar160 / dVar180;
                          dVar189 = ABS((double)local_1090[lVar75 + lVar42 + lVar34 * 4]);
                          dVar129 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar75 + lVar42 + lVar34 * 4]);
                          dVar170 = ABS((double)local_1090[lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar122 + dVar189 + 1e-100);
                          dVar212 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar146 + dVar129 + 1e-100);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar75 + lVar42 + lVar34]) /
                                    (dVar189 + dVar129 + 1e-100) + 1.0;
                          dVar129 = (dVar114 + dVar212) * dVar129;
                          dVar213 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar64 + lVar42 + lVar34 * 2]);
                          dVar213 = dVar213 / (ABS((double)local_1090[lVar64 + lVar42 + lVar34 * 2])
                                              + dVar213);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          uVar97 = -(ulong)((double)local_1090[lVar64 + lVar42 + lVar34 * 2] == 0.0)
                          ;
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 4]);
                          dVar214 = ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 4]);
                          dVar131 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar149 + dVar230 + 1e-100);
                          dVar227 = ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar133 + dVar214 + 1e-100);
                          dVar177 = ABS((double)local_8d0[lVar75 + lVar42 + lVar34]) /
                                    (dVar230 + dVar214 + 1e-100) + 1.0;
                          dVar230 = (dVar131 + dVar177) * dVar230;
                          dVar161 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar42 + lVar34 * 2]);
                          dVar161 = dVar161 / (ABS((double)local_8d0[lVar64 + lVar42 + lVar34 * 2])
                                              + dVar161);
                          uVar98 = -(ulong)((double)local_8d0[lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          uVar99 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + lVar42 + lVar34 * 2] == 0.0);
                          dVar142 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar75 + lVar42 + lVar34 * 7]);
                          dVar193 = ABS((double)local_1090[lVar75 + lVar42 + lVar34 * 7]) + dVar142;
                          dVar178 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar75 + lVar52 + lVar34 * 7]);
                          dVar215 = ABS((double)local_1090[lVar64 + lVar42 + lVar34 * 6]);
                          dVar179 = ABS((double)local_1090[lVar64 + lVar52 + lVar34 * 6]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar64 + lVar42 + lVar34 * 6]);
                          dVar231 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar64 + lVar42 + lVar34 * 3]) /
                                    (dVar215 + dVar110 + 1e-100);
                          dVar151 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar179 + dVar231 + 1e-100);
                          dVar143 = ABS((double)local_1090[lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar215 + dVar179 + 1e-100) + 1.0;
                          dVar194 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar87 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar110 + dVar231 + 1e-100) + 1.0;
                          dVar110 = (dVar235 + dVar194) * dVar110;
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 5]);
                          dVar144 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34 * 5]);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 3]) /
                                    (dVar140 + dVar113 + 1e-100);
                          dVar180 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34 * 3]) /
                                    (dVar126 + dVar144 + 1e-100);
                          dVar172 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34]) /
                                    (dVar113 + dVar144 + 1e-100) + 1.0;
                          dVar113 = (dVar112 + dVar172) * dVar113;
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar42 + lVar34 * 3]);
                          dVar145 = dVar145 / (dVar217 + dVar145);
                          dVar108 = dVar145;
                          if (((double)p_Var2 == 0.0) && (!NAN((double)p_Var2))) {
                            dVar108 = 0.5;
                          }
                          uVar100 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar64 + lVar42 + lVar34 * 3] == 0.0)
                          ;
                          dVar176 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 7]);
                          dVar173 = dVar176 + ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 7]);
                          dVar174 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34 * 7]);
                          dVar206 = dVar197 + dVar176;
                          dVar186 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar42 + lVar34 * 6]);
                          dVar185 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar221 = ABS((double)local_8d0[lVar64 + lVar42 + lVar34 * 6]);
                          dVar205 = ABS((double)local_8d0[lVar64 + lVar52 + lVar34 * 6]);
                          dVar198 = ABS((double)local_8d0[lVar64 + lVar42 + lVar34 * 3]) /
                                    (dVar186 + dVar221 + 1e-100);
                          dVar222 = ABS((double)local_8d0[lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar185 + dVar205 + 1e-100);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar186 + dVar185 + 1e-100) + 1.0;
                          dVar186 = (dVar217 + dVar198) * dVar186;
                          dVar175 = ABS((double)local_8d0[lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar221 + dVar205 + 1e-100) + 1.0;
                          local_2c8[(long)local_d38] =
                               (_func_int *)
                               ((((double)local_8d0[lVar88 + lVar52 + lVar34 * 8] * dVar197 *
                                  (ABS((double)local_c70._vptr_BaseFab
                                               [lVar77 + lVar88 + lVar42 + lVar34 * 6]) /
                                   (dVar159 + 1e-100) +
                                  ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 5]) /
                                  (dVar197 + dVar211 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar52 + lVar34 * 4]) /
                                  (dVar197 + dVar225 + 1e-100) +
                                  ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 3]) /
                                  (ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 7]) +
                                   dVar211 + dVar159 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar88 + lVar52 + lVar34 * 2]) /
                                  (ABS((double)local_c70._vptr_BaseFab
                                               [lVar77 + lVar88 + lVar52 + lVar34 * 7]) +
                                   dVar225 + dVar159 + 1e-100) +
                                  ABS((double)local_8d0[lVar65 + lVar52 + lVar34]) /
                                  (ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 7]) +
                                   dVar197 + dVar211 + dVar225 + 1e-100) + 1.0) *
                                  (dVar188 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar63 + lVar52 + lVar34 * 5] +
                                  dVar125 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52 + lVar34] +
                                  dVar134 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52] +
                                  dVar130 * (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar63 + lVar52 + lVar34 * 4] +
                                  (double)p_Var69 * dVar232 + (double)p_Var4 * dVar109 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar84 + lVar63 + lVar52 + lVar34 * 7] +
                                  (double)p_Var3 * dVar162) +
                                 (dVar128 /
                                 ((dVar233 + dVar192) * dVar121 + dVar128 +
                                  (dVar158 + dVar150) * dVar167 + (dVar192 + dVar150) * dVar224 +
                                 1e-100)) *
                                 (dVar162 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar52 + lVar34 * 5] +
                                 dVar109 * (double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar65 + lVar52 + lVar34 * 7] +
                                 dVar232 * (double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar65 + lVar52 + lVar34 * 4] +
                                 (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52 + lVar34]
                                 * dVar134) +
                                 (dVar141 /
                                 ((dVar166 + dVar127) * dVar120 + dVar141 +
                                  (dVar234 + dVar191) * dVar126 + (dVar127 + dVar191) * dVar157 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar52 + lVar34 * 7] * dVar188 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 6] * dVar162 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 3] * dVar109 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar87 + lVar63 + lVar52 + lVar34 * 7] * dVar200 +
                                 dVar216 * (double)local_c70._vptr_BaseFab
                                                   [lVar87 + lVar63 + lVar52 + lVar34 * 6] +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 4] * dVar125 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar134 +
                                 (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar52 + lVar34]
                                 * dVar130 +
                                 (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar52] * dVar232
                                 + dVar236 * (double)local_c70._vptr_BaseFab
                                                     [lVar87 + lVar63 + lVar52 + lVar34 * 2] +
                                   dVar229 * (double)local_c70._vptr_BaseFab
                                                     [lVar87 + lVar63 + lVar52 + lVar34 * 4] +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 5]) +
                                 (double)(~uVar95 & (ulong)dVar187 | (ulong)dVar102 & uVar95) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar52 + lVar34 * 7] * dVar162 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 5] * dVar109 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar87 + lVar65 + lVar52 + lVar34 * 7] * dVar216 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 4] * dVar134 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar87 + lVar65 + lVar52 + lVar34 * 4] * dVar236 +
                                 dVar232 * (double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar65 + lVar52 + lVar34]) +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar87 + lVar88 + lVar52 + lVar34 * 8] * dVar196 *
                                 (ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar88 + lVar42 + lVar34 * 6]) /
                                  (dVar165 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar65 + lVar42 + lVar34 * 5]) /
                                 (dVar124 + dVar196 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar65 + lVar52 + lVar34 * 4]) /
                                 (dVar196 + dVar210 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar42 + lVar34 * 3]) /
                                 (ABS((double)local_2e0[lVar88 + lVar34 * 7]) + dVar124 + dVar196 +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar88 + lVar42 + lVar34 * 7]) + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar88 + lVar52 + lVar34 * 2]) /
                                 (ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar88 + lVar52 + lVar34 * 7]) +
                                  dVar210 + dVar165 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar87 + lVar65 + lVar52 + lVar34]) /
                                 (ABS((double)local_1090[lVar65 + lVar52 + lVar34 * 7]) +
                                  dVar124 + dVar196 + dVar210 + 1e-100) + 1.0) *
                                 ((double)p_Var76 * dVar109 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar63 + lVar52 + lVar34 * 5] * dVar200 +
                                  (double)p_Var67 * dVar216 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar63 + lVar52 + lVar34 * 4] * dVar130 +
                                  (double)p_Var56 * dVar232 +
                                  (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52] *
                                  dVar236 + (double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar63 + lVar52 + lVar34] * dVar229 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar52 + lVar34 * 7]) +
                                 (dVar209 /
                                 ((dVar123 + dVar135) * dVar164 + dVar209 +
                                  (dVar123 + dVar219) * dVar156 + (dVar139 + dVar219) * dVar190 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar65 + lVar52 + lVar34 * 7] * dVar109 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar52 + lVar34 * 5] * dVar216 +
                                 (double)local_c70._vptr_BaseFab[lVar81 + lVar65 + lVar52 + lVar34]
                                 * dVar236 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar52 + lVar34 * 4] * dVar232) +
                                 (dVar115 /
                                 ((dVar155 + dVar138) * dVar184 + dVar115 +
                                  (dVar195 + dVar204) * dVar133 + (dVar138 + dVar204) * dVar163 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar63 + lVar42 + lVar34 * 5] * dVar125 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar134 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar84 + lVar63 + lVar42 + lVar34 * 6] * dVar232 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar84 + lVar63 + lVar42 + lVar34 * 7] * dVar130) +
                                 (double)((uVar93 & 0x3fe0000000000000 | ~uVar93 & (ulong)dVar148) &
                                          uVar94 | ~uVar94 & (ulong)dVar148) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar84 + lVar65 + lVar42 + lVar34 * 7] * dVar232 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar42 + lVar34 * 5] * dVar134) +
                                 (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar181) &
                                          uVar154 | ~uVar154 & (ulong)dVar181) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar65 + lVar42 + lVar34 * 5] * dVar236 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar65 + lVar42 + lVar34 * 7] * dVar232) +
                                 (dVar203 /
                                 ((dVar183 + dVar132) * dVar202 + (dVar171 + dVar183) * dVar122 +
                                  dVar203 + (dVar132 + dVar218) * dVar147 + 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar63 + lVar42 + lVar34 * 7] * dVar130 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar42 + lVar34 * 6] * dVar232 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar42 + lVar34 * 3] * dVar236 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar63 + lVar42 + lVar34 * 5] * dVar229) +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar42 + lVar34 * 7] * dVar134 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar87 + lVar65 + lVar42 + lVar34 * 7] * dVar236 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar42 + lVar34 * 5] * dVar232 +
                                 dVar223 * ((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar63 + lVar42 + lVar34 * 7] *
                                            dVar125 +
                                           (double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar134
                                           + (double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar63 + lVar42 + lVar34 * 5] *
                                             dVar130 + (double)local_c70._vptr_BaseFab
                                                               [lVar77 + lVar63 + lVar42 + lVar34 * 
                                                  3] * dVar232 +
                                                  (double)local_c70._vptr_BaseFab
                                                          [lVar87 + lVar63 + lVar42 + lVar34 * 6] *
                                                  dVar236 + (double)local_c70._vptr_BaseFab
                                                                    [lVar87 + lVar63 + lVar42 + 
                                                  lVar34 * 7] * dVar229)) * 0.125 +
                                ((dVar186 /
                                 ((dVar198 + dVar175) * dVar221 + dVar186 +
                                  (dVar217 + dVar222) * dVar185 + (dVar175 + dVar222) * dVar205 +
                                 1e-100)) *
                                 (dVar160 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar75 + lVar52 + lVar34 * 5] +
                                 dVar228 * (double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar75 + lVar52 + lVar34 * 7] +
                                 dVar208 * (double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar75 + lVar52 + lVar34 * 4] +
                                 dVar226 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar75 + lVar52 + lVar34]) +
                                (double)local_8d0[lVar75 + lVar52 + lVar34 * 8] * dVar176 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar75 + lVar42 + lVar34 * 6]) /
                                 (dVar206 + 1e-100) +
                                ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 5]) /
                                (dVar173 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar75 + lVar52 + lVar34 * 4]) /
                                (dVar174 + dVar176 + 1e-100) +
                                ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 3]) /
                                (dVar211 + dVar206 +
                                 ABS((double)local_8d0[lVar75 + lVar42 + lVar34 * 7]) + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar75 + lVar52 + lVar34 * 2]) /
                                (dVar225 + dVar206 + dVar174 + 1e-100) +
                                ABS((double)local_8d0[lVar75 + lVar52 + lVar34]) /
                                (ABS((double)local_8d0[lVar75 + lVar52 + lVar34 * 7]) +
                                 dVar173 + dVar174 + 1e-100) + 1.0) *
                                ((double)p_Var3 * dVar160 +
                                dVar103 * (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar44 + lVar52 + lVar34 * 5] +
                                (double)p_Var4 * dVar228 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52] * dVar226
                                + dVar182 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar44 + lVar52 + lVar34] +
                                  dVar201 * (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar44 + lVar52 + lVar34 * 4] +
                                  (double)p_Var69 * dVar208 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar44 + lVar52 + lVar34 * 7]) +
                                (double)(~uVar100 & (ulong)dVar145 | (ulong)dVar108 & uVar100) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar75 + lVar52 + lVar34 * 7] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar75 + lVar52 + lVar34 * 5] * dVar228 +
                                dVar168 * (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar75 + lVar52 + lVar34 * 7] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar75 + lVar52 + lVar34 * 4] * dVar226 +
                                dVar220 * (double)local_c70._vptr_BaseFab
                                                  [lVar87 + lVar75 + lVar52 + lVar34 * 4] +
                                dVar208 * (double)local_c70._vptr_BaseFab
                                                  [lVar77 + lVar75 + lVar52 + lVar34]) +
                                (dVar113 /
                                ((dVar234 + dVar112) * dVar140 + dVar113 +
                                 (dVar234 + dVar180) * dVar126 + (dVar172 + dVar180) * dVar144 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 6] * dVar160 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 7] * dVar103 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar52 + lVar34 * 3] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar63 + lVar52 + lVar34 * 6] * dVar168 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar87 + lVar44 + lVar52 + lVar34 * 7] * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar226 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 4] * dVar182 +
                                (double)local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar52] * dVar208
                                + (double)local_c70._vptr_BaseFab[lVar77 + lVar44 + lVar52 + lVar34]
                                  * dVar201 +
                                  dVar169 * (double)local_c70._vptr_BaseFab
                                                    [lVar87 + lVar44 + lVar52 + lVar34 * 4] +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar63 + lVar52 + lVar34 * 2] * dVar220 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar77 + lVar44 + lVar52 + lVar34 * 5]) +
                                (dVar110 /
                                ((dVar143 + dVar235) * dVar215 + dVar110 +
                                 (dVar143 + dVar151) * dVar179 + (dVar194 + dVar151) * dVar231 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar81 + lVar75 + lVar52 + lVar34 * 7] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar81 + lVar75 + lVar52 + lVar34 * 5] * dVar168 +
                                (double)local_c70._vptr_BaseFab[lVar81 + lVar75 + lVar52 + lVar34] *
                                dVar220 + (double)local_c70._vptr_BaseFab
                                                  [lVar81 + lVar75 + lVar52 + lVar34 * 4] * dVar208)
                                + (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar75 + lVar52 + lVar34 * 8] * dVar142 *
                                  (ABS((double)local_c70._vptr_BaseFab
                                               [lVar87 + lVar75 + lVar42 + lVar34 * 6]) /
                                   (dVar196 + dVar142 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar75 + lVar42 + lVar34 * 5]) /
                                  (dVar193 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar75 + lVar52 + lVar34 * 4]) /
                                  (dVar178 + dVar142 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar75 + lVar42 + lVar34 * 3]) /
                                  (ABS((double)local_1090[lVar75 + lVar42 + lVar34 * 7]) + dVar124 +
                                   dVar196 + dVar142 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar75 + lVar52 + lVar34 * 2]) /
                                  (dVar210 + dVar196 + dVar142 + dVar178 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar87 + lVar75 + lVar52 + lVar34]) /
                                  (ABS((double)local_1090[lVar75 + lVar52 + lVar34 * 7]) + dVar193 +
                                   dVar178 + 1e-100) + 1.0) *
                                  ((double)p_Var76 * dVar228 +
                                  (double)p_Var67 * dVar168 +
                                  dVar111 * (double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar44 + lVar52 + lVar34 * 5] +
                                  (double)p_Var56 * dVar208 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar44 + lVar52 + lVar34 * 4] * dVar201 +
                                  (double)local_c70._vptr_BaseFab[lVar81 + lVar44 + lVar52 + lVar34]
                                  * dVar169 +
                                  (double)local_c70._vptr_BaseFab[lVar81 + lVar63 + lVar52] *
                                  dVar220 + (double)local_c70._vptr_BaseFab
                                                    [lVar81 + lVar44 + lVar52 + lVar34 * 7]) +
                                  (double)((uVar98 & 0x3fe0000000000000 | ~uVar98 & (ulong)dVar161)
                                           & uVar99 | ~uVar99 & (ulong)dVar161) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar84 + lVar75 + lVar42 + lVar34 * 7] * dVar208 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar75 + lVar42 + lVar34 * 5] * dVar226) +
                                  (dVar230 /
                                  ((dVar195 + dVar131) * dVar149 + dVar230 +
                                   (dVar195 + dVar227) * dVar133 + (dVar177 + dVar227) * dVar214 +
                                  1e-100)) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar226 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar44 + lVar42 + lVar34 * 5] * dVar182 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar84 + lVar44 + lVar42 + lVar34 * 7] * dVar201 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar84 + lVar63 + lVar42 + lVar34 * 6] * dVar208) +
                                  (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar213)
                                           & uVar97 | ~uVar97 & (ulong)dVar213) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar81 + lVar75 + lVar42 + lVar34 * 5] * dVar220 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar75 + lVar42 + lVar34 * 7] * dVar208) +
                                  (dVar129 /
                                  ((dVar171 + dVar212) * dVar146 +
                                   (dVar170 + dVar114) * dVar189 + (dVar171 + dVar170) * dVar122 +
                                   dVar129 + 1e-100)) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar81 + lVar63 + lVar42 + lVar34 * 6] * dVar208 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar44 + lVar42 + lVar34 * 7] * dVar201 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar44 + lVar42 + lVar34 * 5] * dVar169 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar81 + lVar63 + lVar42 + lVar34 * 3] * dVar220) +
                                  local_11d8 *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar226 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar44 + lVar42 + lVar34 * 7] * dVar182 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar42 + lVar34 * 3] * dVar208 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar44 + lVar42 + lVar34 * 5] * dVar201 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar44 + lVar42 + lVar34 * 7] * dVar169 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar63 + lVar42 + lVar34 * 6] * dVar220) +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar75 + lVar42 + lVar34 * 7] * dVar226 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar87 + lVar75 + lVar42 + lVar34 * 7] * dVar220 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar75 + lVar42 + lVar34 * 5] * dVar208) * 0.125
                                ) * 0.5);
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 3]);
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34 * 3];
                          dVar187 = ABS((double)p_Var69);
                          dVar103 = dVar103 / (dVar103 + dVar187);
                          p_Var56 = local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52 + lVar34];
                          p_Var67 = local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52 + lVar34 * 3];
                          p_Var76 = local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52 + lVar34 * 5];
                          p_Var2 = local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar52 + lVar34];
                          p_Var3 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 3];
                          p_Var4 = local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar52 + lVar34 * 5];
                          p_Var5 = local_c70._vptr_BaseFab[lVar62 + lVar65 + lVar52 + lVar34 * 3];
                          p_Var6 = local_c70._vptr_BaseFab[lVar84 + lVar65 + lVar86 + lVar34 * 2];
                          p_Var7 = local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar86 + lVar34 * 2];
                          dVar102 = dVar103;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            dVar102 = 0.5;
                          }
                          dVar187 = dVar187 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + lVar53 + lVar34 * 3])
                                              + dVar187);
                          dVar108 = dVar187;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            dVar108 = 0.5;
                          }
                          dVar109 = ABS((double)p_Var6) + ABS((double)p_Var7);
                          dVar223 = 0.5;
                          if ((double)p_Var7 != 0.0 || (double)p_Var6 != 0.0) {
                            dVar223 = ABS((double)p_Var7) / dVar109;
                          }
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar42 + lVar34 * 2];
                          dVar228 = 0.5;
                          if ((double)p_Var7 != 0.0 || (double)p_Var6 != 0.0) {
                            dVar228 = ABS((double)p_Var6) / dVar109;
                          }
                          dVar188 = ABS((double)p_Var69);
                          dVar109 = dVar188 / (ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 2])
                                              + dVar188);
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_8d0[lVar65 + lVar42 + lVar34 * 2] == 0.0
                                             );
                            dVar109 = (double)(uVar31 & 0x3fe0000000000000 |
                                              ~uVar31 & (ulong)dVar109);
                          }
                          local_12e8 = ABS((double)local_c70._vptr_BaseFab
                                                   [lVar78 + lVar65 + lVar42 + lVar34 * 2]);
                          local_12e8 = local_12e8 / (dVar188 + local_12e8);
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar78 + lVar65 + lVar42 + lVar34 * 2] == 0.0
                                             );
                            local_12e8 = (double)(uVar31 & 0x3fe0000000000000 |
                                                 ~uVar31 & (ulong)local_12e8);
                          }
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar53 + lVar34 * 7]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar53 + lVar34 * 7]);
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar52 + lVar34 * 7]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 7]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar52 + lVar34 * 7]);
                          dVar126 = dVar128 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar84 + lVar45 + lVar52 + lVar34 * 7]);
                          dVar208 = ABS((double)p_Var67) / (dVar200 + dVar126 + dVar217 + 1e-100);
                          dVar182 = ABS((double)p_Var56) /
                                    (dVar229 + dVar188 + dVar128 + dVar217 + 1e-100) + 1.0;
                          dVar230 = ABS((double)p_Var76) / (dVar128 + dVar217 + 1e-100);
                          dVar120 = dVar217 * (double)local_c70._vptr_BaseFab
                                                      [lVar82 + lVar68 + lVar52 + lVar34 * 8] *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar68 + lVar52 + lVar34 * 6]) /
                                     (dVar200 + dVar217 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 4]) /
                                    (dVar188 + dVar217 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar45 + lVar53 + lVar34 * 7]) + dVar188
                                     + dVar200 + dVar217 + 1e-100) + dVar182 + dVar208 + dVar230);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar121 + dVar114 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar111 + dVar232 + 1e-100);
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar121 + dVar111 + 1e-100) + 1.0;
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar114 + dVar232 + 1e-100) + 1.0;
                          dVar111 = (dVar127 + dVar188) * dVar111;
                          dVar232 = (dVar112 + dVar188) * dVar232;
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar129 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar52 + lVar34 * 7]);
                          dVar125 = dVar129 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar84 + lVar63 + lVar52 + lVar34 * 7]);
                          uStack_bd0 = 0;
                          dVar168 = ABS((double)p_Var3) / (dVar200 + dVar125 + dVar217 + 1e-100);
                          dVar235 = ABS((double)p_Var2) /
                                    (dVar189 + dVar188 + dVar129 + dVar200 + 1e-100) + 1.0;
                          uStack_a60 = 0;
                          dVar110 = ABS((double)p_Var4) / (dVar129 + dVar200 + 1e-100);
                          dVar122 = dVar200 * (double)local_c70._vptr_BaseFab
                                                      [lVar82 + lVar63 + lVar52 + lVar34 * 8] *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar52 + lVar34 * 6]) /
                                     (dVar217 + dVar200 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 4]) /
                                    (dVar188 + dVar200 + 1e-100) +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar52 + lVar34 * 2]) /
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar53 + lVar34 * 7]) + dVar188
                                     + dVar200 + dVar217 + 1e-100) + dVar235 + dVar168 + dVar110);
                          uStack_e90 = 0;
                          dVar123 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar53 + lVar34 * 5]);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar52 + lVar34 * 5]);
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar53 + lVar34 * 5]);
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar52 + lVar34 * 5]);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar53 + lVar34 * 3]) /
                                    (dVar123 + dVar115 + 1e-100);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar52 + lVar34 * 3]) /
                                    (dVar200 + dVar236 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar45 + lVar52 + lVar34]) /
                                    (dVar123 + dVar200 + 1e-100) + 1.0;
                          dVar217 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar52 + lVar34]) /
                                    (dVar115 + dVar236 + 1e-100) + 1.0;
                          dVar112 = (dVar130 + dVar112) * dVar114 + (dVar127 + dVar130) * dVar121 +
                                    dVar111 + dVar232 + 1e-100;
                          dVar232 = dVar232 / dVar112;
                          dVar236 = (dVar217 + dVar124) * dVar236;
                          dVar236 = dVar236 / ((dVar188 + dVar124) * dVar200 +
                                               (dVar113 + dVar217) * dVar115 +
                                               (dVar188 + dVar113) * dVar123 + dVar236 + 1e-100);
                          dVar217 = ABS((double)p_Var5);
                          dVar200 = dVar217 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar65 + lVar53 + lVar34 * 3])
                                              + dVar217);
                          dVar188 = dVar200;
                          if (((double)p_Var5 == 0.0) && (!NAN((double)p_Var5))) {
                            dVar188 = 0.5;
                          }
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar53 + lVar34 * 3] == 0.0);
                          dVar149 = (double)(~uVar31 & (ulong)dVar200 | (ulong)dVar188 & uVar31);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar123 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar114 + dVar123 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar113 + dVar115 + 1e-100);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34]) /
                                    (dVar114 + dVar113 + 1e-100) + 1.0;
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34]) /
                                    (dVar123 + dVar115 + 1e-100) + 1.0;
                          dVar113 = (dVar124 + dVar188) * dVar113;
                          dVar113 = dVar113 / ((dVar121 + dVar200) * dVar123 +
                                               (dVar124 + dVar121) * dVar114 + dVar113 +
                                               (dVar200 + dVar188) * dVar115 + 1e-100);
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar45 + lVar86 + lVar34 * 4]);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar86 + lVar34 * 4]);
                          dVar224 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar86 + lVar34 * 4]);
                          dVar166 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar86 + lVar34 * 4]);
                          dVar131 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar68 + lVar86 + lVar34 * 2]) /
                                    (dVar127 + dVar224 + 1e-100);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar86 + lVar34 * 2]) /
                                    (dVar124 + dVar166 + 1e-100);
                          dVar114 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar45 + lVar86 + lVar34]) /
                                    (dVar127 + dVar124 + 1e-100) + 1.0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar68 + lVar86 + lVar34]) /
                                    (dVar224 + dVar166 + 1e-100) + 1.0;
                          dVar224 = (dVar131 + dVar188) * dVar224;
                          dVar166 = (dVar188 + dVar121) * dVar166;
                          dVar141 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar142 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar133 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar141 + dVar132 + 1e-100);
                          dVar123 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar142 + dVar130 + 1e-100);
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34]) /
                                    (dVar141 + dVar142 + 1e-100) + 1.0;
                          dVar141 = (dVar188 + dVar133) * dVar141;
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34]) /
                                    (dVar132 + dVar130 + 1e-100) + 1.0;
                          dVar142 = (dVar188 + dVar123) * dVar142;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar68 + lVar86 + lVar34]);
                          dVar188 = dVar188 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar45 + lVar86 + lVar34]) +
                                              dVar188);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar68 + lVar86 + lVar34] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar45 + lVar86 + lVar34] == 0.0);
                          dVar188 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar188
                                             ) & uVar154 | ~uVar154 & (ulong)dVar188);
                          dVar200 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar86 + lVar34]);
                          dVar200 = dVar200 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar63 + lVar86 + lVar34]) +
                                              dVar200);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar63 + lVar86 + lVar34] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar44 + lVar86 + lVar34] == 0.0);
                          dVar200 = (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar200
                                             ) & uVar154 | ~uVar154 & (ulong)dVar200);
                          dVar164 = (dVar114 + dVar131) * dVar127 + dVar224 +
                                    (dVar114 + dVar121) * dVar124 + dVar166 + 1e-100;
                          dVar166 = dVar166 / dVar164;
                          uStack_1000 = 0;
                          dVar183 = (dVar133 + dVar115) * dVar132 + dVar141 + dVar142 +
                                    (dVar115 + dVar123) * dVar130 + 1e-100;
                          dVar142 = dVar142 / dVar183;
                          dVar204 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34]);
                          dVar204 = dVar204 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar89 + lVar42 + lVar34]) +
                                              dVar204);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar46 + lVar42 + lVar34] == 0.0);
                          uVar154 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar77 + lVar89 + lVar42 + lVar34] == 0.0);
                          dVar209 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34]);
                          dVar209 = dVar209 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar88 + lVar42 + lVar34]) +
                                              dVar209);
                          uVar93 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar88 + lVar42 + lVar34] == 0.0);
                          uVar94 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34] == 0.0);
                          dVar210 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 4]);
                          dVar155 = ABS((double)local_2e8[lVar89 + lVar34 * 4]);
                          dVar134 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 4]);
                          dVar211 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 4]);
                          dVar174 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar210 + dVar134 + 1e-100);
                          dVar135 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar155 + dVar211 + 1e-100);
                          dVar114 = ABS((double)local_2e8[lVar89 + lVar34]) /
                                    (dVar210 + dVar155 + 1e-100) + 1.0;
                          dVar184 = ABS((double)local_8d0[lVar46 + lVar42 + lVar34]) /
                                    (dVar134 + dVar211 + 1e-100) + 1.0;
                          dVar156 = (dVar174 + dVar184) * dVar134;
                          dVar167 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar190 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 4]);
                          dVar150 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar212 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 4]);
                          dVar173 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar167 + dVar150 + 1e-100);
                          dVar225 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar190 + dVar212 + 1e-100);
                          dVar127 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34]) /
                                    (dVar167 + dVar190 + 1e-100) + 1.0;
                          dVar169 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34]) /
                                    (dVar150 + dVar212 + 1e-100) + 1.0;
                          dVar115 = (dVar127 + dVar173) * dVar167;
                          dVar191 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 5]);
                          dVar170 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar52 + lVar34 * 5]);
                          dVar144 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 5]);
                          dVar213 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 5]);
                          dVar143 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 3]) /
                                    (dVar191 + dVar144 + 1e-100);
                          dVar151 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 3]) /
                                    (dVar170 + dVar213 + 1e-100);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar52 + lVar34]) /
                                    (dVar191 + dVar170 + 1e-100) + 1.0;
                          dVar157 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34]) /
                                    (dVar144 + dVar213 + 1e-100) + 1.0;
                          dVar144 = (dVar143 + dVar157) * dVar144;
                          uVar95 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 3] == 0.0);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar158 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar226 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 5]);
                          dVar214 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 5]);
                          dVar192 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar121 + dVar226 + 1e-100);
                          dVar171 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34 * 3]) /
                                    (dVar158 + dVar214 + 1e-100);
                          dVar131 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34]) /
                                    (dVar121 + dVar158 + 1e-100) + 1.0;
                          dVar121 = (dVar131 + dVar192) * dVar121;
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar52 + lVar34]) /
                                    (dVar226 + dVar214 + 1e-100) + 1.0;
                          dVar159 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar42 + lVar34 * 7]);
                          dVar132 = dVar159 + ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 7]);
                          dVar177 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar46 + lVar52 + lVar34 * 7]);
                          dVar193 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar89 + lVar42 + lVar34 * 7]) + dVar159;
                          uStack_d90 = 0;
                          uStack_db0 = 0;
                          dVar146 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar46 + lVar42 + lVar34 * 7]);
                          uStack_cf0 = 0;
                          dVar147 = dVar146 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar78 + lVar89 + lVar42 + lVar34 * 7]);
                          uStack_da0 = 0;
                          dVar160 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar133 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar161 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 6]);
                          dVar178 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 6]);
                          dVar194 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar160 + dVar161 + 1e-100);
                          dVar215 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar133 + dVar178 + 1e-100);
                          dVar233 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar160 + dVar133 + 1e-100) + 1.0;
                          dVar138 = ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar161 + dVar178 + 1e-100) + 1.0;
                          dVar123 = (dVar233 + dVar194) * dVar160;
                          dVar162 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar139 = dVar162 + ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]);
                          dVar179 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar195 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 7]) + dVar162;
                          dVar148 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar45 + lVar53 + lVar34 * 5]);
                          dVar140 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar45 + lVar52 + lVar34 * 5]);
                          dVar163 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar53 + lVar34 * 5]);
                          dVar180 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar52 + lVar34 * 5]);
                          dVar165 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar53 + lVar34 * 3]) /
                                    (dVar148 + dVar163 + 1e-100);
                          dVar181 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar52 + lVar34 * 3]) /
                                    (dVar140 + dVar180 + 1e-100);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar45 + lVar52 + lVar34]) /
                                    (dVar148 + dVar140 + 1e-100) + 1.0;
                          dVar196 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar52 + lVar34]) /
                                    (dVar163 + dVar180 + 1e-100) + 1.0;
                          dVar180 = (dVar196 + dVar181) * dVar180;
                          dVar180 = dVar180 / ((dVar124 + dVar181) * dVar140 +
                                               (dVar165 + dVar196) * dVar163 +
                                               (dVar124 + dVar165) * dVar148 + dVar180 + 1e-100);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar53 + lVar34 * 3] == 0.0);
                          dVar234 = (double)(~uVar96 & (ulong)dVar187 | (ulong)dVar108 & uVar96);
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar140 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar148 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar163 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar108 + dVar140 + 1e-100);
                          dVar165 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar124 + dVar148 + 1e-100);
                          dVar181 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34]) /
                                    (dVar108 + dVar124 + 1e-100) + 1.0;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34]) /
                                    (dVar140 + dVar148 + 1e-100) + 1.0;
                          dVar124 = (dVar181 + dVar165) * dVar124;
                          dVar124 = dVar124 / ((dVar163 + dVar187) * dVar140 +
                                               (dVar181 + dVar163) * dVar108 + dVar124 +
                                               (dVar187 + dVar165) * dVar148 + 1e-100);
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar68 + lVar86 + lVar34]);
                          dVar187 = dVar187 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar45 + lVar86 + lVar34]) +
                                              dVar187);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar68 + lVar86 + lVar34] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar45 + lVar86 + lVar34] == 0.0);
                          dVar187 = (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar187
                                             ) & uVar97 | ~uVar97 & (ulong)dVar187);
                          dVar216 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar68 + lVar52 + lVar34 * 8] * dVar128 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar68 + lVar52 + lVar34 * 6]) /
                                     (dVar126 + 1e-100) +
                                    dVar230 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar84 + lVar68 + lVar52 + lVar34 * 4]) /
                                              (dVar229 + dVar128 + 1e-100) +
                                              dVar208 + dVar182 + ABS((double)local_c70.
                                                                              _vptr_BaseFab
                                                                              [lVar84 + lVar68 + 
                                                  lVar52 + lVar34 * 2]) /
                                                  (ABS((double)local_c70._vptr_BaseFab
                                                               [lVar84 + lVar45 + lVar52 + lVar34 * 
                                                  7]) + ABS((double)local_c70._vptr_BaseFab
                                                                    [lVar84 + lVar45 + lVar53 + 
                                                  lVar34 * 7]) + dVar229 + dVar128 + 1e-100));
                          dVar111 = dVar111 / dVar112;
                          dVar108 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar86 + lVar34]);
                          dVar108 = dVar108 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar63 + lVar86 + lVar34]) +
                                              dVar108);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar63 + lVar86 + lVar34] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar44 + lVar86 + lVar34] == 0.0);
                          dVar108 = (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar108
                                             ) & uVar97 | ~uVar97 & (ulong)dVar108);
                          dVar181 = (double)local_c70._vptr_BaseFab
                                            [lVar82 + lVar63 + lVar52 + lVar34 * 8] * dVar129 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar63 + lVar52 + lVar34 * 6]) /
                                     (dVar125 + 1e-100) +
                                    dVar110 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar84 + lVar44 + lVar52 + lVar34 * 4]) /
                                              (dVar189 + dVar129 + 1e-100) +
                                              dVar168 + dVar235 + ABS((double)local_c70.
                                                                              _vptr_BaseFab
                                                                              [lVar84 + lVar63 + 
                                                  lVar52 + lVar34 * 2]) /
                                                  (ABS((double)local_c70._vptr_BaseFab
                                                               [lVar84 + lVar63 + lVar52 + lVar34 * 
                                                  7]) + ABS((double)local_c70._vptr_BaseFab
                                                                    [lVar84 + lVar63 + lVar53 + 
                                                  lVar34 * 7]) + dVar189 + dVar129 + 1e-100));
                          dVar224 = dVar224 / dVar164;
                          dVar141 = dVar141 / dVar183;
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar89 + lVar42 + lVar34 * 4]);
                          dVar189 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar46 + lVar42 + lVar34 * 4]);
                          dVar196 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar46 + lVar42 + lVar34 * 2]) /
                                    (dVar126 + dVar189 + 1e-100);
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar89 + lVar42 + lVar34]) /
                                    (dVar210 + dVar126 + 1e-100) + 1.0;
                          dVar229 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar46 + lVar42 + lVar34]) /
                                    (dVar134 + dVar189 + 1e-100) + 1.0;
                          dVar189 = (dVar229 + dVar196) * dVar189;
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar197 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar227 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar88 + lVar42 + lVar34 * 2]) /
                                    (dVar110 + dVar197 + 1e-100);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar42 + lVar34]) /
                                    (dVar167 + dVar110 + 1e-100) + 1.0;
                          dVar163 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar88 + lVar42 + lVar34]) /
                                    (dVar150 + dVar197 + 1e-100) + 1.0;
                          dVar110 = (dVar235 + dVar227) * dVar110;
                          dVar201 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar46 + lVar42 + lVar34]);
                          dVar201 = dVar201 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar89 + lVar42 + lVar34]) +
                                              dVar201);
                          uVar96 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar46 + lVar42 + lVar34] == 0.0);
                          uVar97 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar89 + lVar42 + lVar34] == 0.0);
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar42 + lVar34]);
                          dVar128 = dVar128 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar88 + lVar42 + lVar34]) +
                                              dVar128);
                          uVar98 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar88 + lVar42 + lVar34] == 0.0);
                          uVar99 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar42 + lVar34] == 0.0);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar46 + lVar52 + lVar34 * 7]);
                          dVar140 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar164 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar129 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar42 + lVar34 * 3]) /
                                    (dVar160 + dVar140 + 1e-100);
                          dVar202 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar133 + dVar164 + 1e-100);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar140 + dVar164 + 1e-100) + 1.0;
                          dVar140 = (dVar129 + dVar208) * dVar140;
                          dVar218 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar42 + lVar34 * 7]);
                          dVar125 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar219 = dVar218 + ABS((double)local_c70._vptr_BaseFab
                                                          [lVar78 + lVar88 + lVar42 + lVar34 * 7]);
                          dVar183 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar89 + lVar42 + lVar34 * 5]);
                          dVar203 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar89 + lVar52 + lVar34 * 5]);
                          dVar168 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar46 + lVar42 + lVar34 * 5]);
                          dVar220 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar46 + lVar52 + lVar34 * 5]);
                          dVar182 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar46 + lVar42 + lVar34 * 3]) /
                                    (dVar183 + dVar168 + 1e-100);
                          dVar172 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar46 + lVar52 + lVar34 * 3]) /
                                    (dVar203 + dVar220 + 1e-100);
                          dVar165 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar89 + lVar52 + lVar34]) /
                                    (dVar183 + dVar203 + 1e-100) + 1.0;
                          dVar231 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar46 + lVar52 + lVar34]) /
                                    (dVar168 + dVar220 + 1e-100) + 1.0;
                          dVar168 = (dVar182 + dVar231) * dVar168;
                          dVar148 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar42 + lVar34 * 3]);
                          dVar148 = dVar148 / (dVar217 + dVar148);
                          dVar217 = dVar148;
                          if (((double)p_Var5 == 0.0) && (!NAN((double)p_Var5))) {
                            dVar217 = 0.5;
                          }
                          uVar100 = -(ulong)((double)local_c70._vptr_BaseFab
                                                     [lVar62 + lVar65 + lVar42 + lVar34 * 3] == 0.0)
                          ;
                          dVar186 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar176 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar206 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar88 + lVar42 + lVar34 * 5]);
                          dVar205 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar88 + lVar52 + lVar34 * 5]);
                          dVar198 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar186 + dVar206 + 1e-100);
                          dVar221 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar88 + lVar52 + lVar34 * 3]) /
                                    (dVar176 + dVar205 + 1e-100);
                          dVar175 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar52 + lVar34]) /
                                    (dVar186 + dVar176 + 1e-100) + 1.0;
                          dVar186 = (dVar175 + dVar198) * dVar186;
                          dVar185 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar88 + lVar52 + lVar34]) /
                                    (dVar206 + dVar205 + 1e-100) + 1.0;
                          local_2d0[(long)local_d38] =
                               (_func_int *)
                               ((((double)local_8d0[lVar88 + lVar52 + lVar34 * 8] * dVar162 *
                                  (ABS((double)local_c70._vptr_BaseFab
                                               [lVar77 + lVar88 + lVar42 + lVar34 * 6]) /
                                   (dVar195 + 1e-100) +
                                  ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 5]) /
                                  (dVar139 + 1e-100) +
                                  ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar52 + lVar34 * 4]) /
                                  (dVar162 + dVar179 + 1e-100) +
                                  ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 3]) /
                                  (ABS((double)local_8d0[lVar88 + lVar42 + lVar34 * 7]) +
                                   ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 7]) + dVar195 +
                                  1e-100) + ABS((double)local_c70._vptr_BaseFab
                                                        [lVar77 + lVar88 + lVar52 + lVar34 * 2]) /
                                            (ABS((double)local_c70._vptr_BaseFab
                                                         [lVar77 + lVar88 + lVar52 + lVar34 * 7]) +
                                             dVar179 + dVar195 + 1e-100) +
                                            ABS((double)local_8d0[lVar65 + lVar52 + lVar34]) /
                                            (ABS((double)local_8d0[lVar65 + lVar52 + lVar34 * 7]) +
                                             dVar139 + dVar179 + 1e-100) + 1.0) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar63 + lVar52 + lVar34 * 6] * dVar200 +
                                  dVar142 * (double)p_Var3 +
                                  dVar223 * (double)p_Var4 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar63 + lVar52 + lVar34 * 2] * dVar113 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar44 + lVar52 + lVar34 * 4] * dVar149 +
                                  dVar232 * (double)p_Var2 +
                                  dVar122 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar63 + lVar52] +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar44 + lVar52 + lVar34 * 7]) +
                                 (dVar123 /
                                 ((dVar194 + dVar138) * dVar161 + dVar123 +
                                  (dVar233 + dVar215) * dVar133 + (dVar138 + dVar215) * dVar178 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar65 + lVar52 + lVar34 * 7] * dVar200 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar46 + lVar52 + lVar34 * 7] * dVar188 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar52 + lVar34 * 5] * dVar142 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar52 + lVar34 * 3] * dVar223 +
                                 dVar166 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar46 + lVar52 + lVar34 * 5] +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar52 + lVar34 * 4] * dVar113 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar52 + lVar34 * 2] * dVar149 +
                                 dVar236 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar46 + lVar52 + lVar34 * 4] +
                                 (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52 + lVar34]
                                 * dVar122 +
                                 dVar120 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar46 + lVar52 + lVar34] +
                                 dVar232 * (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52]
                                 + (double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar65 + lVar52 + lVar34 * 6]) +
                                 (double)local_8d0[lVar46 + lVar52 + lVar34 * 8] * dVar159 *
                                 (ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar46 + lVar42 + lVar34 * 6]) /
                                  (dVar193 + 1e-100) +
                                 ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 5]) /
                                 (dVar132 + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar46 + lVar52 + lVar34 * 4]) /
                                 (dVar159 + dVar177 + 1e-100) +
                                 ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 3]) /
                                 (ABS((double)local_2e8[lVar89 + lVar34 * 7]) + dVar193 +
                                  ABS((double)local_8d0[lVar46 + lVar42 + lVar34 * 7]) + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar46 + lVar52 + lVar34 * 2]) /
                                 (ABS((double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar89 + lVar52 + lVar34 * 7]) + dVar193 +
                                  dVar177 + 1e-100) +
                                 ABS((double)local_8d0[lVar46 + lVar52 + lVar34]) /
                                 (ABS((double)local_8d0[lVar46 + lVar52 + lVar34 * 7]) +
                                  dVar132 + dVar177 + 1e-100) + 1.0) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar68 + lVar52 + lVar34 * 6] * dVar188 +
                                  (double)p_Var76 * dVar223 +
                                  (double)p_Var67 * dVar166 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar68 + lVar52 + lVar34 * 4] * dVar149 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar68 + lVar52 + lVar34 * 2] * dVar236 +
                                  (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52] *
                                  dVar120 + (double)p_Var56 * dVar232 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar52 + lVar34 * 7]) +
                                 (dVar121 /
                                 ((dVar192 + dVar145) * dVar226 + dVar121 +
                                  (dVar131 + dVar171) * dVar158 + (dVar145 + dVar171) * dVar214 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar52 + lVar34 * 6] * dVar142 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar44 + lVar52 + lVar34 * 7] * dVar223 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar44 + lVar52 + lVar34 * 4] * dVar232 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar52 + lVar34 * 2] * dVar122) +
                                 (double)(~uVar95 & (ulong)dVar103 | (ulong)dVar102 & uVar95) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar65 + lVar52 + lVar34 * 7] * dVar142 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 6] * dVar223 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar46 + lVar52 + lVar34 * 7] * dVar166 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 4] * dVar122 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar46 + lVar52 + lVar34 * 4] * dVar120 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar52 + lVar34 * 2] * dVar232) +
                                 (dVar144 /
                                 ((dVar130 + dVar143) * dVar191 + dVar144 +
                                  (dVar130 + dVar151) * dVar170 + (dVar157 + dVar151) * dVar213 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar68 + lVar52 + lVar34 * 7] * dVar223 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar52 + lVar34 * 6] * dVar166 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar52 + lVar34 * 2] * dVar120 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar52 + lVar34 * 4] * dVar232) +
                                 (dVar115 /
                                 ((dVar173 + dVar169) * dVar150 + dVar115 +
                                  (dVar127 + dVar225) * dVar190 + (dVar169 + dVar225) * dVar212 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar63 + lVar42 + lVar34 * 6] * dVar113 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar44 + lVar42 + lVar34 * 7] * dVar149 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar44 + lVar42 + lVar34 * 5] * dVar232 +
                                 dVar122 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar63 + lVar42 + lVar34 * 3]) +
                                 (dVar156 /
                                 ((dVar114 + dVar174) * dVar210 + dVar156 +
                                  (dVar114 + dVar135) * dVar155 + (dVar184 + dVar135) * dVar211 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar68 + lVar42 + lVar34 * 7] * dVar149 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar42 + lVar34 * 6] * dVar236 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar42 + lVar34 * 3] * dVar120 +
                                 dVar232 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar68 + lVar42 + lVar34 * 5]) +
                                 (double)((uVar93 & 0x3fe0000000000000 | ~uVar93 & (ulong)dVar209) &
                                          uVar94 | ~uVar94 & (ulong)dVar209) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar44 + lVar42 + lVar34 * 7] * dVar232 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar122) +
                                 (double)((uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)dVar204) &
                                          uVar154 | ~uVar154 & (ulong)dVar204) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar68 + lVar42 + lVar34 * 6] * dVar120 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar68 + lVar42 + lVar34 * 7] * dVar232) +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar42 + lVar34 * 7] * dVar122 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar46 + lVar42 + lVar34 * 7] * dVar120 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar77 + lVar65 + lVar42 + lVar34 * 6] * dVar232 +
                                 dVar109 * ((double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar42 + lVar34 * 7] *
                                            dVar113 +
                                           (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar65 + lVar42 + lVar34 * 6] * dVar149
                                           + (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar46 + lVar42 + lVar34 * 7] *
                                             dVar236 + (double)local_c70._vptr_BaseFab
                                                               [lVar82 + lVar65 + lVar42 + lVar34 * 
                                                  5] * dVar122 +
                                                  (double)local_c70._vptr_BaseFab
                                                          [lVar82 + lVar46 + lVar42 + lVar34 * 5] *
                                                  dVar120 + dVar232 * (double)local_c70.
                                                                              _vptr_BaseFab
                                                                              [lVar82 + lVar65 + 
                                                  lVar42 + lVar34 * 3])) * 0.125 +
                                ((dVar186 /
                                 ((dVar198 + dVar185) * dVar206 + dVar186 +
                                  (dVar175 + dVar221) * dVar176 + (dVar185 + dVar221) * dVar205 +
                                 1e-100)) *
                                 (dVar141 * (double)local_c70._vptr_BaseFab
                                                    [lVar78 + lVar63 + lVar52 + lVar34 * 6] +
                                 dVar228 * (double)local_c70._vptr_BaseFab
                                                   [lVar78 + lVar44 + lVar52 + lVar34 * 7] +
                                 dVar111 * (double)local_c70._vptr_BaseFab
                                                   [lVar78 + lVar44 + lVar52 + lVar34 * 4] +
                                 dVar181 * (double)local_c70._vptr_BaseFab
                                                   [lVar78 + lVar63 + lVar52 + lVar34 * 2]) +
                                (double)(~uVar100 & (ulong)dVar148 | (ulong)dVar217 & uVar100) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar65 + lVar52 + lVar34 * 7] * dVar141 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar65 + lVar52 + lVar34 * 6] * dVar228 +
                                dVar224 * (double)local_c70._vptr_BaseFab
                                                  [lVar78 + lVar46 + lVar52 + lVar34 * 7] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar65 + lVar52 + lVar34 * 4] * dVar181 +
                                dVar216 * (double)local_c70._vptr_BaseFab
                                                  [lVar78 + lVar46 + lVar52 + lVar34 * 4] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar65 + lVar52 + lVar34 * 2] * dVar111) +
                                (dVar168 /
                                ((dVar165 + dVar182) * dVar183 + dVar168 +
                                 (dVar165 + dVar172) * dVar203 + (dVar231 + dVar172) * dVar220 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar68 + lVar52 + lVar34 * 7] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar68 + lVar52 + lVar34 * 6] * dVar224 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar68 + lVar52 + lVar34 * 2] * dVar216 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar68 + lVar52 + lVar34 * 4] * dVar111) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar88 + lVar52 + lVar34 * 8] * dVar218 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar88 + lVar42 + lVar34 * 6]) /
                                 (dVar219 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar65 + lVar42 + lVar34 * 5]) /
                                (dVar162 + dVar218 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar65 + lVar52 + lVar34 * 4]) /
                                (dVar125 + dVar218 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar88 + lVar42 + lVar34 * 3]) /
                                (dVar195 + dVar218 +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar88 + lVar42 + lVar34 * 7]) + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar88 + lVar52 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar88 + lVar52 + lVar34 * 7]) +
                                 dVar125 + dVar219 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar65 + lVar52 + lVar34]) /
                                (dVar179 + dVar162 + dVar218 + dVar125 + 1e-100) + 1.0) *
                                ((double)p_Var3 * dVar141 +
                                (double)p_Var4 * dVar228 +
                                dVar108 * (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar63 + lVar52 + lVar34 * 6] +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52] * dVar181
                                + (double)p_Var2 * dVar111 +
                                  dVar234 * (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar44 + lVar52 + lVar34 * 4] +
                                  dVar124 * (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar63 + lVar52 + lVar34 * 2] +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar44 + lVar52 + lVar34 * 7]) +
                                (dVar140 /
                                ((dVar233 + dVar129) * dVar160 + dVar140 +
                                 (dVar233 + dVar202) * dVar133 + (dVar208 + dVar202) * dVar164 +
                                1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar52 + lVar34 * 5] * dVar141 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar52 + lVar34 * 3] * dVar228 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar52 + lVar34 * 5] * dVar224 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar52 + lVar34 * 7] * dVar108 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar46 + lVar52 + lVar34 * 7] * dVar187 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52 + lVar34] *
                                dVar181 + (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52]
                                          * dVar111 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar46 + lVar52 + lVar34] * dVar216 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar65 + lVar52 + lVar34 * 4] * dVar124
                                          + dVar180 * (double)local_c70._vptr_BaseFab
                                                              [lVar84 + lVar46 + lVar52 + lVar34 * 4
                                                              ] +
                                            (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar65 + lVar52 + lVar34 * 2] *
                                            dVar234 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar52 + lVar34 * 6]) +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar46 + lVar52 + lVar34 * 8] * dVar146 *
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar46 + lVar42 + lVar34 * 6]) /
                                 (dVar147 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar46 + lVar42 + lVar34 * 5]) /
                                (dVar159 + dVar146 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar46 + lVar52 + lVar34 * 4]) /
                                (dVar112 + dVar146 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar46 + lVar42 + lVar34 * 3]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar89 + lVar42 + lVar34 * 7]) + dVar193 +
                                 dVar146 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar46 + lVar52 + lVar34 * 2]) /
                                (ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar89 + lVar52 + lVar34 * 7]) + dVar147 +
                                 dVar112 + 1e-100) +
                                ABS((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar46 + lVar52 + lVar34]) /
                                (dVar177 + dVar159 + dVar146 + dVar112 + 1e-100) + 1.0) *
                                ((double)p_Var76 * dVar228 +
                                (double)p_Var67 * dVar224 +
                                dVar187 * (double)local_c70._vptr_BaseFab
                                                  [lVar84 + lVar68 + lVar52 + lVar34 * 6] +
                                (double)p_Var56 * dVar111 +
                                (double)local_c70._vptr_BaseFab[lVar82 + lVar68 + lVar52] * dVar216
                                + (double)local_c70._vptr_BaseFab
                                          [lVar84 + lVar68 + lVar52 + lVar34 * 2] * dVar180 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar84 + lVar68 + lVar52 + lVar34 * 4] * dVar234 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar68 + lVar52 + lVar34 * 7]) +
                                (double)((uVar98 & 0x3fe0000000000000 | ~uVar98 & (ulong)dVar128) &
                                         uVar99 | ~uVar99 & (ulong)dVar128) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar44 + lVar42 + lVar34 * 7] * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar63 + lVar42 + lVar34 * 6] * dVar181) +
                                (double)((uVar96 & 0x3fe0000000000000 | ~uVar96 & (ulong)dVar201) &
                                         uVar97 | ~uVar97 & (ulong)dVar201) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar68 + lVar42 + lVar34 * 6] * dVar216 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar68 + lVar42 + lVar34 * 7] * dVar111) +
                                (dVar110 /
                                ((dVar173 + dVar163) * dVar150 + (dVar173 + dVar235) * dVar167 +
                                 dVar110 + (dVar163 + dVar227) * dVar197 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar63 + lVar42 + lVar34 * 3] * dVar181 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar44 + lVar42 + lVar34 * 5] * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar44 + lVar42 + lVar34 * 7] * dVar234 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar63 + lVar42 + lVar34 * 6] * dVar124) +
                                (dVar189 /
                                ((dVar230 + dVar196) * dVar126 +
                                 (dVar174 + dVar229) * dVar134 + (dVar174 + dVar230) * dVar210 +
                                 dVar189 + 1e-100)) *
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar68 + lVar42 + lVar34 * 5] * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar68 + lVar42 + lVar34 * 3] * dVar216 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar68 + lVar42 + lVar34 * 6] * dVar180 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar68 + lVar42 + lVar34 * 7] * dVar234) +
                                ((double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar65 + lVar42 + lVar34 * 5] * dVar181 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar65 + lVar42 + lVar34 * 3] * dVar111 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar82 + lVar46 + lVar42 + lVar34 * 5] * dVar216 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar42 + lVar34 * 7] * dVar124 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar46 + lVar42 + lVar34 * 7] * dVar180 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar84 + lVar65 + lVar42 + lVar34 * 6] * dVar234) *
                                local_12e8 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar65 + lVar42 + lVar34 * 7] * dVar181 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar46 + lVar42 + lVar34 * 7] * dVar216 +
                                (double)local_c70._vptr_BaseFab
                                        [lVar78 + lVar65 + lVar42 + lVar34 * 6] * dVar111) * 0.125)
                               * 0.5);
                          uStack_a40 = 0;
                          p_Var69 = local_c70._vptr_BaseFab[lVar62 + lVar44 + lVar86 + lVar34];
                          p_Var56 = local_c70._vptr_BaseFab[lVar62 + lVar63 + lVar86 + lVar34];
                          dVar103 = ABS((double)p_Var69) + ABS((double)p_Var56);
                          p_Var67 = local_c70._vptr_BaseFab[lVar62 + lVar64 + lVar52 + lVar34 * 3];
                          p_Var76 = local_c70._vptr_BaseFab[lVar84 + lVar64 + lVar86 + lVar34 * 2];
                          p_Var2 = local_c70._vptr_BaseFab[lVar82 + lVar64 + lVar86 + lVar34 * 2];
                          p_Var3 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34];
                          p_Var4 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 2];
                          uStack_e70 = 0;
                          p_Var5 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 3];
                          p_Var6 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 5];
                          p_Var7 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 6];
                          p_Var8 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52 + lVar34 * 8];
                          dVar102 = 0.5;
                          if ((double)p_Var56 != 0.0 || (double)p_Var69 != 0.0) {
                            dVar102 = ABS((double)p_Var56) / dVar103;
                          }
                          p_Var9 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar42 + lVar34];
                          local_1300 = 0.5;
                          if ((double)p_Var56 != 0.0 || (double)p_Var69 != 0.0) {
                            local_1300 = ABS((double)p_Var69) / dVar103;
                          }
                          dVar103 = ABS((double)p_Var9);
                          local_12a8 = dVar103 / (ABS((double)local_c70._vptr_BaseFab
                                                              [lVar77 + lVar88 + lVar42 + lVar34]) +
                                                 dVar103);
                          if (((double)p_Var9 == 0.0) && (!NAN((double)p_Var9))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar77 + lVar88 + lVar42 + lVar34] == 0.0);
                            local_12a8 = (double)(uVar31 & 0x3fe0000000000000 |
                                                 ~uVar31 & (ulong)local_12a8);
                          }
                          local_ec8._0_8_ =
                               ABS((double)local_c70._vptr_BaseFab
                                           [lVar77 + lVar75 + lVar42 + lVar34]);
                          local_ec8._0_8_ =
                               (double)local_ec8._0_8_ / (dVar103 + (double)local_ec8._0_8_);
                          if (((double)p_Var9 == 0.0) && (!NAN((double)p_Var9))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar77 + lVar75 + lVar42 + lVar34] == 0.0);
                            local_ec8._0_8_ =
                                 uVar31 & 0x3fe0000000000000 | ~uVar31 & local_ec8._0_8_;
                          }
                          local_fd8 = local_c70._vptr_BaseFab[lVar77 + lVar64 + lVar42 + lVar34 * 3]
                          ;
                          uStack_fd0 = 0;
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar64 + lVar52 + lVar34 * 3];
                          dVar103 = ABS((double)p_Var69);
                          piVar152 = (pointer)(ABS((double)local_fd8) /
                                              (ABS((double)local_fd8) + dVar103));
                          local_1058 = piVar152;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            local_1058 = (pointer)0x3fe0000000000000;
                          }
                          local_ec8._8_8_ = 0;
                          piStack_1050 = (pointer)0x0;
                          dVar103 = dVar103 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar64 + lVar53 + lVar34 * 3])
                                              + dVar103);
                          dVar187 = dVar103;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            dVar187 = 0.5;
                          }
                          dVar109 = ABS((double)p_Var76) + ABS((double)p_Var2);
                          dVar108 = 0.5;
                          if ((double)p_Var2 != 0.0 || (double)p_Var76 != 0.0) {
                            dVar108 = ABS((double)p_Var2) / dVar109;
                          }
                          p_Var69 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar42 + lVar34 * 2];
                          local_14d0 = 0.5;
                          if ((double)p_Var2 != 0.0 || (double)p_Var76 != 0.0) {
                            local_14d0 = ABS((double)p_Var76) / dVar109;
                          }
                          dVar109 = ABS((double)p_Var69);
                          local_1238 = dVar109 / (ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 2
                                                                       ]) + dVar109);
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_8d0[lVar65 + lVar42 + lVar34 * 2] == 0.0
                                             );
                            local_1238 = (double)(uVar31 & 0x3fe0000000000000 |
                                                 ~uVar31 & (ulong)local_1238);
                          }
                          p_Var56 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34 * 3];
                          p_Var76 = local_c70._vptr_BaseFab[lVar62 + lVar65 + lVar52 + lVar34 * 3];
                          local_e88 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar78 + lVar65 + lVar42 + lVar34 * 2]);
                          local_e88 = local_e88 / (dVar109 + local_e88);
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar78 + lVar65 + lVar42 + lVar34 * 2] == 0.0
                                             );
                            local_e88 = (double)(uVar31 & 0x3fe0000000000000 |
                                                ~uVar31 & (ulong)local_e88);
                          }
                          dVar223 = ABS((double)p_Var76);
                          dVar228 = dVar223 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar65 + lVar53 + lVar34 * 3])
                                              + dVar223);
                          dVar109 = dVar228;
                          if (((double)p_Var76 == 0.0) && (!NAN((double)p_Var76))) {
                            dVar109 = 0.5;
                          }
                          local_d68 = local_c70._vptr_BaseFab[lVar62 + lVar65 + lVar42 + lVar34 * 3]
                          ;
                          uStack_d60 = 0;
                          local_d78 = ABS((double)local_d68) / (dVar223 + ABS((double)local_d68));
                          local_f58 = local_d78;
                          if (((double)p_Var76 == 0.0) && (!NAN((double)p_Var76))) {
                            local_f58 = 0.5;
                          }
                          uStack_f50 = 0;
                          uStack_d70 = 0;
                          dVar188 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 3]);
                          dVar217 = ABS((double)p_Var56);
                          dVar188 = dVar188 / (dVar188 + dVar217);
                          dVar223 = dVar188;
                          if (((double)p_Var56 == 0.0) && (!NAN((double)p_Var56))) {
                            dVar223 = 0.5;
                          }
                          uStack_e80 = 0;
                          p_Var69 = local_c70._vptr_BaseFab[lVar84 + lVar65 + lVar86 + lVar34 * 2];
                          p_Var76 = local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar86 + lVar34 * 2];
                          p_Var2 = local_c70._vptr_BaseFab[lVar77 + lVar44 + lVar86 + lVar34];
                          p_Var9 = local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar86 + lVar34];
                          dVar217 = dVar217 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar77 + lVar65 + lVar53 + lVar34 * 3])
                                              + dVar217);
                          dVar200 = dVar217;
                          if (((double)p_Var56 == 0.0) && (!NAN((double)p_Var56))) {
                            dVar200 = 0.5;
                          }
                          uStack_f80 = 0;
                          uStack_ee0 = 0;
                          dVar229 = ABS((double)p_Var2) + ABS((double)p_Var9);
                          dVar189 = 0.5;
                          if ((double)p_Var9 != 0.0 || (double)p_Var2 != 0.0) {
                            dVar189 = ABS((double)p_Var9) / dVar229;
                          }
                          local_1448 = 0.5;
                          if ((double)p_Var9 != 0.0 || (double)p_Var2 != 0.0) {
                            local_1448 = ABS((double)p_Var2) / dVar229;
                          }
                          dVar208 = ABS((double)p_Var69) + ABS((double)p_Var76);
                          dVar229 = 0.5;
                          if ((double)p_Var76 != 0.0 || (double)p_Var69 != 0.0) {
                            dVar229 = ABS((double)p_Var76) / dVar208;
                          }
                          p_Var56 = local_c70._vptr_BaseFab[lVar77 + lVar64 + lVar42 + lVar34 * 2];
                          local_1450 = 0.5;
                          if ((double)p_Var76 != 0.0 || (double)p_Var69 != 0.0) {
                            local_1450 = ABS((double)p_Var69) / dVar208;
                          }
                          dVar208 = ABS((double)p_Var56);
                          local_11b8 = (double *)
                                       (dVar208 /
                                       (ABS((double)local_8d0[lVar64 + lVar42 + lVar34 * 2]) +
                                       dVar208));
                          if (((double)p_Var56 == 0.0) && (!NAN((double)p_Var56))) {
                            uVar31 = -(ulong)((double)local_8d0[lVar64 + lVar42 + lVar34 * 2] == 0.0
                                             );
                            local_11b8 = (double *)
                                         (uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)local_11b8)
                            ;
                          }
                          p_Var69 = local_c70._vptr_BaseFab[lVar62 + lVar65 + lVar42 + lVar34];
                          local_bb8 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar78 + lVar64 + lVar42 + lVar34 * 2]);
                          local_bb8 = local_bb8 / (dVar208 + local_bb8);
                          if (((double)p_Var56 == 0.0) && (!NAN((double)p_Var56))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar78 + lVar64 + lVar42 + lVar34 * 2] == 0.0
                                             );
                            local_bb8 = (double)(uVar31 & 0x3fe0000000000000 |
                                                ~uVar31 & (ulong)local_bb8);
                          }
                          dVar208 = ABS((double)p_Var69);
                          local_ed8 = (_Bit_type *)
                                      (dVar208 /
                                      (ABS((double)local_c70._vptr_BaseFab
                                                   [lVar62 + lVar88 + lVar42 + lVar34]) + dVar208));
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar62 + lVar88 + lVar42 + lVar34] == 0.0);
                            local_ed8 = (_Bit_type *)
                                        (uVar31 & 0x3fe0000000000000 | ~uVar31 & (ulong)local_ed8);
                          }
                          local_14c8 = ABS((double)local_c70._vptr_BaseFab
                                                   [lVar62 + lVar75 + lVar42 + lVar34]);
                          local_14c8 = local_14c8 / (dVar208 + local_14c8);
                          uStack_bb0 = 0;
                          dStack_ed0 = 0.0;
                          if (((double)p_Var69 == 0.0) && (!NAN((double)p_Var69))) {
                            uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                      [lVar62 + lVar75 + lVar42 + lVar34] == 0.0);
                            local_14c8 = (double)(uVar31 & 0x3fe0000000000000 |
                                                 ~uVar31 & (ulong)local_14c8);
                          }
                          dVar236 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar53 + lVar34 * 7]);
                          dVar120 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar52 + lVar34 * 7]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar52 + lVar34 * 7]);
                          dVar114 = ABS((double)p_Var3) /
                                    (dVar236 + dVar110 + dVar120 + dVar208 + 1e-100) + 1.0;
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar53 + lVar34 * 7]);
                          dVar131 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar230 = ABS((double)p_Var4) /
                                    (dVar110 + dVar232 + dVar131 + dVar208 + 1e-100);
                          dVar111 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar52 + lVar34 * 7]);
                          dVar129 = ABS((double)p_Var5) /
                                    (dVar131 + dVar120 + dVar111 + dVar208 + 1e-100);
                          uStack_10b0 = 0;
                          dVar168 = ABS((double)p_Var6) / (dVar120 + dVar208 + 1e-100);
                          dVar235 = ABS((double)p_Var7) / (dVar208 + dVar131 + 1e-100);
                          uStack_820 = 0;
                          dVar125 = dVar208 * (double)p_Var8 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar82 + lVar63 + lVar52 + lVar34 * 4]) /
                                     (dVar110 + dVar208 + 1e-100) + dVar114 + dVar230 + dVar129 +
                                     dVar168 + dVar235);
                          dVar121 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar124 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar112 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 6]);
                          dVar115 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar53 + lVar34 * 3]) /
                                    (dVar121 + dVar112 + 1e-100);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 3]) /
                                    (dVar124 + dVar115 + 1e-100);
                          dVar123 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar121 + dVar124 + 1e-100) + 1.0;
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar112 + dVar115 + 1e-100) + 1.0;
                          dVar124 = (dVar123 + dVar208) * dVar124;
                          dVar115 = (dVar126 + dVar208) * dVar115;
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar53 + lVar34 * 5]);
                          dVar182 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar110 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar122 + dVar127 + 1e-100);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (dVar182 + dVar110 + 1e-100);
                          dVar113 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar44 + lVar52 + lVar34]) /
                                    (dVar122 + dVar182 + 1e-100) + 1.0;
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar63 + lVar52 + lVar34]) /
                                    (dVar127 + dVar110 + 1e-100) + 1.0;
                          dVar182 = (dVar113 + dVar130) * dVar182;
                          dVar123 = (dVar132 + dVar126) * dVar112 + (dVar123 + dVar132) * dVar121 +
                                    dVar124 + dVar115 + 1e-100;
                          dVar115 = dVar115 / dVar123;
                          dVar110 = (dVar208 + dVar130) * dVar110;
                          dVar121 = (dVar128 + dVar208) * dVar127 + (dVar113 + dVar128) * dVar122 +
                                    dVar182 + dVar110 + 1e-100;
                          dVar110 = dVar110 / dVar121;
                          dVar113 = ABS((double)p_Var67);
                          dVar112 = dVar113 / (ABS((double)local_c70._vptr_BaseFab
                                                           [lVar62 + lVar64 + lVar53 + lVar34 * 3])
                                              + dVar113);
                          dVar208 = dVar112;
                          if (((double)p_Var67 == 0.0) && (!NAN((double)p_Var67))) {
                            dVar208 = 0.5;
                          }
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar64 + lVar53 + lVar34 * 3] == 0.0);
                          dVar112 = (double)(~uVar31 & (ulong)dVar112 | (ulong)dVar208 & uVar31);
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar208 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34 * 4]);
                          dVar128 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 4]);
                          local_de8 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar63 + lVar86 + lVar34 * 4]);
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar126 + dVar128 + 1e-100);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34 * 2]) /
                                    (dVar208 + local_de8 + 1e-100);
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar86 + lVar34]) /
                                    (dVar126 + dVar208 + 1e-100) + 1.0;
                          local_df8 = (pointer)((dVar122 + dVar127) * dVar126);
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar63 + lVar86 + lVar34]) /
                                    (dVar128 + local_de8 + 1e-100) + 1.0;
                          dVar128 = (dVar127 + dVar126) * dVar128;
                          dVar208 = (dVar122 + dVar130) * dVar208;
                          local_de8 = (dVar126 + dVar130) * local_de8;
                          p_Var69 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar52];
                          uStack_df0 = 0;
                          local_1038 = (double)local_df8 + dVar128 + dVar208 + local_de8 + 1e-100;
                          uStack_1030 = 0;
                          local_de8 = local_de8 / local_1038;
                          uStack_de0 = 0;
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar126 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar138 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 6]);
                          dVar133 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar53 + lVar34 * 3]) /
                                    (dVar132 + dVar138 + 1e-100);
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 3]) /
                                    (dVar126 + dVar133 + 1e-100);
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar132 + dVar126 + 1e-100) + 1.0;
                          dVar142 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar65 + lVar52 + lVar34 * 2]) /
                                    (dVar138 + dVar133 + 1e-100) + 1.0;
                          dVar126 = (dVar122 + dVar127) * dVar126;
                          dVar133 = (dVar142 + dVar127) * dVar133;
                          p_Var56 = local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar52 + lVar34];
                          dVar127 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar84 + lVar44 + lVar53 + lVar34 * 7]);
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar62 + lVar65 + lVar53 + lVar34 * 3] == 0.0);
                          dVar109 = (double)(~uVar31 & (ulong)dVar228 | (ulong)dVar109 & uVar31);
                          local_bd8 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar44 + lVar42 + lVar34 * 7] * dVar109;
                          dVar140 = ABS((double)p_Var56) /
                                    (dVar232 + dVar127 + dVar111 + dVar131 + 1e-100) + 1.0;
                          local_f68 = local_c70._vptr_BaseFab[lVar82 + lVar44 + lVar52 + lVar34 * 5]
                          ;
                          dVar141 = ABS((double)local_f68) / (dVar131 + dVar111 + 1e-100);
                          uStack_1020 = 0;
                          dVar139 = dVar131 * (double)p_Var8 *
                                    (dVar235 +
                                    ABS((double)local_c70._vptr_BaseFab
                                                [lVar82 + lVar44 + lVar52 + lVar34 * 4]) /
                                    (dVar232 + dVar131 + 1e-100) + dVar230 + dVar140 + dVar129 +
                                    dVar141);
                          dVar182 = dVar182 / dVar121;
                          dVar121 = (dVar130 + dVar142) * dVar138 + (dVar122 + dVar130) * dVar132 +
                                    dVar126 + dVar133 + 1e-100;
                          dVar133 = dVar133 / dVar121;
                          uStack_f60 = 0;
                          dVar208 = dVar208 / local_1038;
                          dVar130 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar53 + lVar34 * 5]);
                          local_ce8 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar77 + lVar44 + lVar52 + lVar34 * 5]);
                          dVar132 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 5]);
                          dVar232 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 5]);
                          dVar235 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar53 + lVar34 * 3]) /
                                    (dVar130 + dVar132 + 1e-100);
                          dVar228 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34 * 3]) /
                                    (local_ce8 + dVar232 + 1e-100);
                          dVar122 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar44 + lVar52 + lVar34]) /
                                    (dVar130 + local_ce8 + 1e-100) + 1.0;
                          dVar230 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar63 + lVar52 + lVar34]) /
                                    (dVar132 + dVar232 + 1e-100) + 1.0;
                          local_ce8 = (dVar122 + dVar228) * local_ce8;
                          dVar232 = (dVar230 + dVar228) * dVar232;
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar64 + lVar53 + lVar34 * 3] == 0.0);
                          dVar228 = (double)(~uVar31 & (ulong)dVar103 | (ulong)dVar187 & uVar31);
                          p_Var76 = local_c70._vptr_BaseFab[lVar84 + lVar63 + lVar52 + lVar34 * 2];
                          dVar131 = ABS((double)p_Var76) /
                                    (dVar236 + dVar127 + dVar111 + dVar120 + 1e-100);
                          local_828 = (double)local_c70._vptr_BaseFab
                                              [lVar84 + lVar63 + lVar42 + lVar34 * 7] * dVar228;
                          local_e08 = local_c70._vptr_BaseFab[lVar84 + lVar63 + lVar52 + lVar34 * 6]
                          ;
                          dVar103 = ABS((double)local_e08) / (dVar120 + dVar111 + 1e-100);
                          dVar236 = dVar120 * (double)p_Var8 *
                                    (dVar168 + ABS((double)local_c70._vptr_BaseFab
                                                           [lVar84 + lVar63 + lVar52 + lVar34 * 4])
                                               / (dVar236 + dVar120 + 1e-100) +
                                               dVar114 + dVar131 + dVar129 + dVar103);
                          dVar124 = dVar124 / dVar123;
                          dVar187 = (dVar235 + dVar230) * dVar132 + (dVar122 + dVar235) * dVar130 +
                                    local_ce8 + dVar232 + 1e-100;
                          dVar232 = dVar232 / dVar187;
                          p_Stack_e00 = (_Bit_type *)0x0;
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar53 + lVar34 * 3] == 0.0);
                          dVar217 = (double)(~uVar31 & (ulong)dVar217 | (ulong)dVar200 & uVar31);
                          local_ce8 = local_ce8 / dVar187;
                          dVar126 = dVar126 / dVar121;
                          local_ee8 = (FabArray<amrex::EBCellFlagFab> *)
                                      ((double)local_c70._vptr_BaseFab
                                               [lVar84 + lVar44 + lVar42 + lVar34 * 7] * dVar217);
                          dVar200 = dVar111 * (double)p_Var8 *
                                    (ABS((double)local_c70._vptr_BaseFab
                                                 [lVar84 + lVar44 + lVar52 + lVar34 * 4]) /
                                     (dVar127 + dVar111 + 1e-100) + dVar131 + dVar140 + dVar129 +
                                     dVar141 + dVar103);
                          local_d58 = (double)p_Var5 * dVar208 +
                                      (double)p_Var4 * dVar182 +
                                      dVar109 * (double)local_c70._vptr_BaseFab
                                                        [lVar82 + lVar44 + lVar52 + lVar34 * 4] +
                                      (double)p_Var56 * dVar133 + (double)p_Var69 * dVar139 +
                                      (double)local_f68 * dVar229 +
                                      (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar44 + lVar52 + lVar34 * 7];
                          dStack_d50 = 0.0;
                          local_eb8 = local_c70._vptr_BaseFab[lVar62 + lVar64 + lVar42 + lVar34 * 3]
                          ;
                          uStack_eb0 = 0;
                          local_10c8 = ABS((double)local_eb8) / (dVar113 + ABS((double)local_eb8));
                          local_5d8 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar63 + lVar42 + lVar34 * 7] * dVar115;
                          local_5c8 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar42 + lVar34 * 7] * dVar110;
                          local_a38 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar65 + lVar52 + lVar34 * 7] * local_de8;
                          local_b38 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar63 + lVar52 + lVar34 * 4] * dVar115;
                          local_b28 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar65 + lVar52 + lVar34 * 4] * dVar110;
                          dVar103 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 7]);
                          local_c80 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar44 + lVar42 + lVar34 * 7] * dVar133;
                          local_9a8 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar75 + lVar42 + lVar34 * 7] * dVar139;
                          local_538 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar75 + lVar42 + lVar34 * 7] * dVar182;
                          local_e68 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar44 + lVar52 + lVar34 * 4] * dVar133;
                          local_c78 = (double)local_c70._vptr_BaseFab
                                              [lVar77 + lVar75 + lVar52 + lVar34 * 7] * dVar208;
                          local_8e0 = (double)local_c70._vptr_BaseFab
                                              [lVar82 + lVar75 + lVar52 + lVar34 * 4] * dVar182;
                          dVar187 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 7]);
                          local_1008 = (double)local_8d0[lVar75 + lVar52 + lVar34 * 8] * dVar187;
                          dVar128 = dVar128 / local_1038;
                          local_db8 = (double)local_c70._vptr_BaseFab
                                              [lVar84 + lVar65 + lVar42 + lVar34 * 7] * dVar232;
                          local_a68 = (double)local_c70._vptr_BaseFab
                                              [lVar78 + lVar65 + lVar42 + lVar34 * 7] * dVar236;
                          local_cf8 = (double)local_c70._vptr_BaseFab
                                              [lVar78 + lVar63 + lVar42 + lVar34 * 7] * dVar124;
                          local_da8 = (double)local_c70._vptr_BaseFab
                                              [lVar84 + lVar65 + lVar52 + lVar34 * 4] * dVar232;
                          local_898 = (double)local_c70._vptr_BaseFab
                                              [lVar78 + lVar65 + lVar52 + lVar34 * 7] * dVar128;
                          local_d98 = (double)local_c70._vptr_BaseFab
                                              [lVar78 + lVar63 + lVar52 + lVar34 * 4] * dVar124;
                          dVar109 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar42 + lVar34 * 7]);
                          local_a48 = (double)local_c70._vptr_BaseFab
                                              [lVar78 + lVar88 + lVar52 + lVar34 * 8] * dVar109;
                          local_f88 = (FabArray<amrex::FArrayBox> *)
                                      ((double)local_c70._vptr_BaseFab
                                               [lVar84 + lVar75 + lVar42 + lVar34 * 7] * local_ce8);
                          uStack_ce0 = 0;
                          local_e18._M_head_impl =
                               (MultiFab *)
                               ABS((double)local_c70._vptr_BaseFab
                                           [lVar78 + lVar75 + lVar42 + lVar34 * 7]);
                          uStack_e10 = 0;
                          local_e98 = (double)local_c70._vptr_BaseFab
                                              [lVar78 + lVar75 + lVar52 + lVar34 * 8] *
                                      (double)local_e18._M_head_impl;
                          local_c90 = local_c70._vptr_BaseFab + lVar78 + lVar64 + lVar52;
                          local_c88 = local_c70._vptr_BaseFab + lVar62 + lVar75 + lVar52;
                          local_f78 = local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar42 + lVar34 * 5]
                          ;
                          p_Var2 = local_c70._vptr_BaseFab[lVar82 + lVar63 + lVar42 + lVar34 * 3];
                          local_10b8 = local_c70._vptr_BaseFab
                                       [lVar82 + lVar63 + lVar42 + lVar34 * 6];
                          local_e78 = local_c70._vptr_BaseFab[lVar77 + lVar63 + lVar52 + lVar34 * 2]
                          ;
                          local_f48 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34 * 4]
                          ;
                          uStack_f40 = 0;
                          local_548 = local_c70._vptr_BaseFab[lVar77 + lVar65 + lVar52 + lVar34];
                          uStack_540 = 0;
                          local_5a8 = local_8d0[lVar65 + lVar52 + lVar34 * 2];
                          uStack_5a0 = 0;
                          local_588 = local_8d0[lVar65 + lVar52 + lVar34 * 6];
                          uStack_580 = 0;
                          local_598 = local_8d0[lVar65 + lVar52 + lVar34 * 3];
                          uStack_590 = 0;
                          local_9d8 = local_8d0[lVar65 + lVar52 + lVar34];
                          uStack_9d0 = 0;
                          local_9f8 = local_8d0[lVar65 + lVar52 + lVar34 * 7];
                          uStack_9f0 = 0;
                          local_5f8 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar52 + lVar34];
                          uStack_5f0 = 0;
                          local_a08 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar52 + lVar34 * 5]
                          ;
                          uStack_a00 = 0;
                          local_a18 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar52 + lVar34 * 3]
                          ;
                          uStack_a10 = 0;
                          local_578 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar52 + lVar34 * 2]
                          ;
                          uStack_570 = 0;
                          local_9e8 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar52 + lVar34 * 7]
                          ;
                          uStack_9e0 = 0;
                          local_5e8 = local_8d0[lVar88 + lVar42 + lVar34 * 4];
                          uStack_5e0 = 0;
                          local_608 = local_8d0[lVar88 + lVar42 + lVar34 * 2];
                          uStack_600 = 0;
                          local_9b8 = local_8d0[lVar88 + lVar42 + lVar34 * 3];
                          uStack_9b0 = 0;
                          local_9c8 = local_8d0[lVar88 + lVar42 + lVar34 * 7];
                          uStack_9c0 = 0;
                          local_5b8 = local_8d0[lVar65 + lVar42 + lVar34 * 6];
                          uStack_5b0 = 0;
                          local_998 = local_8d0[lVar65 + lVar42 + lVar34 * 7];
                          uStack_990 = 0;
                          local_558 = local_8d0[lVar65 + lVar42 + lVar34 * 5];
                          uStack_550 = 0;
                          local_a28 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar42 + lVar34 * 5]
                          ;
                          uStack_a20 = 0;
                          local_568 = local_c70._vptr_BaseFab[lVar77 + lVar88 + lVar42 + lVar34 * 6]
                          ;
                          uStack_560 = 0;
                          local_10a8._0_8_ =
                               local_c70._vptr_BaseFab[lVar82 + lVar75 + lVar52 + lVar34];
                          local_4e8 = local_8d0[lVar75 + lVar52 + lVar34];
                          uStack_4e0 = 0;
                          local_988 = local_8d0[lVar75 + lVar52 + lVar34 * 7];
                          uStack_980 = 0;
                          local_4b8 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar52 + lVar34 * 4]
                          ;
                          uStack_4b0 = 0;
                          local_518 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar52 + lVar34];
                          uStack_510 = 0;
                          local_528 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar52 + lVar34 * 5]
                          ;
                          uStack_520 = 0;
                          local_3a8 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar52 + lVar34 * 3]
                          ;
                          uStack_3a0 = 0;
                          local_398 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar52 + lVar34 * 2]
                          ;
                          uStack_390 = 0;
                          local_af8 = local_8d0[lVar75 + lVar42 + lVar34];
                          uStack_af0 = 0;
                          local_b08 = local_8d0[lVar75 + lVar42 + lVar34 * 4];
                          uStack_b00 = 0;
                          local_b18 = local_8d0[lVar75 + lVar42 + lVar34 * 2];
                          uStack_b10 = 0;
                          local_4f8 = local_8d0[lVar75 + lVar42 + lVar34 * 7];
                          uStack_4f0 = 0;
                          local_978 = local_8d0[lVar75 + lVar42 + lVar34 * 3];
                          uStack_970 = 0;
                          local_4c8 = local_8d0[lVar75 + lVar42 + lVar34 * 5];
                          uStack_4c0 = 0;
                          local_3b8 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar42 + lVar34 * 5]
                          ;
                          uStack_3b0 = 0;
                          local_508 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar42 + lVar34 * 3]
                          ;
                          uStack_500 = 0;
                          local_4d8 = local_c70._vptr_BaseFab[lVar77 + lVar75 + lVar42 + lVar34 * 6]
                          ;
                          uStack_4d0 = 0;
                          local_f28 = local_8d0[lVar64 + lVar42 + lVar34 * 6];
                          uStack_f20 = 0;
                          local_d28 = local_8d0[lVar64 + lVar42 + lVar34 * 3];
                          uStack_d20 = 0;
                          local_aa8 = local_8d0[lVar64 + lVar52 + lVar34 * 2];
                          uStack_aa0 = 0;
                          local_f08 = local_8d0[lVar64 + lVar52 + lVar34 * 6];
                          uStack_f00 = 0;
                          local_f18 = local_8d0[lVar64 + lVar52 + lVar34 * 3];
                          uStack_f10 = 0;
                          local_868 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar52 + lVar34 * 4]
                          ;
                          uStack_860 = 0;
                          local_c08 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar52 + lVar34 * 2]
                          ;
                          uStack_c00 = 0;
                          local_a98 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar52 + lVar34 * 6]
                          ;
                          uStack_a90 = 0;
                          local_c18 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar52 + lVar34 * 3]
                          ;
                          uStack_c10 = 0;
                          local_d08 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar52 + lVar34];
                          uStack_d00 = 0;
                          local_a78 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar52 + lVar34 * 2]
                          ;
                          uStack_a70 = 0;
                          local_bf8 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar52 + lVar34 * 7]
                          ;
                          uStack_bf0 = 0;
                          local_1078 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar42 + lVar34];
                          uStack_1070 = 0;
                          local_ef8 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar42 + lVar34 * 6]
                          ;
                          uStack_ef0 = 0;
                          local_858 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar42 + lVar34 * 3]
                          ;
                          uStack_850 = 0;
                          local_878 = local_c70._vptr_BaseFab[lVar78 + lVar65 + lVar42 + lVar34 * 5]
                          ;
                          uStack_870 = 0;
                          local_dc8 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar42 + lVar34];
                          uStack_dc0 = 0;
                          local_c28 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar42 + lVar34 * 4]
                          ;
                          uStack_c20 = 0;
                          local_d18 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar42 + lVar34 * 2]
                          ;
                          uStack_d10 = 0;
                          local_a88 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar42 + lVar34 * 7]
                          ;
                          uStack_a80 = 0;
                          local_be8 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar42 + lVar34 * 3]
                          ;
                          uStack_be0 = 0;
                          local_888 = local_c70._vptr_BaseFab[lVar78 + lVar88 + lVar42 + lVar34 * 6]
                          ;
                          uStack_880 = 0;
                          local_848 = local_c70._vptr_BaseFab[lVar62 + lVar88 + lVar42 + lVar34 * 5]
                          ;
                          uStack_840 = 0;
                          local_a58 = local_c70._vptr_BaseFab[lVar62 + lVar88 + lVar42 + lVar34 * 3]
                          ;
                          uStack_a50 = 0;
                          local_bc8 = local_c70._vptr_BaseFab[lVar62 + lVar88 + lVar52 + lVar34];
                          uStack_bc0 = 0;
                          local_488 = local_c70._vptr_BaseFab[lVar62 + lVar88 + lVar52 + lVar34 * 5]
                          ;
                          uStack_480 = 0;
                          local_838 = local_c70._vptr_BaseFab[lVar62 + lVar88 + lVar52 + lVar34 * 3]
                          ;
                          uStack_830 = 0;
                          local_ff8 = local_c70._vptr_BaseFab[lVar78 + lVar75 + lVar52 + lVar34 * 4]
                          ;
                          uStack_ff0 = 0;
                          local_10f8 = local_c70._vptr_BaseFab[lVar78 + lVar75 + lVar52 + lVar34];
                          uStack_10f0 = 0;
                          local_1068._8_8_ = 0;
                          local_1068._0_8_ =
                               local_c70._vptr_BaseFab[lVar78 + lVar75 + lVar42 + lVar34];
                          local_1088 = local_c70._vptr_BaseFab
                                       [lVar78 + lVar75 + lVar42 + lVar34 * 4];
                          uStack_1080 = 0;
                          local_10e8 = local_c70._vptr_BaseFab
                                       [lVar78 + lVar75 + lVar42 + lVar34 * 6];
                          uStack_10e0 = 0;
                          local_fe8 = local_c70._vptr_BaseFab[lVar78 + lVar64 + lVar42 + lVar34 * 6]
                          ;
                          uStack_fe0 = 0;
                          local_10d8 = local_c90[lVar34 * 2];
                          uStack_10d0 = 0;
                          local_ea8 = local_c90[lVar34 * 6];
                          uStack_ea0 = 0;
                          local_d88 = local_c90[lVar34 * 3];
                          uStack_d80 = 0;
                          local_1048 = local_c70._vptr_BaseFab
                                       [lVar62 + lVar75 + lVar42 + lVar34 * 5];
                          uStack_1040 = 0;
                          local_dd8 = local_c70._vptr_BaseFab[lVar62 + lVar75 + lVar42 + lVar34 * 3]
                          ;
                          dStack_dd0 = 0.0;
                          local_f38 = local_10c8;
                          if (((double)p_Var67 == 0.0) && (!NAN((double)p_Var67))) {
                            local_f38 = 0.5;
                          }
                          uStack_f30 = 0;
                          uStack_10c0 = 0;
                          dVar203 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar122 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 4]);
                          local_fc8 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar77 + lVar88 + lVar42 + lVar34 * 4]);
                          dVar192 = ABS((double)local_5e8);
                          dStack_fc0 = 0.0;
                          local_d48 = ABS((double)local_c70._vptr_BaseFab
                                                  [lVar77 + lVar88 + lVar42 + lVar34 * 2]) /
                                      (dVar203 + local_fc8 + 1e-100);
                          dStack_d40 = 0.0;
                          dVar181 = ABS((double)local_608) / (dVar122 + dVar192 + 1e-100);
                          dVar123 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34]) /
                                    (dVar203 + dVar122 + 1e-100) + 1.0;
                          dVar212 = ABS((double)local_8d0[lVar88 + lVar42 + lVar34]) /
                                    (local_fc8 + dVar192 + 1e-100) + 1.0;
                          dVar127 = (dVar123 + local_d48) * dVar203;
                          uVar31 = -(ulong)((double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar65 + lVar42 + lVar34 * 3] == 0.0);
                          dVar164 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar141 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar225 = ABS((double)local_a28);
                          dVar155 = ABS((double)local_a08);
                          dVar231 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 3]) /
                                    (dVar164 + dVar225 + 1e-100);
                          dVar213 = ABS((double)local_a18) / (dVar141 + dVar155 + 1e-100);
                          dVar218 = ABS((double)local_548) / (dVar164 + dVar141 + 1e-100) + 1.0;
                          dVar193 = ABS((double)local_5f8) / (dVar225 + dVar155 + 1e-100) + 1.0;
                          dVar142 = (dVar218 + dVar231) * dVar164;
                          local_1018 = (double *)
                                       ABS((double)local_c70._vptr_BaseFab
                                                   [lVar77 + lVar65 + lVar42 + lVar34 * 6]);
                          dVar165 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 6]);
                          dVar156 = ABS((double)local_5b8);
                          dVar226 = ABS((double)local_588);
                          uStack_1010 = 0;
                          dVar172 = ABS((double)local_8d0[lVar65 + lVar42 + lVar34 * 3]) /
                                    ((double)local_1018 + dVar156 + 1e-100);
                          dVar233 = ABS((double)local_598) / (dVar165 + dVar226 + 1e-100);
                          dVar166 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 2]) /
                                    ((double)local_1018 + dVar165 + 1e-100) + 1.0;
                          dVar230 = ABS((double)local_5a8) / (dVar156 + dVar226 + 1e-100) + 1.0;
                          dVar129 = (dVar166 + dVar172) * (double)local_1018;
                          dVar174 = ABS((double)local_998);
                          dVar167 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar169 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar88 + lVar42 + lVar34 * 7]) + dVar103;
                          local_1028 = (double)local_c70._vptr_BaseFab
                                               [lVar82 + lVar75 + lVar52 + lVar34 * 7] * local_1300
                                       + dVar208 * (double)local_c70._vptr_BaseFab
                                                           [lVar82 + lVar75 + lVar52 + lVar34 * 5] +
                                         dVar139 * (double)local_10a8._0_8_ + local_8e0;
                          dVar143 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 4]);
                          dVar170 = ABS((double)local_b08);
                          dVar151 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar203 + dVar143 + 1e-100);
                          dVar157 = ABS((double)local_b18) / (dVar122 + dVar170 + 1e-100);
                          dVar235 = ABS((double)local_af8) / (dVar143 + dVar170 + 1e-100) + 1.0;
                          dVar130 = (dVar151 + dVar235) * dVar143;
                          dVar184 = ABS((double)local_3b8);
                          dVar204 = ABS((double)local_528);
                          dVar183 = ABS((double)local_508) / (dVar164 + dVar184 + 1e-100);
                          dVar214 = ABS((double)local_3a8) / (dVar141 + dVar204 + 1e-100);
                          dVar194 = ABS((double)local_518) / (dVar184 + dVar204 + 1e-100) + 1.0;
                          dVar184 = (dVar183 + dVar194) * dVar184;
                          dVar111 = dVar187 + ABS((double)local_4f8);
                          dVar144 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar75 + lVar52 + lVar34 * 7]);
                          dVar209 = dVar103 + dVar187;
                          dVar158 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar42 + lVar34 * 6]);
                          dVar131 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar52 + lVar34 * 6]);
                          dVar132 = ABS((double)local_f28);
                          dVar210 = ABS((double)local_f08);
                          dVar159 = ABS((double)local_d28) / (dVar158 + dVar132 + 1e-100);
                          dVar215 = ABS((double)local_f18) / (dVar131 + dVar210 + 1e-100);
                          dVar145 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar77 + lVar64 + lVar52 + lVar34 * 2]) /
                                    (dVar158 + dVar131 + 1e-100) + 1.0;
                          dVar195 = ABS((double)local_aa8) / (dVar132 + dVar210 + 1e-100) + 1.0;
                          dVar113 = (dVar145 + dVar159) * dVar158;
                          dVar160 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar42 + lVar34 * 4]);
                          dVar138 = ABS((double)local_c28);
                          dVar196 = ABS((double)local_d18) / (dVar160 + dVar138 + 1e-100);
                          dVar114 = ABS((double)local_dc8) / (local_fc8 + dVar138 + 1e-100) + 1.0;
                          dVar171 = ABS((double)local_1078) / (dVar203 + dVar160 + 1e-100) + 1.0;
                          dVar177 = (dVar171 + dVar196) * dVar160;
                          dVar219 = ABS((double)local_ef8);
                          dVar178 = ABS((double)local_a98);
                          dVar234 = ABS((double)local_858) / ((double)local_1018 + dVar219 + 1e-100)
                          ;
                          dVar197 = ABS((double)local_c18) / (dVar165 + dVar178 + 1e-100);
                          dVar140 = ABS((double)local_c08) / (dVar219 + dVar178 + 1e-100) + 1.0;
                          dVar219 = (dVar234 + dVar140) * dVar219;
                          dVar224 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar65 + lVar52 + lVar34 * 7]);
                          dVar161 = dVar109 + ABS((double)local_a88);
                          dVar146 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar42 + lVar34 * 5]);
                          dVar168 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar52 + lVar34 * 5]);
                          dVar162 = ABS((double)local_848);
                          dVar175 = ABS((double)local_488);
                          dVar211 = ABS((double)local_a58) / (dVar146 + dVar162 + 1e-100);
                          dVar120 = ABS((double)local_838) / (dVar168 + dVar175 + 1e-100);
                          dVar173 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar62 + lVar65 + lVar52 + lVar34]) /
                                    (dVar146 + dVar168 + 1e-100) + 1.0;
                          dVar220 = ABS((double)local_bc8) / (dVar162 + dVar175 + 1e-100) + 1.0;
                          dVar216 = (dVar173 + dVar211) * dVar146;
                          dVar121 = (double)local_df8 / local_1038;
                          dVar163 = ABS((double)local_1088);
                          dVar147 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar75 + lVar42 + lVar34 * 2]) /
                                    (dVar160 + dVar163 + 1e-100);
                          dVar134 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar75 + lVar42 + lVar34]) /
                                    (dVar143 + dVar163 + 1e-100) + 1.0;
                          dVar163 = (dVar134 + dVar147) * dVar163;
                          dVar190 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar75 + lVar52 + lVar34 * 7]);
                          dVar180 = ABS((double)local_fe8);
                          dVar227 = ABS((double)local_ea8);
                          dVar179 = ABS((double)local_c70._vptr_BaseFab
                                                [lVar78 + lVar64 + lVar42 + lVar34 * 3]) /
                                    (dVar158 + dVar180 + 1e-100);
                          dVar135 = ABS((double)local_d88) / (dVar131 + dVar227 + 1e-100);
                          dVar201 = ABS((double)local_10d8) / (dVar180 + dVar227 + 1e-100) + 1.0;
                          dVar180 = (dVar179 + dVar201) * dVar180;
                          dVar149 = ABS((double)local_1048);
                          dVar191 = ABS((double)local_c88[lVar34 * 5]);
                          dVar148 = ABS((double)local_dd8) / (dVar146 + dVar149 + 1e-100);
                          dVar150 = ABS((double)local_c88[lVar34 * 3]) /
                                    (dVar168 + dVar191 + 1e-100);
                          dVar202 = ABS((double)local_c88[lVar34]) / (dVar149 + dVar191 + 1e-100) +
                                    1.0;
                          dVar149 = (dVar148 + dVar202) * dVar149;
                          local_2d8[(long)local_d38] =
                               (_func_int *)
                               ((((double)(~-(ulong)((double)local_eb8 == 0.0) & (ulong)local_10c8 |
                                          (ulong)local_f38 & -(ulong)((double)local_eb8 == 0.0)) *
                                  (dVar200 * (double)local_ff8 +
                                  dVar121 * (double)local_c70._vptr_BaseFab
                                                    [lVar78 + lVar75 + lVar52 + lVar34 * 7]) +
                                 (dVar149 /
                                 ((dVar173 + dVar148) * dVar146 + dVar149 +
                                  (dVar173 + dVar150) * dVar168 + (dVar202 + dVar150) * dVar191 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar78 + lVar63 + lVar52 + lVar34 * 6] * dVar121 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar44 + lVar52 + lVar34 * 7] * local_1450 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar44 + lVar52 + lVar34 * 4] * dVar126 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar63 + lVar52 + lVar34 * 2] * dVar200) +
                                 (dVar180 /
                                 ((dVar145 + dVar179) * dVar158 + dVar180 +
                                  (dVar145 + dVar135) * dVar131 + (dVar201 + dVar135) * dVar227 +
                                 1e-100)) *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar75 + lVar52 + lVar34 * 5] * dVar121 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar84 + lVar75 + lVar52 + lVar34 * 7] * local_1448 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar84 + lVar75 + lVar52 + lVar34 * 4] * local_ce8 +
                                 (double)local_10a8._0_8_ * dVar200) +
                                 local_e98 *
                                 (ABS((double)local_10e8) /
                                  (dVar109 + (double)local_e18._M_head_impl + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar75 + lVar42 + lVar34 * 5]) /
                                 (dVar187 + (double)local_e18._M_head_impl + 1e-100) +
                                 ABS((double)local_ff8) /
                                 (dVar190 + (double)local_e18._M_head_impl + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar75 + lVar42 + lVar34 * 3]) /
                                 (dVar209 + dVar109 + (double)local_e18._M_head_impl + 1e-100) +
                                 ABS((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar75 + lVar52 + lVar34 * 2]) /
                                 (dVar224 + dVar109 + (double)local_e18._M_head_impl + dVar190 +
                                 1e-100) + ABS((double)local_10f8) /
                                           (dVar144 + dVar187 + (double)local_e18._M_head_impl +
                                            dVar190 + 1e-100) + 1.0) *
                                 ((double)p_Var5 * dVar121 +
                                 (double)local_f68 * local_1450 +
                                 (double)local_e08 * local_1448 +
                                 (double)p_Var69 * dVar200 +
                                 (double)p_Var56 * dVar126 +
                                 dVar217 * (double)local_c70._vptr_BaseFab
                                                   [lVar84 + lVar44 + lVar52 + lVar34 * 4] +
                                 (double)p_Var76 * local_ce8 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar84 + lVar44 + lVar52 + lVar34 * 7]) +
                                 (dVar163 /
                                 ((dVar171 + dVar147) * dVar160 +
                                  (dVar151 + dVar134) * dVar143 + (dVar151 + dVar171) * dVar203 +
                                  dVar163 + 1e-100)) *
                                 ((double)p_Var2 * dVar200 +
                                 dVar126 * (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar44 + lVar42 + lVar34 * 5] +
                                 (double)local_ee8 +
                                 local_ce8 *
                                 (double)local_c70._vptr_BaseFab
                                         [lVar84 + lVar63 + lVar42 + lVar34 * 6]) +
                                 ((double)local_f88 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar82 + lVar75 + lVar42 + lVar34 * 5] * dVar200) *
                                 local_bb8 +
                                 local_14c8 *
                                 ((double)local_c70._vptr_BaseFab
                                          [lVar78 + lVar44 + lVar42 + lVar34 * 7] * dVar126 +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar63 + lVar42 + lVar34 * 6] * dVar200) +
                                 (double)local_c70._vptr_BaseFab
                                         [lVar78 + lVar75 + lVar42 + lVar34 * 7] * dVar200) * 0.125
                                + ((dVar216 /
                                   ((dVar211 + dVar220) * dVar162 + dVar216 +
                                    (dVar173 + dVar120) * dVar168 + (dVar220 + dVar120) * dVar175 +
                                   1e-100)) *
                                   ((double)local_c70._vptr_BaseFab
                                            [lVar78 + lVar63 + lVar52 + lVar34 * 7] * local_14d0 +
                                   dVar128 * (double)local_c70._vptr_BaseFab
                                                     [lVar78 + lVar63 + lVar52 + lVar34 * 6] +
                                   dVar236 * (double)local_c70._vptr_BaseFab
                                                     [lVar78 + lVar63 + lVar52 + lVar34 * 2] +
                                   local_d98) +
                                  (double)(~-(ulong)((double)local_d68 == 0.0) & (ulong)local_d78 |
                                          (ulong)local_f58 & -(ulong)((double)local_d68 == 0.0)) *
                                  ((double)local_868 * dVar236 + local_898) +
                                  local_a48 *
                                  (ABS((double)local_888) / (dVar161 + 1e-100) +
                                  ABS((double)local_878) / (dVar103 + dVar109 + 1e-100) +
                                  ABS((double)local_868) / (dVar109 + dVar224 + 1e-100) +
                                  ABS((double)local_be8) /
                                  (dVar169 + dVar109 + ABS((double)local_a88) + 1e-100) +
                                  ABS((double)local_a78) /
                                  (ABS((double)local_bf8) + dVar224 + dVar161 + 1e-100) +
                                  ABS((double)local_d08) /
                                  (dVar167 + dVar103 + dVar109 + dVar224 + 1e-100) + 1.0) *
                                  ((double)p_Var6 * local_14d0 +
                                  (double)p_Var5 * dVar128 +
                                  (double)p_Var3 * dVar124 +
                                  (double)p_Var69 * dVar236 +
                                  (double)p_Var76 * dVar232 +
                                  dVar228 * (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar63 + lVar52 + lVar34 * 4] +
                                  (double)local_e08 * dVar189 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar84 + lVar63 + lVar52 + lVar34 * 7]) +
                                  (dVar219 /
                                  ((dVar166 + dVar234) * (double)local_1018 + dVar219 +
                                   (dVar166 + dVar197) * dVar165 + (dVar140 + dVar197) * dVar178 +
                                  1e-100)) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar65 + lVar52 + lVar34 * 5] * dVar128 +
                                  dVar189 * (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar65 + lVar52 + lVar34 * 7] +
                                  local_da8 +
                                  (double)local_c70._vptr_BaseFab[lVar82 + lVar65 + lVar52 + lVar34]
                                  * dVar236) +
                                  local_a68 +
                                  (dVar177 /
                                  ((local_d48 + dVar114) * local_fc8 +
                                   (local_d48 + dVar171) * dVar203 + dVar177 +
                                   (dVar114 + dVar196) * dVar138 + 1e-100)) *
                                  (dVar124 * (double)local_c70._vptr_BaseFab
                                                     [lVar82 + lVar63 + lVar42 + lVar34 * 5] +
                                  (double)p_Var2 * dVar236 +
                                  dVar232 * (double)local_c70._vptr_BaseFab
                                                    [lVar84 + lVar63 + lVar42 + lVar34 * 6] +
                                  local_828) + local_e88 * (local_db8 + (double)local_f78 * dVar236)
                                  + (double)local_ed8 *
                                    ((double)local_c70._vptr_BaseFab
                                             [lVar78 + lVar63 + lVar42 + lVar34 * 6] * dVar236 +
                                    local_cf8)) * 0.125 +
                                  ((dVar113 /
                                   ((dVar159 + dVar195) * dVar132 + dVar113 +
                                    (dVar145 + dVar215) * dVar131 + (dVar195 + dVar215) * dVar210 +
                                   1e-100)) * local_1028 +
                                  local_1008 *
                                  (ABS((double)local_4d8) / (dVar209 + 1e-100) +
                                  ABS((double)local_4c8) / (dVar111 + 1e-100) +
                                  ABS((double)local_4b8) / (dVar187 + dVar144 + 1e-100) +
                                  ABS((double)local_978) /
                                  (dVar174 + dVar209 + ABS((double)local_4f8) + 1e-100) +
                                  ABS((double)local_398) / (dVar167 + dVar209 + dVar144 + 1e-100) +
                                  ABS((double)local_4e8) /
                                  (ABS((double)local_988) + dVar111 + dVar144 + 1e-100) + 1.0) *
                                  ((double)p_Var7 * local_1300 + local_d58) +
                                  (double)(~-(ulong)((double)local_fd8 == 0.0) & (ulong)piVar152 |
                                          (ulong)local_1058 & -(ulong)((double)local_fd8 == 0.0)) *
                                  ((double)local_4b8 * dVar139 + local_c78) +
                                  (dVar184 /
                                  ((dVar218 + dVar183) * dVar164 + dVar184 +
                                   (dVar218 + dVar214) * dVar141 + (dVar194 + dVar214) * dVar204 +
                                  1e-100)) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar77 + lVar63 + lVar52 + lVar34 * 6] * dVar208 +
                                  dVar229 * (double)local_c70._vptr_BaseFab
                                                    [lVar77 + lVar44 + lVar52 + lVar34 * 7] +
                                  local_e68 + (double)local_e78 * dVar139) +
                                  (dVar130 /
                                  ((dVar123 + dVar151) * dVar203 + dVar130 +
                                   (dVar123 + dVar157) * dVar122 + (dVar235 + dVar157) * dVar170 +
                                  1e-100)) *
                                  (dVar182 * (double)local_10b8 +
                                  local_bd8 +
                                  dVar133 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar44 + lVar42 + lVar34 * 5] +
                                  (double)p_Var2 * dVar139) +
                                  (double)local_ec8._0_8_ *
                                  (local_c80 +
                                  (double)local_c70._vptr_BaseFab
                                          [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar139) +
                                  local_9a8 +
                                  (double)local_11b8 *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar75 + lVar42 + lVar34 * 5] * dVar139 +
                                  local_538)) * 0.125 +
                                  ((double)local_8d0[lVar88 + lVar52 + lVar34 * 8] * dVar103 *
                                   (ABS((double)local_568) / (dVar169 + 1e-100) +
                                   ABS((double)local_558) / (dVar103 + dVar174 + 1e-100) +
                                   ABS((double)local_f48) / (dVar103 + dVar167 + 1e-100) +
                                   ABS((double)local_9b8) /
                                   (ABS((double)local_9c8) + dVar174 + dVar169 + 1e-100) +
                                   ABS((double)local_578) /
                                   (ABS((double)local_9e8) + dVar167 + dVar169 + 1e-100) +
                                   ABS((double)local_9d8) /
                                   (ABS((double)local_9f8) + dVar103 + dVar174 + dVar167 + 1e-100) +
                                   1.0) * (dVar102 * (double)p_Var7 +
                                           dVar108 * (double)p_Var6 +
                                           (double)p_Var5 * local_de8 +
                                           (double)local_c70._vptr_BaseFab
                                                   [lVar82 + lVar63 + lVar52 + lVar34 * 4] * dVar112
                                           + (double)p_Var4 * dVar110 +
                                             (double)p_Var69 * dVar125 + (double)p_Var3 * dVar115 +
                                          (double)local_c70._vptr_BaseFab
                                                  [lVar82 + lVar63 + lVar52 + lVar34 * 7]) +
                                  (dVar129 /
                                  ((dVar172 + dVar230) * dVar156 + dVar129 +
                                   (dVar166 + dVar233) * dVar165 + (dVar230 + dVar233) * dVar226 +
                                  1e-100)) *
                                  ((double)local_c70._vptr_BaseFab
                                           [lVar82 + lVar65 + lVar52 + lVar34 * 7] * dVar102 +
                                  local_de8 *
                                  (double)local_c70._vptr_BaseFab
                                          [lVar82 + lVar65 + lVar52 + lVar34 * 5] +
                                  dVar125 * (double)local_c70._vptr_BaseFab
                                                    [lVar82 + lVar65 + lVar52 + lVar34] + local_b28)
                                  + (dVar142 /
                                    ((dVar231 + dVar193) * dVar225 + dVar142 +
                                     (dVar218 + dVar213) * dVar141 + (dVar193 + dVar213) * dVar155 +
                                    1e-100)) *
                                    ((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar63 + lVar52 + lVar34 * 7] * dVar108 +
                                    (double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar63 + lVar52 + lVar34 * 6] * local_de8 +
                                    (double)local_e78 * dVar125 + local_b38) +
                                    (double)(~uVar31 & (ulong)dVar188 | (ulong)dVar223 & uVar31) *
                                    ((double)local_f48 * dVar125 + local_a38) +
                                    (dVar127 /
                                    ((local_d48 + dVar212) * local_fc8 + dVar127 +
                                     (dVar123 + dVar181) * dVar122 + (dVar212 + dVar181) * dVar192 +
                                    1e-100)) *
                                    ((double)local_c70._vptr_BaseFab
                                             [lVar82 + lVar63 + lVar42 + lVar34 * 7] * dVar112 +
                                    dVar110 * (double)local_10b8 +
                                    (double)p_Var2 * dVar125 +
                                    dVar115 * (double)local_c70._vptr_BaseFab
                                                      [lVar82 + lVar63 + lVar42 + lVar34 * 5]) +
                                    local_1238 * ((double)local_f78 * dVar125 + local_5c8) +
                                    (double)local_c70._vptr_BaseFab
                                            [lVar77 + lVar65 + lVar42 + lVar34 * 7] * dVar125 +
                                    ((double)local_c70._vptr_BaseFab
                                             [lVar77 + lVar63 + lVar42 + lVar34 * 6] * dVar125 +
                                    local_5d8) * local_12a8) * 0.125) * 0.25);
                          lVar72 = lVar72 + 1;
                          pFVar55 = local_2f8;
                        } while (local_8bc != (int)lVar72);
                      }
                      local_958 = local_958 + 1;
                    } while (local_8c0 != (int)local_958);
                  }
                  local_960 = (ulong)(iVar30 + 1);
                } while (iVar30 != iStack_ad4);
              }
              MFIter::operator++((MFIter *)local_ba0);
            } while (aiStack_b80[0] < aiStack_b80[2]);
          }
          pFVar55 = local_4a8;
          MFIter::~MFIter((MFIter *)local_ba0);
          MFIter::MFIter((MFIter *)local_ba0,&pFVar55->super_FabArrayBase,true);
          if (aiStack_b80[0] < aiStack_b80[2]) {
            do {
              MFIter::tilebox((Box *)&local_c70,(MFIter *)local_ba0);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_e60,pFVar55,(MFIter *)local_ba0);
              uVar31 = (ulong)DAT_0065b980;
              uVar154 = (ulong)DAT_0065c6d0;
              if ((int)local_c70.super_DataAllocator.m_arena <= local_c70.dptr._4_4_) {
                lVar51 = (long)local_c70._vptr_BaseFab._4_4_;
                iVar30 = (int)local_c70.super_DataAllocator.m_arena + -1;
                iVar39 = (int)local_c70.super_DataAllocator.m_arena;
                do {
                  if (local_c70._vptr_BaseFab._4_4_ <= (int)local_c70.dptr) {
                    lVar70 = (long)local_e58 * 8;
                    lVar77 = ((lVar51 + -1) - (long)iStack_e3c) * lVar70;
                    lVar74 = (long)(iVar30 - local_e38) * auStack_e50._0_8_ * 8;
                    lVar86 = lVar77 + lVar74;
                    lVar57 = (long)stack0xfffffffffffff1b8 * 0x38;
                    lVar34 = ((long)iVar39 - (long)local_e38) * auStack_e50._0_8_ * 8;
                    lVar77 = lVar77 + lVar34;
                    lVar42 = (lVar51 - iStack_e3c) * lVar70;
                    lVar74 = lVar74 + lVar42;
                    lVar42 = lVar42 + lVar34;
                    lVar34 = (long)stack0xfffffffffffff1b8 * 0x30;
                    lVar78 = (long)iStack_e40;
                    lVar82 = (long)local_e60 +
                             lVar86 + lVar57 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar53 = (long)local_e60 +
                             lVar77 + lVar57 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar71 = (long)local_e60 +
                             lVar77 + (long)stack0xfffffffffffff1b8 * 0x20 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar52 = (long)local_e60 +
                             lVar74 + lVar57 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar72 = (long)local_e60 +
                             lVar74 + (long)stack0xfffffffffffff1b8 * 0x28 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar75 = (long)local_e60 +
                             lVar57 + lVar42 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                    local_1740 = (long)local_e60 +
                                 (long)stack0xfffffffffffff1b8 * 0x28 + lVar42 + lVar78 * -8 +
                                 (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar87 = (long)local_e60 +
                             (long)stack0xfffffffffffff1b8 * 0x20 + lVar42 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar84 = (long)local_e60 +
                             lVar42 + (long)stack0xfffffffffffff1b8 * 8 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    local_1780 = (long)local_e60 +
                                 lVar74 + lVar34 + lVar78 * -8 +
                                 (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar81 = (long)local_e60 +
                             lVar74 + (long)stack0xfffffffffffff1b8 * 0x18 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    local_16f8 = (long)local_e60 +
                                 (long)stack0xfffffffffffff1b8 * 0x40 + lVar42 + lVar78 * -8 +
                                 (long)(int)local_c70._vptr_BaseFab * 8;
                    local_1748 = (long)local_e60 +
                                 lVar42 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                    local_1778 = (long)local_e60 +
                                 lVar42 + lVar34 + lVar78 * -8 +
                                 (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar74 = (long)local_e60 +
                             (long)stack0xfffffffffffff1b8 * 0x18 + lVar42 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar42 = (long)local_e60 +
                             lVar42 + (long)stack0xfffffffffffff1b8 * 0x10 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    lVar57 = (long)local_e60 +
                             lVar86 + lVar34 + lVar78 * -8 + (long)(int)local_c70._vptr_BaseFab * 8;
                    local_1788 = (_func_int *)
                                 ((long)local_e60 +
                                 lVar34 + lVar77 + lVar78 * -8 +
                                 (long)(int)local_c70._vptr_BaseFab * 8);
                    lVar86 = (long)local_e60 +
                             (long)stack0xfffffffffffff1b8 * 0x10 + lVar77 + lVar78 * -8 +
                             (long)(int)local_c70._vptr_BaseFab * 8;
                    local_1730 = (_func_int *)lVar51;
                    do {
                      if ((int)local_c70._vptr_BaseFab <=
                          local_c70.super_DataAllocator.m_arena._4_4_) {
                        lVar34 = 0;
                        do {
                          *(ulong *)(local_1748 + lVar34 * 8) =
                               (ulong)(*(double *)(lVar84 + -8 + lVar34 * 8) +
                                       *(double *)(lVar84 + lVar34 * 8) +
                                       *(double *)(lVar86 + lVar34 * 8) +
                                       *(double *)(lVar42 + lVar34 * 8) +
                                       *(double *)(lVar81 + lVar34 * 8) +
                                       *(double *)(lVar74 + lVar34 * 8) +
                                       *(double *)(lVar71 + -8 + lVar34 * 8) +
                                       *(double *)(lVar71 + lVar34 * 8) +
                                       *(double *)(lVar87 + -8 + lVar34 * 8) +
                                       *(double *)(lVar87 + lVar34 * 8) +
                                       *(double *)(lVar72 + -8 + lVar34 * 8) +
                                       *(double *)(lVar72 + lVar34 * 8) +
                                       *(double *)(local_1740 + -8 + lVar34 * 8) +
                                       *(double *)(local_1740 + lVar34 * 8) +
                                       *(double *)(lVar57 + lVar34 * 8) +
                                       *(double *)(local_1780 + lVar34 * 8) +
                                       *(double *)((long)local_1788 + lVar34 * 8) +
                                       *(double *)(local_1778 + lVar34 * 8) +
                                       *(double *)(lVar82 + -8 + lVar34 * 8) +
                                       *(double *)(lVar82 + lVar34 * 8) +
                                       *(double *)(lVar52 + -8 + lVar34 * 8) +
                                       *(double *)(lVar52 + lVar34 * 8) +
                                       *(double *)(lVar53 + -8 + lVar34 * 8) +
                                       *(double *)(lVar53 + lVar34 * 8) +
                                       *(double *)(lVar75 + -8 + lVar34 * 8) +
                                      *(double *)(lVar75 + lVar34 * 8)) ^ uVar31;
                          *(double *)(local_16f8 + lVar34 * 8) =
                               1.0 / ((double)(*(ulong *)(lVar75 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(lVar75 + -8 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(lVar53 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(lVar53 + -8 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(lVar52 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(lVar52 + -8 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(lVar82 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(lVar82 + -8 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)(local_1778 + lVar34 * 8) & uVar154) +
                                      (double)(*(ulong *)((long)local_1788 + lVar34 * 8) & uVar154)
                                      + (double)(*(ulong *)(local_1780 + lVar34 * 8) & uVar154) +
                                        (double)(*(ulong *)(lVar57 + lVar34 * 8) & uVar154) +
                                        (double)(*(ulong *)(local_1740 + lVar34 * 8) & uVar154) +
                                        (double)(*(ulong *)(local_1740 + -8 + lVar34 * 8) & uVar154)
                                        + (double)(*(ulong *)(lVar72 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar72 + -8 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar87 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar87 + -8 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar71 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar71 + -8 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar74 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar81 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar42 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar86 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar84 + lVar34 * 8) & uVar154) +
                                          (double)(*(ulong *)(lVar84 + -8 + lVar34 * 8) & uVar154) +
                                     1e-100);
                          lVar34 = lVar34 + 1;
                        } while ((local_c70.super_DataAllocator.m_arena._4_4_ -
                                 (int)local_c70._vptr_BaseFab) + 1 != (int)lVar34);
                      }
                      local_1730 = (_func_int *)((long)local_1730 + 1);
                      lVar82 = lVar82 + lVar70;
                      lVar53 = lVar53 + lVar70;
                      lVar71 = lVar71 + lVar70;
                      lVar52 = lVar52 + lVar70;
                      lVar72 = lVar72 + lVar70;
                      lVar75 = lVar75 + lVar70;
                      local_1740 = local_1740 + lVar70;
                      lVar87 = lVar87 + lVar70;
                      lVar84 = lVar84 + lVar70;
                      local_1780 = local_1780 + lVar70;
                      lVar81 = lVar81 + lVar70;
                      local_16f8 = local_16f8 + lVar70;
                      local_1748 = local_1748 + lVar70;
                      local_1778 = local_1778 + lVar70;
                      lVar74 = lVar74 + lVar70;
                      lVar42 = lVar42 + lVar70;
                      lVar57 = lVar57 + lVar70;
                      local_1788 = (_func_int *)((long)local_1788 + lVar70);
                      lVar86 = lVar86 + lVar70;
                    } while ((int)local_c70.dptr + 1 != (int)local_1730);
                  }
                  iVar30 = iVar30 + 1;
                  bVar92 = iVar39 != local_c70.dptr._4_4_;
                  iVar39 = iVar39 + 1;
                } while (bVar92);
              }
              MFIter::operator++((MFIter *)local_ba0);
              pFVar55 = local_4a8;
            } while (aiStack_b80[0] < aiStack_b80[2]);
          }
          MFIter::~MFIter((MFIter *)local_ba0);
          if (bVar91 || !bVar90) {
            period = Periodicity::NonPeriodic();
            FabArray<amrex::FArrayBox>::ParallelCopy
                      (local_380,(FabArray<amrex::FArrayBox> *)local_268,period,COPY);
          }
          lVar51 = local_378;
          pFVar55 = *(FabArray<amrex::FArrayBox> **)
                     (*(long *)((long)&(((this->m_stencil).
                                         super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       ).
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               + local_388) + local_378 * 8);
          PVar237 = Geometry::periodicity
                              ((Geometry *)
                               (local_378 * 200 +
                               *(long *)((long)&(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                ).
                                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                        + local_388)));
          local_ba0[0] = PVar237.period.vect[0]._0_1_;
          local_ba0._1_2_ = PVar237.period.vect[0]._1_2_;
          local_ba0[3] = PVar237.period.vect[0]._3_1_;
          local_ba0._4_4_ = PVar237.period.vect[1];
          local_ba0._8_4_ = PVar237.period.vect[2];
          FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar55,(Periodicity *)local_ba0,false);
          MultiFab::~MultiFab((MultiFab *)local_268);
          lVar51 = lVar51 + 1;
        } while (lVar51 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar47]);
      }
      uVar47 = uVar47 + 1;
      iVar30 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
      uVar31 = (ulong)iVar30;
    } while ((long)uVar47 < (long)uVar31);
    if (0 < iVar30) {
      puVar48 = (uint *)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                        super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      lVar51 = 0;
      do {
        if (0 < (int)puVar48[lVar51]) {
          lVar86 = 0;
          do {
            MFIter::MFIter((MFIter *)local_268,
                           *(FabArrayBase **)
                            (*(long *)&(local_fb0->
                                       super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       ).
                                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar51].
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            + lVar86 * 8),true);
            if ((int)local_268._32_4_ < (int)local_268._40_4_) {
              do {
                MFIter::tilebox((Box *)&local_c70,(MFIter *)local_268);
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          ((Array4<const_double> *)local_ba0,
                           *(FabArray<amrex::FArrayBox> **)
                            (*(long *)&(this->m_stencil).
                                       super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar51].
                                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            + lVar86 * 8),(MFIter *)local_268);
                FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                          ((Array4<int> *)local_e60,
                           *(FabArray<amrex::IArrayBox> **)
                            (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                                       super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar51].
                                       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                            + lVar86 * 8),(MFIter *)local_268);
                if ((int)local_c70.super_DataAllocator.m_arena <= local_c70.dptr._4_4_) {
                  iVar30 = (int)local_c70.super_DataAllocator.m_arena;
                  do {
                    if (local_c70._vptr_BaseFab._4_4_ <= (int)local_c70.dptr) {
                      iVar39 = local_c70._vptr_BaseFab._4_4_;
                      do {
                        if ((int)local_c70._vptr_BaseFab <=
                            local_c70.super_DataAllocator.m_arena._4_4_) {
                          iVar49 = (int)local_c70._vptr_BaseFab;
                          do {
                            dVar102 = *(double *)
                                       (CONCAT44(local_ba0._4_4_,
                                                 CONCAT13(local_ba0[3],
                                                          CONCAT21(local_ba0._1_2_,local_ba0[0]))) +
                                        ((long)iVar39 - (long)aiStack_b80[1]) *
                                        CONCAT44(local_ba0._12_4_,local_ba0._8_4_) * 8 +
                                        (long)(iVar49 - aiStack_b80[0]) * 8 +
                                       ((long)iVar30 - (long)aiStack_b80[2]) *
                                       CONCAT44(local_ba0._20_4_,local_ba0._16_4_) * 8);
                            if ((dVar102 == 0.0) && (!NAN(dVar102))) {
                              *(undefined4 *)
                               ((long)local_e60 +
                               ((long)iVar30 - (long)local_e38) * auStack_e50._0_8_ * 4 +
                               (long)(iVar49 - iStack_e40) * 4 +
                               ((long)iVar39 - (long)iStack_e3c) * (long)local_e58 * 4) = 1;
                            }
                            iVar49 = iVar49 + 1;
                          } while (local_c70.super_DataAllocator.m_arena._4_4_ + 1 != iVar49);
                        }
                        bVar90 = iVar39 != (int)local_c70.dptr;
                        iVar39 = iVar39 + 1;
                      } while (bVar90);
                    }
                    bVar90 = iVar30 != local_c70.dptr._4_4_;
                    iVar30 = iVar30 + 1;
                  } while (bVar90);
                }
                MFIter::operator++((MFIter *)local_268);
              } while ((int)local_268._32_4_ < (int)local_268._40_4_);
            }
            MFIter::~MFIter((MFIter *)local_268);
            lVar86 = lVar86 + 1;
            puVar48 = (uint *)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                              super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
          } while (lVar86 < (int)puVar48[lVar51]);
          uVar31 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
        }
        lVar51 = lVar51 + 1;
      } while (lVar51 < (int)uVar31);
      goto LAB_005ba1b4;
    }
  }
  puVar48 = (uint *)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                    super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
LAB_005ba1b4:
  uVar47 = (ulong)*puVar48;
  uVar31 = uVar47;
  do {
    uVar31 = uVar31 - 1;
    iVar30 = (int)uVar47;
    if (iVar30 < 2) {
      iVar30 = 1;
      break;
    }
    iVar39 = iMultiFab::min(*(iMultiFab **)
                             (*(long *)&(((this->super_MLNodeLinOp).m_dirichlet_mask.
                                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                        ).
                                        super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                             + uVar31 * 8),0,0,false);
    uVar47 = (ulong)(iVar30 - 1);
  } while (iVar39 != 0);
  iVar39 = *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
            super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (iVar30 < iVar39) {
    resizeMultiGrid(this,iVar30);
    iVar39 = *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar32 = &(this->super_MLNodeLinOp).m_bottom_dot_mask;
  FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
            (&pMVar32->super_FabArray<amrex::FArrayBox>);
  pAVar17 = (this->super_MLNodeLinOp).m_bottom_dot_mask.super_FabArray<amrex::FArrayBox>.m_arrays.hp
  ;
  pFVar18 = *(FabArray<amrex::IArrayBox> **)
             (*(long *)&(((this->super_MLNodeLinOp).m_dirichlet_mask.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                        ).
                        super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              + -8 + (long)iVar39 * 8);
  FabArray<amrex::IArrayBox>::build_arrays<amrex::IArrayBox,_0>(pFVar18);
  pAVar19 = (pFVar18->m_const_arrays).hp;
  local_e60 = (undefined1  [8])0x0;
  auVar20._12_4_ = 0;
  auVar20._0_12_ = stack0xfffffffffffff1ac;
  _local_e58 = auVar20 << 0x20;
  local_ba0._4_4_ = Gpu::Device::max_gpu_streams.itype;
  local_ba0[0] = true;
  local_ba0._8_4_ = (undefined4)FabArrayBase::mfiter_tile_size;
  local_ba0._12_4_ = SUB84(FabArrayBase::mfiter_tile_size,4);
  local_ba0._16_4_ = DAT_00717ec0;
  local_ba0._1_2_ = 0x100;
  MFIter::MFIter((MFIter *)local_268,(FabArrayBase *)pMVar32,(MFItInfo *)local_ba0);
  if ((int)local_268._32_4_ < (int)local_268._40_4_) {
    do {
      MFIter::growntilebox((Box *)local_ba0,(MFIter *)local_268,(IntVect *)local_e60);
      piVar41 = (int *)(local_268 + 0x20);
      if ((long *)local_268._64_8_ != (long *)0x0) {
        piVar41 = (int *)((long)(int)local_268._32_4_ * 4 + *(long *)local_268._64_8_);
      }
      if ((int)local_ba0._8_4_ <= (int)local_ba0._20_4_) {
        iVar30 = CONCAT13(local_ba0[3],CONCAT21(local_ba0._1_2_,local_ba0[0]));
        pAVar1 = pAVar19 + *piVar41;
        pAVar73 = pAVar17 + *piVar41;
        IVar22.itype = local_ba0._8_4_;
        do {
          if ((int)local_ba0._4_4_ <= (int)local_ba0._16_4_) {
            IVar83.itype = local_ba0._4_4_;
            do {
              if (iVar30 <= (int)local_ba0._12_4_) {
                iVar39 = (pAVar1->begin).x;
                iVar49 = (pAVar1->begin).y;
                iVar85 = (pAVar1->begin).z;
                piVar41 = pAVar1->p;
                lVar51 = pAVar1->kstride;
                lVar86 = pAVar1->jstride;
                lVar34 = 0;
                do {
                  if (piVar41[(long)iVar30 +
                              ((((long)(int)IVar22.itype - (long)iVar85) * lVar51 +
                               ((long)(int)IVar83.itype - (long)iVar49) * lVar86 + lVar34) -
                              (long)iVar39)] != 0) {
                    pAVar73->p
                    [(((long)(int)IVar83.itype - (long)(pAVar73->begin).y) * pAVar73->jstride +
                     ((long)(int)IVar22.itype - (long)(pAVar73->begin).z) * pAVar73->kstride +
                     iVar30 + lVar34) - (long)(pAVar73->begin).x] = 0.0;
                  }
                  lVar34 = lVar34 + 1;
                } while ((local_ba0._12_4_ - iVar30) + 1 != (int)lVar34);
              }
              bVar90 = IVar83.itype != local_ba0._16_4_;
              IVar83.itype = IVar83.itype + 1;
            } while (bVar90);
          }
          bVar90 = IVar22.itype != local_ba0._20_4_;
          IVar22.itype = IVar22.itype + 1;
        } while (bVar90);
      }
      MFIter::operator++((MFIter *)local_268);
    } while ((int)local_268._32_4_ < (int)local_268._40_4_);
  }
  MFIter::~MFIter((MFIter *)local_268);
  if ((this->super_MLNodeLinOp).m_is_bottom_singular == true) {
    pMVar32 = &(this->super_MLNodeLinOp).m_coarse_dot_mask;
    FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
              (&pMVar32->super_FabArray<amrex::FArrayBox>);
    pAVar17 = (this->super_MLNodeLinOp).m_coarse_dot_mask.super_FabArray<amrex::FArrayBox>.m_arrays.
              hp;
    pFVar18 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                   super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ;
    FabArray<amrex::IArrayBox>::build_arrays<amrex::IArrayBox,_0>(pFVar18);
    pAVar19 = (pFVar18->m_const_arrays).hp;
    local_e60 = (undefined1  [8])0x0;
    auVar21._12_4_ = 0;
    auVar21._0_12_ = stack0xfffffffffffff1ac;
    _local_e58 = auVar21 << 0x20;
    local_ba0._4_4_ = Gpu::Device::max_gpu_streams.itype;
    local_ba0[0] = true;
    local_ba0._8_4_ = (undefined4)FabArrayBase::mfiter_tile_size;
    local_ba0._12_4_ = SUB84(FabArrayBase::mfiter_tile_size,4);
    local_ba0._16_4_ = DAT_00717ec0;
    local_ba0._1_2_ = 0x100;
    MFIter::MFIter((MFIter *)local_268,(FabArrayBase *)pMVar32,(MFItInfo *)local_ba0);
    if ((int)local_268._32_4_ < (int)local_268._40_4_) {
      do {
        MFIter::growntilebox((Box *)local_ba0,(MFIter *)local_268,(IntVect *)local_e60);
        piVar41 = (int *)(local_268 + 0x20);
        if ((long *)local_268._64_8_ != (long *)0x0) {
          piVar41 = (int *)((long)(int)local_268._32_4_ * 4 + *(long *)local_268._64_8_);
        }
        if ((int)local_ba0._8_4_ <= (int)local_ba0._20_4_) {
          iVar30 = CONCAT13(local_ba0[3],CONCAT21(local_ba0._1_2_,local_ba0[0]));
          pAVar1 = pAVar19 + *piVar41;
          pAVar73 = pAVar17 + *piVar41;
          IVar22.itype = local_ba0._8_4_;
          do {
            if ((int)local_ba0._4_4_ <= (int)local_ba0._16_4_) {
              IVar83.itype = local_ba0._4_4_;
              do {
                if (iVar30 <= (int)local_ba0._12_4_) {
                  iVar39 = (pAVar1->begin).x;
                  iVar49 = (pAVar1->begin).y;
                  iVar85 = (pAVar1->begin).z;
                  piVar41 = pAVar1->p;
                  lVar51 = pAVar1->kstride;
                  lVar86 = pAVar1->jstride;
                  lVar34 = 0;
                  do {
                    if (piVar41[(long)iVar30 +
                                ((((long)(int)IVar22.itype - (long)iVar85) * lVar51 +
                                 ((long)(int)IVar83.itype - (long)iVar49) * lVar86 + lVar34) -
                                (long)iVar39)] != 0) {
                      pAVar73->p
                      [(((long)(int)IVar83.itype - (long)(pAVar73->begin).y) * pAVar73->jstride +
                       ((long)(int)IVar22.itype - (long)(pAVar73->begin).z) * pAVar73->kstride +
                       iVar30 + lVar34) - (long)(pAVar73->begin).x] = 0.0;
                    }
                    lVar34 = lVar34 + 1;
                  } while ((local_ba0._12_4_ - iVar30) + 1 != (int)lVar34);
                }
                bVar90 = IVar83.itype != local_ba0._16_4_;
                IVar83.itype = IVar83.itype + 1;
              } while (bVar90);
            }
            bVar90 = IVar22.itype != local_ba0._20_4_;
            IVar22.itype = IVar22.itype + 1;
          } while (bVar90);
        }
        MFIter::operator++((MFIter *)local_268);
      } while ((int)local_268._32_4_ < (int)local_268._40_4_);
    }
    MFIter::~MFIter((MFIter *)local_268);
  }
  Gpu::Device::streamSynchronize();
  RVar106 = MultiFab::norm0((MultiFab *)
                            (*(pointer *)
                              ((long)&(((this->m_stencil).
                                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                        .
                                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                      ).
                                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                              + 8))[-1]._M_t.
                            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                            ,0,0,false,false);
  (*(pointer *)
    ((long)&(((this->m_s0_norm0).
              super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
              .
              super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_> + 8))[-1] =
       RVar106 * this->m_normalization_threshold;
  return;
}

Assistant:

void
MLNodeLaplacian::buildStencil ()
{
    m_stencil.resize(m_num_amr_levels);
    m_nosigma_stencil.resize(m_num_amr_levels);
    m_s0_norm0.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_stencil[amrlev].resize(m_num_mg_levels[amrlev]);
        m_s0_norm0[amrlev].resize(m_num_mg_levels[amrlev],0.0);
    }

    if (m_coarsening_strategy != CoarseningStrategy::RAP) return;

    const int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMREX_SPACEDIM != 1,
                                     "MLNodeLaplacian::buildStencil: 1d not supported");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!m_geom[0][0].IsRZ(),
                                     "MLNodeLaplacian::buildStencil: cylindrical not supported for RAP");

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        AMREX_ALWAYS_ASSERT(amrlev == m_num_amr_levels-1 || AMRRefRatio(amrlev) == 2);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const int nghost = (0 == amrlev && mglev+1 == m_num_mg_levels[amrlev]) ? 1 : 4;
            m_stencil[amrlev][mglev] = std::make_unique<MultiFab>
                (amrex::convert(m_grids[amrlev][mglev], IntVect::TheNodeVector()),
                 m_dmap[amrlev][mglev], ncomp_s, nghost);
            m_stencil[amrlev][mglev]->setVal(0.0);
        }

        if (amrlev > 0) {
            m_nosigma_stencil[amrlev] = std::make_unique<MultiFab>
                (amrex::convert(m_grids[amrlev][0], IntVect::TheNodeVector()),
                 m_dmap[amrlev][0], ncomp_s, 4);
            m_nosigma_stencil[amrlev]->setVal(0.0);
        }

        {
            const Geometry& geom = m_geom[amrlev][0];
            const auto dxinvarr = geom.InvCellSizeArray();

#ifdef AMREX_USE_EB
            auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
            const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
            const MultiFab* intg = m_integral[amrlev].get();
            const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

            MFItInfo mfi_info;
            if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            {
                FArrayBox sgfab;
                FArrayBox cnfab;

                for (MFIter mfi(*m_stencil[amrlev][0],mfi_info); mfi.isValid(); ++mfi)
                {
                    Box vbx = mfi.validbox();
                    AMREX_D_TERM(vbx.growLo(0,1);, vbx.growLo(1,1);, vbx.growLo(2,1));
                    Box bx = mfi.growntilebox(1);
                    bx &= vbx;
                    const Box& ccbx = amrex::enclosedCells(bx);
                    const Box& ccbxg1 = amrex::grow(ccbx,1);
                    const FArrayBox& sgfab_orig = (*m_sigma[amrlev][0][0])[mfi];
                    Array4<Real const> const& sgarr_orig = sgfab_orig.const_array();

                    Array4<Real> const& starr = m_stencil[amrlev][0]->array(mfi);
                    Array4<Real> const ns_starr = m_nosigma_stencil[amrlev] ?
                        m_nosigma_stencil[amrlev]->array(mfi) : Array4<Real>{};
#ifdef AMREX_USE_EB
                    Array4<Real const> const& intgarr = intg->const_array(mfi);

                    const int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                    bool regular = !factory;
                    if (factory)
                    {
                        Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        const auto& flag = (*flags)[mfi];
                        const auto& typ = flag.getType(ccbxg1);
                        if (typ == FabType::covered)
                        {
                            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx,ncomp_s,i,j,k,n,
                            {
                                starr(i,j,k,n) = 0.0;
                            });

                            if (ns_starr) {
                                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx,ncomp_s,i,j,k,n,
                                {
                                    ns_starr(i,j,k,n) = 0.0;
                                });
                            }
                        }
                        else if (typ == FabType::singlevalued)
                        {
                            const Box& btmp = ccbxg1 & sgfab_orig.box();

                            cnfab.resize(ccbxg1, ncomp_c);
                            Elixir cneli = cnfab.elixir();
                            Array4<Real> const& cnarr = cnfab.array();

                            sgfab.resize(ccbxg1);
                            Elixir sgeli = sgfab.elixir();
                            Array4<Real> const& sgarr = sgfab.array();

                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (btmp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                    mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                                    sgarr(i,j,k) = sgarr_orig(i,j,k);
                                } else {
                                    for (int n = 0; n < ncomp_c; ++n) {
                                        cnarr(i,j,k,n) = 0.0;
                                    }
                                    sgarr(i,j,k) = 0.0;
                                }
                            });

                            AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                            {
                                mlndlap_set_stencil_eb(i, j, k, starr, sgarr, cnarr, dxinvarr);
                            });

                            if (ns_starr) {
                                AMREX_HOST_DEVICE_FOR_3D(btmp, i, j, k,
                                {
                                    sgarr(i,j,k) = Real(1.0);
                                });
                                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                                {
                                    mlndlap_set_stencil_eb(i,j,k, ns_starr, sgarr, cnarr, dxinvarr);
                                });
                            }
                        }
                        else
                        {
                            regular = true;
                        }
                    }
                    if (regular)
#endif
                    {
                        const Box& btmp = ccbxg1 & sgfab_orig.box();

                        sgfab.resize(ccbxg1);
                        Elixir sgeli = sgfab.elixir();
                        Array4<Real> const& sgarr = sgfab.array();

                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (btmp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sgarr(i,j,k) = sgarr_orig(i,j,k);
                            } else {
                                sgarr(i,j,k) = 0.0;
                            }
                        });

                        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
                        {
                            mlndlap_set_stencil(tbx,starr,sgarr,dxinvarr);
                        });

                        if (ns_starr) {
                            AMREX_HOST_DEVICE_FOR_3D(btmp, i, j, k,
                            {
                                sgarr(i,j,k) = Real(1.0);
                            });

                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
                            {
                                mlndlap_set_stencil(tbx, ns_starr, sgarr, dxinvarr);
                            });
                        }
                    }
                }
            }

            // set_stencil_s0 has to be in a separate MFIter from set_stencil
            // because it uses other cells' data.
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*m_stencil[amrlev][0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                Array4<Real> const& starr = m_stencil[amrlev][0]->array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_set_stencil_s0(i,j,k,starr);
                });

                if (m_nosigma_stencil[amrlev]) {
                    Array4<Real> const& ns_starr = m_nosigma_stencil[amrlev]->array(mfi);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_set_stencil_s0(i,j,k,ns_starr);
                    });
                }
            }

            m_stencil[amrlev][0]->FillBoundary(geom.periodicity());

            if (m_nosigma_stencil[amrlev]) {
                m_nosigma_stencil[amrlev]->FillBoundary(geom.periodicity());
            }
        }

        for (int mglev = 1; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const MultiFab& fine = *m_stencil[amrlev][mglev-1];
            MultiFab& crse = *m_stencil[amrlev][mglev];
            bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
            MultiFab cfine;
            if (need_parallel_copy) {
                const BoxArray& ba = amrex::coarsen(fine.boxArray(), 2);
                cfine.define(ba, fine.DistributionMap(), fine.nComp(), 1);
                cfine.setVal(0.0);
            }

            MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                Box vbx = mfi.validbox();
                AMREX_D_TERM(vbx.growLo(0,1);, vbx.growLo(1,1);, vbx.growLo(2,1));
                Box bx = mfi.growntilebox(1);
                bx &= vbx;
                Array4<Real> const& csten = pcrse->array(mfi);
                Array4<Real const> const& fsten = fine.const_array(mfi);

                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_stencil_rap(i,j,k,csten,fsten);
                });
            }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*pcrse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                Array4<Real> const& starr = pcrse->array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_set_stencil_s0(i,j,k,starr);
                });
            }

            if (need_parallel_copy) {
                crse.ParallelCopy(cfine);
            }

            m_stencil[amrlev][mglev]->FillBoundary(m_geom[amrlev][mglev].periodicity());
        }
    }

#ifdef AMREX_USE_EB
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && m_stencil[amrlev][mglev]->isFusingCandidate()) {
                auto const& stma = m_stencil[amrlev][mglev]->const_arrays();
                auto const& dmskma = m_dirichlet_mask[amrlev][mglev]->arrays();
                ParallelFor(*m_stencil[amrlev][mglev],
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    if (stma[box_no](i,j,k,0) == Real(0.0)) {
                        dmskma[box_no](i,j,k) = 1;
                    }
                });
                // We only need to sync once at the end of this function.
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(*m_stencil[amrlev][mglev],TilingIfNotGPU()); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    Array4<Real const> const& starr = m_stencil[amrlev][mglev]->const_array(mfi);
                    Array4<int> const& dmskarr = m_dirichlet_mask[amrlev][mglev]->array(mfi);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        if (starr(i,j,k,0) == Real(0.0)) {
                            dmskarr(i,j,k) = 1;
                        }
                    });
                }
            }
        }
    }
#endif

#ifdef AMREX_USE_EB
    int max_eb_level = 0;
    for (int mglev = m_num_mg_levels[0]-1; mglev > 0; --mglev) {
        int mlo = m_dirichlet_mask[0][mglev]->min(0);
        if (!mlo) {
            // This level is good because not every nodes are Dirichlet.
            max_eb_level = mglev;
            break;
        }
    }
    if (max_eb_level+1 < m_num_mg_levels[0]) {
        resizeMultiGrid(max_eb_level+1);
    }
#endif

    {
        int amrlev = 0;
        int mglev = m_num_mg_levels[amrlev]-1;
        auto const& dotmasks = m_bottom_dot_mask.arrays();
        auto const& dirmasks = m_dirichlet_mask[amrlev][mglev]->const_arrays();
        amrex::ParallelFor(m_bottom_dot_mask,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
        {
            if (dirmasks[box_no](i,j,k)) {
                dotmasks[box_no](i,j,k) = Real(0.);
            }
        });
    }

    if (m_is_bottom_singular)
    {
        int amrlev = 0;
        int mglev = 0;
        auto const& dotmasks = m_coarse_dot_mask.arrays();
        auto const& dirmasks = m_dirichlet_mask[amrlev][mglev]->const_arrays();
        amrex::ParallelFor(m_coarse_dot_mask,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
        {
            if (dirmasks[box_no](i,j,k)) {
                dotmasks[box_no](i,j,k) = Real(0.);
            }
        });
    }

    Gpu::streamSynchronize();

    // This is only needed at the bottom.
    m_s0_norm0[0].back() = m_stencil[0].back()->norm0(0,0) * m_normalization_threshold;
}